

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Deconvolution_x86_avx512::forward
          (Deconvolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long *plVar1;
  uint *puVar2;
  uint uVar3;
  undefined4 uVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  _func_int **pp_Var13;
  int *piVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  Layer *pLVar19;
  _func_int **pp_Var20;
  _func_int *p_Var21;
  byte bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  byte bVar30;
  byte bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  ulong uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined4 uVar132;
  undefined4 uVar133;
  Allocator AVar134;
  Allocator AVar135;
  Allocator AVar136;
  Allocator AVar137;
  Allocator AVar138;
  Allocator AVar139;
  Allocator AVar140;
  Allocator AVar141;
  float afVar142 [16];
  float afVar143 [16];
  float afVar144 [16];
  float afVar145 [16];
  float afVar146 [16];
  float afVar147 [16];
  float afVar148 [16];
  float afVar149 [16];
  float afVar150 [16];
  float afVar151 [16];
  float afVar152 [16];
  float afVar153 [16];
  float afVar154 [16];
  float afVar155 [16];
  float afVar156 [16];
  float afVar157 [16];
  float afVar158 [16];
  Mat *pMVar159;
  uint uVar160;
  int iVar161;
  int iVar162;
  int iVar163;
  int iVar164;
  int iVar165;
  long lVar166;
  Allocator *pAVar167;
  _func_int *p_Var168;
  uint uVar169;
  uint uVar170;
  ulong uVar171;
  int iVar172;
  int iVar173;
  int y_8;
  uint uVar174;
  int iVar175;
  uint uVar176;
  undefined1 (*pauVar177) [16];
  undefined1 (*pauVar178) [32];
  float *pfVar179;
  int iVar180;
  ulong uVar181;
  undefined1 (*pauVar182) [64];
  void *pvVar183;
  void *pvVar184;
  int i_2;
  ulong uVar185;
  ulong uVar186;
  long lVar187;
  Allocator *pAVar188;
  int iVar189;
  uint uVar190;
  int y_5;
  ulong uVar191;
  int y;
  long lVar192;
  undefined1 (*pauVar193) [64];
  int y_1;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar226 [16];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  int iVar194;
  int iVar195;
  void *pvVar196;
  void *pvVar197;
  float *pfVar198;
  bool bVar199;
  ushort uVar200;
  ulong uVar201;
  ulong uVar202;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar203 [16];
  undefined1 auVar309 [64];
  undefined1 auVar310 [64];
  undefined1 auVar311 [64];
  undefined1 auVar312 [64];
  undefined1 auVar313 [64];
  undefined1 auVar314 [64];
  undefined1 auVar315 [64];
  undefined1 auVar316 [64];
  undefined1 auVar317 [64];
  undefined1 auVar318 [64];
  undefined1 auVar319 [64];
  undefined1 auVar320 [64];
  undefined1 auVar321 [64];
  undefined1 auVar322 [64];
  undefined1 auVar323 [64];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar324 [64];
  undefined1 auVar325 [64];
  undefined1 auVar326 [64];
  undefined1 auVar327 [64];
  undefined1 auVar328 [64];
  undefined1 auVar329 [64];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar330 [64];
  undefined1 auVar331 [64];
  undefined1 auVar332 [64];
  undefined1 auVar333 [64];
  undefined1 auVar334 [64];
  undefined1 auVar335 [64];
  undefined1 auVar336 [64];
  undefined1 auVar337 [64];
  undefined1 auVar338 [64];
  undefined1 auVar339 [64];
  undefined1 auVar340 [64];
  undefined1 auVar341 [64];
  undefined1 auVar342 [64];
  undefined1 auVar343 [64];
  undefined1 auVar344 [64];
  undefined1 auVar345 [64];
  undefined1 auVar346 [64];
  undefined1 auVar347 [64];
  undefined1 auVar348 [64];
  undefined1 auVar349 [64];
  undefined1 auVar350 [64];
  undefined1 auVar351 [64];
  undefined1 auVar352 [64];
  undefined1 auVar353 [64];
  undefined1 auVar354 [64];
  undefined1 auVar355 [64];
  undefined1 auVar356 [64];
  undefined1 auVar357 [64];
  undefined1 auVar358 [64];
  undefined1 auVar359 [64];
  undefined1 auVar360 [64];
  undefined1 auVar361 [64];
  undefined1 auVar362 [64];
  undefined1 auVar363 [64];
  undefined1 auVar364 [64];
  undefined1 auVar365 [64];
  undefined1 auVar366 [64];
  undefined1 auVar367 [64];
  int iVar368;
  int iVar369;
  int iVar370;
  int iVar371;
  int iVar372;
  int iVar373;
  int iVar374;
  int iVar375;
  int iVar376;
  int iVar377;
  int iVar378;
  float fVar379;
  undefined1 auVar380 [16];
  float fVar395;
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [64];
  undefined1 auVar390 [64];
  undefined1 auVar391 [64];
  undefined1 auVar392 [64];
  undefined1 auVar393 [64];
  undefined1 auVar394 [64];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  float fVar402;
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [32];
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  v4sf one;
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  undefined1 auVar427 [16];
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar433 [64];
  undefined1 auVar473 [32];
  undefined1 auVar474 [32];
  undefined1 auVar475 [32];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  undefined1 auVar457 [32];
  undefined1 auVar458 [32];
  undefined1 auVar459 [32];
  undefined1 auVar460 [32];
  undefined1 auVar461 [32];
  undefined1 auVar462 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar476 [32];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar477 [32];
  undefined1 auVar478 [32];
  undefined1 auVar479 [32];
  undefined1 auVar480 [32];
  undefined1 auVar481 [32];
  undefined1 auVar482 [32];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar483 [32];
  undefined1 auVar484 [32];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar485 [64];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [32];
  undefined1 auVar490 [32];
  undefined1 auVar491 [32];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [32];
  undefined1 auVar496 [32];
  undefined1 auVar497 [32];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [32];
  undefined1 auVar502 [32];
  undefined1 auVar503 [32];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [32];
  undefined1 auVar508 [32];
  undefined1 auVar509 [32];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [32];
  undefined1 auVar514 [32];
  undefined1 auVar515 [32];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [32];
  undefined1 auVar520 [32];
  undefined1 auVar521 [32];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM29 [64];
  int outw;
  int size;
  int h_3;
  int h;
  int outh_3;
  int outh;
  Option opt_b;
  _func_int **local_300;
  long local_2f0;
  long local_2e8;
  Allocator *local_2d8;
  Allocator *local_280;
  uint local_238;
  Mat local_228;
  undefined8 local_1d8;
  int local_1cc;
  Allocator *local_1c8;
  Option *local_1c0;
  uint local_1b8;
  int local_1b4;
  _func_int *local_1b0;
  undefined1 local_1a8 [64];
  undefined1 local_168 [64];
  Mat *local_120;
  long *local_118;
  undefined4 uStack_110;
  int iStack_10c;
  long local_108;
  undefined4 uStack_100;
  long *local_f8;
  undefined4 uStack_f0;
  int iStack_ec;
  undefined1 auStack_e8 [12];
  undefined8 local_d8;
  long local_d0;
  void *local_c8;
  int *piStack_c0;
  size_t local_b8;
  int local_b0;
  Allocator *local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  int local_90;
  size_t local_88;
  undefined1 local_78 [16];
  undefined1 auStack_68 [48];
  
  iVar10 = bottom_blob->w;
  iVar11 = bottom_blob->h;
  uVar171 = bottom_blob->elemsize;
  p_Var168 = this->_vptr_Deconvolution_x86_avx512[-3];
  uVar160 = *(uint *)(&this->field_0xd0 + (long)p_Var168);
  iVar189 = (*(int *)(&this->field_0xd4 + (long)p_Var168) + -1) *
            *(int *)(&this->field_0xdc + (long)p_Var168);
  local_1b0 = (_func_int *)CONCAT44(local_1b0._4_4_,iVar189);
  iVar173 = *(int *)(&this->field_0xe4 + (long)p_Var168);
  local_1b4 = (*(int *)(&this->field_0xd8 + (long)p_Var168) + -1) *
              *(int *)(&this->field_0xe0 + (long)p_Var168);
  iVar175 = *(int *)(&this->field_0xe8 + (long)p_Var168);
  iVar172 = *(int *)(&this->field_0xfc + (long)p_Var168);
  iVar180 = *(int *)(&this->field_0x100 + (long)p_Var168);
  uVar176 = bottom_blob->elempack;
  uVar190 = 1;
  if (opt->use_packing_layout == true) {
    if ((uVar160 & 0xf) == 0) {
      uVar190 = 0x10;
    }
    else if ((uVar160 & 7) == 0) {
      uVar190 = 8;
    }
    else {
      uVar190 = (uint)((uVar160 & 3) == 0) * 3 + 1;
    }
  }
  uVar160 = (int)uVar160 / (int)uVar190;
  local_228.cstep = 0;
  local_228.data = (Allocator *)0x0;
  local_228.refcount._0_4_ = 0;
  local_228.refcount._4_4_ = 0;
  local_228.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_228.elempack = 0;
  local_228.h = 0;
  p_Var168 = this->_vptr_Deconvolution_x86_avx512[-3];
  lVar192 = 0x10;
  local_228.allocator = (Allocator *)local_228.data;
  local_228.dims = (int)local_228.refcount;
  local_228.w = local_228.refcount._4_4_;
  local_228.d = (int)local_228.refcount;
  local_228.c = local_228.elempack;
  if (((((*(int *)(&this->field_0xec + (long)p_Var168) < 1) &&
        (*(int *)(&this->field_0xf0 + (long)p_Var168) < 1)) &&
       (*(int *)(&this->field_0xf4 + (long)p_Var168) < 1)) &&
      (*(int *)(&this->field_0xf8 + (long)p_Var168) < 1)) &&
     (((*(int *)(&this->field_0x104 + (long)p_Var168) < 1 ||
       (*(int *)(&this->field_0x108 + (long)p_Var168) < 1)) && (lVar192 = 8, &local_228 != top_blob)
      ))) {
    piVar14 = top_blob->refcount;
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + 1;
      UNLOCK();
    }
    local_228.data = top_blob->data;
    local_228.refcount._0_4_ = (int)top_blob->refcount;
    local_228.refcount._4_4_ = (uint)((ulong)top_blob->refcount >> 0x20);
    local_228.elemsize = top_blob->elemsize;
    local_228.elempack = top_blob->elempack;
    local_228.allocator = top_blob->allocator;
    uVar6 = top_blob->dims;
    uVar7 = top_blob->w;
    uVar8 = top_blob->h;
    uVar9 = top_blob->d;
    local_228.c = top_blob->c;
    local_228.cstep = top_blob->cstep;
    local_228.dims = uVar6;
    local_228.w = uVar7;
    local_228.h = uVar8;
    local_228.d = uVar9;
  }
  iVar172 = (iVar10 + -1) * iVar173 + iVar189 + iVar172 + 1;
  local_1c0 = opt;
  local_120 = top_blob;
  Mat::create(&local_228,iVar172,iVar180 + (iVar11 + -1) * iVar175 + local_1b4 + 1,uVar160,
              (uVar171 / (ulong)(long)(int)uVar176) * (ulong)uVar190,uVar190,
              *(Allocator **)(&opt->lightmode + lVar192));
  iVar173 = local_228.w;
  pvVar197 = local_228.data;
  afVar151 = _ps512_cephes_exp_p5;
  afVar150 = _ps512_cephes_exp_p4;
  afVar149 = _ps512_cephes_exp_p3;
  afVar148 = _ps512_cephes_exp_p2;
  afVar147 = _ps512_cephes_exp_p1;
  afVar146 = _ps512_cephes_exp_p0;
  afVar145 = _ps512_cephes_LOG2EF;
  afVar144 = _ps512_exp_lo;
  afVar143 = _ps512_exp_hi;
  afVar142 = _ps512_1;
  iVar175 = -100;
  if (((Allocator *)local_228.data == (Allocator *)0x0) ||
     (local_1d8 = (_func_int **)(long)local_228.c, local_228.cstep * (long)local_1d8 == 0))
  goto LAB_0027f9d1;
  pp_Var13 = this->_vptr_Deconvolution_x86_avx512;
  p_Var168 = pp_Var13[-3];
  uVar169 = *(uint *)(&this->field_0xd4 + (long)p_Var168);
  uVar170 = *(uint *)(&this->field_0xd8 + (long)p_Var168);
  local_1cc = uVar170 * uVar169;
  if (local_1c0->use_sgemm_convolution == true) {
    piVar14 = bottom_blob->refcount;
    local_c8 = bottom_blob->data;
    piStack_c0 = bottom_blob->refcount;
    local_b8 = bottom_blob->elemsize;
    local_b0 = bottom_blob->elempack;
    local_a8 = bottom_blob->allocator;
    iVar173 = bottom_blob->h;
    iVar175 = bottom_blob->w;
    uVar132 = bottom_blob->dims;
    uVar133 = bottom_blob->d;
    local_90 = bottom_blob->c;
    local_88 = bottom_blob->cstep;
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + 1;
      UNLOCK();
      iVar175 = bottom_blob->w;
      iVar173 = bottom_blob->h;
    }
    local_a0 = CONCAT44(iVar173 * iVar175,uVar132);
    uStack_98 = CONCAT44(uVar133,1);
    local_d8 = 0;
    local_118 = (long *)0x0;
    uStack_110 = 0;
    iStack_10c = 0;
    local_108 = 0;
    uStack_100 = 0;
    auStack_e8 = SUB1612(ZEXT816(0),0);
    auStack_68 = SUB6448(*local_1c0,0x10);
    local_78._0_8_ = SUB648(*local_1c0,0);
    local_78._8_8_ = local_228.allocator;
    local_f8 = local_118;
    uStack_f0 = uStack_110;
    iStack_ec = iStack_10c;
    (*this->gemm->_vptr_Layer[7])();
    pp_Var13 = this->_vptr_Deconvolution_x86_avx512;
    p_Var168 = pp_Var13[-3];
    iVar173 = (iVar172 * *(int *)(&this->field_0xe8 + (long)p_Var168) -
              *(int *)(&this->field_0xe4 + (long)p_Var168) * iVar10) * uVar190;
    if (uVar190 < 8) {
      bVar199 = uVar190 == 1;
joined_r0x0027b457:
      if (bVar199) {
        if (0 < (int)uVar160) {
          uVar186 = (long)local_228.h * (long)local_228.w;
          uVar181 = 0;
          uVar171 = (local_228.elemsize * uVar186 + 0xf & 0xfffffffffffffff0) / local_228.elemsize;
          if (local_228.dims == 4) {
            uVar171 = uVar186;
          }
          pp_Var13 = this->_vptr_Deconvolution_x86_avx512;
          iVar175 = (int)uVar171 * local_228.d;
          p_Var168 = pp_Var13[-3];
          auVar336 = vpbroadcastq_avx512f();
          auVar337 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar338 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          pAVar188 = (Allocator *)local_228.data;
          do {
            auVar203 = ZEXT816(0) << 0x40;
            if ((*(long *)(&this->field_0x1a8 + (long)p_Var168) != 0) &&
               ((long)*(int *)(&this->field_0x1e0 + (long)p_Var168) *
                *(long *)(&this->field_0x1e8 + (long)p_Var168) != 0)) {
              auVar203 = ZEXT416(*(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var168) +
                                          uVar181 * 4));
            }
            if (0 < iVar175) {
              auVar339 = vbroadcastss_avx512f(auVar203);
              uVar171 = 0;
              do {
                auVar340 = vpbroadcastq_avx512f();
                auVar341 = vporq_avx512f(auVar340,auVar337);
                auVar340 = vporq_avx512f(auVar340,auVar338);
                uVar40 = vpcmpuq_avx512f(auVar340,auVar336,2);
                uVar41 = vpcmpuq_avx512f(auVar341,auVar336,2);
                bVar30 = (byte)uVar41;
                uVar200 = CONCAT11(bVar30,(byte)uVar40);
                puVar2 = (uint *)((long)&pAVar188->_vptr_Allocator + uVar171 * 4);
                bVar199 = (bool)((byte)uVar40 & 1);
                bVar23 = (bool)((byte)(uVar200 >> 1) & 1);
                bVar24 = (bool)((byte)(uVar200 >> 2) & 1);
                bVar25 = (bool)((byte)(uVar200 >> 3) & 1);
                bVar26 = (bool)((byte)(uVar200 >> 4) & 1);
                bVar27 = (bool)((byte)(uVar200 >> 5) & 1);
                bVar28 = (bool)((byte)(uVar200 >> 6) & 1);
                bVar29 = (bool)((byte)(uVar200 >> 7) & 1);
                bVar32 = (bool)(bVar30 >> 1 & 1);
                bVar33 = (bool)(bVar30 >> 2 & 1);
                bVar34 = (bool)(bVar30 >> 3 & 1);
                bVar35 = (bool)(bVar30 >> 4 & 1);
                bVar36 = (bool)(bVar30 >> 5 & 1);
                bVar37 = (bool)(bVar30 >> 6 & 1);
                *puVar2 = (uint)bVar199 * auVar339._0_4_ | (uint)!bVar199 * *puVar2;
                puVar2[1] = (uint)bVar23 * auVar339._4_4_ | (uint)!bVar23 * puVar2[1];
                puVar2[2] = (uint)bVar24 * auVar339._8_4_ | (uint)!bVar24 * puVar2[2];
                puVar2[3] = (uint)bVar25 * auVar339._12_4_ | (uint)!bVar25 * puVar2[3];
                puVar2[4] = (uint)bVar26 * auVar339._16_4_ | (uint)!bVar26 * puVar2[4];
                puVar2[5] = (uint)bVar27 * auVar339._20_4_ | (uint)!bVar27 * puVar2[5];
                puVar2[6] = (uint)bVar28 * auVar339._24_4_ | (uint)!bVar28 * puVar2[6];
                puVar2[7] = (uint)bVar29 * auVar339._28_4_ | (uint)!bVar29 * puVar2[7];
                puVar2[8] = (uint)(bVar30 & 1) * auVar339._32_4_ |
                            (uint)!(bool)(bVar30 & 1) * puVar2[8];
                puVar2[9] = (uint)bVar32 * auVar339._36_4_ | (uint)!bVar32 * puVar2[9];
                puVar2[10] = (uint)bVar33 * auVar339._40_4_ | (uint)!bVar33 * puVar2[10];
                puVar2[0xb] = (uint)bVar34 * auVar339._44_4_ | (uint)!bVar34 * puVar2[0xb];
                puVar2[0xc] = (uint)bVar35 * auVar339._48_4_ | (uint)!bVar35 * puVar2[0xc];
                puVar2[0xd] = (uint)bVar36 * auVar339._52_4_ | (uint)!bVar36 * puVar2[0xd];
                puVar2[0xe] = (uint)bVar37 * auVar339._56_4_ | (uint)!bVar37 * puVar2[0xe];
                puVar2[0xf] = (uint)(bVar30 >> 7) * auVar339._60_4_ |
                              (uint)!(bool)(bVar30 >> 7) * puVar2[0xf];
                uVar171 = uVar171 + 0x10;
              } while ((iVar175 + 0xfU & 0xfffffff0) != uVar171);
              p_Var168 = pp_Var13[-3];
            }
            if (0 < *(int *)(&this->field_0xd8 + (long)p_Var168)) {
              pfVar198 = (float *)(uVar181 * (long)local_1cc * iStack_ec * local_108 +
                                  (long)local_118);
              iVar172 = 0;
              do {
                if (0 < *(int *)(&this->field_0xd4 + (long)p_Var168)) {
                  iVar180 = 0;
                  do {
                    if (0 < iVar11) {
                      pfVar179 = (float *)((long)&((Allocator *)local_228.data)->_vptr_Allocator +
                                          (long)iVar180 *
                                          (long)*(int *)(&this->field_0xdc + (long)p_Var168) * 4 +
                                          (long)iVar172 *
                                          (long)*(int *)(&this->field_0xe0 + (long)p_Var168) *
                                          local_228.elemsize * (long)local_228.w +
                                          local_228.cstep * local_228.elemsize * uVar181);
                      iVar189 = 0;
                      do {
                        iVar195 = iVar10;
                        if (0 < iVar10) {
                          do {
                            *pfVar179 = *pfVar179 + *pfVar198;
                            p_Var168 = pp_Var13[-3];
                            pfVar179 = pfVar179 + *(int *)(&this->field_0xe4 + (long)p_Var168);
                            pfVar198 = pfVar198 + 1;
                            iVar195 = iVar195 + -1;
                          } while (iVar195 != 0);
                        }
                        pfVar179 = pfVar179 + iVar173;
                        iVar189 = iVar189 + 1;
                      } while (iVar189 != iVar11);
                    }
                    iVar180 = iVar180 + 1;
                  } while (iVar180 < *(int *)(&this->field_0xd4 + (long)p_Var168));
                }
                iVar172 = iVar172 + 1;
              } while (iVar172 < *(int *)(&this->field_0xd8 + (long)p_Var168));
            }
            uVar181 = uVar181 + 1;
            pAVar188 = (Allocator *)
                       ((long)&pAVar188->_vptr_Allocator + local_228.cstep * local_228.elemsize);
          } while (uVar181 != uVar160);
        }
      }
      else if ((uVar190 == 4) && (0 < (int)uVar160)) {
        pp_Var13 = this->_vptr_Deconvolution_x86_avx512;
        lVar192 = (long)local_1cc;
        p_Var168 = pp_Var13[-3];
        uVar171 = 0;
        do {
          sVar15 = local_228.elemsize;
          pfVar198 = (float *)((long)iStack_ec * uVar171 * lVar192 * local_108 + (long)local_118);
          lVar187 = (long)local_228.w;
          pAVar188 = (Allocator *)
                     ((long)(_func_int ***)local_228.data +
                     local_228.cstep * uVar171 * local_228.elemsize);
          uVar181 = local_228.h * lVar187;
          uVar186 = (local_228.elemsize * uVar181 + 0xf & 0xfffffffffffffff0) / local_228.elemsize;
          if (local_228.dims == 4) {
            uVar186 = uVar181;
          }
          if ((*(long *)(&this->field_0x1a8 + (long)p_Var168) == 0) ||
             ((long)*(int *)(&this->field_0x1e0 + (long)p_Var168) *
              *(long *)(&this->field_0x1e8 + (long)p_Var168) == 0)) {
            uVar176 = local_228.d * (int)uVar186;
            if (0 < (int)uVar176) {
              memset(pAVar188,0,(ulong)uVar176 << 4);
            }
          }
          else {
            iVar175 = local_228.d * (int)uVar186;
            if (0 < iVar175) {
              auVar203 = *(undefined1 (*) [16])
                          (*(long *)(&this->field_0x1a8 + (long)p_Var168) + uVar171 * 0x10);
              pAVar167 = pAVar188;
              do {
                *(undefined1 (*) [16])pAVar167 = auVar203;
                pAVar167 = pAVar167 + 2;
                iVar175 = iVar175 + -1;
              } while (iVar175 != 0);
            }
          }
          p_Var168 = pp_Var13[-3];
          if (0 < *(int *)(&this->field_0xd8 + (long)p_Var168)) {
            iVar175 = 0;
            do {
              if (0 < *(int *)(&this->field_0xd4 + (long)p_Var168)) {
                iVar172 = 0;
                do {
                  if (0 < iVar11) {
                    pauVar177 = (undefined1 (*) [16])
                                ((long)&pAVar188->_vptr_Allocator +
                                (long)(*(int *)(&this->field_0xdc + (long)p_Var168) * iVar172 * 4) *
                                4 + (long)iVar175 *
                                    (long)*(int *)(&this->field_0xe0 + (long)p_Var168) *
                                    sVar15 * lVar187);
                    iVar180 = 0;
                    do {
                      iVar189 = iVar10;
                      if (0 < iVar10) {
                        do {
                          auVar380._0_4_ = *pfVar198 + *(float *)*pauVar177;
                          auVar380._4_4_ = pfVar198[1] + *(float *)(*pauVar177 + 4);
                          auVar380._8_4_ = pfVar198[2] + *(float *)(*pauVar177 + 8);
                          auVar380._12_4_ = pfVar198[3] + *(float *)(*pauVar177 + 0xc);
                          *pauVar177 = auVar380;
                          p_Var168 = pp_Var13[-3];
                          pauVar177 = pauVar177 + *(int *)(&this->field_0xe4 + (long)p_Var168);
                          pfVar198 = pfVar198 + 4;
                          iVar189 = iVar189 + -1;
                        } while (iVar189 != 0);
                      }
                      pauVar177 = (undefined1 (*) [16])(*pauVar177 + (long)iVar173 * 4);
                      iVar180 = iVar180 + 1;
                    } while (iVar180 != iVar11);
                  }
                  iVar172 = iVar172 + 1;
                } while (iVar172 < *(int *)(&this->field_0xd4 + (long)p_Var168));
              }
              iVar175 = iVar175 + 1;
            } while (iVar175 < *(int *)(&this->field_0xd8 + (long)p_Var168));
          }
          uVar171 = uVar171 + 1;
        } while (uVar171 != uVar160);
      }
    }
    else if (uVar190 == 8) {
      if (0 < (int)uVar160) {
        pp_Var13 = this->_vptr_Deconvolution_x86_avx512;
        lVar192 = (long)local_1cc;
        p_Var168 = pp_Var13[-3];
        uVar171 = 0;
        do {
          sVar15 = local_228.elemsize;
          pfVar198 = (float *)((long)iStack_ec * uVar171 * lVar192 * local_108 + (long)local_118);
          lVar187 = (long)local_228.w;
          pAVar188 = (Allocator *)
                     ((long)(_func_int ***)local_228.data +
                     local_228.cstep * uVar171 * local_228.elemsize);
          uVar181 = local_228.h * lVar187;
          uVar186 = (local_228.elemsize * uVar181 + 0xf & 0xfffffffffffffff0) / local_228.elemsize;
          if (local_228.dims == 4) {
            uVar186 = uVar181;
          }
          if ((*(long *)(&this->field_0x1a8 + (long)p_Var168) == 0) ||
             ((long)*(int *)(&this->field_0x1e0 + (long)p_Var168) *
              *(long *)(&this->field_0x1e8 + (long)p_Var168) == 0)) {
            uVar176 = local_228.d * (int)uVar186;
            if (0 < (int)uVar176) {
              memset(pAVar188,0,(ulong)uVar176 << 5);
            }
          }
          else {
            iVar175 = local_228.d * (int)uVar186;
            if (0 < iVar175) {
              auVar257 = *(undefined1 (*) [32])
                          (*(long *)(&this->field_0x1a8 + (long)p_Var168) + uVar171 * 0x20);
              pAVar167 = pAVar188;
              do {
                *(undefined1 (*) [32])pAVar167 = auVar257;
                pAVar167 = pAVar167 + 4;
                iVar175 = iVar175 + -1;
              } while (iVar175 != 0);
            }
          }
          p_Var168 = pp_Var13[-3];
          if (0 < *(int *)(&this->field_0xd8 + (long)p_Var168)) {
            iVar175 = 0;
            do {
              if (0 < *(int *)(&this->field_0xd4 + (long)p_Var168)) {
                iVar172 = 0;
                do {
                  if (0 < iVar11) {
                    pauVar178 = (undefined1 (*) [32])
                                ((long)&pAVar188->_vptr_Allocator +
                                (long)(*(int *)(&this->field_0xdc + (long)p_Var168) * iVar172 * 8) *
                                4 + (long)iVar175 *
                                    (long)*(int *)(&this->field_0xe0 + (long)p_Var168) *
                                    sVar15 * lVar187);
                    iVar180 = 0;
                    do {
                      iVar189 = iVar10;
                      if (0 < iVar10) {
                        do {
                          auVar257._0_4_ = *pfVar198 + *(float *)*pauVar178;
                          auVar257._4_4_ = pfVar198[1] + *(float *)(*pauVar178 + 4);
                          auVar257._8_4_ = pfVar198[2] + *(float *)(*pauVar178 + 8);
                          auVar257._12_4_ = pfVar198[3] + *(float *)(*pauVar178 + 0xc);
                          auVar257._16_4_ = pfVar198[4] + *(float *)(*pauVar178 + 0x10);
                          auVar257._20_4_ = pfVar198[5] + *(float *)(*pauVar178 + 0x14);
                          auVar257._24_4_ = pfVar198[6] + *(float *)(*pauVar178 + 0x18);
                          auVar257._28_4_ = pfVar198[7] + *(float *)(*pauVar178 + 0x1c);
                          *pauVar178 = auVar257;
                          p_Var168 = pp_Var13[-3];
                          pauVar178 = pauVar178 + *(int *)(&this->field_0xe4 + (long)p_Var168);
                          pfVar198 = pfVar198 + 8;
                          iVar189 = iVar189 + -1;
                        } while (iVar189 != 0);
                      }
                      pauVar178 = (undefined1 (*) [32])(*pauVar178 + (long)iVar173 * 4);
                      iVar180 = iVar180 + 1;
                    } while (iVar180 != iVar11);
                  }
                  iVar172 = iVar172 + 1;
                } while (iVar172 < *(int *)(&this->field_0xd4 + (long)p_Var168));
              }
              iVar175 = iVar175 + 1;
            } while (iVar175 < *(int *)(&this->field_0xd8 + (long)p_Var168));
          }
          uVar171 = uVar171 + 1;
        } while (uVar171 != uVar160);
        bVar199 = false;
        goto joined_r0x0027b457;
      }
    }
    else if ((uVar190 == 0x10) && (0 < (int)uVar160)) {
      lVar192 = (long)local_1cc;
      uVar171 = 0;
      do {
        sVar15 = local_228.elemsize;
        pauVar193 = (undefined1 (*) [64])
                    ((long)iStack_ec * uVar171 * lVar192 * local_108 + (long)local_118);
        lVar187 = (long)local_228.w;
        pAVar188 = (Allocator *)
                   ((long)(_func_int ***)local_228.data +
                   local_228.cstep * uVar171 * local_228.elemsize);
        uVar181 = local_228.h * lVar187;
        uVar186 = (local_228.elemsize * uVar181 + 0xf & 0xfffffffffffffff0) / local_228.elemsize;
        if (local_228.dims == 4) {
          uVar186 = uVar181;
        }
        if ((*(long *)(&this->field_0x1a8 + (long)p_Var168) == 0) ||
           ((long)*(int *)(&this->field_0x1e0 + (long)p_Var168) *
            *(long *)(&this->field_0x1e8 + (long)p_Var168) == 0)) {
          uVar176 = local_228.d * (int)uVar186;
          if (0 < (int)uVar176) {
            memset(pAVar188,0,(ulong)uVar176 << 6);
          }
        }
        else {
          iVar175 = local_228.d * (int)uVar186;
          if (0 < iVar175) {
            plVar1 = (long *)(*(long *)(&this->field_0x1a8 + (long)p_Var168) + uVar171 * 0x40);
            AVar134._vptr_Allocator = (_func_int **)*plVar1;
            AVar135._vptr_Allocator = (_func_int **)plVar1[1];
            AVar136._vptr_Allocator = (_func_int **)plVar1[2];
            AVar137._vptr_Allocator = (_func_int **)plVar1[3];
            AVar138._vptr_Allocator = (_func_int **)plVar1[4];
            AVar139._vptr_Allocator = (_func_int **)plVar1[5];
            AVar140._vptr_Allocator = (_func_int **)plVar1[6];
            AVar141._vptr_Allocator = (_func_int **)plVar1[7];
            pAVar167 = pAVar188;
            do {
              pAVar167->_vptr_Allocator = AVar134._vptr_Allocator;
              pAVar167[1]._vptr_Allocator = AVar135._vptr_Allocator;
              pAVar167[2]._vptr_Allocator = AVar136._vptr_Allocator;
              pAVar167[3]._vptr_Allocator = AVar137._vptr_Allocator;
              pAVar167[4]._vptr_Allocator = AVar138._vptr_Allocator;
              pAVar167[5]._vptr_Allocator = AVar139._vptr_Allocator;
              pAVar167[6]._vptr_Allocator = AVar140._vptr_Allocator;
              pAVar167[7]._vptr_Allocator = AVar141._vptr_Allocator;
              pAVar167 = pAVar167 + 8;
              iVar175 = iVar175 + -1;
            } while (iVar175 != 0);
          }
        }
        p_Var168 = pp_Var13[-3];
        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var168)) {
          iVar175 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)p_Var168)) {
              iVar172 = 0;
              do {
                if (0 < iVar11) {
                  pauVar182 = (undefined1 (*) [64])
                              ((long)&pAVar188->_vptr_Allocator +
                              (long)(*(int *)(&this->field_0xdc + (long)p_Var168) * iVar172 * 0x10)
                              * 4 + (long)*(int *)(&this->field_0xe0 + (long)p_Var168) *
                                    (long)iVar175 * sVar15 * lVar187);
                  iVar180 = 0;
                  do {
                    iVar189 = iVar10;
                    if (0 < iVar10) {
                      do {
                        auVar336 = vaddps_avx512f(*pauVar193,*pauVar182);
                        *pauVar182 = auVar336;
                        p_Var168 = pp_Var13[-3];
                        pauVar182 = pauVar182 + *(int *)(&this->field_0xe4 + (long)p_Var168);
                        pauVar193 = pauVar193 + 1;
                        iVar189 = iVar189 + -1;
                      } while (iVar189 != 0);
                    }
                    pauVar182 = (undefined1 (*) [64])(*pauVar182 + (long)iVar173 * 4);
                    iVar180 = iVar180 + 1;
                  } while (iVar180 != iVar11);
                }
                iVar172 = iVar172 + 1;
              } while (iVar172 < *(int *)(&this->field_0xd4 + (long)p_Var168));
            }
            iVar175 = iVar175 + 1;
          } while (iVar175 < *(int *)(&this->field_0xd8 + (long)p_Var168));
        }
        uVar171 = uVar171 + 1;
      } while (uVar171 != uVar160);
    }
    pLVar19 = this->activation;
    if (pLVar19 != (Layer *)0x0) {
      (*pLVar19->_vptr_Layer[9])(pLVar19,&local_228,local_1c0);
    }
    piVar14 = (int *)CONCAT44(iStack_10c,uStack_110);
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (local_f8 == (long *)0x0) {
          if (local_118 != (long *)0x0) {
            free(local_118);
          }
        }
        else {
          (**(code **)(*local_f8 + 0x18))();
        }
      }
    }
    if (piStack_c0 != (int *)0x0) {
      LOCK();
      *piStack_c0 = *piStack_c0 + -1;
      UNLOCK();
      if (*piStack_c0 == 0) {
        if (local_a8 == (Allocator *)0x0) {
          if (local_c8 != (void *)0x0) {
            free(local_c8);
          }
        }
        else {
          (*local_a8->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    if ((uVar176 == 0x10) && (uVar190 == 0x10)) {
      if (local_228.c < 1) goto LAB_0027f987;
      iVar10 = *(int *)(&this->field_0xdc + (long)p_Var168);
      iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var168);
      iVar175 = *(int *)(&this->field_0xe4 + (long)p_Var168);
      iVar172 = *(int *)(&this->field_0xe8 + (long)p_Var168);
      uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var168);
      lVar192 = *(long *)(&this->field_0x1a8 + (long)p_Var168);
      auVar336 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar337 = vxorps_avx512dq(auVar336,(undefined1  [64])_ps512_cephes_log_q2);
      in_ZMM9 = vxorps_avx512dq(auVar336,(undefined1  [64])_ps512_cephes_log_q1);
      auVar338 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      local_1a8 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar336);
      local_300 = (_func_int **)0x0;
      auVar203 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
      in_ZMM29 = ZEXT1664(auVar203);
      auVar336 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      do {
        local_168._0_4_ = local_228.h;
        if (0 < local_228.h) {
          iVar180 = bottom_blob->w;
          iVar189 = bottom_blob->h;
          pAVar188 = (Allocator *)
                     ((long)(_func_int ***)local_228.data +
                     local_228.cstep * (long)local_300 * local_228.elemsize);
          uVar160 = bottom_blob->c;
          iVar195 = 0;
          do {
            if (0 < local_228.w) {
              uVar174 = 0;
              iVar194 = (1 - uVar169) * iVar10;
              do {
                if (lVar192 == 0) {
                  auVar339 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar339 = *(undefined1 (*) [64])(lVar192 + (long)local_300 * 0x40);
                }
                if (0 < (int)uVar160) {
                  pvVar196 = (void *)((this->weight_data_tm).cstep * (long)local_300 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar183 = bottom_blob->data;
                  uVar171 = 0;
                  do {
                    if (0 < (int)uVar170) {
                      uVar181 = 0;
                      uVar186 = 0;
                      do {
                        iVar161 = (((int)uVar186 - uVar170) + 1) * iVar11 + iVar195;
                        if ((((-1 < iVar161) &&
                             (iVar162 = iVar161 / iVar172, iVar161 % iVar172 == 0)) &&
                            (0 < (int)uVar169)) && (iVar162 < iVar189)) {
                          lVar187 = (long)iVar162 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar171;
                          uVar185 = uVar181;
                          uVar191 = (ulong)uVar169;
                          iVar161 = iVar194;
                          do {
                            if (((-1 < iVar161) &&
                                (iVar162 = iVar161 / iVar175, iVar161 % iVar175 == 0)) &&
                               (iVar162 < iVar180)) {
                              lVar166 = (long)(iVar162 << 4);
                              auVar340 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187)));
                              auVar341 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 4)));
                              in_ZMM16 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 8)));
                              in_ZMM17 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0xc)));
                              auVar309 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x10)))
                              ;
                              auVar310 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x14)))
                              ;
                              auVar311 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x18)))
                              ;
                              auVar312 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x1c)))
                              ;
                              auVar313 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x20)))
                              ;
                              auVar314 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x24)))
                              ;
                              auVar315 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x28)))
                              ;
                              auVar316 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x2c)))
                              ;
                              auVar317 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x30)))
                              ;
                              auVar318 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x34)))
                              ;
                              auVar319 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x38)))
                              ;
                              auVar320 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x3c)))
                              ;
                              uVar201 = uVar185 & 0xffffffff;
                              auVar339 = vfmadd231ps_avx512f(auVar339,auVar340,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4));
                              auVar339 = vfmadd231ps_avx512f(auVar339,auVar341,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0x40))
                              ;
                              auVar339 = vfmadd231ps_avx512f(auVar339,in_ZMM16,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0x80))
                              ;
                              auVar339 = vfmadd231ps_avx512f(auVar339,in_ZMM17,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0xc0))
                              ;
                              auVar339 = vfmadd231ps_avx512f(auVar339,auVar309,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0x100)
                                                            );
                              auVar339 = vfmadd231ps_avx512f(auVar339,auVar310,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0x140)
                                                            );
                              auVar339 = vfmadd231ps_avx512f(auVar339,auVar311,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0x180)
                                                            );
                              auVar339 = vfmadd231ps_avx512f(auVar339,auVar312,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0x1c0)
                                                            );
                              auVar339 = vfmadd231ps_avx512f(auVar339,auVar313,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0x200)
                                                            );
                              auVar339 = vfmadd231ps_avx512f(auVar339,auVar314,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0x240)
                                                            );
                              auVar339 = vfmadd231ps_avx512f(auVar339,auVar315,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0x280)
                                                            );
                              auVar339 = vfmadd231ps_avx512f(auVar339,auVar316,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0x2c0)
                                                            );
                              auVar339 = vfmadd231ps_avx512f(auVar339,auVar317,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0x300)
                                                            );
                              auVar339 = vfmadd231ps_avx512f(auVar339,auVar318,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0x340)
                                                            );
                              auVar339 = vfmadd231ps_avx512f(auVar339,auVar319,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0x380)
                                                            );
                              auVar339 = vfmadd231ps_avx512f(auVar339,auVar320,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0x3c0)
                                                            );
                            }
                            uVar185 = uVar185 + 0x100;
                            iVar161 = iVar161 + iVar10;
                            uVar191 = uVar191 - 1;
                          } while (uVar191 != 0);
                        }
                        uVar186 = uVar186 + 1;
                        uVar181 = uVar181 + (ulong)uVar169 * 0x100;
                      } while (uVar186 != uVar170);
                    }
                    pvVar196 = (void *)((long)pvVar196 + (long)(int)(uVar169 * uVar170 * 0x100) * 4)
                    ;
                    uVar171 = uVar171 + 1;
                  } while (uVar171 != uVar160);
                }
                switch(uVar12) {
                case 1:
                  auVar339 = vmaxps_avx512f(auVar339,in_ZMM29);
                  break;
                case 2:
                  uVar171 = vcmpps_avx512f(auVar339,in_ZMM29,1);
                  uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                  auVar315._4_4_ = uVar4;
                  auVar315._0_4_ = uVar4;
                  auVar315._8_4_ = uVar4;
                  auVar315._12_4_ = uVar4;
                  auVar315._16_4_ = uVar4;
                  auVar315._20_4_ = uVar4;
                  auVar315._24_4_ = uVar4;
                  auVar315._28_4_ = uVar4;
                  auVar315._32_4_ = uVar4;
                  auVar315._36_4_ = uVar4;
                  auVar315._40_4_ = uVar4;
                  auVar315._44_4_ = uVar4;
                  auVar315._48_4_ = uVar4;
                  auVar315._52_4_ = uVar4;
                  auVar315._56_4_ = uVar4;
                  auVar315._60_4_ = uVar4;
                  auVar340 = vmulps_avx512f(auVar339,auVar315);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  auVar316._0_4_ = (uint)bVar199 * auVar340._0_4_ | (uint)!bVar199 * auVar339._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  auVar316._4_4_ = (uint)bVar199 * auVar340._4_4_ | (uint)!bVar199 * auVar339._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  auVar316._8_4_ = (uint)bVar199 * auVar340._8_4_ | (uint)!bVar199 * auVar339._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  auVar316._12_4_ =
                       (uint)bVar199 * auVar340._12_4_ | (uint)!bVar199 * auVar339._12_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                  auVar316._16_4_ =
                       (uint)bVar199 * auVar340._16_4_ | (uint)!bVar199 * auVar339._16_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                  auVar316._20_4_ =
                       (uint)bVar199 * auVar340._20_4_ | (uint)!bVar199 * auVar339._20_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                  auVar316._24_4_ =
                       (uint)bVar199 * auVar340._24_4_ | (uint)!bVar199 * auVar339._24_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 7) & 1);
                  auVar316._28_4_ =
                       (uint)bVar199 * auVar340._28_4_ | (uint)!bVar199 * auVar339._28_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 8) & 1);
                  auVar316._32_4_ =
                       (uint)bVar199 * auVar340._32_4_ | (uint)!bVar199 * auVar339._32_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 9) & 1);
                  auVar316._36_4_ =
                       (uint)bVar199 * auVar340._36_4_ | (uint)!bVar199 * auVar339._36_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 10) & 1);
                  auVar316._40_4_ =
                       (uint)bVar199 * auVar340._40_4_ | (uint)!bVar199 * auVar339._40_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xb) & 1);
                  auVar316._44_4_ =
                       (uint)bVar199 * auVar340._44_4_ | (uint)!bVar199 * auVar339._44_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xc) & 1);
                  auVar316._48_4_ =
                       (uint)bVar199 * auVar340._48_4_ | (uint)!bVar199 * auVar339._48_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xd) & 1);
                  auVar316._52_4_ =
                       (uint)bVar199 * auVar340._52_4_ | (uint)!bVar199 * auVar339._52_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xe) & 1);
                  auVar316._56_4_ =
                       (uint)bVar199 * auVar340._56_4_ | (uint)!bVar199 * auVar339._56_4_;
                  bVar199 = SUB81(uVar171 >> 0xf,0);
                  auVar316._60_4_ =
                       (uint)bVar199 * auVar340._60_4_ | (uint)!bVar199 * auVar339._60_4_;
                  auVar339 = auVar316;
                  break;
                case 3:
                  uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                  auVar314._4_4_ = uVar4;
                  auVar314._0_4_ = uVar4;
                  auVar314._8_4_ = uVar4;
                  auVar314._12_4_ = uVar4;
                  auVar314._16_4_ = uVar4;
                  auVar314._20_4_ = uVar4;
                  auVar314._24_4_ = uVar4;
                  auVar314._28_4_ = uVar4;
                  auVar314._32_4_ = uVar4;
                  auVar314._36_4_ = uVar4;
                  auVar314._40_4_ = uVar4;
                  auVar314._44_4_ = uVar4;
                  auVar314._48_4_ = uVar4;
                  auVar314._52_4_ = uVar4;
                  auVar314._56_4_ = uVar4;
                  auVar314._60_4_ = uVar4;
                  auVar340 = vmaxps_avx512f(auVar339,auVar314);
                  uVar4 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var168))[1];
                  auVar339._4_4_ = uVar4;
                  auVar339._0_4_ = uVar4;
                  auVar339._8_4_ = uVar4;
                  auVar339._12_4_ = uVar4;
                  auVar339._16_4_ = uVar4;
                  auVar339._20_4_ = uVar4;
                  auVar339._24_4_ = uVar4;
                  auVar339._28_4_ = uVar4;
                  auVar339._32_4_ = uVar4;
                  auVar339._36_4_ = uVar4;
                  auVar339._40_4_ = uVar4;
                  auVar339._44_4_ = uVar4;
                  auVar339._48_4_ = uVar4;
                  auVar339._52_4_ = uVar4;
                  auVar339._56_4_ = uVar4;
                  auVar339._60_4_ = uVar4;
                  auVar339 = vminps_avx512f(auVar340,auVar339);
                  break;
                case 4:
                  auVar341._8_4_ = 0x80000000;
                  auVar341._0_8_ = 0x8000000080000000;
                  auVar341._12_4_ = 0x80000000;
                  auVar341._16_4_ = 0x80000000;
                  auVar341._20_4_ = 0x80000000;
                  auVar341._24_4_ = 0x80000000;
                  auVar341._28_4_ = 0x80000000;
                  auVar341._32_4_ = 0x80000000;
                  auVar341._36_4_ = 0x80000000;
                  auVar341._40_4_ = 0x80000000;
                  auVar341._44_4_ = 0x80000000;
                  auVar341._48_4_ = 0x80000000;
                  auVar341._52_4_ = 0x80000000;
                  auVar341._56_4_ = 0x80000000;
                  auVar341._60_4_ = 0x80000000;
                  auVar339 = vxorps_avx512dq(auVar339,auVar341);
                  auVar339 = vminps_avx512f(auVar339,(undefined1  [64])afVar143);
                  auVar339 = vmaxps_avx512f(auVar339,(undefined1  [64])afVar144);
                  auVar340 = vfmadd213ps_avx512f((undefined1  [64])afVar145,auVar339,
                                                 (undefined1  [64])afVar151);
                  auVar341 = vrndscaleps_avx512f(auVar340,1);
                  uVar171 = vcmpps_avx512f(auVar340,auVar341,1);
                  auVar340 = vsubps_avx512f(auVar341,(undefined1  [64])afVar142);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  auVar313._0_4_ = (uint)bVar199 * auVar340._0_4_ | (uint)!bVar199 * auVar341._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  auVar313._4_4_ = (uint)bVar199 * auVar340._4_4_ | (uint)!bVar199 * auVar341._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  auVar313._8_4_ = (uint)bVar199 * auVar340._8_4_ | (uint)!bVar199 * auVar341._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  auVar313._12_4_ =
                       (uint)bVar199 * auVar340._12_4_ | (uint)!bVar199 * auVar341._12_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                  auVar313._16_4_ =
                       (uint)bVar199 * auVar340._16_4_ | (uint)!bVar199 * auVar341._16_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                  auVar313._20_4_ =
                       (uint)bVar199 * auVar340._20_4_ | (uint)!bVar199 * auVar341._20_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                  auVar313._24_4_ =
                       (uint)bVar199 * auVar340._24_4_ | (uint)!bVar199 * auVar341._24_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 7) & 1);
                  auVar313._28_4_ =
                       (uint)bVar199 * auVar340._28_4_ | (uint)!bVar199 * auVar341._28_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 8) & 1);
                  auVar313._32_4_ =
                       (uint)bVar199 * auVar340._32_4_ | (uint)!bVar199 * auVar341._32_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 9) & 1);
                  auVar313._36_4_ =
                       (uint)bVar199 * auVar340._36_4_ | (uint)!bVar199 * auVar341._36_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 10) & 1);
                  auVar313._40_4_ =
                       (uint)bVar199 * auVar340._40_4_ | (uint)!bVar199 * auVar341._40_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xb) & 1);
                  auVar313._44_4_ =
                       (uint)bVar199 * auVar340._44_4_ | (uint)!bVar199 * auVar341._44_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xc) & 1);
                  auVar313._48_4_ =
                       (uint)bVar199 * auVar340._48_4_ | (uint)!bVar199 * auVar341._48_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xd) & 1);
                  auVar313._52_4_ =
                       (uint)bVar199 * auVar340._52_4_ | (uint)!bVar199 * auVar341._52_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xe) & 1);
                  auVar313._56_4_ =
                       (uint)bVar199 * auVar340._56_4_ | (uint)!bVar199 * auVar341._56_4_;
                  bVar199 = SUB81(uVar171 >> 0xf,0);
                  auVar313._60_4_ =
                       (uint)bVar199 * auVar340._60_4_ | (uint)!bVar199 * auVar341._60_4_;
                  auVar339 = vfmadd231ps_avx512f(auVar339,auVar313,auVar337);
                  in_ZMM16 = vfmadd231ps_avx512f(auVar339,auVar313,in_ZMM9);
                  auVar339 = vmulps_avx512f(in_ZMM16,in_ZMM16);
                  auVar340 = vfmadd213ps_avx512f(in_ZMM16,(undefined1  [64])afVar146,
                                                 (undefined1  [64])afVar147);
                  auVar340 = vfmadd213ps_avx512f(auVar340,in_ZMM16,(undefined1  [64])afVar148);
                  auVar340 = vfmadd213ps_avx512f(auVar340,in_ZMM16,(undefined1  [64])afVar149);
                  auVar340 = vfmadd213ps_avx512f(auVar340,in_ZMM16,(undefined1  [64])afVar150);
                  auVar340 = vfmadd213ps_avx512f(auVar340,in_ZMM16,(undefined1  [64])afVar151);
                  auVar339 = vfmadd213ps_avx512f(auVar340,auVar339,in_ZMM16);
                  auVar339 = vaddps_avx512f(auVar339,(undefined1  [64])afVar142);
                  auVar340 = vcvttps2dq_avx512f(auVar313);
                  auVar340 = vpaddd_avx512f(auVar340,auVar338);
                  auVar340 = vpslld_avx512f(auVar340,0x17);
                  auVar339 = vfmadd213ps_avx512f(auVar340,auVar339,auVar336);
                  auVar340 = vrcp14ps_avx512f(auVar339);
                  auVar339 = vfmsub213ps_avx512f(auVar339,auVar340,auVar336);
                  auVar339 = vfnmadd132ps_avx512vl(auVar339,auVar340,auVar340);
                  break;
                case 5:
                  auVar340 = vminps_avx512f(auVar339,(undefined1  [64])afVar143);
                  auVar340 = vmaxps_avx512f(auVar340,(undefined1  [64])afVar144);
                  auVar341 = vfmadd213ps_avx512f((undefined1  [64])afVar145,auVar340,
                                                 (undefined1  [64])afVar151);
                  auVar309 = vrndscaleps_avx512f(auVar341,1);
                  uVar171 = vcmpps_avx512f(auVar341,auVar309,1);
                  auVar341 = vsubps_avx512f(auVar309,(undefined1  [64])afVar142);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  auVar310._0_4_ = (uint)bVar199 * auVar341._0_4_ | (uint)!bVar199 * auVar309._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  auVar310._4_4_ = (uint)bVar199 * auVar341._4_4_ | (uint)!bVar199 * auVar309._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  auVar310._8_4_ = (uint)bVar199 * auVar341._8_4_ | (uint)!bVar199 * auVar309._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  auVar310._12_4_ =
                       (uint)bVar199 * auVar341._12_4_ | (uint)!bVar199 * auVar309._12_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                  auVar310._16_4_ =
                       (uint)bVar199 * auVar341._16_4_ | (uint)!bVar199 * auVar309._16_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                  auVar310._20_4_ =
                       (uint)bVar199 * auVar341._20_4_ | (uint)!bVar199 * auVar309._20_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                  auVar310._24_4_ =
                       (uint)bVar199 * auVar341._24_4_ | (uint)!bVar199 * auVar309._24_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 7) & 1);
                  auVar310._28_4_ =
                       (uint)bVar199 * auVar341._28_4_ | (uint)!bVar199 * auVar309._28_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 8) & 1);
                  auVar310._32_4_ =
                       (uint)bVar199 * auVar341._32_4_ | (uint)!bVar199 * auVar309._32_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 9) & 1);
                  auVar310._36_4_ =
                       (uint)bVar199 * auVar341._36_4_ | (uint)!bVar199 * auVar309._36_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 10) & 1);
                  auVar310._40_4_ =
                       (uint)bVar199 * auVar341._40_4_ | (uint)!bVar199 * auVar309._40_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xb) & 1);
                  auVar310._44_4_ =
                       (uint)bVar199 * auVar341._44_4_ | (uint)!bVar199 * auVar309._44_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xc) & 1);
                  auVar310._48_4_ =
                       (uint)bVar199 * auVar341._48_4_ | (uint)!bVar199 * auVar309._48_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xd) & 1);
                  auVar310._52_4_ =
                       (uint)bVar199 * auVar341._52_4_ | (uint)!bVar199 * auVar309._52_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xe) & 1);
                  auVar310._56_4_ =
                       (uint)bVar199 * auVar341._56_4_ | (uint)!bVar199 * auVar309._56_4_;
                  bVar199 = SUB81(uVar171 >> 0xf,0);
                  auVar310._60_4_ =
                       (uint)bVar199 * auVar341._60_4_ | (uint)!bVar199 * auVar309._60_4_;
                  auVar340 = vfmadd231ps_avx512f(auVar340,auVar310,auVar337);
                  auVar340 = vfmadd231ps_avx512f(auVar340,auVar310,in_ZMM9);
                  auVar341 = vmulps_avx512f(auVar340,auVar340);
                  auVar309 = vfmadd213ps_avx512f(auVar340,(undefined1  [64])afVar146,
                                                 (undefined1  [64])afVar147);
                  auVar309 = vfmadd213ps_avx512f(auVar309,auVar340,(undefined1  [64])afVar148);
                  auVar309 = vfmadd213ps_avx512f(auVar309,auVar340,(undefined1  [64])afVar149);
                  auVar309 = vfmadd213ps_avx512f(auVar309,auVar340,(undefined1  [64])afVar150);
                  auVar309 = vfmadd213ps_avx512f(auVar309,auVar340,(undefined1  [64])afVar151);
                  auVar340 = vfmadd213ps_avx512f(auVar309,auVar341,auVar340);
                  auVar340 = vaddps_avx512f(auVar340,(undefined1  [64])afVar142);
                  auVar341 = vcvttps2dq_avx512f(auVar310);
                  auVar341 = vpaddd_avx512f(auVar341,auVar338);
                  auVar341 = vpslld_avx512f(auVar341,0x17);
                  auVar340 = vfmadd213ps_avx512f(auVar341,auVar340,auVar336);
                  auVar341 = vmaxps_avx512f(auVar340,(undefined1  [64])_ps512_min_norm_pos);
                  auVar309 = vpsrld_avx512f(auVar341,0x17);
                  auVar341 = vpternlogd_avx512f(auVar341,(undefined1  [64])afVar151,
                                                (undefined1  [64])_ps512_inv_mant_mask,0xec);
                  uVar171 = vcmpps_avx512f(auVar341,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                  auVar310 = vsubps_avx512f(auVar341,(undefined1  [64])afVar142);
                  auVar341 = vaddps_avx512f(auVar310,auVar341);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  auVar311._0_4_ = (uint)bVar199 * auVar341._0_4_ | (uint)!bVar199 * auVar310._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  auVar311._4_4_ = (uint)bVar199 * auVar341._4_4_ | (uint)!bVar199 * auVar310._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  auVar311._8_4_ = (uint)bVar199 * auVar341._8_4_ | (uint)!bVar199 * auVar310._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  auVar311._12_4_ =
                       (uint)bVar199 * auVar341._12_4_ | (uint)!bVar199 * auVar310._12_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                  auVar311._16_4_ =
                       (uint)bVar199 * auVar341._16_4_ | (uint)!bVar199 * auVar310._16_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                  auVar311._20_4_ =
                       (uint)bVar199 * auVar341._20_4_ | (uint)!bVar199 * auVar310._20_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                  auVar311._24_4_ =
                       (uint)bVar199 * auVar341._24_4_ | (uint)!bVar199 * auVar310._24_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 7) & 1);
                  auVar311._28_4_ =
                       (uint)bVar199 * auVar341._28_4_ | (uint)!bVar199 * auVar310._28_4_;
                  bVar30 = (byte)(uVar171 >> 8);
                  bVar199 = (bool)(bVar30 & 1);
                  auVar311._32_4_ =
                       (uint)bVar199 * auVar341._32_4_ | (uint)!bVar199 * auVar310._32_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 9) & 1);
                  auVar311._36_4_ =
                       (uint)bVar199 * auVar341._36_4_ | (uint)!bVar199 * auVar310._36_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 10) & 1);
                  auVar311._40_4_ =
                       (uint)bVar199 * auVar341._40_4_ | (uint)!bVar199 * auVar310._40_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xb) & 1);
                  auVar311._44_4_ =
                       (uint)bVar199 * auVar341._44_4_ | (uint)!bVar199 * auVar310._44_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xc) & 1);
                  auVar311._48_4_ =
                       (uint)bVar199 * auVar341._48_4_ | (uint)!bVar199 * auVar310._48_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xd) & 1);
                  auVar311._52_4_ =
                       (uint)bVar199 * auVar341._52_4_ | (uint)!bVar199 * auVar310._52_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xe) & 1);
                  auVar311._56_4_ =
                       (uint)bVar199 * auVar341._56_4_ | (uint)!bVar199 * auVar310._56_4_;
                  bVar199 = SUB81(uVar171 >> 0xf,0);
                  auVar311._60_4_ =
                       (uint)bVar199 * auVar341._60_4_ | (uint)!bVar199 * auVar310._60_4_;
                  auVar341 = vmulps_avx512f(auVar311,auVar311);
                  auVar310 = vfmadd132ps_avx512f(auVar311,(undefined1  [64])_ps512_cephes_log_p1,
                                                 (undefined1  [64])_ps512_cephes_log_p0);
                  auVar310 = vfmadd213ps_avx512f(auVar310,auVar311,
                                                 (undefined1  [64])_ps512_cephes_log_p2);
                  auVar310 = vfmadd213ps_avx512f(auVar310,auVar311,
                                                 (undefined1  [64])_ps512_cephes_log_p3);
                  auVar310 = vfmadd213ps_avx512f(auVar310,auVar311,
                                                 (undefined1  [64])_ps512_cephes_log_p4);
                  auVar310 = vfmadd213ps_avx512f(auVar310,auVar311,
                                                 (undefined1  [64])_ps512_cephes_log_p5);
                  auVar310 = vfmadd213ps_avx512f(auVar310,auVar311,
                                                 (undefined1  [64])_ps512_cephes_log_p6);
                  auVar310 = vfmadd213ps_avx512f(auVar310,auVar311,
                                                 (undefined1  [64])_ps512_cephes_log_p7);
                  auVar310 = vfmadd213ps_avx512f(auVar310,auVar311,
                                                 (undefined1  [64])_ps512_cephes_log_p8);
                  auVar312 = vmulps_avx512f(auVar341,auVar311);
                  auVar310 = vfmadd213ps_avx512f(auVar312,auVar310,auVar311);
                  uVar186 = vcmpps_avx512f(auVar340,in_ZMM29,2);
                  auVar340 = vpsubd_avx512f(auVar309,auVar338);
                  auVar340 = vcvtdq2ps_avx512f(auVar340);
                  auVar309 = vaddps_avx512f(auVar340,(undefined1  [64])afVar142);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  auVar312._0_4_ = (uint)bVar199 * auVar340._0_4_ | (uint)!bVar199 * auVar309._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  auVar312._4_4_ = (uint)bVar199 * auVar340._4_4_ | (uint)!bVar199 * auVar309._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  auVar312._8_4_ = (uint)bVar199 * auVar340._8_4_ | (uint)!bVar199 * auVar309._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  auVar312._12_4_ =
                       (uint)bVar199 * auVar340._12_4_ | (uint)!bVar199 * auVar309._12_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                  auVar312._16_4_ =
                       (uint)bVar199 * auVar340._16_4_ | (uint)!bVar199 * auVar309._16_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                  auVar312._20_4_ =
                       (uint)bVar199 * auVar340._20_4_ | (uint)!bVar199 * auVar309._20_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                  auVar312._24_4_ =
                       (uint)bVar199 * auVar340._24_4_ | (uint)!bVar199 * auVar309._24_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 7) & 1);
                  auVar312._28_4_ =
                       (uint)bVar199 * auVar340._28_4_ | (uint)!bVar199 * auVar309._28_4_;
                  bVar199 = (bool)(bVar30 & 1);
                  auVar312._32_4_ =
                       (uint)bVar199 * auVar340._32_4_ | (uint)!bVar199 * auVar309._32_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 9) & 1);
                  auVar312._36_4_ =
                       (uint)bVar199 * auVar340._36_4_ | (uint)!bVar199 * auVar309._36_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 10) & 1);
                  auVar312._40_4_ =
                       (uint)bVar199 * auVar340._40_4_ | (uint)!bVar199 * auVar309._40_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xb) & 1);
                  auVar312._44_4_ =
                       (uint)bVar199 * auVar340._44_4_ | (uint)!bVar199 * auVar309._44_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xc) & 1);
                  auVar312._48_4_ =
                       (uint)bVar199 * auVar340._48_4_ | (uint)!bVar199 * auVar309._48_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xd) & 1);
                  auVar312._52_4_ =
                       (uint)bVar199 * auVar340._52_4_ | (uint)!bVar199 * auVar309._52_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xe) & 1);
                  auVar312._56_4_ =
                       (uint)bVar199 * auVar340._56_4_ | (uint)!bVar199 * auVar309._56_4_;
                  bVar199 = SUB81(uVar171 >> 0xf,0);
                  auVar312._60_4_ =
                       (uint)bVar199 * auVar340._60_4_ | (uint)!bVar199 * auVar309._60_4_;
                  auVar340 = vfmadd231ps_avx512f(auVar310,auVar312,
                                                 (undefined1  [64])_ps512_cephes_log_q1);
                  auVar340 = vfmadd231ps_avx512f(auVar340,auVar341,local_1a8);
                  auVar340 = vfmadd231ps_avx512f(auVar340,auVar312,
                                                 (undefined1  [64])_ps512_cephes_log_q2);
                  auVar341 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
                  auVar340 = vmulps_avx512f(auVar340,auVar341);
                  auVar310 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                  bVar199 = (bool)((byte)uVar186 & 1);
                  auVar309._0_4_ = (uint)bVar199 * auVar310._0_4_ | (uint)!bVar199 * auVar340._0_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 1) & 1);
                  auVar309._4_4_ = (uint)bVar199 * auVar310._4_4_ | (uint)!bVar199 * auVar340._4_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 2) & 1);
                  auVar309._8_4_ = (uint)bVar199 * auVar310._8_4_ | (uint)!bVar199 * auVar340._8_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 3) & 1);
                  auVar309._12_4_ =
                       (uint)bVar199 * auVar310._12_4_ | (uint)!bVar199 * auVar340._12_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 4) & 1);
                  auVar309._16_4_ =
                       (uint)bVar199 * auVar310._16_4_ | (uint)!bVar199 * auVar340._16_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 5) & 1);
                  auVar309._20_4_ =
                       (uint)bVar199 * auVar310._20_4_ | (uint)!bVar199 * auVar340._20_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 6) & 1);
                  auVar309._24_4_ =
                       (uint)bVar199 * auVar310._24_4_ | (uint)!bVar199 * auVar340._24_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 7) & 1);
                  auVar309._28_4_ =
                       (uint)bVar199 * auVar310._28_4_ | (uint)!bVar199 * auVar340._28_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 8) & 1);
                  auVar309._32_4_ =
                       (uint)bVar199 * auVar310._32_4_ | (uint)!bVar199 * auVar340._32_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 9) & 1);
                  auVar309._36_4_ =
                       (uint)bVar199 * auVar310._36_4_ | (uint)!bVar199 * auVar340._36_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 10) & 1);
                  auVar309._40_4_ =
                       (uint)bVar199 * auVar310._40_4_ | (uint)!bVar199 * auVar340._40_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 0xb) & 1);
                  auVar309._44_4_ =
                       (uint)bVar199 * auVar310._44_4_ | (uint)!bVar199 * auVar340._44_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 0xc) & 1);
                  auVar309._48_4_ =
                       (uint)bVar199 * auVar310._48_4_ | (uint)!bVar199 * auVar340._48_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 0xd) & 1);
                  auVar309._52_4_ =
                       (uint)bVar199 * auVar310._52_4_ | (uint)!bVar199 * auVar340._52_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 0xe) & 1);
                  auVar309._56_4_ =
                       (uint)bVar199 * auVar310._56_4_ | (uint)!bVar199 * auVar340._56_4_;
                  bVar199 = SUB81(uVar186 >> 0xf,0);
                  auVar309._60_4_ =
                       (uint)bVar199 * auVar310._60_4_ | (uint)!bVar199 * auVar340._60_4_;
                  auVar340 = vminps_avx512f(auVar309,(undefined1  [64])afVar143);
                  auVar340 = vmaxps_avx512f(auVar340,(undefined1  [64])afVar144);
                  auVar309 = vfmadd213ps_avx512f((undefined1  [64])afVar145,auVar340,
                                                 (undefined1  [64])afVar151);
                  auVar310 = vrndscaleps_avx512f(auVar309,1);
                  uVar171 = vcmpps_avx512f(auVar309,auVar310,1);
                  auVar309 = vsubps_avx512f(auVar310,(undefined1  [64])afVar142);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  in_ZMM16._0_4_ = (uint)bVar199 * auVar309._0_4_ | (uint)!bVar199 * auVar310._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  in_ZMM16._4_4_ = (uint)bVar199 * auVar309._4_4_ | (uint)!bVar199 * auVar310._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  in_ZMM16._8_4_ = (uint)bVar199 * auVar309._8_4_ | (uint)!bVar199 * auVar310._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  in_ZMM16._12_4_ =
                       (uint)bVar199 * auVar309._12_4_ | (uint)!bVar199 * auVar310._12_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                  in_ZMM16._16_4_ =
                       (uint)bVar199 * auVar309._16_4_ | (uint)!bVar199 * auVar310._16_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                  in_ZMM16._20_4_ =
                       (uint)bVar199 * auVar309._20_4_ | (uint)!bVar199 * auVar310._20_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                  in_ZMM16._24_4_ =
                       (uint)bVar199 * auVar309._24_4_ | (uint)!bVar199 * auVar310._24_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 7) & 1);
                  in_ZMM16._28_4_ =
                       (uint)bVar199 * auVar309._28_4_ | (uint)!bVar199 * auVar310._28_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 8) & 1);
                  in_ZMM16._32_4_ =
                       (uint)bVar199 * auVar309._32_4_ | (uint)!bVar199 * auVar310._32_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 9) & 1);
                  in_ZMM16._36_4_ =
                       (uint)bVar199 * auVar309._36_4_ | (uint)!bVar199 * auVar310._36_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 10) & 1);
                  in_ZMM16._40_4_ =
                       (uint)bVar199 * auVar309._40_4_ | (uint)!bVar199 * auVar310._40_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xb) & 1);
                  in_ZMM16._44_4_ =
                       (uint)bVar199 * auVar309._44_4_ | (uint)!bVar199 * auVar310._44_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xc) & 1);
                  in_ZMM16._48_4_ =
                       (uint)bVar199 * auVar309._48_4_ | (uint)!bVar199 * auVar310._48_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xd) & 1);
                  in_ZMM16._52_4_ =
                       (uint)bVar199 * auVar309._52_4_ | (uint)!bVar199 * auVar310._52_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xe) & 1);
                  in_ZMM16._56_4_ =
                       (uint)bVar199 * auVar309._56_4_ | (uint)!bVar199 * auVar310._56_4_;
                  bVar199 = SUB81(uVar171 >> 0xf,0);
                  in_ZMM16._60_4_ =
                       (uint)bVar199 * auVar309._60_4_ | (uint)!bVar199 * auVar310._60_4_;
                  auVar340 = vfmadd231ps_avx512f(auVar340,in_ZMM16,auVar337);
                  auVar340 = vfmadd231ps_avx512f(auVar340,in_ZMM16,in_ZMM9);
                  auVar309 = vmulps_avx512f(auVar340,auVar340);
                  auVar310 = vfmadd213ps_avx512f(auVar340,(undefined1  [64])afVar146,
                                                 (undefined1  [64])afVar147);
                  auVar310 = vfmadd213ps_avx512f(auVar310,auVar340,(undefined1  [64])afVar148);
                  auVar310 = vfmadd213ps_avx512f(auVar310,auVar340,(undefined1  [64])afVar149);
                  auVar310 = vfmadd213ps_avx512f(auVar310,auVar340,(undefined1  [64])afVar150);
                  auVar310 = vfmadd213ps_avx512f(auVar310,auVar340,(undefined1  [64])afVar151);
                  in_ZMM17 = vfmadd213ps_avx512f(auVar310,auVar309,auVar340);
                  auVar340 = vaddps_avx512f(in_ZMM17,(undefined1  [64])afVar142);
                  auVar309 = vcvttps2dq_avx512f(in_ZMM16);
                  auVar309 = vpaddd_avx512f(auVar309,auVar338);
                  auVar309 = vpslld_avx512f(auVar309,0x17);
                  auVar340 = vfmadd213ps_avx512f(auVar309,auVar340,auVar336);
                  auVar309 = vrcp14ps_avx512f(auVar340);
                  auVar340 = vfmsub213ps_avx512f(auVar340,auVar309,auVar336);
                  auVar340 = vfnmadd132ps_avx512vl(auVar340,auVar309,auVar309);
                  auVar340 = vfnmsub213ps_avx512f(auVar340,auVar341,auVar336);
                  auVar339 = vmulps_avx512f(auVar340,auVar339);
                  break;
                case 6:
                  auVar341 = vbroadcastss_avx512f
                                       (ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var168)));
                  uVar3 = (*(uint **)(&this->field_0x118 + (long)p_Var168))[1];
                  auVar340._4_4_ = uVar3;
                  auVar340._0_4_ = uVar3;
                  auVar340._8_4_ = uVar3;
                  auVar340._12_4_ = uVar3;
                  auVar340._16_4_ = uVar3;
                  auVar340._20_4_ = uVar3;
                  auVar340._24_4_ = uVar3;
                  auVar340._28_4_ = uVar3;
                  auVar340._32_4_ = uVar3;
                  auVar340._36_4_ = uVar3;
                  auVar340._40_4_ = uVar3;
                  auVar340._44_4_ = uVar3;
                  auVar340._48_4_ = uVar3;
                  auVar340._52_4_ = uVar3;
                  auVar340._56_4_ = uVar3;
                  auVar340._60_4_ = uVar3;
                  auVar340 = vfmadd213ps_avx512f(auVar341,auVar339,auVar340);
                  auVar340 = vmaxps_avx512f(auVar340,in_ZMM29);
                  auVar340 = vminps_avx512f(auVar340,auVar336);
                  auVar339 = vmulps_avx512f(auVar340,auVar339);
                }
                *(undefined1 (*) [64])pAVar188 = auVar339;
                pAVar188 = pAVar188 + 8;
                uVar174 = uVar174 + 1;
                iVar194 = iVar194 + 1;
              } while (uVar174 != local_228.w);
            }
            iVar195 = iVar195 + 1;
          } while (iVar195 != local_228.h);
        }
        local_300 = (_func_int **)((long)local_300 + 1);
      } while (local_300 != local_1d8);
    }
    afVar156 = _ps512_cephes_log_p8;
    afVar155 = _ps512_cephes_log_p7;
    afVar154 = _ps512_cephes_log_p6;
    afVar153 = _ps512_cephes_log_p5;
    afVar152 = _ps512_cephes_log_p4;
    afVar151 = _ps512_cephes_exp_p5;
    afVar150 = _ps512_cephes_exp_p4;
    afVar149 = _ps512_cephes_exp_p3;
    afVar148 = _ps512_cephes_exp_p2;
    afVar147 = _ps512_cephes_exp_p1;
    afVar146 = _ps512_cephes_exp_p0;
    afVar145 = _ps512_cephes_LOG2EF;
    afVar144 = _ps512_exp_lo;
    afVar143 = _ps512_exp_hi;
    afVar142 = _ps512_1;
    if ((uVar176 == 8) && (uVar190 == 0x10)) {
      if ((long)local_228.c < 1) goto LAB_0027f987;
      p_Var168 = pp_Var13[-3];
      iVar10 = *(int *)(&this->field_0xdc + (long)p_Var168);
      iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var168);
      iVar175 = *(int *)(&this->field_0xe4 + (long)p_Var168);
      iVar172 = *(int *)(&this->field_0xe8 + (long)p_Var168);
      uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var168);
      lVar192 = *(long *)(&this->field_0x1a8 + (long)p_Var168);
      uVar160 = *(uint *)(&this->field_0xd4 + (long)p_Var168);
      uVar169 = *(uint *)(&this->field_0xd8 + (long)p_Var168);
      auVar336 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar337 = vxorps_avx512dq(auVar336,(undefined1  [64])_ps512_cephes_log_q2);
      in_ZMM9 = vxorps_avx512dq(auVar336,(undefined1  [64])_ps512_cephes_log_q1);
      auVar338 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      auVar339 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar336);
      iVar180 = (1 - uVar160) * iVar10;
      local_168._0_4_ = iVar180;
      local_300 = (_func_int **)0x0;
      auVar203 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
      in_ZMM29 = ZEXT1664(auVar203);
      auVar340 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar341 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      do {
        local_1a8._0_4_ = local_228.h;
        if (0 < local_228.h) {
          iVar189 = bottom_blob->w;
          iVar195 = bottom_blob->h;
          pAVar188 = (Allocator *)
                     ((long)(_func_int ***)local_228.data +
                     local_228.cstep * (long)local_300 * local_228.elemsize);
          uVar170 = bottom_blob->c;
          iVar194 = 0;
          do {
            if (0 < local_228.w) {
              uVar174 = 0;
              iVar161 = iVar180;
              do {
                if (lVar192 == 0) {
                  auVar309 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar309 = *(undefined1 (*) [64])(lVar192 + (long)local_300 * 0x40);
                }
                if (0 < (int)uVar170) {
                  pvVar196 = (void *)((this->weight_data_tm).cstep * (long)local_300 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar183 = bottom_blob->data;
                  uVar171 = 0;
                  do {
                    if (0 < (int)uVar169) {
                      uVar186 = 0;
                      uVar181 = 0;
                      do {
                        iVar162 = (((int)uVar181 - uVar169) + 1) * iVar11 + iVar194;
                        if ((((-1 < iVar162) &&
                             (iVar163 = iVar162 / iVar172, iVar162 % iVar172 == 0)) &&
                            (0 < (int)uVar160)) && (iVar163 < iVar195)) {
                          lVar187 = (long)iVar163 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar171;
                          uVar185 = (ulong)uVar160;
                          uVar191 = uVar186;
                          iVar162 = iVar161;
                          do {
                            if (((-1 < iVar162) &&
                                (iVar163 = iVar162 / iVar175, iVar162 % iVar175 == 0)) &&
                               (iVar163 < iVar189)) {
                              lVar166 = (long)(iVar163 << 3);
                              auVar310 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187)));
                              auVar311 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 4)));
                              in_ZMM16 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 8)));
                              in_ZMM17 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0xc)));
                              auVar312 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x10)))
                              ;
                              auVar313 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x14)))
                              ;
                              auVar314 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x18)))
                              ;
                              auVar315 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x1c)))
                              ;
                              uVar201 = uVar191 & 0xffffffff;
                              auVar309 = vfmadd231ps_avx512f(auVar309,auVar310,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4));
                              auVar309 = vfmadd231ps_avx512f(auVar309,auVar311,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0x40))
                              ;
                              auVar309 = vfmadd231ps_avx512f(auVar309,in_ZMM16,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0x80))
                              ;
                              auVar309 = vfmadd231ps_avx512f(auVar309,in_ZMM17,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0xc0))
                              ;
                              auVar309 = vfmadd231ps_avx512f(auVar309,auVar312,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0x100)
                                                            );
                              auVar309 = vfmadd231ps_avx512f(auVar309,auVar313,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0x140)
                                                            );
                              auVar309 = vfmadd231ps_avx512f(auVar309,auVar314,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0x180)
                                                            );
                              auVar309 = vfmadd231ps_avx512f(auVar309,auVar315,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0x1c0)
                                                            );
                            }
                            uVar191 = uVar191 + 0x80;
                            iVar162 = iVar162 + iVar10;
                            uVar185 = uVar185 - 1;
                          } while (uVar185 != 0);
                        }
                        uVar181 = uVar181 + 1;
                        uVar186 = uVar186 + (ulong)uVar160 * 0x80;
                      } while (uVar181 != uVar169);
                    }
                    pvVar196 = (void *)((long)pvVar196 + (long)(int)(uVar160 * uVar169 * 0x80) * 4);
                    uVar171 = uVar171 + 1;
                  } while (uVar171 != uVar170);
                }
                switch(uVar12) {
                case 1:
                  auVar309 = vmaxps_avx512f(auVar309,in_ZMM29);
                  break;
                case 2:
                  uVar171 = vcmpps_avx512f(auVar309,in_ZMM29,1);
                  uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                  auVar123._4_4_ = uVar4;
                  auVar123._0_4_ = uVar4;
                  auVar123._8_4_ = uVar4;
                  auVar123._12_4_ = uVar4;
                  auVar123._16_4_ = uVar4;
                  auVar123._20_4_ = uVar4;
                  auVar123._24_4_ = uVar4;
                  auVar123._28_4_ = uVar4;
                  auVar123._32_4_ = uVar4;
                  auVar123._36_4_ = uVar4;
                  auVar123._40_4_ = uVar4;
                  auVar123._44_4_ = uVar4;
                  auVar123._48_4_ = uVar4;
                  auVar123._52_4_ = uVar4;
                  auVar123._56_4_ = uVar4;
                  auVar123._60_4_ = uVar4;
                  auVar310 = vmulps_avx512f(auVar309,auVar123);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  auVar323._0_4_ = (uint)bVar199 * auVar310._0_4_ | (uint)!bVar199 * auVar309._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  auVar323._4_4_ = (uint)bVar199 * auVar310._4_4_ | (uint)!bVar199 * auVar309._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  auVar323._8_4_ = (uint)bVar199 * auVar310._8_4_ | (uint)!bVar199 * auVar309._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  auVar323._12_4_ =
                       (uint)bVar199 * auVar310._12_4_ | (uint)!bVar199 * auVar309._12_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                  auVar323._16_4_ =
                       (uint)bVar199 * auVar310._16_4_ | (uint)!bVar199 * auVar309._16_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                  auVar323._20_4_ =
                       (uint)bVar199 * auVar310._20_4_ | (uint)!bVar199 * auVar309._20_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                  auVar323._24_4_ =
                       (uint)bVar199 * auVar310._24_4_ | (uint)!bVar199 * auVar309._24_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 7) & 1);
                  auVar323._28_4_ =
                       (uint)bVar199 * auVar310._28_4_ | (uint)!bVar199 * auVar309._28_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 8) & 1);
                  auVar323._32_4_ =
                       (uint)bVar199 * auVar310._32_4_ | (uint)!bVar199 * auVar309._32_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 9) & 1);
                  auVar323._36_4_ =
                       (uint)bVar199 * auVar310._36_4_ | (uint)!bVar199 * auVar309._36_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 10) & 1);
                  auVar323._40_4_ =
                       (uint)bVar199 * auVar310._40_4_ | (uint)!bVar199 * auVar309._40_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xb) & 1);
                  auVar323._44_4_ =
                       (uint)bVar199 * auVar310._44_4_ | (uint)!bVar199 * auVar309._44_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xc) & 1);
                  auVar323._48_4_ =
                       (uint)bVar199 * auVar310._48_4_ | (uint)!bVar199 * auVar309._48_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xd) & 1);
                  auVar323._52_4_ =
                       (uint)bVar199 * auVar310._52_4_ | (uint)!bVar199 * auVar309._52_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xe) & 1);
                  auVar323._56_4_ =
                       (uint)bVar199 * auVar310._56_4_ | (uint)!bVar199 * auVar309._56_4_;
                  bVar199 = SUB81(uVar171 >> 0xf,0);
                  auVar323._60_4_ =
                       (uint)bVar199 * auVar310._60_4_ | (uint)!bVar199 * auVar309._60_4_;
                  auVar309 = auVar323;
                  break;
                case 3:
                  uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                  auVar121._4_4_ = uVar4;
                  auVar121._0_4_ = uVar4;
                  auVar121._8_4_ = uVar4;
                  auVar121._12_4_ = uVar4;
                  auVar121._16_4_ = uVar4;
                  auVar121._20_4_ = uVar4;
                  auVar121._24_4_ = uVar4;
                  auVar121._28_4_ = uVar4;
                  auVar121._32_4_ = uVar4;
                  auVar121._36_4_ = uVar4;
                  auVar121._40_4_ = uVar4;
                  auVar121._44_4_ = uVar4;
                  auVar121._48_4_ = uVar4;
                  auVar121._52_4_ = uVar4;
                  auVar121._56_4_ = uVar4;
                  auVar121._60_4_ = uVar4;
                  auVar309 = vmaxps_avx512f(auVar309,auVar121);
                  uVar4 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var168))[1];
                  auVar122._4_4_ = uVar4;
                  auVar122._0_4_ = uVar4;
                  auVar122._8_4_ = uVar4;
                  auVar122._12_4_ = uVar4;
                  auVar122._16_4_ = uVar4;
                  auVar122._20_4_ = uVar4;
                  auVar122._24_4_ = uVar4;
                  auVar122._28_4_ = uVar4;
                  auVar122._32_4_ = uVar4;
                  auVar122._36_4_ = uVar4;
                  auVar122._40_4_ = uVar4;
                  auVar122._44_4_ = uVar4;
                  auVar122._48_4_ = uVar4;
                  auVar122._52_4_ = uVar4;
                  auVar122._56_4_ = uVar4;
                  auVar122._60_4_ = uVar4;
                  auVar309 = vminps_avx512f(auVar309,auVar122);
                  break;
                case 4:
                  auVar309 = vxorps_avx512dq(auVar309,auVar336);
                  auVar309 = vminps_avx512f(auVar309,(undefined1  [64])afVar143);
                  auVar309 = vmaxps_avx512f(auVar309,(undefined1  [64])afVar144);
                  auVar310 = vfmadd213ps_avx512f((undefined1  [64])afVar145,auVar309,
                                                 (undefined1  [64])afVar151);
                  auVar311 = vrndscaleps_avx512f(auVar310,1);
                  uVar171 = vcmpps_avx512f(auVar310,auVar311,1);
                  auVar310 = vsubps_avx512f(auVar311,(undefined1  [64])afVar142);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  auVar322._0_4_ = (uint)bVar199 * auVar310._0_4_ | (uint)!bVar199 * auVar311._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  auVar322._4_4_ = (uint)bVar199 * auVar310._4_4_ | (uint)!bVar199 * auVar311._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  auVar322._8_4_ = (uint)bVar199 * auVar310._8_4_ | (uint)!bVar199 * auVar311._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  auVar322._12_4_ =
                       (uint)bVar199 * auVar310._12_4_ | (uint)!bVar199 * auVar311._12_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                  auVar322._16_4_ =
                       (uint)bVar199 * auVar310._16_4_ | (uint)!bVar199 * auVar311._16_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                  auVar322._20_4_ =
                       (uint)bVar199 * auVar310._20_4_ | (uint)!bVar199 * auVar311._20_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                  auVar322._24_4_ =
                       (uint)bVar199 * auVar310._24_4_ | (uint)!bVar199 * auVar311._24_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 7) & 1);
                  auVar322._28_4_ =
                       (uint)bVar199 * auVar310._28_4_ | (uint)!bVar199 * auVar311._28_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 8) & 1);
                  auVar322._32_4_ =
                       (uint)bVar199 * auVar310._32_4_ | (uint)!bVar199 * auVar311._32_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 9) & 1);
                  auVar322._36_4_ =
                       (uint)bVar199 * auVar310._36_4_ | (uint)!bVar199 * auVar311._36_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 10) & 1);
                  auVar322._40_4_ =
                       (uint)bVar199 * auVar310._40_4_ | (uint)!bVar199 * auVar311._40_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xb) & 1);
                  auVar322._44_4_ =
                       (uint)bVar199 * auVar310._44_4_ | (uint)!bVar199 * auVar311._44_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xc) & 1);
                  auVar322._48_4_ =
                       (uint)bVar199 * auVar310._48_4_ | (uint)!bVar199 * auVar311._48_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xd) & 1);
                  auVar322._52_4_ =
                       (uint)bVar199 * auVar310._52_4_ | (uint)!bVar199 * auVar311._52_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xe) & 1);
                  auVar322._56_4_ =
                       (uint)bVar199 * auVar310._56_4_ | (uint)!bVar199 * auVar311._56_4_;
                  bVar199 = SUB81(uVar171 >> 0xf,0);
                  auVar322._60_4_ =
                       (uint)bVar199 * auVar310._60_4_ | (uint)!bVar199 * auVar311._60_4_;
                  auVar309 = vfmadd231ps_avx512f(auVar309,auVar322,auVar337);
                  in_ZMM16 = vfmadd231ps_avx512f(auVar309,auVar322,in_ZMM9);
                  auVar309 = vmulps_avx512f(in_ZMM16,in_ZMM16);
                  auVar310 = vfmadd213ps_avx512f(in_ZMM16,(undefined1  [64])afVar146,
                                                 (undefined1  [64])afVar147);
                  auVar310 = vfmadd213ps_avx512f(auVar310,in_ZMM16,(undefined1  [64])afVar148);
                  auVar310 = vfmadd213ps_avx512f(auVar310,in_ZMM16,(undefined1  [64])afVar149);
                  auVar310 = vfmadd213ps_avx512f(auVar310,in_ZMM16,(undefined1  [64])afVar150);
                  auVar310 = vfmadd213ps_avx512f(auVar310,in_ZMM16,(undefined1  [64])afVar151);
                  auVar309 = vfmadd213ps_avx512f(auVar310,auVar309,in_ZMM16);
                  auVar309 = vaddps_avx512f(auVar309,(undefined1  [64])afVar142);
                  auVar310 = vcvttps2dq_avx512f(auVar322);
                  auVar310 = vpaddd_avx512f(auVar310,auVar338);
                  auVar310 = vpslld_avx512f(auVar310,0x17);
                  auVar309 = vfmadd213ps_avx512f(auVar310,auVar309,auVar340);
                  auVar310 = vrcp14ps_avx512f(auVar309);
                  auVar309 = vfmsub213ps_avx512f(auVar309,auVar310,auVar340);
                  auVar309 = vfnmadd132ps_avx512vl(auVar309,auVar310,auVar310);
                  break;
                case 5:
                  auVar310 = vminps_avx512f(auVar309,(undefined1  [64])afVar143);
                  auVar310 = vmaxps_avx512f(auVar310,(undefined1  [64])afVar144);
                  auVar311 = vfmadd213ps_avx512f((undefined1  [64])afVar145,auVar310,
                                                 (undefined1  [64])afVar151);
                  auVar312 = vrndscaleps_avx512f(auVar311,1);
                  uVar171 = vcmpps_avx512f(auVar311,auVar312,1);
                  auVar311 = vsubps_avx512f(auVar312,(undefined1  [64])afVar142);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  auVar318._0_4_ = (uint)bVar199 * auVar311._0_4_ | (uint)!bVar199 * auVar312._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  auVar318._4_4_ = (uint)bVar199 * auVar311._4_4_ | (uint)!bVar199 * auVar312._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  auVar318._8_4_ = (uint)bVar199 * auVar311._8_4_ | (uint)!bVar199 * auVar312._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  auVar318._12_4_ =
                       (uint)bVar199 * auVar311._12_4_ | (uint)!bVar199 * auVar312._12_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                  auVar318._16_4_ =
                       (uint)bVar199 * auVar311._16_4_ | (uint)!bVar199 * auVar312._16_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                  auVar318._20_4_ =
                       (uint)bVar199 * auVar311._20_4_ | (uint)!bVar199 * auVar312._20_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                  auVar318._24_4_ =
                       (uint)bVar199 * auVar311._24_4_ | (uint)!bVar199 * auVar312._24_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 7) & 1);
                  auVar318._28_4_ =
                       (uint)bVar199 * auVar311._28_4_ | (uint)!bVar199 * auVar312._28_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 8) & 1);
                  auVar318._32_4_ =
                       (uint)bVar199 * auVar311._32_4_ | (uint)!bVar199 * auVar312._32_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 9) & 1);
                  auVar318._36_4_ =
                       (uint)bVar199 * auVar311._36_4_ | (uint)!bVar199 * auVar312._36_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 10) & 1);
                  auVar318._40_4_ =
                       (uint)bVar199 * auVar311._40_4_ | (uint)!bVar199 * auVar312._40_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xb) & 1);
                  auVar318._44_4_ =
                       (uint)bVar199 * auVar311._44_4_ | (uint)!bVar199 * auVar312._44_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xc) & 1);
                  auVar318._48_4_ =
                       (uint)bVar199 * auVar311._48_4_ | (uint)!bVar199 * auVar312._48_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xd) & 1);
                  auVar318._52_4_ =
                       (uint)bVar199 * auVar311._52_4_ | (uint)!bVar199 * auVar312._52_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xe) & 1);
                  auVar318._56_4_ =
                       (uint)bVar199 * auVar311._56_4_ | (uint)!bVar199 * auVar312._56_4_;
                  bVar199 = SUB81(uVar171 >> 0xf,0);
                  auVar318._60_4_ =
                       (uint)bVar199 * auVar311._60_4_ | (uint)!bVar199 * auVar312._60_4_;
                  auVar310 = vfmadd231ps_avx512f(auVar310,auVar318,auVar337);
                  auVar310 = vfmadd231ps_avx512f(auVar310,auVar318,in_ZMM9);
                  auVar311 = vmulps_avx512f(auVar310,auVar310);
                  auVar312 = vfmadd213ps_avx512f(auVar310,(undefined1  [64])afVar146,
                                                 (undefined1  [64])afVar147);
                  auVar312 = vfmadd213ps_avx512f(auVar312,auVar310,(undefined1  [64])afVar148);
                  auVar312 = vfmadd213ps_avx512f(auVar312,auVar310,(undefined1  [64])afVar149);
                  auVar312 = vfmadd213ps_avx512f(auVar312,auVar310,(undefined1  [64])afVar150);
                  auVar312 = vfmadd213ps_avx512f(auVar312,auVar310,(undefined1  [64])afVar151);
                  auVar310 = vfmadd213ps_avx512f(auVar312,auVar311,auVar310);
                  auVar310 = vaddps_avx512f(auVar310,(undefined1  [64])afVar142);
                  auVar311 = vcvttps2dq_avx512f(auVar318);
                  auVar311 = vpaddd_avx512f(auVar311,auVar338);
                  auVar311 = vpslld_avx512f(auVar311,0x17);
                  auVar310 = vfmadd213ps_avx512f(auVar311,auVar310,auVar340);
                  auVar311 = vmaxps_avx512f(auVar310,(undefined1  [64])_ps512_min_norm_pos);
                  auVar312 = vpsrld_avx512f(auVar311,0x17);
                  auVar311 = vpternlogd_avx512f(auVar311,(undefined1  [64])afVar151,
                                                (undefined1  [64])_ps512_inv_mant_mask,0xec);
                  uVar171 = vcmpps_avx512f(auVar311,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                  auVar313 = vsubps_avx512f(auVar311,(undefined1  [64])afVar142);
                  auVar311 = vaddps_avx512f(auVar313,auVar311);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  auVar319._0_4_ = (uint)bVar199 * auVar311._0_4_ | (uint)!bVar199 * auVar313._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  auVar319._4_4_ = (uint)bVar199 * auVar311._4_4_ | (uint)!bVar199 * auVar313._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  auVar319._8_4_ = (uint)bVar199 * auVar311._8_4_ | (uint)!bVar199 * auVar313._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  auVar319._12_4_ =
                       (uint)bVar199 * auVar311._12_4_ | (uint)!bVar199 * auVar313._12_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                  auVar319._16_4_ =
                       (uint)bVar199 * auVar311._16_4_ | (uint)!bVar199 * auVar313._16_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                  auVar319._20_4_ =
                       (uint)bVar199 * auVar311._20_4_ | (uint)!bVar199 * auVar313._20_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                  auVar319._24_4_ =
                       (uint)bVar199 * auVar311._24_4_ | (uint)!bVar199 * auVar313._24_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 7) & 1);
                  auVar319._28_4_ =
                       (uint)bVar199 * auVar311._28_4_ | (uint)!bVar199 * auVar313._28_4_;
                  bVar30 = (byte)(uVar171 >> 8);
                  bVar199 = (bool)(bVar30 & 1);
                  auVar319._32_4_ =
                       (uint)bVar199 * auVar311._32_4_ | (uint)!bVar199 * auVar313._32_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 9) & 1);
                  auVar319._36_4_ =
                       (uint)bVar199 * auVar311._36_4_ | (uint)!bVar199 * auVar313._36_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 10) & 1);
                  auVar319._40_4_ =
                       (uint)bVar199 * auVar311._40_4_ | (uint)!bVar199 * auVar313._40_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xb) & 1);
                  auVar319._44_4_ =
                       (uint)bVar199 * auVar311._44_4_ | (uint)!bVar199 * auVar313._44_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xc) & 1);
                  auVar319._48_4_ =
                       (uint)bVar199 * auVar311._48_4_ | (uint)!bVar199 * auVar313._48_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xd) & 1);
                  auVar319._52_4_ =
                       (uint)bVar199 * auVar311._52_4_ | (uint)!bVar199 * auVar313._52_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xe) & 1);
                  auVar319._56_4_ =
                       (uint)bVar199 * auVar311._56_4_ | (uint)!bVar199 * auVar313._56_4_;
                  bVar199 = SUB81(uVar171 >> 0xf,0);
                  auVar319._60_4_ =
                       (uint)bVar199 * auVar311._60_4_ | (uint)!bVar199 * auVar313._60_4_;
                  auVar311 = vmulps_avx512f(auVar319,auVar319);
                  auVar313 = vfmadd132ps_avx512f(auVar319,(undefined1  [64])_ps512_cephes_log_p1,
                                                 (undefined1  [64])_ps512_cephes_log_p0);
                  auVar313 = vfmadd213ps_avx512f(auVar313,auVar319,
                                                 (undefined1  [64])_ps512_cephes_log_p2);
                  auVar313 = vfmadd213ps_avx512f(auVar313,auVar319,
                                                 (undefined1  [64])_ps512_cephes_log_p3);
                  auVar313 = vfmadd213ps_avx512f(auVar313,auVar319,(undefined1  [64])afVar152);
                  auVar313 = vfmadd213ps_avx512f(auVar313,auVar319,(undefined1  [64])afVar153);
                  auVar313 = vfmadd213ps_avx512f(auVar313,auVar319,(undefined1  [64])afVar154);
                  auVar313 = vfmadd213ps_avx512f(auVar313,auVar319,(undefined1  [64])afVar155);
                  auVar313 = vfmadd213ps_avx512f(auVar313,auVar319,(undefined1  [64])afVar156);
                  auVar314 = vmulps_avx512f(auVar311,auVar319);
                  auVar313 = vfmadd213ps_avx512f(auVar314,auVar313,auVar319);
                  uVar186 = vcmpps_avx512f(auVar310,in_ZMM29,2);
                  auVar310 = vpsubd_avx512f(auVar312,auVar338);
                  auVar310 = vcvtdq2ps_avx512f(auVar310);
                  auVar312 = vaddps_avx512f(auVar310,(undefined1  [64])afVar142);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  auVar320._0_4_ = (uint)bVar199 * auVar310._0_4_ | (uint)!bVar199 * auVar312._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  auVar320._4_4_ = (uint)bVar199 * auVar310._4_4_ | (uint)!bVar199 * auVar312._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  auVar320._8_4_ = (uint)bVar199 * auVar310._8_4_ | (uint)!bVar199 * auVar312._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  auVar320._12_4_ =
                       (uint)bVar199 * auVar310._12_4_ | (uint)!bVar199 * auVar312._12_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                  auVar320._16_4_ =
                       (uint)bVar199 * auVar310._16_4_ | (uint)!bVar199 * auVar312._16_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                  auVar320._20_4_ =
                       (uint)bVar199 * auVar310._20_4_ | (uint)!bVar199 * auVar312._20_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                  auVar320._24_4_ =
                       (uint)bVar199 * auVar310._24_4_ | (uint)!bVar199 * auVar312._24_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 7) & 1);
                  auVar320._28_4_ =
                       (uint)bVar199 * auVar310._28_4_ | (uint)!bVar199 * auVar312._28_4_;
                  bVar199 = (bool)(bVar30 & 1);
                  auVar320._32_4_ =
                       (uint)bVar199 * auVar310._32_4_ | (uint)!bVar199 * auVar312._32_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 9) & 1);
                  auVar320._36_4_ =
                       (uint)bVar199 * auVar310._36_4_ | (uint)!bVar199 * auVar312._36_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 10) & 1);
                  auVar320._40_4_ =
                       (uint)bVar199 * auVar310._40_4_ | (uint)!bVar199 * auVar312._40_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xb) & 1);
                  auVar320._44_4_ =
                       (uint)bVar199 * auVar310._44_4_ | (uint)!bVar199 * auVar312._44_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xc) & 1);
                  auVar320._48_4_ =
                       (uint)bVar199 * auVar310._48_4_ | (uint)!bVar199 * auVar312._48_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xd) & 1);
                  auVar320._52_4_ =
                       (uint)bVar199 * auVar310._52_4_ | (uint)!bVar199 * auVar312._52_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xe) & 1);
                  auVar320._56_4_ =
                       (uint)bVar199 * auVar310._56_4_ | (uint)!bVar199 * auVar312._56_4_;
                  bVar199 = SUB81(uVar171 >> 0xf,0);
                  auVar320._60_4_ =
                       (uint)bVar199 * auVar310._60_4_ | (uint)!bVar199 * auVar312._60_4_;
                  auVar310 = vfmadd231ps_avx512f(auVar313,auVar320,
                                                 (undefined1  [64])_ps512_cephes_log_q1);
                  auVar310 = vfmadd231ps_avx512f(auVar310,auVar339,auVar311);
                  auVar310 = vfmadd231ps_avx512f(auVar310,auVar320,
                                                 (undefined1  [64])_ps512_cephes_log_q2);
                  auVar310 = vmulps_avx512f(auVar310,auVar341);
                  auVar311 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                  bVar199 = (bool)((byte)uVar186 & 1);
                  auVar321._0_4_ = (uint)bVar199 * auVar311._0_4_ | (uint)!bVar199 * auVar310._0_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 1) & 1);
                  auVar321._4_4_ = (uint)bVar199 * auVar311._4_4_ | (uint)!bVar199 * auVar310._4_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 2) & 1);
                  auVar321._8_4_ = (uint)bVar199 * auVar311._8_4_ | (uint)!bVar199 * auVar310._8_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 3) & 1);
                  auVar321._12_4_ =
                       (uint)bVar199 * auVar311._12_4_ | (uint)!bVar199 * auVar310._12_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 4) & 1);
                  auVar321._16_4_ =
                       (uint)bVar199 * auVar311._16_4_ | (uint)!bVar199 * auVar310._16_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 5) & 1);
                  auVar321._20_4_ =
                       (uint)bVar199 * auVar311._20_4_ | (uint)!bVar199 * auVar310._20_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 6) & 1);
                  auVar321._24_4_ =
                       (uint)bVar199 * auVar311._24_4_ | (uint)!bVar199 * auVar310._24_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 7) & 1);
                  auVar321._28_4_ =
                       (uint)bVar199 * auVar311._28_4_ | (uint)!bVar199 * auVar310._28_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 8) & 1);
                  auVar321._32_4_ =
                       (uint)bVar199 * auVar311._32_4_ | (uint)!bVar199 * auVar310._32_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 9) & 1);
                  auVar321._36_4_ =
                       (uint)bVar199 * auVar311._36_4_ | (uint)!bVar199 * auVar310._36_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 10) & 1);
                  auVar321._40_4_ =
                       (uint)bVar199 * auVar311._40_4_ | (uint)!bVar199 * auVar310._40_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 0xb) & 1);
                  auVar321._44_4_ =
                       (uint)bVar199 * auVar311._44_4_ | (uint)!bVar199 * auVar310._44_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 0xc) & 1);
                  auVar321._48_4_ =
                       (uint)bVar199 * auVar311._48_4_ | (uint)!bVar199 * auVar310._48_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 0xd) & 1);
                  auVar321._52_4_ =
                       (uint)bVar199 * auVar311._52_4_ | (uint)!bVar199 * auVar310._52_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 0xe) & 1);
                  auVar321._56_4_ =
                       (uint)bVar199 * auVar311._56_4_ | (uint)!bVar199 * auVar310._56_4_;
                  bVar199 = SUB81(uVar186 >> 0xf,0);
                  auVar321._60_4_ =
                       (uint)bVar199 * auVar311._60_4_ | (uint)!bVar199 * auVar310._60_4_;
                  auVar310 = vminps_avx512f(auVar321,(undefined1  [64])afVar143);
                  auVar310 = vmaxps_avx512f(auVar310,(undefined1  [64])afVar144);
                  auVar311 = vfmadd213ps_avx512f((undefined1  [64])afVar145,auVar310,
                                                 (undefined1  [64])afVar151);
                  auVar312 = vrndscaleps_avx512f(auVar311,1);
                  uVar171 = vcmpps_avx512f(auVar311,auVar312,1);
                  auVar311 = vsubps_avx512f(auVar312,(undefined1  [64])afVar142);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  in_ZMM16._0_4_ = (uint)bVar199 * auVar311._0_4_ | (uint)!bVar199 * auVar312._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  in_ZMM16._4_4_ = (uint)bVar199 * auVar311._4_4_ | (uint)!bVar199 * auVar312._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  in_ZMM16._8_4_ = (uint)bVar199 * auVar311._8_4_ | (uint)!bVar199 * auVar312._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  in_ZMM16._12_4_ =
                       (uint)bVar199 * auVar311._12_4_ | (uint)!bVar199 * auVar312._12_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                  in_ZMM16._16_4_ =
                       (uint)bVar199 * auVar311._16_4_ | (uint)!bVar199 * auVar312._16_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                  in_ZMM16._20_4_ =
                       (uint)bVar199 * auVar311._20_4_ | (uint)!bVar199 * auVar312._20_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                  in_ZMM16._24_4_ =
                       (uint)bVar199 * auVar311._24_4_ | (uint)!bVar199 * auVar312._24_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 7) & 1);
                  in_ZMM16._28_4_ =
                       (uint)bVar199 * auVar311._28_4_ | (uint)!bVar199 * auVar312._28_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 8) & 1);
                  in_ZMM16._32_4_ =
                       (uint)bVar199 * auVar311._32_4_ | (uint)!bVar199 * auVar312._32_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 9) & 1);
                  in_ZMM16._36_4_ =
                       (uint)bVar199 * auVar311._36_4_ | (uint)!bVar199 * auVar312._36_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 10) & 1);
                  in_ZMM16._40_4_ =
                       (uint)bVar199 * auVar311._40_4_ | (uint)!bVar199 * auVar312._40_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xb) & 1);
                  in_ZMM16._44_4_ =
                       (uint)bVar199 * auVar311._44_4_ | (uint)!bVar199 * auVar312._44_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xc) & 1);
                  in_ZMM16._48_4_ =
                       (uint)bVar199 * auVar311._48_4_ | (uint)!bVar199 * auVar312._48_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xd) & 1);
                  in_ZMM16._52_4_ =
                       (uint)bVar199 * auVar311._52_4_ | (uint)!bVar199 * auVar312._52_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xe) & 1);
                  in_ZMM16._56_4_ =
                       (uint)bVar199 * auVar311._56_4_ | (uint)!bVar199 * auVar312._56_4_;
                  bVar199 = SUB81(uVar171 >> 0xf,0);
                  in_ZMM16._60_4_ =
                       (uint)bVar199 * auVar311._60_4_ | (uint)!bVar199 * auVar312._60_4_;
                  auVar310 = vfmadd231ps_avx512f(auVar310,in_ZMM16,auVar337);
                  auVar310 = vfmadd231ps_avx512f(auVar310,in_ZMM16,in_ZMM9);
                  auVar311 = vmulps_avx512f(auVar310,auVar310);
                  auVar312 = vfmadd213ps_avx512f(auVar310,(undefined1  [64])afVar146,
                                                 (undefined1  [64])afVar147);
                  auVar312 = vfmadd213ps_avx512f(auVar312,auVar310,(undefined1  [64])afVar148);
                  auVar312 = vfmadd213ps_avx512f(auVar312,auVar310,(undefined1  [64])afVar149);
                  auVar312 = vfmadd213ps_avx512f(auVar312,auVar310,(undefined1  [64])afVar150);
                  auVar312 = vfmadd213ps_avx512f(auVar312,auVar310,(undefined1  [64])afVar151);
                  in_ZMM17 = vfmadd213ps_avx512f(auVar312,auVar311,auVar310);
                  auVar310 = vaddps_avx512f(in_ZMM17,(undefined1  [64])afVar142);
                  auVar311 = vcvttps2dq_avx512f(in_ZMM16);
                  auVar311 = vpaddd_avx512f(auVar311,auVar338);
                  auVar311 = vpslld_avx512f(auVar311,0x17);
                  auVar310 = vfmadd213ps_avx512f(auVar311,auVar310,auVar340);
                  auVar311 = vrcp14ps_avx512f(auVar310);
                  auVar310 = vfmsub213ps_avx512f(auVar310,auVar311,auVar340);
                  auVar310 = vfnmadd132ps_avx512vl(auVar310,auVar311,auVar311);
                  auVar310 = vfnmsub213ps_avx512f(auVar310,auVar341,auVar340);
                  auVar309 = vmulps_avx512f(auVar310,auVar309);
                  break;
                case 6:
                  auVar310 = vbroadcastss_avx512f
                                       (ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var168)));
                  uVar3 = (*(uint **)(&this->field_0x118 + (long)p_Var168))[1];
                  auVar317._4_4_ = uVar3;
                  auVar317._0_4_ = uVar3;
                  auVar317._8_4_ = uVar3;
                  auVar317._12_4_ = uVar3;
                  auVar317._16_4_ = uVar3;
                  auVar317._20_4_ = uVar3;
                  auVar317._24_4_ = uVar3;
                  auVar317._28_4_ = uVar3;
                  auVar317._32_4_ = uVar3;
                  auVar317._36_4_ = uVar3;
                  auVar317._40_4_ = uVar3;
                  auVar317._44_4_ = uVar3;
                  auVar317._48_4_ = uVar3;
                  auVar317._52_4_ = uVar3;
                  auVar317._56_4_ = uVar3;
                  auVar317._60_4_ = uVar3;
                  auVar310 = vfmadd213ps_avx512f(auVar310,auVar309,auVar317);
                  auVar310 = vmaxps_avx512f(auVar310,in_ZMM29);
                  auVar310 = vminps_avx512f(auVar310,auVar340);
                  auVar309 = vmulps_avx512f(auVar310,auVar309);
                }
                *(undefined1 (*) [64])pAVar188 = auVar309;
                pAVar188 = pAVar188 + 8;
                uVar174 = uVar174 + 1;
                iVar161 = iVar161 + 1;
              } while (uVar174 != local_228.w);
            }
            iVar194 = iVar194 + 1;
          } while (iVar194 != local_228.h);
        }
        local_300 = (_func_int **)((long)local_300 + 1);
      } while (local_300 != (_func_int **)(long)local_228.c);
    }
    if ((uVar176 == 0x10) && (uVar190 == 8)) {
      if ((long)local_228.c < 1) goto LAB_0027f987;
      p_Var168 = pp_Var13[-3];
      iVar10 = *(int *)(&this->field_0xdc + (long)p_Var168);
      iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var168);
      iVar175 = *(int *)(&this->field_0xe4 + (long)p_Var168);
      iVar172 = *(int *)(&this->field_0xe8 + (long)p_Var168);
      iVar180 = *(int *)(&this->field_0x114 + (long)p_Var168);
      lVar192 = *(long *)(&this->field_0x1a8 + (long)p_Var168);
      uVar160 = *(uint *)(&this->field_0xd4 + (long)p_Var168);
      uVar169 = *(uint *)(&this->field_0xd8 + (long)p_Var168);
      iVar189 = (1 - uVar160) * iVar10;
      local_168._0_4_ = iVar189;
      local_300 = (_func_int **)0x0;
      auVar279._8_4_ = 0x42b0c0a5;
      auVar279._0_8_ = 0x42b0c0a542b0c0a5;
      auVar279._12_4_ = 0x42b0c0a5;
      auVar279._16_4_ = 0x42b0c0a5;
      auVar279._20_4_ = 0x42b0c0a5;
      auVar279._24_4_ = 0x42b0c0a5;
      auVar279._28_4_ = 0x42b0c0a5;
      auVar280._8_4_ = 0xc2b0c0a5;
      auVar280._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar280._12_4_ = 0xc2b0c0a5;
      auVar280._16_4_ = 0xc2b0c0a5;
      auVar280._20_4_ = 0xc2b0c0a5;
      auVar280._24_4_ = 0xc2b0c0a5;
      auVar280._28_4_ = 0xc2b0c0a5;
      auVar281._8_4_ = 0x3f000000;
      auVar281._0_8_ = 0x3f0000003f000000;
      auVar281._12_4_ = 0x3f000000;
      auVar281._16_4_ = 0x3f000000;
      auVar281._20_4_ = 0x3f000000;
      auVar281._24_4_ = 0x3f000000;
      auVar281._28_4_ = 0x3f000000;
      auVar282._8_4_ = 0x3fb8aa3b;
      auVar282._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar282._12_4_ = 0x3fb8aa3b;
      auVar282._16_4_ = 0x3fb8aa3b;
      auVar282._20_4_ = 0x3fb8aa3b;
      auVar282._24_4_ = 0x3fb8aa3b;
      auVar282._28_4_ = 0x3fb8aa3b;
      auVar283._8_4_ = 0x3f800000;
      auVar283._0_8_ = 0x3f8000003f800000;
      auVar283._12_4_ = 0x3f800000;
      auVar283._16_4_ = 0x3f800000;
      auVar283._20_4_ = 0x3f800000;
      auVar283._24_4_ = 0x3f800000;
      auVar283._28_4_ = 0x3f800000;
      auVar284._8_4_ = 0x3f318000;
      auVar284._0_8_ = 0x3f3180003f318000;
      auVar284._12_4_ = 0x3f318000;
      auVar284._16_4_ = 0x3f318000;
      auVar284._20_4_ = 0x3f318000;
      auVar284._24_4_ = 0x3f318000;
      auVar284._28_4_ = 0x3f318000;
      auVar257 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar285._8_4_ = 0x3ab743ce;
      auVar285._0_8_ = 0x3ab743ce3ab743ce;
      auVar285._12_4_ = 0x3ab743ce;
      auVar285._16_4_ = 0x3ab743ce;
      auVar285._20_4_ = 0x3ab743ce;
      auVar285._24_4_ = 0x3ab743ce;
      auVar285._28_4_ = 0x3ab743ce;
      auVar286._8_4_ = 0x3c088908;
      auVar286._0_8_ = 0x3c0889083c088908;
      auVar286._12_4_ = 0x3c088908;
      auVar286._16_4_ = 0x3c088908;
      auVar286._20_4_ = 0x3c088908;
      auVar286._24_4_ = 0x3c088908;
      auVar286._28_4_ = 0x3c088908;
      auVar287._8_4_ = 0x3d2aa9c1;
      auVar287._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar287._12_4_ = 0x3d2aa9c1;
      auVar287._16_4_ = 0x3d2aa9c1;
      auVar287._20_4_ = 0x3d2aa9c1;
      auVar287._24_4_ = 0x3d2aa9c1;
      auVar287._28_4_ = 0x3d2aa9c1;
      auVar288._8_4_ = 0x3e2aaaaa;
      auVar288._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar288._12_4_ = 0x3e2aaaaa;
      auVar288._16_4_ = 0x3e2aaaaa;
      auVar288._20_4_ = 0x3e2aaaaa;
      auVar288._24_4_ = 0x3e2aaaaa;
      auVar288._28_4_ = 0x3e2aaaaa;
      auVar289._8_4_ = 0x3f800000;
      auVar289._0_8_ = 0x3f8000003f800000;
      auVar289._12_4_ = 0x3f800000;
      auVar289._16_4_ = 0x3f800000;
      auVar289._20_4_ = 0x3f800000;
      auVar289._24_4_ = 0x3f800000;
      auVar289._28_4_ = 0x3f800000;
      auVar290._8_4_ = 0xb95e8083;
      auVar290._0_8_ = 0xb95e8083b95e8083;
      auVar290._12_4_ = 0xb95e8083;
      auVar290._16_4_ = 0xb95e8083;
      auVar290._20_4_ = 0xb95e8083;
      auVar290._24_4_ = 0xb95e8083;
      auVar290._28_4_ = 0xb95e8083;
      auVar258 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      do {
        local_1a8._0_4_ = local_228.h;
        if (0 < local_228.h) {
          iVar195 = bottom_blob->w;
          iVar194 = bottom_blob->h;
          pAVar188 = (Allocator *)
                     ((long)(_func_int ***)local_228.data +
                     local_228.cstep * (long)local_300 * local_228.elemsize);
          uVar170 = bottom_blob->c;
          iVar161 = 0;
          do {
            if (0 < local_228.w) {
              uVar174 = 0;
              iVar162 = iVar189;
              do {
                if (lVar192 == 0) {
                  auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar336 = ZEXT3264(*(undefined1 (*) [32])(lVar192 + (long)local_300 * 0x20));
                }
                if (0 < (int)uVar170) {
                  pvVar196 = (void *)((this->weight_data_tm).cstep * (long)local_300 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar183 = bottom_blob->data;
                  uVar171 = 0;
                  do {
                    if (0 < (int)uVar169) {
                      uVar186 = 0;
                      uVar181 = 0;
                      do {
                        iVar163 = (((int)uVar181 - uVar169) + 1) * iVar11 + iVar161;
                        if ((((-1 < iVar163) &&
                             (iVar164 = iVar163 / iVar172, iVar163 % iVar172 == 0)) &&
                            (0 < (int)uVar160)) && (iVar164 < iVar194)) {
                          lVar187 = (long)iVar164 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar171;
                          uVar185 = (ulong)uVar160;
                          uVar191 = uVar186;
                          iVar163 = iVar162;
                          do {
                            if (((-1 < iVar163) &&
                                (iVar164 = iVar163 / iVar175, iVar163 % iVar175 == 0)) &&
                               (iVar164 < iVar195)) {
                              lVar166 = (long)(iVar164 << 4);
                              uVar12 = *(undefined4 *)((long)pvVar183 + lVar166 * 4 + lVar187);
                              auVar475._4_4_ = uVar12;
                              auVar475._0_4_ = uVar12;
                              auVar475._8_4_ = uVar12;
                              auVar475._12_4_ = uVar12;
                              auVar475._16_4_ = uVar12;
                              auVar475._20_4_ = uVar12;
                              auVar475._24_4_ = uVar12;
                              auVar475._28_4_ = uVar12;
                              uVar12 = *(undefined4 *)((long)pvVar183 + lVar166 * 4 + lVar187 + 4);
                              auVar473._4_4_ = uVar12;
                              auVar473._0_4_ = uVar12;
                              auVar473._8_4_ = uVar12;
                              auVar473._12_4_ = uVar12;
                              auVar473._16_4_ = uVar12;
                              auVar473._20_4_ = uVar12;
                              auVar473._24_4_ = uVar12;
                              auVar473._28_4_ = uVar12;
                              in_ZMM9 = ZEXT3264(auVar473);
                              auVar259 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 8)));
                              in_ZMM16 = ZEXT3264(auVar259);
                              auVar260 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0xc)));
                              in_ZMM17 = ZEXT3264(auVar260);
                              auVar261 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x10)))
                              ;
                              auVar262 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x14)))
                              ;
                              auVar263 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x18)))
                              ;
                              auVar264 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x1c)))
                              ;
                              auVar265 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x20)))
                              ;
                              auVar266 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x24)))
                              ;
                              auVar267 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x28)))
                              ;
                              auVar268 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x2c)))
                              ;
                              auVar269 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x30)))
                              ;
                              auVar270 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x34)))
                              ;
                              in_ZMM29 = ZEXT3264(auVar270);
                              auVar271 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x38)))
                              ;
                              auVar272 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x3c)))
                              ;
                              uVar201 = uVar191 & 0xffffffff;
                              auVar203 = vfmadd231ps_fma(auVar336._0_32_,auVar475,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar196 + uVar201 * 4));
                              auVar203 = vfmadd231ps_fma(ZEXT1632(auVar203),auVar473,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar196 + uVar201 * 4 + 0x20));
                              auVar259 = vfmadd231ps_avx512vl
                                                   (ZEXT1632(auVar203),auVar259,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar196 + uVar201 * 4 + 0x40));
                              auVar259 = vfmadd231ps_avx512vl
                                                   (auVar259,auVar260,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar196 + uVar201 * 4 + 0x60));
                              auVar259 = vfmadd231ps_avx512vl
                                                   (auVar259,auVar261,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar196 + uVar201 * 4 + 0x80));
                              auVar259 = vfmadd231ps_avx512vl
                                                   (auVar259,auVar262,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar196 + uVar201 * 4 + 0xa0));
                              auVar259 = vfmadd231ps_avx512vl
                                                   (auVar259,auVar263,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar196 + uVar201 * 4 + 0xc0));
                              auVar259 = vfmadd231ps_avx512vl
                                                   (auVar259,auVar264,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar196 + uVar201 * 4 + 0xe0));
                              auVar259 = vfmadd231ps_avx512vl
                                                   (auVar259,auVar265,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar196 + uVar201 * 4 + 0x100));
                              auVar259 = vfmadd231ps_avx512vl
                                                   (auVar259,auVar266,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar196 + uVar201 * 4 + 0x120));
                              auVar259 = vfmadd231ps_avx512vl
                                                   (auVar259,auVar267,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar196 + uVar201 * 4 + 0x140));
                              auVar259 = vfmadd231ps_avx512vl
                                                   (auVar259,auVar268,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar196 + uVar201 * 4 + 0x160));
                              auVar259 = vfmadd231ps_avx512vl
                                                   (auVar259,auVar269,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar196 + uVar201 * 4 + 0x180));
                              auVar259 = vfmadd231ps_avx512vl
                                                   (auVar259,auVar270,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar196 + uVar201 * 4 + 0x1a0));
                              auVar259 = vfmadd231ps_avx512vl
                                                   (auVar259,auVar271,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar196 + uVar201 * 4 + 0x1c0));
                              auVar259 = vfmadd231ps_avx512vl
                                                   (auVar259,auVar272,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar196 + uVar201 * 4 + 0x1e0));
                              auVar336 = ZEXT3264(auVar259);
                            }
                            uVar191 = uVar191 + 0x80;
                            iVar163 = iVar163 + iVar10;
                            uVar185 = uVar185 - 1;
                          } while (uVar185 != 0);
                        }
                        uVar181 = uVar181 + 1;
                        uVar186 = uVar186 + (ulong)uVar160 * 0x80;
                      } while (uVar181 != uVar169);
                    }
                    pvVar196 = (void *)((long)pvVar196 + (long)(int)(uVar160 * uVar169 * 0x80) * 4);
                    uVar171 = uVar171 + 1;
                  } while (uVar171 != uVar170);
                }
                auVar259 = auVar336._0_32_;
                if (iVar180 - 1U < 6) {
                  auVar260 = ZEXT1632(ZEXT816(0) << 0x40);
                  auVar337._28_36_ = auVar336._28_36_;
                  switch(iVar180) {
                  case 1:
                    auVar259 = vmaxps_avx(auVar259,ZEXT1632(ZEXT816(0) << 0x40));
                    break;
                  case 2:
                    auVar261 = vmaxps_avx(auVar259,auVar260);
                    auVar259 = vminps_avx(auVar259,auVar260);
                    uVar12 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                    auVar90._4_4_ = uVar12;
                    auVar90._0_4_ = uVar12;
                    auVar90._8_4_ = uVar12;
                    auVar90._12_4_ = uVar12;
                    auVar90._16_4_ = uVar12;
                    auVar90._20_4_ = uVar12;
                    auVar90._24_4_ = uVar12;
                    auVar90._28_4_ = uVar12;
                    auVar259 = vfmadd132ps_avx512vl(auVar259,auVar261,auVar90);
                    break;
                  case 3:
                    uVar12 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                    auVar88._4_4_ = uVar12;
                    auVar88._0_4_ = uVar12;
                    auVar88._8_4_ = uVar12;
                    auVar88._12_4_ = uVar12;
                    auVar88._16_4_ = uVar12;
                    auVar88._20_4_ = uVar12;
                    auVar88._24_4_ = uVar12;
                    auVar88._28_4_ = uVar12;
                    auVar259 = vmaxps_avx512vl(auVar259,auVar88);
                    uVar12 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var168))[1];
                    auVar89._4_4_ = uVar12;
                    auVar89._0_4_ = uVar12;
                    auVar89._8_4_ = uVar12;
                    auVar89._12_4_ = uVar12;
                    auVar89._16_4_ = uVar12;
                    auVar89._20_4_ = uVar12;
                    auVar89._24_4_ = uVar12;
                    auVar89._28_4_ = uVar12;
                    auVar259 = vminps_avx512vl(auVar259,auVar89);
                    break;
                  case 4:
                    auVar86._8_4_ = 0x80000000;
                    auVar86._0_8_ = 0x8000000080000000;
                    auVar86._12_4_ = 0x80000000;
                    auVar86._16_4_ = 0x80000000;
                    auVar86._20_4_ = 0x80000000;
                    auVar86._24_4_ = 0x80000000;
                    auVar86._28_4_ = 0x80000000;
                    auVar259 = vxorps_avx512vl(auVar259,auVar86);
                    auVar259 = vminps_avx(auVar259,auVar279);
                    auVar259 = vmaxps_avx(auVar259,auVar280);
                    auVar203 = vfmadd231ps_fma(auVar281,auVar259,auVar282);
                    auVar260 = vrndscaleps_avx512vl(ZEXT1632(auVar203),1);
                    uVar171 = vcmpps_avx512vl(ZEXT1632(auVar203),auVar260,1);
                    auVar261 = vsubps_avx512vl(auVar260,auVar283);
                    bVar199 = (bool)((byte)uVar171 & 1);
                    auVar278._0_4_ =
                         (uint)bVar199 * auVar261._0_4_ | (uint)!bVar199 * auVar260._0_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                    auVar278._4_4_ =
                         (uint)bVar199 * auVar261._4_4_ | (uint)!bVar199 * auVar260._4_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                    auVar278._8_4_ =
                         (uint)bVar199 * auVar261._8_4_ | (uint)!bVar199 * auVar260._8_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                    auVar278._12_4_ =
                         (uint)bVar199 * auVar261._12_4_ | (uint)!bVar199 * auVar260._12_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                    auVar278._16_4_ =
                         (uint)bVar199 * auVar261._16_4_ | (uint)!bVar199 * auVar260._16_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                    auVar278._20_4_ =
                         (uint)bVar199 * auVar261._20_4_ | (uint)!bVar199 * auVar260._20_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                    auVar278._24_4_ =
                         (uint)bVar199 * auVar261._24_4_ | (uint)!bVar199 * auVar260._24_4_;
                    bVar199 = SUB81(uVar171 >> 7,0);
                    auVar278._28_4_ =
                         (uint)bVar199 * auVar261._28_4_ | (uint)!bVar199 * auVar260._28_4_;
                    in_ZMM16 = ZEXT3264(auVar278);
                    auVar259 = vfmsub231ps_avx512vl(auVar259,auVar278,auVar284);
                    auVar87._8_4_ = 0x395e8083;
                    auVar87._0_8_ = 0x395e8083395e8083;
                    auVar87._12_4_ = 0x395e8083;
                    auVar87._16_4_ = 0x395e8083;
                    auVar87._20_4_ = 0x395e8083;
                    auVar87._24_4_ = 0x395e8083;
                    auVar87._28_4_ = 0x395e8083;
                    auVar259 = vfmsub231ps_avx512vl(auVar259,auVar278,auVar87);
                    auVar448._0_4_ = auVar259._0_4_ * auVar259._0_4_;
                    auVar448._4_4_ = auVar259._4_4_ * auVar259._4_4_;
                    auVar448._8_4_ = auVar259._8_4_ * auVar259._8_4_;
                    auVar448._12_4_ = auVar259._12_4_ * auVar259._12_4_;
                    auVar448._16_4_ = auVar259._16_4_ * auVar259._16_4_;
                    auVar448._20_4_ = auVar259._20_4_ * auVar259._20_4_;
                    auVar448._24_4_ = auVar259._24_4_ * auVar259._24_4_;
                    auVar448._28_4_ = 0;
                    auVar203 = vfmadd213ps_fma(auVar257,auVar259,auVar285);
                    auVar203 = vfmadd213ps_fma(ZEXT1632(auVar203),auVar259,auVar286);
                    auVar203 = vfmadd213ps_fma(ZEXT1632(auVar203),auVar259,auVar287);
                    auVar203 = vfmadd213ps_fma(ZEXT1632(auVar203),auVar259,auVar288);
                    auVar203 = vfmadd213ps_fma(ZEXT1632(auVar203),auVar259,auVar281);
                    auVar203 = vfmadd213ps_fma(ZEXT1632(auVar203),auVar448,auVar259);
                    in_ZMM9 = ZEXT1664(auVar203);
                    auVar449._0_4_ = auVar203._0_4_ + 1.0;
                    auVar449._4_4_ = auVar203._4_4_ + 1.0;
                    auVar449._8_4_ = auVar203._8_4_ + 1.0;
                    auVar449._12_4_ = auVar203._12_4_ + 1.0;
                    auVar449._16_4_ = 0x3f800000;
                    auVar449._20_4_ = 0x3f800000;
                    auVar449._24_4_ = 0x3f800000;
                    auVar449._28_4_ = 0x3f800000;
                    auVar259 = vcvttps2dq_avx512vl(auVar278);
                    auVar259 = vpslld_avx2(auVar259,0x17);
                    auVar259 = vpaddd_avx2(auVar289,auVar259);
                    auVar203 = vfmadd213ps_fma(auVar259,auVar449,auVar283);
                    auVar259 = vrcpps_avx(ZEXT1632(auVar203));
                    auVar203 = vfmsub213ps_fma(ZEXT1632(auVar203),auVar259,auVar283);
                    auVar203 = vfnmadd132ps_fma(ZEXT1632(auVar203),auVar259,auVar259);
                    auVar259 = ZEXT1632(auVar203);
                    break;
                  case 5:
                    auVar259 = vminps_avx(auVar259,auVar279);
                    auVar259 = vmaxps_avx(auVar259,auVar280);
                    auVar203 = vfmadd213ps_fma(auVar282,auVar259,auVar281);
                    auVar261 = vrndscaleps_avx512vl(ZEXT1632(auVar203),1);
                    uVar171 = vcmpps_avx512vl(ZEXT1632(auVar203),auVar261,1);
                    auVar262 = vsubps_avx512vl(auVar261,auVar283);
                    bVar199 = (bool)((byte)uVar171 & 1);
                    auVar273._0_4_ =
                         (uint)bVar199 * auVar262._0_4_ | (uint)!bVar199 * auVar261._0_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                    auVar273._4_4_ =
                         (uint)bVar199 * auVar262._4_4_ | (uint)!bVar199 * auVar261._4_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                    auVar273._8_4_ =
                         (uint)bVar199 * auVar262._8_4_ | (uint)!bVar199 * auVar261._8_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                    auVar273._12_4_ =
                         (uint)bVar199 * auVar262._12_4_ | (uint)!bVar199 * auVar261._12_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                    auVar273._16_4_ =
                         (uint)bVar199 * auVar262._16_4_ | (uint)!bVar199 * auVar261._16_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                    auVar273._20_4_ =
                         (uint)bVar199 * auVar262._20_4_ | (uint)!bVar199 * auVar261._20_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                    auVar273._24_4_ =
                         (uint)bVar199 * auVar262._24_4_ | (uint)!bVar199 * auVar261._24_4_;
                    bVar199 = SUB81(uVar171 >> 7,0);
                    auVar273._28_4_ =
                         (uint)bVar199 * auVar262._28_4_ | (uint)!bVar199 * auVar261._28_4_;
                    auVar259 = vfmsub231ps_avx512vl(auVar259,auVar273,auVar284);
                    auVar259 = vfnmsub231ps_avx512vl(auVar259,auVar273,auVar290);
                    auVar474._0_4_ = auVar259._0_4_ * auVar259._0_4_;
                    auVar474._4_4_ = auVar259._4_4_ * auVar259._4_4_;
                    auVar474._8_4_ = auVar259._8_4_ * auVar259._8_4_;
                    auVar474._12_4_ = auVar259._12_4_ * auVar259._12_4_;
                    auVar474._16_4_ = auVar259._16_4_ * auVar259._16_4_;
                    auVar474._20_4_ = auVar259._20_4_ * auVar259._20_4_;
                    auVar474._24_4_ = auVar259._24_4_ * auVar259._24_4_;
                    auVar474._28_4_ = 0;
                    auVar261 = vfmadd213ps_avx512vl(auVar257,auVar259,auVar285);
                    auVar261 = vfmadd213ps_avx512vl(auVar261,auVar259,auVar286);
                    auVar261 = vfmadd213ps_avx512vl(auVar261,auVar259,auVar287);
                    auVar261 = vfmadd213ps_avx512vl(auVar261,auVar259,auVar288);
                    auVar261 = vfmadd213ps_avx512vl(auVar261,auVar259,auVar281);
                    auVar259 = vfmadd213ps_avx512vl(auVar261,auVar474,auVar259);
                    auVar261 = vaddps_avx512vl(auVar259,auVar283);
                    auVar259 = vcvttps2dq_avx512vl(auVar273);
                    auVar259 = vpslld_avx2(auVar259,0x17);
                    auVar259 = vpaddd_avx2(auVar259,auVar289);
                    auVar203 = vfmadd213ps_fma(auVar259,auVar261,auVar283);
                    uVar171 = vcmpps_avx512vl(ZEXT1632(auVar203),auVar260,2);
                    auVar259._8_4_ = 0x800000;
                    auVar259._0_8_ = 0x80000000800000;
                    auVar259._12_4_ = 0x800000;
                    auVar259._16_4_ = 0x800000;
                    auVar259._20_4_ = 0x800000;
                    auVar259._24_4_ = 0x800000;
                    auVar259._28_4_ = 0x800000;
                    auVar259 = vmaxps_avx512vl(ZEXT1632(auVar203),auVar259);
                    auVar475 = vpsrld_avx2(auVar259,0x17);
                    auVar261 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar260._8_4_ = 0x3f000000;
                    auVar260._0_8_ = 0x3f0000003f000000;
                    auVar260._12_4_ = 0x3f000000;
                    auVar260._16_4_ = 0x3f000000;
                    auVar260._20_4_ = 0x3f000000;
                    auVar260._24_4_ = 0x3f000000;
                    auVar260._28_4_ = 0x3f000000;
                    auVar259 = vpternlogd_avx512vl(auVar259,auVar261,auVar260,0xea);
                    auVar263._8_4_ = 0x3f3504f3;
                    auVar263._0_8_ = 0x3f3504f33f3504f3;
                    auVar263._12_4_ = 0x3f3504f3;
                    auVar263._16_4_ = 0x3f3504f3;
                    auVar263._20_4_ = 0x3f3504f3;
                    auVar263._24_4_ = 0x3f3504f3;
                    auVar263._28_4_ = 0x3f3504f3;
                    uVar186 = vcmpps_avx512vl(auVar259,auVar263,1);
                    auVar260 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
                    auVar261 = vaddps_avx512vl(auVar259,auVar260);
                    auVar259 = vaddps_avx512vl(auVar261,auVar259);
                    bVar199 = (bool)((byte)uVar186 & 1);
                    auVar274._0_4_ =
                         (uint)bVar199 * auVar259._0_4_ | (uint)!bVar199 * auVar261._0_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 1) & 1);
                    auVar274._4_4_ =
                         (uint)bVar199 * auVar259._4_4_ | (uint)!bVar199 * auVar261._4_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 2) & 1);
                    auVar274._8_4_ =
                         (uint)bVar199 * auVar259._8_4_ | (uint)!bVar199 * auVar261._8_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 3) & 1);
                    auVar274._12_4_ =
                         (uint)bVar199 * auVar259._12_4_ | (uint)!bVar199 * auVar261._12_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 4) & 1);
                    auVar274._16_4_ =
                         (uint)bVar199 * auVar259._16_4_ | (uint)!bVar199 * auVar261._16_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 5) & 1);
                    auVar274._20_4_ =
                         (uint)bVar199 * auVar259._20_4_ | (uint)!bVar199 * auVar261._20_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 6) & 1);
                    auVar274._24_4_ =
                         (uint)bVar199 * auVar259._24_4_ | (uint)!bVar199 * auVar261._24_4_;
                    bVar199 = SUB81(uVar186 >> 7,0);
                    auVar274._28_4_ =
                         (uint)bVar199 * auVar259._28_4_ | (uint)!bVar199 * auVar261._28_4_;
                    auVar261 = vmulps_avx512vl(auVar274,auVar274);
                    auVar259 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
                    auVar264._8_4_ = 0xbdebd1b8;
                    auVar264._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar264._12_4_ = 0xbdebd1b8;
                    auVar264._16_4_ = 0xbdebd1b8;
                    auVar264._20_4_ = 0xbdebd1b8;
                    auVar264._24_4_ = 0xbdebd1b8;
                    auVar264._28_4_ = 0xbdebd1b8;
                    auVar259 = vfmadd213ps_avx512vl(auVar259,auVar274,auVar264);
                    auVar265._8_4_ = 0x3def251a;
                    auVar265._0_8_ = 0x3def251a3def251a;
                    auVar265._12_4_ = 0x3def251a;
                    auVar265._16_4_ = 0x3def251a;
                    auVar265._20_4_ = 0x3def251a;
                    auVar265._24_4_ = 0x3def251a;
                    auVar265._28_4_ = 0x3def251a;
                    auVar259 = vfmadd213ps_avx512vl(auVar259,auVar274,auVar265);
                    auVar266._8_4_ = 0xbdfe5d4f;
                    auVar266._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar266._12_4_ = 0xbdfe5d4f;
                    auVar266._16_4_ = 0xbdfe5d4f;
                    auVar266._20_4_ = 0xbdfe5d4f;
                    auVar266._24_4_ = 0xbdfe5d4f;
                    auVar266._28_4_ = 0xbdfe5d4f;
                    auVar259 = vfmadd213ps_avx512vl(auVar259,auVar274,auVar266);
                    auVar267._8_4_ = 0x3e11e9bf;
                    auVar267._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar267._12_4_ = 0x3e11e9bf;
                    auVar267._16_4_ = 0x3e11e9bf;
                    auVar267._20_4_ = 0x3e11e9bf;
                    auVar267._24_4_ = 0x3e11e9bf;
                    auVar267._28_4_ = 0x3e11e9bf;
                    auVar259 = vfmadd213ps_avx512vl(auVar259,auVar274,auVar267);
                    auVar268._8_4_ = 0xbe2aae50;
                    auVar268._0_8_ = 0xbe2aae50be2aae50;
                    auVar268._12_4_ = 0xbe2aae50;
                    auVar268._16_4_ = 0xbe2aae50;
                    auVar268._20_4_ = 0xbe2aae50;
                    auVar268._24_4_ = 0xbe2aae50;
                    auVar268._28_4_ = 0xbe2aae50;
                    auVar259 = vfmadd213ps_avx512vl(auVar259,auVar274,auVar268);
                    auVar269._8_4_ = 0x3e4cceac;
                    auVar269._0_8_ = 0x3e4cceac3e4cceac;
                    auVar269._12_4_ = 0x3e4cceac;
                    auVar269._16_4_ = 0x3e4cceac;
                    auVar269._20_4_ = 0x3e4cceac;
                    auVar269._24_4_ = 0x3e4cceac;
                    auVar269._28_4_ = 0x3e4cceac;
                    auVar259 = vfmadd213ps_avx512vl(auVar259,auVar274,auVar269);
                    auVar270._8_4_ = 0xbe7ffffc;
                    auVar270._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar270._12_4_ = 0xbe7ffffc;
                    auVar270._16_4_ = 0xbe7ffffc;
                    auVar270._20_4_ = 0xbe7ffffc;
                    auVar270._24_4_ = 0xbe7ffffc;
                    auVar270._28_4_ = 0xbe7ffffc;
                    auVar259 = vfmadd213ps_avx512vl(auVar259,auVar274,auVar270);
                    auVar271._8_4_ = 0x3eaaaaaa;
                    auVar271._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar271._12_4_ = 0x3eaaaaaa;
                    auVar271._16_4_ = 0x3eaaaaaa;
                    auVar271._20_4_ = 0x3eaaaaaa;
                    auVar271._24_4_ = 0x3eaaaaaa;
                    auVar271._28_4_ = 0x3eaaaaaa;
                    auVar259 = vfmadd213ps_avx512vl(auVar259,auVar274,auVar271);
                    auVar262 = vmulps_avx512vl(auVar261,auVar274);
                    auVar262 = vmulps_avx512vl(auVar262,auVar259);
                    auVar272._8_4_ = 0xffffff82;
                    auVar272._0_8_ = 0xffffff82ffffff82;
                    auVar272._12_4_ = 0xffffff82;
                    auVar272._16_4_ = 0xffffff82;
                    auVar272._20_4_ = 0xffffff82;
                    auVar272._24_4_ = 0xffffff82;
                    auVar272._28_4_ = 0xffffff82;
                    auVar259 = vpaddd_avx512vl(auVar475,auVar272);
                    auVar259 = vcvtdq2ps_avx(auVar259);
                    auVar263 = vsubps_avx512vl(auVar259,auVar283);
                    bVar199 = (bool)((byte)uVar186 & 1);
                    auVar275._0_4_ =
                         (uint)bVar199 * auVar263._0_4_ | (uint)!bVar199 * auVar259._0_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 1) & 1);
                    auVar275._4_4_ =
                         (uint)bVar199 * auVar263._4_4_ | (uint)!bVar199 * auVar259._4_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 2) & 1);
                    auVar275._8_4_ =
                         (uint)bVar199 * auVar263._8_4_ | (uint)!bVar199 * auVar259._8_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 3) & 1);
                    auVar275._12_4_ =
                         (uint)bVar199 * auVar263._12_4_ | (uint)!bVar199 * auVar259._12_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 4) & 1);
                    auVar275._16_4_ =
                         (uint)bVar199 * auVar263._16_4_ | (uint)!bVar199 * auVar259._16_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 5) & 1);
                    auVar275._20_4_ =
                         (uint)bVar199 * auVar263._20_4_ | (uint)!bVar199 * auVar259._20_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 6) & 1);
                    auVar275._24_4_ =
                         (uint)bVar199 * auVar263._24_4_ | (uint)!bVar199 * auVar259._24_4_;
                    bVar199 = SUB81(uVar186 >> 7,0);
                    auVar275._28_4_ =
                         (uint)bVar199 * auVar263._28_4_ | (uint)!bVar199 * auVar259._28_4_;
                    auVar259 = vfmadd231ps_avx512vl(auVar262,auVar275,auVar290);
                    auVar259 = vfmsub231ps_avx512vl(auVar259,auVar281,auVar261);
                    auVar259 = vsubps_avx512vl(auVar259,auVar274);
                    auVar203 = vfmsub231ps_fma(auVar259,auVar284,auVar275);
                    auVar259 = vmulps_avx512vl(ZEXT1632(auVar203),auVar258);
                    auVar261 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar199 = (bool)((byte)uVar171 & 1);
                    auVar276._0_4_ =
                         (uint)bVar199 * auVar261._0_4_ | (uint)!bVar199 * auVar259._0_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                    auVar276._4_4_ =
                         (uint)bVar199 * auVar261._4_4_ | (uint)!bVar199 * auVar259._4_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                    auVar276._8_4_ =
                         (uint)bVar199 * auVar261._8_4_ | (uint)!bVar199 * auVar259._8_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                    auVar276._12_4_ =
                         (uint)bVar199 * auVar261._12_4_ | (uint)!bVar199 * auVar259._12_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                    auVar276._16_4_ =
                         (uint)bVar199 * auVar261._16_4_ | (uint)!bVar199 * auVar259._16_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                    auVar276._20_4_ =
                         (uint)bVar199 * auVar261._20_4_ | (uint)!bVar199 * auVar259._20_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                    auVar276._24_4_ =
                         (uint)bVar199 * auVar261._24_4_ | (uint)!bVar199 * auVar259._24_4_;
                    bVar199 = SUB81(uVar171 >> 7,0);
                    auVar276._28_4_ =
                         (uint)bVar199 * auVar261._28_4_ | (uint)!bVar199 * auVar259._28_4_;
                    auVar259 = vminps_avx(auVar276,auVar279);
                    auVar259 = vmaxps_avx(auVar259,auVar280);
                    auVar203 = vfmadd213ps_fma(auVar282,auVar259,auVar281);
                    auVar261 = vrndscaleps_avx512vl(ZEXT1632(auVar203),1);
                    uVar171 = vcmpps_avx512vl(ZEXT1632(auVar203),auVar261,1);
                    auVar262 = vsubps_avx512vl(auVar261,auVar283);
                    bVar199 = (bool)((byte)uVar171 & 1);
                    auVar277._0_4_ =
                         (uint)bVar199 * auVar262._0_4_ | (uint)!bVar199 * auVar261._0_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                    auVar277._4_4_ =
                         (uint)bVar199 * auVar262._4_4_ | (uint)!bVar199 * auVar261._4_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                    auVar277._8_4_ =
                         (uint)bVar199 * auVar262._8_4_ | (uint)!bVar199 * auVar261._8_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                    auVar277._12_4_ =
                         (uint)bVar199 * auVar262._12_4_ | (uint)!bVar199 * auVar261._12_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                    auVar277._16_4_ =
                         (uint)bVar199 * auVar262._16_4_ | (uint)!bVar199 * auVar261._16_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                    auVar277._20_4_ =
                         (uint)bVar199 * auVar262._20_4_ | (uint)!bVar199 * auVar261._20_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                    auVar277._24_4_ =
                         (uint)bVar199 * auVar262._24_4_ | (uint)!bVar199 * auVar261._24_4_;
                    bVar199 = SUB81(uVar171 >> 7,0);
                    auVar277._28_4_ =
                         (uint)bVar199 * auVar262._28_4_ | (uint)!bVar199 * auVar261._28_4_;
                    in_ZMM16 = ZEXT3264(auVar277);
                    auVar259 = vfmsub231ps_avx512vl(auVar259,auVar277,auVar284);
                    auVar259 = vfnmsub231ps_avx512vl(auVar259,auVar277,auVar290);
                    auVar476._0_4_ = auVar259._0_4_ * auVar259._0_4_;
                    auVar476._4_4_ = auVar259._4_4_ * auVar259._4_4_;
                    auVar476._8_4_ = auVar259._8_4_ * auVar259._8_4_;
                    auVar476._12_4_ = auVar259._12_4_ * auVar259._12_4_;
                    auVar476._16_4_ = auVar259._16_4_ * auVar259._16_4_;
                    auVar476._20_4_ = auVar259._20_4_ * auVar259._20_4_;
                    auVar476._24_4_ = auVar259._24_4_ * auVar259._24_4_;
                    auVar476._28_4_ = 0;
                    auVar261 = vfmadd213ps_avx512vl(auVar257,auVar259,auVar285);
                    auVar261 = vfmadd213ps_avx512vl(auVar261,auVar259,auVar286);
                    auVar261 = vfmadd213ps_avx512vl(auVar261,auVar259,auVar287);
                    auVar261 = vfmadd213ps_avx512vl(auVar261,auVar259,auVar288);
                    auVar261 = vfmadd213ps_avx512vl(auVar261,auVar259,auVar281);
                    auVar259 = vfmadd213ps_avx512vl(auVar261,auVar476,auVar259);
                    in_ZMM17 = ZEXT3264(auVar259);
                    auVar261 = vaddps_avx512vl(auVar259,auVar283);
                    auVar259 = vcvttps2dq_avx512vl(auVar277);
                    auVar259 = vpslld_avx2(auVar259,0x17);
                    auVar259 = vpaddd_avx2(auVar259,auVar289);
                    auVar203 = vfmadd213ps_fma(auVar259,auVar261,auVar283);
                    auVar259 = vrcpps_avx(ZEXT1632(auVar203));
                    auVar203 = vfmsub213ps_fma(ZEXT1632(auVar203),auVar259,auVar283);
                    auVar203 = vfnmadd132ps_fma(ZEXT1632(auVar203),auVar259,auVar259);
                    auVar259 = vfnmadd213ps_avx512vl(ZEXT1632(auVar203),auVar258,auVar260);
                    in_ZMM9 = ZEXT3264(auVar259);
                    auVar337._0_4_ = auVar259._0_4_ * auVar336._0_4_;
                    auVar337._4_4_ = auVar259._4_4_ * auVar336._4_4_;
                    auVar337._8_4_ = auVar259._8_4_ * auVar336._8_4_;
                    auVar337._12_4_ = auVar259._12_4_ * auVar336._12_4_;
                    auVar337._16_4_ = auVar259._16_4_ * auVar336._16_4_;
                    auVar337._20_4_ = auVar259._20_4_ * auVar336._20_4_;
                    auVar337._24_4_ = auVar259._24_4_ * auVar336._24_4_;
                    auVar259 = auVar337._0_32_;
                    break;
                  case 6:
                    uVar12 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                    auVar262._4_4_ = uVar12;
                    auVar262._0_4_ = uVar12;
                    auVar262._8_4_ = uVar12;
                    auVar262._12_4_ = uVar12;
                    auVar262._16_4_ = uVar12;
                    auVar262._20_4_ = uVar12;
                    auVar262._24_4_ = uVar12;
                    auVar262._28_4_ = uVar12;
                    uVar12 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var168))[1];
                    auVar261._4_4_ = uVar12;
                    auVar261._0_4_ = uVar12;
                    auVar261._8_4_ = uVar12;
                    auVar261._12_4_ = uVar12;
                    auVar261._16_4_ = uVar12;
                    auVar261._20_4_ = uVar12;
                    auVar261._24_4_ = uVar12;
                    auVar261._28_4_ = uVar12;
                    auVar259 = vfmadd213ps_avx512vl(auVar262,auVar259,auVar261);
                    auVar259 = vmaxps_avx(auVar259,auVar260);
                    auVar259 = vminps_avx(auVar259,auVar283);
                    auVar338._0_4_ = auVar259._0_4_ * auVar336._0_4_;
                    auVar338._4_4_ = auVar259._4_4_ * auVar336._4_4_;
                    auVar338._8_4_ = auVar259._8_4_ * auVar336._8_4_;
                    auVar338._12_4_ = auVar259._12_4_ * auVar336._12_4_;
                    auVar338._16_4_ = auVar259._16_4_ * auVar336._16_4_;
                    auVar338._20_4_ = auVar259._20_4_ * auVar336._20_4_;
                    auVar338._24_4_ = auVar259._24_4_ * auVar336._24_4_;
                    auVar338._28_36_ = auVar337._28_36_;
                    auVar259 = auVar338._0_32_;
                  }
                }
                *(undefined1 (*) [32])pAVar188 = auVar259;
                pAVar188 = pAVar188 + 4;
                uVar174 = uVar174 + 1;
                iVar162 = iVar162 + 1;
              } while (uVar174 != local_228.w);
            }
            iVar161 = iVar161 + 1;
          } while (iVar161 != local_228.h);
        }
        local_300 = (_func_int **)((long)local_300 + 1);
      } while (local_300 != (_func_int **)(long)local_228.c);
    }
    afVar158 = _ps512_cephes_log_p8;
    afVar157 = _ps512_cephes_log_p7;
    afVar156 = _ps512_cephes_log_p6;
    afVar155 = _ps512_cephes_log_p5;
    afVar154 = _ps512_cephes_log_p4;
    afVar153 = _ps512_cephes_log_p3;
    afVar152 = _ps512_cephes_log_p2;
    afVar151 = _ps512_cephes_exp_p5;
    afVar150 = _ps512_cephes_exp_p4;
    afVar149 = _ps512_cephes_exp_p3;
    afVar148 = _ps512_cephes_exp_p2;
    afVar147 = _ps512_cephes_exp_p1;
    afVar146 = _ps512_cephes_exp_p0;
    afVar145 = _ps512_cephes_LOG2EF;
    afVar144 = _ps512_exp_lo;
    afVar143 = _ps512_exp_hi;
    afVar142 = _ps512_1;
    if ((uVar176 == 4) && (uVar190 == 0x10)) {
      if ((long)local_228.c < 1) goto LAB_0027f987;
      p_Var168 = pp_Var13[-3];
      iVar10 = *(int *)(&this->field_0xdc + (long)p_Var168);
      iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var168);
      iVar175 = *(int *)(&this->field_0xe4 + (long)p_Var168);
      iVar172 = *(int *)(&this->field_0xe8 + (long)p_Var168);
      uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var168);
      lVar192 = *(long *)(&this->field_0x1a8 + (long)p_Var168);
      uVar160 = *(uint *)(&this->field_0xd4 + (long)p_Var168);
      uVar169 = *(uint *)(&this->field_0xd8 + (long)p_Var168);
      auVar336 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar337 = vxorps_avx512dq(auVar336,(undefined1  [64])_ps512_cephes_log_q2);
      in_ZMM9 = vxorps_avx512dq(auVar336,(undefined1  [64])_ps512_cephes_log_q1);
      auVar338 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      auVar339 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar336);
      iVar180 = (1 - uVar160) * iVar10;
      local_168._0_4_ = iVar180;
      local_300 = (_func_int **)0x0;
      auVar203 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
      in_ZMM29 = ZEXT1664(auVar203);
      auVar340 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar341 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      do {
        local_1a8._0_4_ = local_228.h;
        if (0 < local_228.h) {
          iVar189 = bottom_blob->w;
          iVar195 = bottom_blob->h;
          pAVar188 = (Allocator *)
                     ((long)(_func_int ***)local_228.data +
                     local_228.cstep * (long)local_300 * local_228.elemsize);
          uVar170 = bottom_blob->c;
          iVar194 = 0;
          do {
            if (0 < local_228.w) {
              uVar174 = 0;
              iVar161 = iVar180;
              do {
                if (lVar192 == 0) {
                  auVar309 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar309 = *(undefined1 (*) [64])(lVar192 + (long)local_300 * 0x40);
                }
                if (0 < (int)uVar170) {
                  pvVar196 = (void *)((this->weight_data_tm).cstep * (long)local_300 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar183 = bottom_blob->data;
                  uVar171 = 0;
                  do {
                    if (0 < (int)uVar169) {
                      uVar186 = 0;
                      uVar181 = 0;
                      do {
                        iVar162 = (((int)uVar181 - uVar169) + 1) * iVar11 + iVar194;
                        if ((((-1 < iVar162) &&
                             (iVar163 = iVar162 / iVar172, iVar162 % iVar172 == 0)) &&
                            (0 < (int)uVar160)) && (iVar163 < iVar195)) {
                          lVar187 = (long)iVar163 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar171;
                          uVar185 = (ulong)uVar160;
                          uVar191 = uVar186;
                          iVar162 = iVar161;
                          do {
                            if (((-1 < iVar162) &&
                                (iVar163 = iVar162 / iVar175, iVar162 % iVar175 == 0)) &&
                               (iVar163 < iVar189)) {
                              lVar166 = (long)(iVar163 << 2);
                              auVar310 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187)));
                              auVar311 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 4)));
                              in_ZMM16 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 8)));
                              in_ZMM17 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0xc)));
                              uVar201 = uVar191 & 0xffffffff;
                              auVar309 = vfmadd231ps_avx512f(auVar309,auVar310,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4));
                              auVar309 = vfmadd231ps_avx512f(auVar309,auVar311,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0x40))
                              ;
                              auVar309 = vfmadd231ps_avx512f(auVar309,in_ZMM16,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0x80))
                              ;
                              auVar309 = vfmadd231ps_avx512f(auVar309,in_ZMM17,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 + uVar201 * 4 + 0xc0))
                              ;
                            }
                            uVar191 = uVar191 + 0x40;
                            iVar162 = iVar162 + iVar10;
                            uVar185 = uVar185 - 1;
                          } while (uVar185 != 0);
                        }
                        uVar181 = uVar181 + 1;
                        uVar186 = uVar186 + (ulong)uVar160 * 0x40;
                      } while (uVar181 != uVar169);
                    }
                    pvVar196 = (void *)((long)pvVar196 + (long)(int)(uVar160 * uVar169 * 0x40) * 4);
                    uVar171 = uVar171 + 1;
                  } while (uVar171 != uVar170);
                }
                switch(uVar12) {
                case 1:
                  auVar309 = vmaxps_avx512f(auVar309,in_ZMM29);
                  break;
                case 2:
                  uVar171 = vcmpps_avx512f(auVar309,in_ZMM29,1);
                  uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                  auVar127._4_4_ = uVar4;
                  auVar127._0_4_ = uVar4;
                  auVar127._8_4_ = uVar4;
                  auVar127._12_4_ = uVar4;
                  auVar127._16_4_ = uVar4;
                  auVar127._20_4_ = uVar4;
                  auVar127._24_4_ = uVar4;
                  auVar127._28_4_ = uVar4;
                  auVar127._32_4_ = uVar4;
                  auVar127._36_4_ = uVar4;
                  auVar127._40_4_ = uVar4;
                  auVar127._44_4_ = uVar4;
                  auVar127._48_4_ = uVar4;
                  auVar127._52_4_ = uVar4;
                  auVar127._56_4_ = uVar4;
                  auVar127._60_4_ = uVar4;
                  auVar310 = vmulps_avx512f(auVar309,auVar127);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  auVar329._0_4_ = (uint)bVar199 * auVar310._0_4_ | (uint)!bVar199 * auVar309._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  auVar329._4_4_ = (uint)bVar199 * auVar310._4_4_ | (uint)!bVar199 * auVar309._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  auVar329._8_4_ = (uint)bVar199 * auVar310._8_4_ | (uint)!bVar199 * auVar309._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  auVar329._12_4_ =
                       (uint)bVar199 * auVar310._12_4_ | (uint)!bVar199 * auVar309._12_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                  auVar329._16_4_ =
                       (uint)bVar199 * auVar310._16_4_ | (uint)!bVar199 * auVar309._16_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                  auVar329._20_4_ =
                       (uint)bVar199 * auVar310._20_4_ | (uint)!bVar199 * auVar309._20_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                  auVar329._24_4_ =
                       (uint)bVar199 * auVar310._24_4_ | (uint)!bVar199 * auVar309._24_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 7) & 1);
                  auVar329._28_4_ =
                       (uint)bVar199 * auVar310._28_4_ | (uint)!bVar199 * auVar309._28_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 8) & 1);
                  auVar329._32_4_ =
                       (uint)bVar199 * auVar310._32_4_ | (uint)!bVar199 * auVar309._32_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 9) & 1);
                  auVar329._36_4_ =
                       (uint)bVar199 * auVar310._36_4_ | (uint)!bVar199 * auVar309._36_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 10) & 1);
                  auVar329._40_4_ =
                       (uint)bVar199 * auVar310._40_4_ | (uint)!bVar199 * auVar309._40_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xb) & 1);
                  auVar329._44_4_ =
                       (uint)bVar199 * auVar310._44_4_ | (uint)!bVar199 * auVar309._44_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xc) & 1);
                  auVar329._48_4_ =
                       (uint)bVar199 * auVar310._48_4_ | (uint)!bVar199 * auVar309._48_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xd) & 1);
                  auVar329._52_4_ =
                       (uint)bVar199 * auVar310._52_4_ | (uint)!bVar199 * auVar309._52_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xe) & 1);
                  auVar329._56_4_ =
                       (uint)bVar199 * auVar310._56_4_ | (uint)!bVar199 * auVar309._56_4_;
                  bVar199 = SUB81(uVar171 >> 0xf,0);
                  auVar329._60_4_ =
                       (uint)bVar199 * auVar310._60_4_ | (uint)!bVar199 * auVar309._60_4_;
                  auVar309 = auVar329;
                  break;
                case 3:
                  uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                  auVar125._4_4_ = uVar4;
                  auVar125._0_4_ = uVar4;
                  auVar125._8_4_ = uVar4;
                  auVar125._12_4_ = uVar4;
                  auVar125._16_4_ = uVar4;
                  auVar125._20_4_ = uVar4;
                  auVar125._24_4_ = uVar4;
                  auVar125._28_4_ = uVar4;
                  auVar125._32_4_ = uVar4;
                  auVar125._36_4_ = uVar4;
                  auVar125._40_4_ = uVar4;
                  auVar125._44_4_ = uVar4;
                  auVar125._48_4_ = uVar4;
                  auVar125._52_4_ = uVar4;
                  auVar125._56_4_ = uVar4;
                  auVar125._60_4_ = uVar4;
                  auVar309 = vmaxps_avx512f(auVar309,auVar125);
                  uVar4 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var168))[1];
                  auVar126._4_4_ = uVar4;
                  auVar126._0_4_ = uVar4;
                  auVar126._8_4_ = uVar4;
                  auVar126._12_4_ = uVar4;
                  auVar126._16_4_ = uVar4;
                  auVar126._20_4_ = uVar4;
                  auVar126._24_4_ = uVar4;
                  auVar126._28_4_ = uVar4;
                  auVar126._32_4_ = uVar4;
                  auVar126._36_4_ = uVar4;
                  auVar126._40_4_ = uVar4;
                  auVar126._44_4_ = uVar4;
                  auVar126._48_4_ = uVar4;
                  auVar126._52_4_ = uVar4;
                  auVar126._56_4_ = uVar4;
                  auVar126._60_4_ = uVar4;
                  auVar309 = vminps_avx512f(auVar309,auVar126);
                  break;
                case 4:
                  auVar309 = vxorps_avx512dq(auVar309,auVar336);
                  auVar309 = vminps_avx512f(auVar309,(undefined1  [64])afVar143);
                  auVar309 = vmaxps_avx512f(auVar309,(undefined1  [64])afVar144);
                  auVar310 = vfmadd213ps_avx512f((undefined1  [64])afVar145,auVar309,
                                                 (undefined1  [64])afVar151);
                  auVar311 = vrndscaleps_avx512f(auVar310,1);
                  uVar171 = vcmpps_avx512f(auVar310,auVar311,1);
                  auVar310 = vsubps_avx512f(auVar311,(undefined1  [64])afVar142);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  auVar328._0_4_ = (uint)bVar199 * auVar310._0_4_ | (uint)!bVar199 * auVar311._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  auVar328._4_4_ = (uint)bVar199 * auVar310._4_4_ | (uint)!bVar199 * auVar311._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  auVar328._8_4_ = (uint)bVar199 * auVar310._8_4_ | (uint)!bVar199 * auVar311._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  auVar328._12_4_ =
                       (uint)bVar199 * auVar310._12_4_ | (uint)!bVar199 * auVar311._12_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                  auVar328._16_4_ =
                       (uint)bVar199 * auVar310._16_4_ | (uint)!bVar199 * auVar311._16_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                  auVar328._20_4_ =
                       (uint)bVar199 * auVar310._20_4_ | (uint)!bVar199 * auVar311._20_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                  auVar328._24_4_ =
                       (uint)bVar199 * auVar310._24_4_ | (uint)!bVar199 * auVar311._24_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 7) & 1);
                  auVar328._28_4_ =
                       (uint)bVar199 * auVar310._28_4_ | (uint)!bVar199 * auVar311._28_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 8) & 1);
                  auVar328._32_4_ =
                       (uint)bVar199 * auVar310._32_4_ | (uint)!bVar199 * auVar311._32_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 9) & 1);
                  auVar328._36_4_ =
                       (uint)bVar199 * auVar310._36_4_ | (uint)!bVar199 * auVar311._36_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 10) & 1);
                  auVar328._40_4_ =
                       (uint)bVar199 * auVar310._40_4_ | (uint)!bVar199 * auVar311._40_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xb) & 1);
                  auVar328._44_4_ =
                       (uint)bVar199 * auVar310._44_4_ | (uint)!bVar199 * auVar311._44_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xc) & 1);
                  auVar328._48_4_ =
                       (uint)bVar199 * auVar310._48_4_ | (uint)!bVar199 * auVar311._48_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xd) & 1);
                  auVar328._52_4_ =
                       (uint)bVar199 * auVar310._52_4_ | (uint)!bVar199 * auVar311._52_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xe) & 1);
                  auVar328._56_4_ =
                       (uint)bVar199 * auVar310._56_4_ | (uint)!bVar199 * auVar311._56_4_;
                  bVar199 = SUB81(uVar171 >> 0xf,0);
                  auVar328._60_4_ =
                       (uint)bVar199 * auVar310._60_4_ | (uint)!bVar199 * auVar311._60_4_;
                  auVar309 = vfmadd231ps_avx512f(auVar309,auVar328,auVar337);
                  in_ZMM16 = vfmadd231ps_avx512f(auVar309,auVar328,in_ZMM9);
                  auVar309 = vmulps_avx512f(in_ZMM16,in_ZMM16);
                  auVar310 = vfmadd213ps_avx512f(in_ZMM16,(undefined1  [64])afVar146,
                                                 (undefined1  [64])afVar147);
                  auVar310 = vfmadd213ps_avx512f(auVar310,in_ZMM16,(undefined1  [64])afVar148);
                  auVar310 = vfmadd213ps_avx512f(auVar310,in_ZMM16,(undefined1  [64])afVar149);
                  auVar310 = vfmadd213ps_avx512f(auVar310,in_ZMM16,(undefined1  [64])afVar150);
                  auVar310 = vfmadd213ps_avx512f(auVar310,in_ZMM16,(undefined1  [64])afVar151);
                  auVar309 = vfmadd213ps_avx512f(auVar310,auVar309,in_ZMM16);
                  auVar309 = vaddps_avx512f(auVar309,(undefined1  [64])afVar142);
                  auVar310 = vcvttps2dq_avx512f(auVar328);
                  auVar310 = vpaddd_avx512f(auVar310,auVar338);
                  auVar310 = vpslld_avx512f(auVar310,0x17);
                  auVar309 = vfmadd213ps_avx512f(auVar310,auVar309,auVar340);
                  auVar310 = vrcp14ps_avx512f(auVar309);
                  auVar309 = vfmsub213ps_avx512f(auVar309,auVar310,auVar340);
                  auVar309 = vfnmadd132ps_avx512vl(auVar309,auVar310,auVar310);
                  break;
                case 5:
                  auVar310 = vminps_avx512f(auVar309,(undefined1  [64])afVar143);
                  auVar310 = vmaxps_avx512f(auVar310,(undefined1  [64])afVar144);
                  auVar311 = vfmadd213ps_avx512f((undefined1  [64])afVar145,auVar310,
                                                 (undefined1  [64])afVar151);
                  auVar312 = vrndscaleps_avx512f(auVar311,1);
                  uVar171 = vcmpps_avx512f(auVar311,auVar312,1);
                  auVar311 = vsubps_avx512f(auVar312,(undefined1  [64])afVar142);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  auVar324._0_4_ = (uint)bVar199 * auVar311._0_4_ | (uint)!bVar199 * auVar312._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  auVar324._4_4_ = (uint)bVar199 * auVar311._4_4_ | (uint)!bVar199 * auVar312._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  auVar324._8_4_ = (uint)bVar199 * auVar311._8_4_ | (uint)!bVar199 * auVar312._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  auVar324._12_4_ =
                       (uint)bVar199 * auVar311._12_4_ | (uint)!bVar199 * auVar312._12_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                  auVar324._16_4_ =
                       (uint)bVar199 * auVar311._16_4_ | (uint)!bVar199 * auVar312._16_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                  auVar324._20_4_ =
                       (uint)bVar199 * auVar311._20_4_ | (uint)!bVar199 * auVar312._20_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                  auVar324._24_4_ =
                       (uint)bVar199 * auVar311._24_4_ | (uint)!bVar199 * auVar312._24_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 7) & 1);
                  auVar324._28_4_ =
                       (uint)bVar199 * auVar311._28_4_ | (uint)!bVar199 * auVar312._28_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 8) & 1);
                  auVar324._32_4_ =
                       (uint)bVar199 * auVar311._32_4_ | (uint)!bVar199 * auVar312._32_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 9) & 1);
                  auVar324._36_4_ =
                       (uint)bVar199 * auVar311._36_4_ | (uint)!bVar199 * auVar312._36_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 10) & 1);
                  auVar324._40_4_ =
                       (uint)bVar199 * auVar311._40_4_ | (uint)!bVar199 * auVar312._40_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xb) & 1);
                  auVar324._44_4_ =
                       (uint)bVar199 * auVar311._44_4_ | (uint)!bVar199 * auVar312._44_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xc) & 1);
                  auVar324._48_4_ =
                       (uint)bVar199 * auVar311._48_4_ | (uint)!bVar199 * auVar312._48_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xd) & 1);
                  auVar324._52_4_ =
                       (uint)bVar199 * auVar311._52_4_ | (uint)!bVar199 * auVar312._52_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xe) & 1);
                  auVar324._56_4_ =
                       (uint)bVar199 * auVar311._56_4_ | (uint)!bVar199 * auVar312._56_4_;
                  bVar199 = SUB81(uVar171 >> 0xf,0);
                  auVar324._60_4_ =
                       (uint)bVar199 * auVar311._60_4_ | (uint)!bVar199 * auVar312._60_4_;
                  auVar310 = vfmadd231ps_avx512f(auVar310,auVar324,auVar337);
                  auVar310 = vfmadd231ps_avx512f(auVar310,auVar324,in_ZMM9);
                  auVar311 = vmulps_avx512f(auVar310,auVar310);
                  auVar312 = vfmadd213ps_avx512f(auVar310,(undefined1  [64])afVar146,
                                                 (undefined1  [64])afVar147);
                  auVar312 = vfmadd213ps_avx512f(auVar312,auVar310,(undefined1  [64])afVar148);
                  auVar312 = vfmadd213ps_avx512f(auVar312,auVar310,(undefined1  [64])afVar149);
                  auVar312 = vfmadd213ps_avx512f(auVar312,auVar310,(undefined1  [64])afVar150);
                  auVar312 = vfmadd213ps_avx512f(auVar312,auVar310,(undefined1  [64])afVar151);
                  auVar310 = vfmadd213ps_avx512f(auVar312,auVar311,auVar310);
                  auVar310 = vaddps_avx512f(auVar310,(undefined1  [64])afVar142);
                  auVar311 = vcvttps2dq_avx512f(auVar324);
                  auVar311 = vpaddd_avx512f(auVar311,auVar338);
                  auVar311 = vpslld_avx512f(auVar311,0x17);
                  auVar310 = vfmadd213ps_avx512f(auVar311,auVar310,auVar340);
                  auVar311 = vmaxps_avx512f(auVar310,(undefined1  [64])_ps512_min_norm_pos);
                  auVar312 = vpsrld_avx512f(auVar311,0x17);
                  auVar311 = vpternlogd_avx512f(auVar311,(undefined1  [64])afVar151,
                                                (undefined1  [64])_ps512_inv_mant_mask,0xec);
                  uVar171 = vcmpps_avx512f(auVar311,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                  auVar313 = vsubps_avx512f(auVar311,(undefined1  [64])afVar142);
                  auVar311 = vaddps_avx512f(auVar313,auVar311);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  auVar325._0_4_ = (uint)bVar199 * auVar311._0_4_ | (uint)!bVar199 * auVar313._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  auVar325._4_4_ = (uint)bVar199 * auVar311._4_4_ | (uint)!bVar199 * auVar313._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  auVar325._8_4_ = (uint)bVar199 * auVar311._8_4_ | (uint)!bVar199 * auVar313._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  auVar325._12_4_ =
                       (uint)bVar199 * auVar311._12_4_ | (uint)!bVar199 * auVar313._12_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                  auVar325._16_4_ =
                       (uint)bVar199 * auVar311._16_4_ | (uint)!bVar199 * auVar313._16_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                  auVar325._20_4_ =
                       (uint)bVar199 * auVar311._20_4_ | (uint)!bVar199 * auVar313._20_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                  auVar325._24_4_ =
                       (uint)bVar199 * auVar311._24_4_ | (uint)!bVar199 * auVar313._24_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 7) & 1);
                  auVar325._28_4_ =
                       (uint)bVar199 * auVar311._28_4_ | (uint)!bVar199 * auVar313._28_4_;
                  bVar30 = (byte)(uVar171 >> 8);
                  bVar199 = (bool)(bVar30 & 1);
                  auVar325._32_4_ =
                       (uint)bVar199 * auVar311._32_4_ | (uint)!bVar199 * auVar313._32_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 9) & 1);
                  auVar325._36_4_ =
                       (uint)bVar199 * auVar311._36_4_ | (uint)!bVar199 * auVar313._36_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 10) & 1);
                  auVar325._40_4_ =
                       (uint)bVar199 * auVar311._40_4_ | (uint)!bVar199 * auVar313._40_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xb) & 1);
                  auVar325._44_4_ =
                       (uint)bVar199 * auVar311._44_4_ | (uint)!bVar199 * auVar313._44_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xc) & 1);
                  auVar325._48_4_ =
                       (uint)bVar199 * auVar311._48_4_ | (uint)!bVar199 * auVar313._48_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xd) & 1);
                  auVar325._52_4_ =
                       (uint)bVar199 * auVar311._52_4_ | (uint)!bVar199 * auVar313._52_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xe) & 1);
                  auVar325._56_4_ =
                       (uint)bVar199 * auVar311._56_4_ | (uint)!bVar199 * auVar313._56_4_;
                  bVar199 = SUB81(uVar171 >> 0xf,0);
                  auVar325._60_4_ =
                       (uint)bVar199 * auVar311._60_4_ | (uint)!bVar199 * auVar313._60_4_;
                  auVar311 = vmulps_avx512f(auVar325,auVar325);
                  auVar313 = vfmadd132ps_avx512f(auVar325,(undefined1  [64])_ps512_cephes_log_p1,
                                                 (undefined1  [64])_ps512_cephes_log_p0);
                  auVar313 = vfmadd213ps_avx512f(auVar313,auVar325,(undefined1  [64])afVar152);
                  auVar313 = vfmadd213ps_avx512f(auVar313,auVar325,(undefined1  [64])afVar153);
                  auVar313 = vfmadd213ps_avx512f(auVar313,auVar325,(undefined1  [64])afVar154);
                  auVar313 = vfmadd213ps_avx512f(auVar313,auVar325,(undefined1  [64])afVar155);
                  auVar313 = vfmadd213ps_avx512f(auVar313,auVar325,(undefined1  [64])afVar156);
                  auVar313 = vfmadd213ps_avx512f(auVar313,auVar325,(undefined1  [64])afVar157);
                  auVar313 = vfmadd213ps_avx512f(auVar313,auVar325,(undefined1  [64])afVar158);
                  auVar314 = vmulps_avx512f(auVar311,auVar325);
                  auVar313 = vfmadd213ps_avx512f(auVar314,auVar313,auVar325);
                  uVar186 = vcmpps_avx512f(auVar310,in_ZMM29,2);
                  auVar310 = vpsubd_avx512f(auVar312,auVar338);
                  auVar310 = vcvtdq2ps_avx512f(auVar310);
                  auVar312 = vaddps_avx512f(auVar310,(undefined1  [64])afVar142);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  auVar326._0_4_ = (uint)bVar199 * auVar310._0_4_ | (uint)!bVar199 * auVar312._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  auVar326._4_4_ = (uint)bVar199 * auVar310._4_4_ | (uint)!bVar199 * auVar312._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  auVar326._8_4_ = (uint)bVar199 * auVar310._8_4_ | (uint)!bVar199 * auVar312._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  auVar326._12_4_ =
                       (uint)bVar199 * auVar310._12_4_ | (uint)!bVar199 * auVar312._12_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                  auVar326._16_4_ =
                       (uint)bVar199 * auVar310._16_4_ | (uint)!bVar199 * auVar312._16_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                  auVar326._20_4_ =
                       (uint)bVar199 * auVar310._20_4_ | (uint)!bVar199 * auVar312._20_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                  auVar326._24_4_ =
                       (uint)bVar199 * auVar310._24_4_ | (uint)!bVar199 * auVar312._24_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 7) & 1);
                  auVar326._28_4_ =
                       (uint)bVar199 * auVar310._28_4_ | (uint)!bVar199 * auVar312._28_4_;
                  bVar199 = (bool)(bVar30 & 1);
                  auVar326._32_4_ =
                       (uint)bVar199 * auVar310._32_4_ | (uint)!bVar199 * auVar312._32_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 9) & 1);
                  auVar326._36_4_ =
                       (uint)bVar199 * auVar310._36_4_ | (uint)!bVar199 * auVar312._36_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 10) & 1);
                  auVar326._40_4_ =
                       (uint)bVar199 * auVar310._40_4_ | (uint)!bVar199 * auVar312._40_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xb) & 1);
                  auVar326._44_4_ =
                       (uint)bVar199 * auVar310._44_4_ | (uint)!bVar199 * auVar312._44_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xc) & 1);
                  auVar326._48_4_ =
                       (uint)bVar199 * auVar310._48_4_ | (uint)!bVar199 * auVar312._48_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xd) & 1);
                  auVar326._52_4_ =
                       (uint)bVar199 * auVar310._52_4_ | (uint)!bVar199 * auVar312._52_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xe) & 1);
                  auVar326._56_4_ =
                       (uint)bVar199 * auVar310._56_4_ | (uint)!bVar199 * auVar312._56_4_;
                  bVar199 = SUB81(uVar171 >> 0xf,0);
                  auVar326._60_4_ =
                       (uint)bVar199 * auVar310._60_4_ | (uint)!bVar199 * auVar312._60_4_;
                  auVar310 = vfmadd231ps_avx512f(auVar313,auVar326,
                                                 (undefined1  [64])_ps512_cephes_log_q1);
                  auVar310 = vfmadd231ps_avx512f(auVar310,auVar339,auVar311);
                  auVar310 = vfmadd231ps_avx512f(auVar310,auVar326,
                                                 (undefined1  [64])_ps512_cephes_log_q2);
                  auVar310 = vmulps_avx512f(auVar310,auVar341);
                  auVar311 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                  bVar199 = (bool)((byte)uVar186 & 1);
                  auVar327._0_4_ = (uint)bVar199 * auVar311._0_4_ | (uint)!bVar199 * auVar310._0_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 1) & 1);
                  auVar327._4_4_ = (uint)bVar199 * auVar311._4_4_ | (uint)!bVar199 * auVar310._4_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 2) & 1);
                  auVar327._8_4_ = (uint)bVar199 * auVar311._8_4_ | (uint)!bVar199 * auVar310._8_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 3) & 1);
                  auVar327._12_4_ =
                       (uint)bVar199 * auVar311._12_4_ | (uint)!bVar199 * auVar310._12_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 4) & 1);
                  auVar327._16_4_ =
                       (uint)bVar199 * auVar311._16_4_ | (uint)!bVar199 * auVar310._16_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 5) & 1);
                  auVar327._20_4_ =
                       (uint)bVar199 * auVar311._20_4_ | (uint)!bVar199 * auVar310._20_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 6) & 1);
                  auVar327._24_4_ =
                       (uint)bVar199 * auVar311._24_4_ | (uint)!bVar199 * auVar310._24_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 7) & 1);
                  auVar327._28_4_ =
                       (uint)bVar199 * auVar311._28_4_ | (uint)!bVar199 * auVar310._28_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 8) & 1);
                  auVar327._32_4_ =
                       (uint)bVar199 * auVar311._32_4_ | (uint)!bVar199 * auVar310._32_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 9) & 1);
                  auVar327._36_4_ =
                       (uint)bVar199 * auVar311._36_4_ | (uint)!bVar199 * auVar310._36_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 10) & 1);
                  auVar327._40_4_ =
                       (uint)bVar199 * auVar311._40_4_ | (uint)!bVar199 * auVar310._40_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 0xb) & 1);
                  auVar327._44_4_ =
                       (uint)bVar199 * auVar311._44_4_ | (uint)!bVar199 * auVar310._44_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 0xc) & 1);
                  auVar327._48_4_ =
                       (uint)bVar199 * auVar311._48_4_ | (uint)!bVar199 * auVar310._48_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 0xd) & 1);
                  auVar327._52_4_ =
                       (uint)bVar199 * auVar311._52_4_ | (uint)!bVar199 * auVar310._52_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 0xe) & 1);
                  auVar327._56_4_ =
                       (uint)bVar199 * auVar311._56_4_ | (uint)!bVar199 * auVar310._56_4_;
                  bVar199 = SUB81(uVar186 >> 0xf,0);
                  auVar327._60_4_ =
                       (uint)bVar199 * auVar311._60_4_ | (uint)!bVar199 * auVar310._60_4_;
                  auVar310 = vminps_avx512f(auVar327,(undefined1  [64])afVar143);
                  auVar310 = vmaxps_avx512f(auVar310,(undefined1  [64])afVar144);
                  auVar311 = vfmadd213ps_avx512f((undefined1  [64])afVar145,auVar310,
                                                 (undefined1  [64])afVar151);
                  auVar312 = vrndscaleps_avx512f(auVar311,1);
                  uVar171 = vcmpps_avx512f(auVar311,auVar312,1);
                  auVar311 = vsubps_avx512f(auVar312,(undefined1  [64])afVar142);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  in_ZMM16._0_4_ = (uint)bVar199 * auVar311._0_4_ | (uint)!bVar199 * auVar312._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  in_ZMM16._4_4_ = (uint)bVar199 * auVar311._4_4_ | (uint)!bVar199 * auVar312._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  in_ZMM16._8_4_ = (uint)bVar199 * auVar311._8_4_ | (uint)!bVar199 * auVar312._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  in_ZMM16._12_4_ =
                       (uint)bVar199 * auVar311._12_4_ | (uint)!bVar199 * auVar312._12_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                  in_ZMM16._16_4_ =
                       (uint)bVar199 * auVar311._16_4_ | (uint)!bVar199 * auVar312._16_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                  in_ZMM16._20_4_ =
                       (uint)bVar199 * auVar311._20_4_ | (uint)!bVar199 * auVar312._20_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                  in_ZMM16._24_4_ =
                       (uint)bVar199 * auVar311._24_4_ | (uint)!bVar199 * auVar312._24_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 7) & 1);
                  in_ZMM16._28_4_ =
                       (uint)bVar199 * auVar311._28_4_ | (uint)!bVar199 * auVar312._28_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 8) & 1);
                  in_ZMM16._32_4_ =
                       (uint)bVar199 * auVar311._32_4_ | (uint)!bVar199 * auVar312._32_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 9) & 1);
                  in_ZMM16._36_4_ =
                       (uint)bVar199 * auVar311._36_4_ | (uint)!bVar199 * auVar312._36_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 10) & 1);
                  in_ZMM16._40_4_ =
                       (uint)bVar199 * auVar311._40_4_ | (uint)!bVar199 * auVar312._40_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xb) & 1);
                  in_ZMM16._44_4_ =
                       (uint)bVar199 * auVar311._44_4_ | (uint)!bVar199 * auVar312._44_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xc) & 1);
                  in_ZMM16._48_4_ =
                       (uint)bVar199 * auVar311._48_4_ | (uint)!bVar199 * auVar312._48_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xd) & 1);
                  in_ZMM16._52_4_ =
                       (uint)bVar199 * auVar311._52_4_ | (uint)!bVar199 * auVar312._52_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xe) & 1);
                  in_ZMM16._56_4_ =
                       (uint)bVar199 * auVar311._56_4_ | (uint)!bVar199 * auVar312._56_4_;
                  bVar199 = SUB81(uVar171 >> 0xf,0);
                  in_ZMM16._60_4_ =
                       (uint)bVar199 * auVar311._60_4_ | (uint)!bVar199 * auVar312._60_4_;
                  auVar310 = vfmadd231ps_avx512f(auVar310,in_ZMM16,auVar337);
                  auVar310 = vfmadd231ps_avx512f(auVar310,in_ZMM16,in_ZMM9);
                  auVar311 = vmulps_avx512f(auVar310,auVar310);
                  auVar312 = vfmadd213ps_avx512f(auVar310,(undefined1  [64])afVar146,
                                                 (undefined1  [64])afVar147);
                  auVar312 = vfmadd213ps_avx512f(auVar312,auVar310,(undefined1  [64])afVar148);
                  auVar312 = vfmadd213ps_avx512f(auVar312,auVar310,(undefined1  [64])afVar149);
                  auVar312 = vfmadd213ps_avx512f(auVar312,auVar310,(undefined1  [64])afVar150);
                  auVar312 = vfmadd213ps_avx512f(auVar312,auVar310,(undefined1  [64])afVar151);
                  in_ZMM17 = vfmadd213ps_avx512f(auVar312,auVar311,auVar310);
                  auVar310 = vaddps_avx512f(in_ZMM17,(undefined1  [64])afVar142);
                  auVar311 = vcvttps2dq_avx512f(in_ZMM16);
                  auVar311 = vpaddd_avx512f(auVar311,auVar338);
                  auVar311 = vpslld_avx512f(auVar311,0x17);
                  auVar310 = vfmadd213ps_avx512f(auVar311,auVar310,auVar340);
                  auVar311 = vrcp14ps_avx512f(auVar310);
                  auVar310 = vfmsub213ps_avx512f(auVar310,auVar311,auVar340);
                  auVar310 = vfnmadd132ps_avx512vl(auVar310,auVar311,auVar311);
                  auVar310 = vfnmsub213ps_avx512f(auVar310,auVar341,auVar340);
                  auVar309 = vmulps_avx512f(auVar310,auVar309);
                  break;
                case 6:
                  auVar310 = vbroadcastss_avx512f
                                       (ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var168)));
                  uVar3 = (*(uint **)(&this->field_0x118 + (long)p_Var168))[1];
                  auVar124._4_4_ = uVar3;
                  auVar124._0_4_ = uVar3;
                  auVar124._8_4_ = uVar3;
                  auVar124._12_4_ = uVar3;
                  auVar124._16_4_ = uVar3;
                  auVar124._20_4_ = uVar3;
                  auVar124._24_4_ = uVar3;
                  auVar124._28_4_ = uVar3;
                  auVar124._32_4_ = uVar3;
                  auVar124._36_4_ = uVar3;
                  auVar124._40_4_ = uVar3;
                  auVar124._44_4_ = uVar3;
                  auVar124._48_4_ = uVar3;
                  auVar124._52_4_ = uVar3;
                  auVar124._56_4_ = uVar3;
                  auVar124._60_4_ = uVar3;
                  auVar310 = vfmadd213ps_avx512f(auVar310,auVar309,auVar124);
                  auVar310 = vmaxps_avx512f(auVar310,in_ZMM29);
                  auVar310 = vminps_avx512f(auVar310,auVar340);
                  auVar309 = vmulps_avx512f(auVar310,auVar309);
                }
                *(undefined1 (*) [64])pAVar188 = auVar309;
                pAVar188 = pAVar188 + 8;
                uVar174 = uVar174 + 1;
                iVar161 = iVar161 + 1;
              } while (uVar174 != local_228.w);
            }
            iVar194 = iVar194 + 1;
          } while (iVar194 != local_228.h);
        }
        local_300 = (_func_int **)((long)local_300 + 1);
      } while (local_300 != (_func_int **)(long)local_228.c);
    }
    auVar203 = in_ZMM29._0_16_;
    if ((uVar176 == 0x10) && (uVar190 == 4)) {
      if ((long)local_228.c < 1) goto LAB_0027f987;
      p_Var168 = pp_Var13[-3];
      iVar10 = *(int *)(&this->field_0xdc + (long)p_Var168);
      iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var168);
      iVar175 = *(int *)(&this->field_0xe4 + (long)p_Var168);
      iVar172 = *(int *)(&this->field_0xe8 + (long)p_Var168);
      uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var168);
      lVar192 = *(long *)(&this->field_0x1a8 + (long)p_Var168);
      uVar160 = *(uint *)(&this->field_0xd4 + (long)p_Var168);
      uVar169 = *(uint *)(&this->field_0xd8 + (long)p_Var168);
      iVar180 = (1 - uVar160) * iVar10;
      local_168._0_4_ = iVar180;
      local_300 = (_func_int **)0x0;
      auVar226 = ZEXT816(0) << 0x40;
      auVar227._8_4_ = 0x42b0c0a5;
      auVar227._0_8_ = 0x42b0c0a542b0c0a5;
      auVar227._12_4_ = 0x42b0c0a5;
      auVar228._8_4_ = 0xc2b0c0a5;
      auVar228._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar228._12_4_ = 0xc2b0c0a5;
      auVar229._8_4_ = 0x3f000000;
      auVar229._0_8_ = 0x3f0000003f000000;
      auVar229._12_4_ = 0x3f000000;
      auVar230._8_4_ = 0x3fb8aa3b;
      auVar230._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar230._12_4_ = 0x3fb8aa3b;
      auVar231._8_4_ = 0x3f800000;
      auVar231._0_8_ = 0x3f8000003f800000;
      auVar231._12_4_ = 0x3f800000;
      auVar232._8_4_ = 0x3f318000;
      auVar232._0_8_ = 0x3f3180003f318000;
      auVar232._12_4_ = 0x3f318000;
      auVar204 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar244._8_4_ = 0x3ab743ce;
      auVar244._0_8_ = 0x3ab743ce3ab743ce;
      auVar244._12_4_ = 0x3ab743ce;
      auVar237._8_4_ = 0x3c088908;
      auVar237._0_8_ = 0x3c0889083c088908;
      auVar237._12_4_ = 0x3c088908;
      auVar233._8_4_ = 0x3d2aa9c1;
      auVar233._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar233._12_4_ = 0x3d2aa9c1;
      auVar234._8_4_ = 0x3e2aaaaa;
      auVar234._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar234._12_4_ = 0x3e2aaaaa;
      auVar235._8_4_ = 0x3f800000;
      auVar235._0_8_ = 0x3f8000003f800000;
      auVar235._12_4_ = 0x3f800000;
      auVar236._8_4_ = 0xb95e8083;
      auVar236._0_8_ = 0xb95e8083b95e8083;
      auVar236._12_4_ = 0xb95e8083;
      auVar205 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      do {
        local_1a8._0_4_ = local_228.h;
        if (0 < local_228.h) {
          iVar189 = bottom_blob->w;
          iVar195 = bottom_blob->h;
          pAVar188 = (Allocator *)
                     ((long)(_func_int ***)local_228.data +
                     local_228.cstep * (long)local_300 * local_228.elemsize);
          uVar170 = bottom_blob->c;
          iVar194 = 0;
          do {
            if (0 < local_228.w) {
              uVar174 = 0;
              iVar161 = iVar180;
              do {
                if (lVar192 == 0) {
                  auVar203 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar203 = *(undefined1 (*) [16])(lVar192 + (long)local_300 * 0x10);
                }
                auVar336 = ZEXT1664(auVar203);
                if (0 < (int)uVar170) {
                  pvVar196 = (void *)((this->weight_data_tm).cstep * (long)local_300 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar183 = bottom_blob->data;
                  uVar171 = 0;
                  do {
                    if (0 < (int)uVar169) {
                      uVar186 = 0;
                      uVar181 = 0;
                      do {
                        iVar162 = (((int)uVar181 - uVar169) + 1) * iVar11 + iVar194;
                        if ((((-1 < iVar162) &&
                             (iVar163 = iVar162 / iVar172, iVar162 % iVar172 == 0)) &&
                            (0 < (int)uVar160)) && (iVar163 < iVar195)) {
                          lVar187 = (long)iVar163 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar171;
                          uVar185 = (ulong)uVar160;
                          uVar191 = uVar186;
                          iVar162 = iVar161;
                          do {
                            if (((-1 < iVar162) &&
                                (iVar163 = iVar162 / iVar175, iVar162 % iVar175 == 0)) &&
                               (iVar163 < iVar189)) {
                              lVar166 = (long)(iVar163 << 4);
                              uVar4 = *(undefined4 *)((long)pvVar183 + lVar166 * 4 + lVar187);
                              auVar203._4_4_ = uVar4;
                              auVar203._0_4_ = uVar4;
                              auVar203._8_4_ = uVar4;
                              auVar203._12_4_ = uVar4;
                              uVar4 = *(undefined4 *)((long)pvVar183 + lVar166 * 4 + lVar187 + 4);
                              auVar462._4_4_ = uVar4;
                              auVar462._0_4_ = uVar4;
                              auVar462._8_4_ = uVar4;
                              auVar462._12_4_ = uVar4;
                              in_ZMM9 = ZEXT1664(auVar462);
                              auVar206 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 8)));
                              in_ZMM16 = ZEXT1664(auVar206);
                              auVar207 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0xc)));
                              in_ZMM17 = ZEXT1664(auVar207);
                              auVar208 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x10)))
                              ;
                              auVar209 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x14)))
                              ;
                              auVar210 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x18)))
                              ;
                              auVar211 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x1c)))
                              ;
                              auVar212 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x20)))
                              ;
                              auVar213 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x24)))
                              ;
                              auVar214 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x28)))
                              ;
                              auVar215 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x2c)))
                              ;
                              auVar216 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x30)))
                              ;
                              auVar217 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x34)))
                              ;
                              auVar218 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x38)))
                              ;
                              in_ZMM29 = ZEXT1664(auVar218);
                              auVar219 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar183 +
                                                                     lVar166 * 4 + lVar187 + 0x3c)))
                              ;
                              uVar201 = uVar191 & 0xffffffff;
                              auVar203 = vfmadd231ps_fma(auVar336._0_16_,auVar203,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar196 + uVar201 * 4));
                              auVar203 = vfmadd231ps_fma(auVar203,auVar462,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar196 + uVar201 * 4 + 0x10));
                              auVar203 = vfmadd231ps_avx512vl
                                                   (auVar203,auVar206,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar196 + uVar201 * 4 + 0x20));
                              auVar203 = vfmadd231ps_avx512vl
                                                   (auVar203,auVar207,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar196 + uVar201 * 4 + 0x30));
                              auVar203 = vfmadd231ps_avx512vl
                                                   (auVar203,auVar208,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar196 + uVar201 * 4 + 0x40));
                              auVar203 = vfmadd231ps_avx512vl
                                                   (auVar203,auVar209,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar196 + uVar201 * 4 + 0x50));
                              auVar203 = vfmadd231ps_avx512vl
                                                   (auVar203,auVar210,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar196 + uVar201 * 4 + 0x60));
                              auVar203 = vfmadd231ps_avx512vl
                                                   (auVar203,auVar211,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar196 + uVar201 * 4 + 0x70));
                              auVar203 = vfmadd231ps_avx512vl
                                                   (auVar203,auVar212,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar196 + uVar201 * 4 + 0x80));
                              auVar203 = vfmadd231ps_avx512vl
                                                   (auVar203,auVar213,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar196 + uVar201 * 4 + 0x90));
                              auVar203 = vfmadd231ps_avx512vl
                                                   (auVar203,auVar214,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar196 + uVar201 * 4 + 0xa0));
                              auVar203 = vfmadd231ps_avx512vl
                                                   (auVar203,auVar215,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar196 + uVar201 * 4 + 0xb0));
                              auVar203 = vfmadd231ps_avx512vl
                                                   (auVar203,auVar216,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar196 + uVar201 * 4 + 0xc0));
                              auVar203 = vfmadd231ps_avx512vl
                                                   (auVar203,auVar217,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar196 + uVar201 * 4 + 0xd0));
                              auVar203 = vfmadd231ps_avx512vl
                                                   (auVar203,auVar218,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar196 + uVar201 * 4 + 0xe0));
                              auVar203 = vfmadd231ps_avx512vl
                                                   (auVar203,auVar219,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar196 + uVar201 * 4 + 0xf0));
                              auVar336 = ZEXT1664(auVar203);
                            }
                            uVar191 = uVar191 + 0x40;
                            iVar162 = iVar162 + iVar10;
                            uVar185 = uVar185 - 1;
                          } while (uVar185 != 0);
                        }
                        uVar181 = uVar181 + 1;
                        uVar186 = uVar186 + (ulong)uVar160 * 0x40;
                      } while (uVar181 != uVar169);
                    }
                    auVar203 = auVar336._0_16_;
                    pvVar196 = (void *)((long)pvVar196 + (long)(int)(uVar160 * uVar169 * 0x40) * 4);
                    uVar171 = uVar171 + 1;
                  } while (uVar171 != uVar170);
                }
                switch(uVar12) {
                case 1:
                  auVar203 = vmaxps_avx(auVar203,auVar226);
                  break;
                case 2:
                  auVar206 = vmaxps_avx(auVar203,auVar226);
                  auVar203 = vminps_avx(auVar203,auVar226);
                  uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                  auVar48._4_4_ = uVar4;
                  auVar48._0_4_ = uVar4;
                  auVar48._8_4_ = uVar4;
                  auVar48._12_4_ = uVar4;
                  auVar203 = vfmadd132ps_avx512vl(auVar203,auVar206,auVar48);
                  break;
                case 3:
                  uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                  auVar46._4_4_ = uVar4;
                  auVar46._0_4_ = uVar4;
                  auVar46._8_4_ = uVar4;
                  auVar46._12_4_ = uVar4;
                  auVar203 = vmaxps_avx512vl(auVar203,auVar46);
                  uVar4 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var168))[1];
                  auVar47._4_4_ = uVar4;
                  auVar47._0_4_ = uVar4;
                  auVar47._8_4_ = uVar4;
                  auVar47._12_4_ = uVar4;
                  auVar203 = vminps_avx512vl(auVar203,auVar47);
                  break;
                case 4:
                  auVar44._8_4_ = 0x80000000;
                  auVar44._0_8_ = 0x8000000080000000;
                  auVar44._12_4_ = 0x80000000;
                  auVar203 = vxorps_avx512vl(auVar203,auVar44);
                  auVar203 = vminps_avx(auVar203,auVar227);
                  auVar203 = vmaxps_avx(auVar203,auVar228);
                  auVar206 = vfmadd231ps_fma(auVar229,auVar203,auVar230);
                  auVar207 = vcvttps2dq_avx512vl(auVar206);
                  auVar207 = vcvtdq2ps_avx512vl(auVar207);
                  uVar171 = vcmpps_avx512vl(auVar206,auVar207,1);
                  auVar206 = vsubps_avx512vl(auVar207,auVar231);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  auVar225._0_4_ = (uint)bVar199 * auVar206._0_4_ | (uint)!bVar199 * auVar207._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  auVar225._4_4_ = (uint)bVar199 * auVar206._4_4_ | (uint)!bVar199 * auVar207._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  auVar225._8_4_ = (uint)bVar199 * auVar206._8_4_ | (uint)!bVar199 * auVar207._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  auVar225._12_4_ =
                       (uint)bVar199 * auVar206._12_4_ | (uint)!bVar199 * auVar207._12_4_;
                  in_ZMM16 = ZEXT1664(auVar225);
                  auVar203 = vfmsub231ps_avx512vl(auVar203,auVar225,auVar232);
                  auVar45._8_4_ = 0x395e8083;
                  auVar45._0_8_ = 0x395e8083395e8083;
                  auVar45._12_4_ = 0x395e8083;
                  auVar206 = vfmsub231ps_avx512vl(auVar203,auVar225,auVar45);
                  auVar434._0_4_ = auVar206._0_4_ * auVar206._0_4_;
                  auVar434._4_4_ = auVar206._4_4_ * auVar206._4_4_;
                  auVar434._8_4_ = auVar206._8_4_ * auVar206._8_4_;
                  auVar434._12_4_ = auVar206._12_4_ * auVar206._12_4_;
                  auVar203 = vfmadd213ps_fma(auVar204,auVar206,auVar244);
                  auVar203 = vfmadd213ps_fma(auVar203,auVar206,auVar237);
                  auVar203 = vfmadd213ps_fma(auVar203,auVar206,auVar233);
                  auVar203 = vfmadd213ps_fma(auVar203,auVar206,auVar234);
                  auVar203 = vfmadd213ps_fma(auVar203,auVar206,auVar229);
                  auVar203 = vfmadd213ps_fma(auVar203,auVar434,auVar206);
                  in_ZMM9 = ZEXT1664(auVar203);
                  auVar435._0_4_ = auVar203._0_4_ + 1.0;
                  auVar435._4_4_ = auVar203._4_4_ + 1.0;
                  auVar435._8_4_ = auVar203._8_4_ + 1.0;
                  auVar435._12_4_ = auVar203._12_4_ + 1.0;
                  auVar203 = vcvttps2dq_avx512vl(auVar225);
                  auVar203 = vpslld_avx(auVar203,0x17);
                  auVar203 = vpaddd_avx(auVar235,auVar203);
                  auVar206 = vfmadd213ps_fma(auVar203,auVar435,auVar231);
                  auVar203 = vrcpps_avx(auVar206);
                  auVar206 = vfmsub213ps_fma(auVar206,auVar203,auVar231);
                  auVar203 = vfnmadd132ps_fma(auVar206,auVar203,auVar203);
                  break;
                case 5:
                  auVar206 = vminps_avx(auVar203,auVar227);
                  auVar206 = vmaxps_avx(auVar206,auVar228);
                  auVar207 = vfmadd213ps_fma(auVar230,auVar206,auVar229);
                  auVar208 = vcvttps2dq_avx512vl(auVar207);
                  auVar208 = vcvtdq2ps_avx512vl(auVar208);
                  uVar171 = vcmpps_avx512vl(auVar207,auVar208,1);
                  auVar207 = vsubps_avx512vl(auVar208,auVar231);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  auVar220._0_4_ = (uint)bVar199 * auVar207._0_4_ | (uint)!bVar199 * auVar208._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  auVar220._4_4_ = (uint)bVar199 * auVar207._4_4_ | (uint)!bVar199 * auVar208._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  auVar220._8_4_ = (uint)bVar199 * auVar207._8_4_ | (uint)!bVar199 * auVar208._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  auVar220._12_4_ =
                       (uint)bVar199 * auVar207._12_4_ | (uint)!bVar199 * auVar208._12_4_;
                  auVar206 = vfmsub231ps_avx512vl(auVar206,auVar220,auVar232);
                  auVar206 = vfnmsub231ps_avx512vl(auVar206,auVar220,auVar236);
                  auVar463._0_4_ = auVar206._0_4_ * auVar206._0_4_;
                  auVar463._4_4_ = auVar206._4_4_ * auVar206._4_4_;
                  auVar463._8_4_ = auVar206._8_4_ * auVar206._8_4_;
                  auVar463._12_4_ = auVar206._12_4_ * auVar206._12_4_;
                  auVar207 = vfmadd213ps_avx512vl(auVar204,auVar206,auVar244);
                  auVar207 = vfmadd213ps_avx512vl(auVar207,auVar206,auVar237);
                  auVar207 = vfmadd213ps_avx512vl(auVar207,auVar206,auVar233);
                  auVar207 = vfmadd213ps_avx512vl(auVar207,auVar206,auVar234);
                  auVar207 = vfmadd213ps_avx512vl(auVar207,auVar206,auVar229);
                  auVar206 = vfmadd213ps_avx512vl(auVar207,auVar463,auVar206);
                  auVar207 = vaddps_avx512vl(auVar206,auVar231);
                  auVar206 = vcvttps2dq_avx512vl(auVar220);
                  auVar206 = vpslld_avx(auVar206,0x17);
                  auVar206 = vpaddd_avx(auVar206,auVar235);
                  auVar206 = vfmadd213ps_fma(auVar206,auVar207,auVar231);
                  uVar171 = vcmpps_avx512vl(auVar206,auVar226,2);
                  auVar209._8_4_ = 0x800000;
                  auVar209._0_8_ = 0x80000000800000;
                  auVar209._12_4_ = 0x800000;
                  auVar206 = vmaxps_avx512vl(auVar206,auVar209);
                  auVar209 = vpsrld_avx(auVar206,0x17);
                  auVar207 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar210._8_4_ = 0x3f000000;
                  auVar210._0_8_ = 0x3f0000003f000000;
                  auVar210._12_4_ = 0x3f000000;
                  auVar206 = vpternlogd_avx512vl(auVar206,auVar207,auVar210,0xea);
                  auVar211._8_4_ = 0x3f3504f3;
                  auVar211._0_8_ = 0x3f3504f33f3504f3;
                  auVar211._12_4_ = 0x3f3504f3;
                  uVar186 = vcmpps_avx512vl(auVar206,auVar211,1);
                  auVar212._8_4_ = 0xbf800000;
                  auVar212._0_8_ = 0xbf800000bf800000;
                  auVar212._12_4_ = 0xbf800000;
                  auVar207 = vaddps_avx512vl(auVar206,auVar212);
                  auVar206 = vaddps_avx512vl(auVar207,auVar206);
                  bVar199 = (bool)((byte)uVar186 & 1);
                  auVar221._0_4_ = (uint)bVar199 * auVar206._0_4_ | (uint)!bVar199 * auVar207._0_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 1) & 1);
                  auVar221._4_4_ = (uint)bVar199 * auVar206._4_4_ | (uint)!bVar199 * auVar207._4_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 2) & 1);
                  auVar221._8_4_ = (uint)bVar199 * auVar206._8_4_ | (uint)!bVar199 * auVar207._8_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 3) & 1);
                  auVar221._12_4_ =
                       (uint)bVar199 * auVar206._12_4_ | (uint)!bVar199 * auVar207._12_4_;
                  auVar207 = vmulps_avx512vl(auVar221,auVar221);
                  auVar206 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
                  auVar213._8_4_ = 0xbdebd1b8;
                  auVar213._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar213._12_4_ = 0xbdebd1b8;
                  auVar206 = vfmadd213ps_avx512vl(auVar206,auVar221,auVar213);
                  auVar214._8_4_ = 0x3def251a;
                  auVar214._0_8_ = 0x3def251a3def251a;
                  auVar214._12_4_ = 0x3def251a;
                  auVar206 = vfmadd213ps_avx512vl(auVar206,auVar221,auVar214);
                  auVar215._8_4_ = 0xbdfe5d4f;
                  auVar215._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar215._12_4_ = 0xbdfe5d4f;
                  auVar206 = vfmadd213ps_avx512vl(auVar206,auVar221,auVar215);
                  auVar216._8_4_ = 0x3e11e9bf;
                  auVar216._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar216._12_4_ = 0x3e11e9bf;
                  auVar206 = vfmadd213ps_avx512vl(auVar206,auVar221,auVar216);
                  auVar217._8_4_ = 0xbe2aae50;
                  auVar217._0_8_ = 0xbe2aae50be2aae50;
                  auVar217._12_4_ = 0xbe2aae50;
                  auVar206 = vfmadd213ps_avx512vl(auVar206,auVar221,auVar217);
                  auVar218._8_4_ = 0x3e4cceac;
                  auVar218._0_8_ = 0x3e4cceac3e4cceac;
                  auVar218._12_4_ = 0x3e4cceac;
                  auVar206 = vfmadd213ps_avx512vl(auVar206,auVar221,auVar218);
                  auVar219._8_4_ = 0xbe7ffffc;
                  auVar219._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar219._12_4_ = 0xbe7ffffc;
                  auVar206 = vfmadd213ps_avx512vl(auVar206,auVar221,auVar219);
                  auVar42._8_4_ = 0x3eaaaaaa;
                  auVar42._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar42._12_4_ = 0x3eaaaaaa;
                  auVar206 = vfmadd213ps_avx512vl(auVar206,auVar221,auVar42);
                  auVar208 = vmulps_avx512vl(auVar207,auVar221);
                  auVar208 = vmulps_avx512vl(auVar208,auVar206);
                  auVar43._8_4_ = 0xffffff82;
                  auVar43._0_8_ = 0xffffff82ffffff82;
                  auVar43._12_4_ = 0xffffff82;
                  auVar206 = vpaddd_avx512vl(auVar209,auVar43);
                  auVar206 = vcvtdq2ps_avx(auVar206);
                  auVar209 = vsubps_avx512vl(auVar206,auVar231);
                  bVar199 = (bool)((byte)uVar186 & 1);
                  auVar222._0_4_ = (uint)bVar199 * auVar209._0_4_ | (uint)!bVar199 * auVar206._0_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 1) & 1);
                  auVar222._4_4_ = (uint)bVar199 * auVar209._4_4_ | (uint)!bVar199 * auVar206._4_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 2) & 1);
                  auVar222._8_4_ = (uint)bVar199 * auVar209._8_4_ | (uint)!bVar199 * auVar206._8_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 3) & 1);
                  auVar222._12_4_ =
                       (uint)bVar199 * auVar209._12_4_ | (uint)!bVar199 * auVar206._12_4_;
                  auVar206 = vfmadd231ps_avx512vl(auVar208,auVar222,auVar236);
                  auVar206 = vfmsub231ps_avx512vl(auVar206,auVar229,auVar207);
                  auVar206 = vsubps_avx512vl(auVar206,auVar221);
                  auVar206 = vfnmadd231ps_fma(auVar206,auVar232,auVar222);
                  auVar207 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar199 = (bool)((byte)uVar171 & 1);
                  auVar223._0_4_ =
                       (uint)bVar199 * auVar207._0_4_ |
                       (uint)!bVar199 * (int)(auVar206._0_4_ + auVar206._0_4_);
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  auVar223._4_4_ =
                       (uint)bVar199 * auVar207._4_4_ |
                       (uint)!bVar199 * (int)(auVar206._4_4_ + auVar206._4_4_);
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  auVar223._8_4_ =
                       (uint)bVar199 * auVar207._8_4_ |
                       (uint)!bVar199 * (int)(auVar206._8_4_ + auVar206._8_4_);
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  auVar223._12_4_ =
                       (uint)bVar199 * auVar207._12_4_ |
                       (uint)!bVar199 * (int)(auVar206._12_4_ + auVar206._12_4_);
                  auVar206 = vminps_avx(auVar223,auVar227);
                  auVar206 = vmaxps_avx(auVar206,auVar228);
                  auVar207 = vfmadd213ps_fma(auVar230,auVar206,auVar229);
                  auVar208 = vcvttps2dq_avx512vl(auVar207);
                  auVar208 = vcvtdq2ps_avx512vl(auVar208);
                  uVar171 = vcmpps_avx512vl(auVar207,auVar208,1);
                  auVar207 = vsubps_avx512vl(auVar208,auVar231);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  auVar224._0_4_ = (uint)bVar199 * auVar207._0_4_ | (uint)!bVar199 * auVar208._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  auVar224._4_4_ = (uint)bVar199 * auVar207._4_4_ | (uint)!bVar199 * auVar208._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  auVar224._8_4_ = (uint)bVar199 * auVar207._8_4_ | (uint)!bVar199 * auVar208._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  auVar224._12_4_ =
                       (uint)bVar199 * auVar207._12_4_ | (uint)!bVar199 * auVar208._12_4_;
                  auVar206 = vfmsub231ps_avx512vl(auVar206,auVar224,auVar232);
                  auVar206 = vfnmsub231ps_avx512vl(auVar206,auVar224,auVar236);
                  auVar464._0_4_ = auVar206._0_4_ * auVar206._0_4_;
                  auVar464._4_4_ = auVar206._4_4_ * auVar206._4_4_;
                  auVar464._8_4_ = auVar206._8_4_ * auVar206._8_4_;
                  auVar464._12_4_ = auVar206._12_4_ * auVar206._12_4_;
                  auVar207 = vfmadd213ps_avx512vl(auVar204,auVar206,auVar244);
                  auVar207 = vfmadd213ps_avx512vl(auVar207,auVar206,auVar237);
                  auVar207 = vfmadd213ps_avx512vl(auVar207,auVar206,auVar233);
                  auVar207 = vfmadd213ps_avx512vl(auVar207,auVar206,auVar234);
                  auVar207 = vfmadd213ps_avx512vl(auVar207,auVar206,auVar229);
                  auVar206 = vfmadd213ps_avx512vl(auVar207,auVar464,auVar206);
                  in_ZMM17 = ZEXT1664(auVar206);
                  auVar207 = vaddps_avx512vl(auVar206,auVar231);
                  auVar206 = vcvttps2dq_avx512vl(auVar224);
                  auVar206 = vpslld_avx(auVar206,0x17);
                  auVar206 = vpaddd_avx(auVar206,auVar235);
                  auVar207 = vfmadd213ps_fma(auVar206,auVar207,auVar231);
                  auVar206 = vrcpps_avx(auVar207);
                  auVar208 = vaddps_avx512vl(auVar206,auVar206);
                  in_ZMM16 = ZEXT1664(auVar208);
                  auVar207 = vfmsub213ps_avx512vl(auVar207,auVar208,auVar205);
                  auVar206 = vfnmadd213ps_avx512vl(auVar207,auVar206,auVar208);
                  in_ZMM9 = ZEXT1664(auVar206);
                  auVar203 = vfmsub231ps_fma(auVar203,auVar203,auVar206);
                  break;
                case 6:
                  uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                  auVar208._4_4_ = uVar4;
                  auVar208._0_4_ = uVar4;
                  auVar208._8_4_ = uVar4;
                  auVar208._12_4_ = uVar4;
                  uVar4 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var168))[1];
                  auVar206._4_4_ = uVar4;
                  auVar206._0_4_ = uVar4;
                  auVar206._8_4_ = uVar4;
                  auVar206._12_4_ = uVar4;
                  auVar206 = vfmadd213ps_avx512vl(auVar208,auVar203,auVar206);
                  auVar206 = vmaxps_avx(auVar206,auVar226);
                  auVar206 = vminps_avx(auVar206,auVar231);
                  auVar207._0_4_ = auVar206._0_4_ * auVar203._0_4_;
                  auVar207._4_4_ = auVar206._4_4_ * auVar203._4_4_;
                  auVar207._8_4_ = auVar206._8_4_ * auVar203._8_4_;
                  auVar207._12_4_ = auVar206._12_4_ * auVar203._12_4_;
                  auVar203 = auVar207;
                }
                *(undefined1 (*) [16])pAVar188 = auVar203;
                pAVar188 = pAVar188 + 2;
                uVar174 = uVar174 + 1;
                iVar161 = iVar161 + 1;
              } while (uVar174 != local_228.w);
            }
            iVar194 = iVar194 + 1;
          } while (iVar194 != local_228.h);
        }
        auVar203 = in_ZMM29._0_16_;
        local_300 = (_func_int **)((long)local_300 + 1);
      } while (local_300 != (_func_int **)(long)local_228.c);
    }
    afVar158 = _ps512_cephes_log_p8;
    afVar157 = _ps512_cephes_log_p7;
    afVar156 = _ps512_cephes_log_p6;
    afVar155 = _ps512_cephes_log_p5;
    afVar154 = _ps512_cephes_log_p4;
    afVar153 = _ps512_cephes_log_p3;
    afVar152 = _ps512_cephes_log_p2;
    afVar151 = _ps512_cephes_exp_p5;
    afVar150 = _ps512_cephes_exp_p4;
    afVar149 = _ps512_cephes_exp_p3;
    afVar148 = _ps512_cephes_exp_p2;
    afVar147 = _ps512_cephes_exp_p1;
    afVar146 = _ps512_cephes_exp_p0;
    afVar145 = _ps512_cephes_LOG2EF;
    afVar144 = _ps512_exp_lo;
    afVar143 = _ps512_exp_hi;
    afVar142 = _ps512_1;
    if ((uVar176 == 1) && (uVar190 == 0x10)) {
      if ((long)local_228.c < 1) goto LAB_0027f987;
      p_Var168 = pp_Var13[-3];
      iVar10 = *(int *)(&this->field_0xdc + (long)p_Var168);
      iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var168);
      iVar175 = *(int *)(&this->field_0xe4 + (long)p_Var168);
      iVar172 = *(int *)(&this->field_0xe8 + (long)p_Var168);
      uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var168);
      lVar192 = *(long *)(&this->field_0x1a8 + (long)p_Var168);
      uVar160 = *(uint *)(&this->field_0xd4 + (long)p_Var168);
      uVar169 = *(uint *)(&this->field_0xd8 + (long)p_Var168);
      auVar336 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar337 = vxorps_avx512dq(auVar336,(undefined1  [64])_ps512_cephes_log_q2);
      in_ZMM9 = vxorps_avx512dq(auVar336,(undefined1  [64])_ps512_cephes_log_q1);
      auVar338 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      auVar339 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar336);
      iVar180 = (1 - uVar160) * iVar10;
      local_168._0_4_ = iVar180;
      local_300 = (_func_int **)0x0;
      auVar203 = vxorps_avx512vl(auVar203,auVar203);
      auVar309 = ZEXT1664(auVar203);
      auVar340 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar341 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      do {
        local_1a8._0_4_ = local_228.h;
        if (0 < local_228.h) {
          iVar189 = bottom_blob->w;
          iVar195 = bottom_blob->h;
          pAVar188 = (Allocator *)
                     ((long)(_func_int ***)local_228.data +
                     local_228.cstep * (long)local_300 * local_228.elemsize);
          uVar170 = bottom_blob->c;
          iVar194 = 0;
          do {
            if (0 < local_228.w) {
              uVar174 = 0;
              iVar161 = iVar180;
              do {
                if (lVar192 == 0) {
                  auVar310 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar310 = *(undefined1 (*) [64])(lVar192 + (long)local_300 * 0x40);
                }
                if (0 < (int)uVar170) {
                  pvVar196 = (void *)((this->weight_data_tm).cstep * (long)local_300 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  uVar171 = 0;
                  do {
                    if (0 < (int)uVar169) {
                      uVar181 = 0;
                      uVar186 = 0;
                      do {
                        iVar162 = (((int)uVar186 - uVar169) + 1) * iVar11 + iVar194;
                        if ((((-1 < iVar162) &&
                             (iVar163 = iVar162 / iVar172, iVar162 % iVar172 == 0)) &&
                            (iVar163 < iVar195)) && (0 < (int)uVar160)) {
                          uVar185 = (ulong)uVar160;
                          uVar191 = uVar181;
                          iVar162 = iVar161;
                          do {
                            if (((-1 < iVar162) &&
                                (iVar164 = iVar162 / iVar175, iVar162 % iVar175 == 0)) &&
                               (iVar164 < iVar189)) {
                              auVar311 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)bottom_blob->data +
                                                                     (long)iVar164 * 4 +
                                                                     (long)iVar163 *
                                                                     (long)bottom_blob->w *
                                                                     bottom_blob->elemsize +
                                                                     bottom_blob->cstep *
                                                                     bottom_blob->elemsize * uVar171
                                                                     )));
                              auVar310 = vfmadd231ps_avx512f(auVar310,auVar311,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar196 +
                                                              (uVar191 & 0xffffffff) * 4));
                            }
                            uVar191 = uVar191 + 0x10;
                            iVar162 = iVar162 + iVar10;
                            uVar185 = uVar185 - 1;
                          } while (uVar185 != 0);
                        }
                        uVar186 = uVar186 + 1;
                        uVar181 = uVar181 + (ulong)uVar160 * 0x10;
                      } while (uVar186 != uVar169);
                    }
                    pvVar196 = (void *)((long)pvVar196 + (long)(int)(uVar160 * uVar169 * 0x10) * 4);
                    uVar171 = uVar171 + 1;
                  } while (uVar171 != uVar170);
                }
                switch(uVar12) {
                case 1:
                  auVar310 = vmaxps_avx512f(auVar310,auVar309);
                  break;
                case 2:
                  uVar171 = vcmpps_avx512f(auVar310,auVar309,1);
                  uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                  auVar131._4_4_ = uVar4;
                  auVar131._0_4_ = uVar4;
                  auVar131._8_4_ = uVar4;
                  auVar131._12_4_ = uVar4;
                  auVar131._16_4_ = uVar4;
                  auVar131._20_4_ = uVar4;
                  auVar131._24_4_ = uVar4;
                  auVar131._28_4_ = uVar4;
                  auVar131._32_4_ = uVar4;
                  auVar131._36_4_ = uVar4;
                  auVar131._40_4_ = uVar4;
                  auVar131._44_4_ = uVar4;
                  auVar131._48_4_ = uVar4;
                  auVar131._52_4_ = uVar4;
                  auVar131._56_4_ = uVar4;
                  auVar131._60_4_ = uVar4;
                  auVar311 = vmulps_avx512f(auVar310,auVar131);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  auVar335._0_4_ = (uint)bVar199 * auVar311._0_4_ | (uint)!bVar199 * auVar310._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  auVar335._4_4_ = (uint)bVar199 * auVar311._4_4_ | (uint)!bVar199 * auVar310._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  auVar335._8_4_ = (uint)bVar199 * auVar311._8_4_ | (uint)!bVar199 * auVar310._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  auVar335._12_4_ =
                       (uint)bVar199 * auVar311._12_4_ | (uint)!bVar199 * auVar310._12_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                  auVar335._16_4_ =
                       (uint)bVar199 * auVar311._16_4_ | (uint)!bVar199 * auVar310._16_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                  auVar335._20_4_ =
                       (uint)bVar199 * auVar311._20_4_ | (uint)!bVar199 * auVar310._20_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                  auVar335._24_4_ =
                       (uint)bVar199 * auVar311._24_4_ | (uint)!bVar199 * auVar310._24_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 7) & 1);
                  auVar335._28_4_ =
                       (uint)bVar199 * auVar311._28_4_ | (uint)!bVar199 * auVar310._28_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 8) & 1);
                  auVar335._32_4_ =
                       (uint)bVar199 * auVar311._32_4_ | (uint)!bVar199 * auVar310._32_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 9) & 1);
                  auVar335._36_4_ =
                       (uint)bVar199 * auVar311._36_4_ | (uint)!bVar199 * auVar310._36_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 10) & 1);
                  auVar335._40_4_ =
                       (uint)bVar199 * auVar311._40_4_ | (uint)!bVar199 * auVar310._40_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xb) & 1);
                  auVar335._44_4_ =
                       (uint)bVar199 * auVar311._44_4_ | (uint)!bVar199 * auVar310._44_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xc) & 1);
                  auVar335._48_4_ =
                       (uint)bVar199 * auVar311._48_4_ | (uint)!bVar199 * auVar310._48_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xd) & 1);
                  auVar335._52_4_ =
                       (uint)bVar199 * auVar311._52_4_ | (uint)!bVar199 * auVar310._52_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xe) & 1);
                  auVar335._56_4_ =
                       (uint)bVar199 * auVar311._56_4_ | (uint)!bVar199 * auVar310._56_4_;
                  bVar199 = SUB81(uVar171 >> 0xf,0);
                  auVar335._60_4_ =
                       (uint)bVar199 * auVar311._60_4_ | (uint)!bVar199 * auVar310._60_4_;
                  auVar310 = auVar335;
                  break;
                case 3:
                  uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                  auVar129._4_4_ = uVar4;
                  auVar129._0_4_ = uVar4;
                  auVar129._8_4_ = uVar4;
                  auVar129._12_4_ = uVar4;
                  auVar129._16_4_ = uVar4;
                  auVar129._20_4_ = uVar4;
                  auVar129._24_4_ = uVar4;
                  auVar129._28_4_ = uVar4;
                  auVar129._32_4_ = uVar4;
                  auVar129._36_4_ = uVar4;
                  auVar129._40_4_ = uVar4;
                  auVar129._44_4_ = uVar4;
                  auVar129._48_4_ = uVar4;
                  auVar129._52_4_ = uVar4;
                  auVar129._56_4_ = uVar4;
                  auVar129._60_4_ = uVar4;
                  auVar310 = vmaxps_avx512f(auVar310,auVar129);
                  uVar4 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var168))[1];
                  auVar130._4_4_ = uVar4;
                  auVar130._0_4_ = uVar4;
                  auVar130._8_4_ = uVar4;
                  auVar130._12_4_ = uVar4;
                  auVar130._16_4_ = uVar4;
                  auVar130._20_4_ = uVar4;
                  auVar130._24_4_ = uVar4;
                  auVar130._28_4_ = uVar4;
                  auVar130._32_4_ = uVar4;
                  auVar130._36_4_ = uVar4;
                  auVar130._40_4_ = uVar4;
                  auVar130._44_4_ = uVar4;
                  auVar130._48_4_ = uVar4;
                  auVar130._52_4_ = uVar4;
                  auVar130._56_4_ = uVar4;
                  auVar130._60_4_ = uVar4;
                  auVar310 = vminps_avx512f(auVar310,auVar130);
                  break;
                case 4:
                  auVar310 = vxorps_avx512dq(auVar310,auVar336);
                  auVar310 = vminps_avx512f(auVar310,(undefined1  [64])afVar143);
                  auVar310 = vmaxps_avx512f(auVar310,(undefined1  [64])afVar144);
                  auVar311 = vfmadd213ps_avx512f((undefined1  [64])afVar145,auVar310,
                                                 (undefined1  [64])afVar151);
                  auVar312 = vrndscaleps_avx512f(auVar311,1);
                  uVar171 = vcmpps_avx512f(auVar311,auVar312,1);
                  auVar311 = vsubps_avx512f(auVar312,(undefined1  [64])afVar142);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  auVar334._0_4_ = (uint)bVar199 * auVar311._0_4_ | (uint)!bVar199 * auVar312._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  auVar334._4_4_ = (uint)bVar199 * auVar311._4_4_ | (uint)!bVar199 * auVar312._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  auVar334._8_4_ = (uint)bVar199 * auVar311._8_4_ | (uint)!bVar199 * auVar312._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  auVar334._12_4_ =
                       (uint)bVar199 * auVar311._12_4_ | (uint)!bVar199 * auVar312._12_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                  auVar334._16_4_ =
                       (uint)bVar199 * auVar311._16_4_ | (uint)!bVar199 * auVar312._16_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                  auVar334._20_4_ =
                       (uint)bVar199 * auVar311._20_4_ | (uint)!bVar199 * auVar312._20_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                  auVar334._24_4_ =
                       (uint)bVar199 * auVar311._24_4_ | (uint)!bVar199 * auVar312._24_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 7) & 1);
                  auVar334._28_4_ =
                       (uint)bVar199 * auVar311._28_4_ | (uint)!bVar199 * auVar312._28_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 8) & 1);
                  auVar334._32_4_ =
                       (uint)bVar199 * auVar311._32_4_ | (uint)!bVar199 * auVar312._32_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 9) & 1);
                  auVar334._36_4_ =
                       (uint)bVar199 * auVar311._36_4_ | (uint)!bVar199 * auVar312._36_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 10) & 1);
                  auVar334._40_4_ =
                       (uint)bVar199 * auVar311._40_4_ | (uint)!bVar199 * auVar312._40_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xb) & 1);
                  auVar334._44_4_ =
                       (uint)bVar199 * auVar311._44_4_ | (uint)!bVar199 * auVar312._44_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xc) & 1);
                  auVar334._48_4_ =
                       (uint)bVar199 * auVar311._48_4_ | (uint)!bVar199 * auVar312._48_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xd) & 1);
                  auVar334._52_4_ =
                       (uint)bVar199 * auVar311._52_4_ | (uint)!bVar199 * auVar312._52_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xe) & 1);
                  auVar334._56_4_ =
                       (uint)bVar199 * auVar311._56_4_ | (uint)!bVar199 * auVar312._56_4_;
                  bVar199 = SUB81(uVar171 >> 0xf,0);
                  auVar334._60_4_ =
                       (uint)bVar199 * auVar311._60_4_ | (uint)!bVar199 * auVar312._60_4_;
                  auVar310 = vfmadd231ps_avx512f(auVar310,auVar334,auVar337);
                  in_ZMM16 = vfmadd231ps_avx512f(auVar310,auVar334,in_ZMM9);
                  auVar310 = vmulps_avx512f(in_ZMM16,in_ZMM16);
                  auVar311 = vfmadd213ps_avx512f(in_ZMM16,(undefined1  [64])afVar146,
                                                 (undefined1  [64])afVar147);
                  auVar311 = vfmadd213ps_avx512f(auVar311,in_ZMM16,(undefined1  [64])afVar148);
                  auVar311 = vfmadd213ps_avx512f(auVar311,in_ZMM16,(undefined1  [64])afVar149);
                  auVar311 = vfmadd213ps_avx512f(auVar311,in_ZMM16,(undefined1  [64])afVar150);
                  auVar311 = vfmadd213ps_avx512f(auVar311,in_ZMM16,(undefined1  [64])afVar151);
                  auVar310 = vfmadd213ps_avx512f(auVar311,auVar310,in_ZMM16);
                  auVar310 = vaddps_avx512f(auVar310,(undefined1  [64])afVar142);
                  auVar311 = vcvttps2dq_avx512f(auVar334);
                  auVar311 = vpaddd_avx512f(auVar311,auVar338);
                  auVar311 = vpslld_avx512f(auVar311,0x17);
                  auVar310 = vfmadd213ps_avx512f(auVar311,auVar310,auVar340);
                  auVar311 = vrcp14ps_avx512f(auVar310);
                  auVar310 = vfmsub213ps_avx512f(auVar310,auVar311,auVar340);
                  auVar310 = vfnmadd132ps_avx512vl(auVar310,auVar311,auVar311);
                  break;
                case 5:
                  auVar311 = vminps_avx512f(auVar310,(undefined1  [64])afVar143);
                  auVar311 = vmaxps_avx512f(auVar311,(undefined1  [64])afVar144);
                  auVar312 = vfmadd213ps_avx512f((undefined1  [64])afVar145,auVar311,
                                                 (undefined1  [64])afVar151);
                  auVar313 = vrndscaleps_avx512f(auVar312,1);
                  uVar171 = vcmpps_avx512f(auVar312,auVar313,1);
                  auVar312 = vsubps_avx512f(auVar313,(undefined1  [64])afVar142);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  auVar330._0_4_ = (uint)bVar199 * auVar312._0_4_ | (uint)!bVar199 * auVar313._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  auVar330._4_4_ = (uint)bVar199 * auVar312._4_4_ | (uint)!bVar199 * auVar313._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  auVar330._8_4_ = (uint)bVar199 * auVar312._8_4_ | (uint)!bVar199 * auVar313._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  auVar330._12_4_ =
                       (uint)bVar199 * auVar312._12_4_ | (uint)!bVar199 * auVar313._12_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                  auVar330._16_4_ =
                       (uint)bVar199 * auVar312._16_4_ | (uint)!bVar199 * auVar313._16_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                  auVar330._20_4_ =
                       (uint)bVar199 * auVar312._20_4_ | (uint)!bVar199 * auVar313._20_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                  auVar330._24_4_ =
                       (uint)bVar199 * auVar312._24_4_ | (uint)!bVar199 * auVar313._24_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 7) & 1);
                  auVar330._28_4_ =
                       (uint)bVar199 * auVar312._28_4_ | (uint)!bVar199 * auVar313._28_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 8) & 1);
                  auVar330._32_4_ =
                       (uint)bVar199 * auVar312._32_4_ | (uint)!bVar199 * auVar313._32_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 9) & 1);
                  auVar330._36_4_ =
                       (uint)bVar199 * auVar312._36_4_ | (uint)!bVar199 * auVar313._36_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 10) & 1);
                  auVar330._40_4_ =
                       (uint)bVar199 * auVar312._40_4_ | (uint)!bVar199 * auVar313._40_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xb) & 1);
                  auVar330._44_4_ =
                       (uint)bVar199 * auVar312._44_4_ | (uint)!bVar199 * auVar313._44_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xc) & 1);
                  auVar330._48_4_ =
                       (uint)bVar199 * auVar312._48_4_ | (uint)!bVar199 * auVar313._48_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xd) & 1);
                  auVar330._52_4_ =
                       (uint)bVar199 * auVar312._52_4_ | (uint)!bVar199 * auVar313._52_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xe) & 1);
                  auVar330._56_4_ =
                       (uint)bVar199 * auVar312._56_4_ | (uint)!bVar199 * auVar313._56_4_;
                  bVar199 = SUB81(uVar171 >> 0xf,0);
                  auVar330._60_4_ =
                       (uint)bVar199 * auVar312._60_4_ | (uint)!bVar199 * auVar313._60_4_;
                  auVar311 = vfmadd231ps_avx512f(auVar311,auVar330,auVar337);
                  auVar311 = vfmadd231ps_avx512f(auVar311,auVar330,in_ZMM9);
                  auVar312 = vmulps_avx512f(auVar311,auVar311);
                  auVar313 = vfmadd213ps_avx512f(auVar311,(undefined1  [64])afVar146,
                                                 (undefined1  [64])afVar147);
                  auVar313 = vfmadd213ps_avx512f(auVar313,auVar311,(undefined1  [64])afVar148);
                  auVar313 = vfmadd213ps_avx512f(auVar313,auVar311,(undefined1  [64])afVar149);
                  auVar313 = vfmadd213ps_avx512f(auVar313,auVar311,(undefined1  [64])afVar150);
                  auVar313 = vfmadd213ps_avx512f(auVar313,auVar311,(undefined1  [64])afVar151);
                  auVar311 = vfmadd213ps_avx512f(auVar313,auVar312,auVar311);
                  auVar311 = vaddps_avx512f(auVar311,(undefined1  [64])afVar142);
                  auVar312 = vcvttps2dq_avx512f(auVar330);
                  auVar312 = vpaddd_avx512f(auVar312,auVar338);
                  auVar312 = vpslld_avx512f(auVar312,0x17);
                  auVar311 = vfmadd213ps_avx512f(auVar312,auVar311,auVar340);
                  auVar312 = vmaxps_avx512f(auVar311,(undefined1  [64])_ps512_min_norm_pos);
                  auVar313 = vpsrld_avx512f(auVar312,0x17);
                  auVar312 = vpternlogd_avx512f(auVar312,(undefined1  [64])afVar151,
                                                (undefined1  [64])_ps512_inv_mant_mask,0xec);
                  uVar171 = vcmpps_avx512f(auVar312,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                  auVar314 = vsubps_avx512f(auVar312,(undefined1  [64])afVar142);
                  auVar312 = vaddps_avx512f(auVar314,auVar312);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  auVar331._0_4_ = (uint)bVar199 * auVar312._0_4_ | (uint)!bVar199 * auVar314._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  auVar331._4_4_ = (uint)bVar199 * auVar312._4_4_ | (uint)!bVar199 * auVar314._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  auVar331._8_4_ = (uint)bVar199 * auVar312._8_4_ | (uint)!bVar199 * auVar314._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  auVar331._12_4_ =
                       (uint)bVar199 * auVar312._12_4_ | (uint)!bVar199 * auVar314._12_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                  auVar331._16_4_ =
                       (uint)bVar199 * auVar312._16_4_ | (uint)!bVar199 * auVar314._16_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                  auVar331._20_4_ =
                       (uint)bVar199 * auVar312._20_4_ | (uint)!bVar199 * auVar314._20_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                  auVar331._24_4_ =
                       (uint)bVar199 * auVar312._24_4_ | (uint)!bVar199 * auVar314._24_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 7) & 1);
                  auVar331._28_4_ =
                       (uint)bVar199 * auVar312._28_4_ | (uint)!bVar199 * auVar314._28_4_;
                  bVar30 = (byte)(uVar171 >> 8);
                  bVar199 = (bool)(bVar30 & 1);
                  auVar331._32_4_ =
                       (uint)bVar199 * auVar312._32_4_ | (uint)!bVar199 * auVar314._32_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 9) & 1);
                  auVar331._36_4_ =
                       (uint)bVar199 * auVar312._36_4_ | (uint)!bVar199 * auVar314._36_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 10) & 1);
                  auVar331._40_4_ =
                       (uint)bVar199 * auVar312._40_4_ | (uint)!bVar199 * auVar314._40_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xb) & 1);
                  auVar331._44_4_ =
                       (uint)bVar199 * auVar312._44_4_ | (uint)!bVar199 * auVar314._44_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xc) & 1);
                  auVar331._48_4_ =
                       (uint)bVar199 * auVar312._48_4_ | (uint)!bVar199 * auVar314._48_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xd) & 1);
                  auVar331._52_4_ =
                       (uint)bVar199 * auVar312._52_4_ | (uint)!bVar199 * auVar314._52_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xe) & 1);
                  auVar331._56_4_ =
                       (uint)bVar199 * auVar312._56_4_ | (uint)!bVar199 * auVar314._56_4_;
                  bVar199 = SUB81(uVar171 >> 0xf,0);
                  auVar331._60_4_ =
                       (uint)bVar199 * auVar312._60_4_ | (uint)!bVar199 * auVar314._60_4_;
                  auVar312 = vmulps_avx512f(auVar331,auVar331);
                  auVar314 = vfmadd132ps_avx512f(auVar331,(undefined1  [64])_ps512_cephes_log_p1,
                                                 (undefined1  [64])_ps512_cephes_log_p0);
                  auVar314 = vfmadd213ps_avx512f(auVar314,auVar331,(undefined1  [64])afVar152);
                  auVar314 = vfmadd213ps_avx512f(auVar314,auVar331,(undefined1  [64])afVar153);
                  auVar314 = vfmadd213ps_avx512f(auVar314,auVar331,(undefined1  [64])afVar154);
                  auVar314 = vfmadd213ps_avx512f(auVar314,auVar331,(undefined1  [64])afVar155);
                  auVar314 = vfmadd213ps_avx512f(auVar314,auVar331,(undefined1  [64])afVar156);
                  auVar314 = vfmadd213ps_avx512f(auVar314,auVar331,(undefined1  [64])afVar157);
                  auVar314 = vfmadd213ps_avx512f(auVar314,auVar331,(undefined1  [64])afVar158);
                  auVar315 = vmulps_avx512f(auVar312,auVar331);
                  auVar314 = vfmadd213ps_avx512f(auVar315,auVar314,auVar331);
                  uVar186 = vcmpps_avx512f(auVar311,auVar309,2);
                  auVar311 = vpsubd_avx512f(auVar313,auVar338);
                  auVar311 = vcvtdq2ps_avx512f(auVar311);
                  auVar313 = vaddps_avx512f(auVar311,(undefined1  [64])afVar142);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  auVar332._0_4_ = (uint)bVar199 * auVar311._0_4_ | (uint)!bVar199 * auVar313._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  auVar332._4_4_ = (uint)bVar199 * auVar311._4_4_ | (uint)!bVar199 * auVar313._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  auVar332._8_4_ = (uint)bVar199 * auVar311._8_4_ | (uint)!bVar199 * auVar313._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  auVar332._12_4_ =
                       (uint)bVar199 * auVar311._12_4_ | (uint)!bVar199 * auVar313._12_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                  auVar332._16_4_ =
                       (uint)bVar199 * auVar311._16_4_ | (uint)!bVar199 * auVar313._16_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                  auVar332._20_4_ =
                       (uint)bVar199 * auVar311._20_4_ | (uint)!bVar199 * auVar313._20_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                  auVar332._24_4_ =
                       (uint)bVar199 * auVar311._24_4_ | (uint)!bVar199 * auVar313._24_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 7) & 1);
                  auVar332._28_4_ =
                       (uint)bVar199 * auVar311._28_4_ | (uint)!bVar199 * auVar313._28_4_;
                  bVar199 = (bool)(bVar30 & 1);
                  auVar332._32_4_ =
                       (uint)bVar199 * auVar311._32_4_ | (uint)!bVar199 * auVar313._32_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 9) & 1);
                  auVar332._36_4_ =
                       (uint)bVar199 * auVar311._36_4_ | (uint)!bVar199 * auVar313._36_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 10) & 1);
                  auVar332._40_4_ =
                       (uint)bVar199 * auVar311._40_4_ | (uint)!bVar199 * auVar313._40_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xb) & 1);
                  auVar332._44_4_ =
                       (uint)bVar199 * auVar311._44_4_ | (uint)!bVar199 * auVar313._44_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xc) & 1);
                  auVar332._48_4_ =
                       (uint)bVar199 * auVar311._48_4_ | (uint)!bVar199 * auVar313._48_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xd) & 1);
                  auVar332._52_4_ =
                       (uint)bVar199 * auVar311._52_4_ | (uint)!bVar199 * auVar313._52_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xe) & 1);
                  auVar332._56_4_ =
                       (uint)bVar199 * auVar311._56_4_ | (uint)!bVar199 * auVar313._56_4_;
                  bVar199 = SUB81(uVar171 >> 0xf,0);
                  auVar332._60_4_ =
                       (uint)bVar199 * auVar311._60_4_ | (uint)!bVar199 * auVar313._60_4_;
                  auVar311 = vfmadd231ps_avx512f(auVar314,auVar332,
                                                 (undefined1  [64])_ps512_cephes_log_q1);
                  auVar311 = vfmadd231ps_avx512f(auVar311,auVar339,auVar312);
                  auVar311 = vfmadd231ps_avx512f(auVar311,auVar332,
                                                 (undefined1  [64])_ps512_cephes_log_q2);
                  auVar311 = vmulps_avx512f(auVar311,auVar341);
                  auVar312 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                  bVar199 = (bool)((byte)uVar186 & 1);
                  auVar333._0_4_ = (uint)bVar199 * auVar312._0_4_ | (uint)!bVar199 * auVar311._0_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 1) & 1);
                  auVar333._4_4_ = (uint)bVar199 * auVar312._4_4_ | (uint)!bVar199 * auVar311._4_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 2) & 1);
                  auVar333._8_4_ = (uint)bVar199 * auVar312._8_4_ | (uint)!bVar199 * auVar311._8_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 3) & 1);
                  auVar333._12_4_ =
                       (uint)bVar199 * auVar312._12_4_ | (uint)!bVar199 * auVar311._12_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 4) & 1);
                  auVar333._16_4_ =
                       (uint)bVar199 * auVar312._16_4_ | (uint)!bVar199 * auVar311._16_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 5) & 1);
                  auVar333._20_4_ =
                       (uint)bVar199 * auVar312._20_4_ | (uint)!bVar199 * auVar311._20_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 6) & 1);
                  auVar333._24_4_ =
                       (uint)bVar199 * auVar312._24_4_ | (uint)!bVar199 * auVar311._24_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 7) & 1);
                  auVar333._28_4_ =
                       (uint)bVar199 * auVar312._28_4_ | (uint)!bVar199 * auVar311._28_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 8) & 1);
                  auVar333._32_4_ =
                       (uint)bVar199 * auVar312._32_4_ | (uint)!bVar199 * auVar311._32_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 9) & 1);
                  auVar333._36_4_ =
                       (uint)bVar199 * auVar312._36_4_ | (uint)!bVar199 * auVar311._36_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 10) & 1);
                  auVar333._40_4_ =
                       (uint)bVar199 * auVar312._40_4_ | (uint)!bVar199 * auVar311._40_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 0xb) & 1);
                  auVar333._44_4_ =
                       (uint)bVar199 * auVar312._44_4_ | (uint)!bVar199 * auVar311._44_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 0xc) & 1);
                  auVar333._48_4_ =
                       (uint)bVar199 * auVar312._48_4_ | (uint)!bVar199 * auVar311._48_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 0xd) & 1);
                  auVar333._52_4_ =
                       (uint)bVar199 * auVar312._52_4_ | (uint)!bVar199 * auVar311._52_4_;
                  bVar199 = (bool)((byte)(uVar186 >> 0xe) & 1);
                  auVar333._56_4_ =
                       (uint)bVar199 * auVar312._56_4_ | (uint)!bVar199 * auVar311._56_4_;
                  bVar199 = SUB81(uVar186 >> 0xf,0);
                  auVar333._60_4_ =
                       (uint)bVar199 * auVar312._60_4_ | (uint)!bVar199 * auVar311._60_4_;
                  auVar311 = vminps_avx512f(auVar333,(undefined1  [64])afVar143);
                  auVar311 = vmaxps_avx512f(auVar311,(undefined1  [64])afVar144);
                  auVar312 = vfmadd213ps_avx512f((undefined1  [64])afVar145,auVar311,
                                                 (undefined1  [64])afVar151);
                  auVar313 = vrndscaleps_avx512f(auVar312,1);
                  uVar171 = vcmpps_avx512f(auVar312,auVar313,1);
                  auVar312 = vsubps_avx512f(auVar313,(undefined1  [64])afVar142);
                  bVar199 = (bool)((byte)uVar171 & 1);
                  in_ZMM16._0_4_ = (uint)bVar199 * auVar312._0_4_ | (uint)!bVar199 * auVar313._0_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                  in_ZMM16._4_4_ = (uint)bVar199 * auVar312._4_4_ | (uint)!bVar199 * auVar313._4_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                  in_ZMM16._8_4_ = (uint)bVar199 * auVar312._8_4_ | (uint)!bVar199 * auVar313._8_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                  in_ZMM16._12_4_ =
                       (uint)bVar199 * auVar312._12_4_ | (uint)!bVar199 * auVar313._12_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                  in_ZMM16._16_4_ =
                       (uint)bVar199 * auVar312._16_4_ | (uint)!bVar199 * auVar313._16_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                  in_ZMM16._20_4_ =
                       (uint)bVar199 * auVar312._20_4_ | (uint)!bVar199 * auVar313._20_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                  in_ZMM16._24_4_ =
                       (uint)bVar199 * auVar312._24_4_ | (uint)!bVar199 * auVar313._24_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 7) & 1);
                  in_ZMM16._28_4_ =
                       (uint)bVar199 * auVar312._28_4_ | (uint)!bVar199 * auVar313._28_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 8) & 1);
                  in_ZMM16._32_4_ =
                       (uint)bVar199 * auVar312._32_4_ | (uint)!bVar199 * auVar313._32_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 9) & 1);
                  in_ZMM16._36_4_ =
                       (uint)bVar199 * auVar312._36_4_ | (uint)!bVar199 * auVar313._36_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 10) & 1);
                  in_ZMM16._40_4_ =
                       (uint)bVar199 * auVar312._40_4_ | (uint)!bVar199 * auVar313._40_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xb) & 1);
                  in_ZMM16._44_4_ =
                       (uint)bVar199 * auVar312._44_4_ | (uint)!bVar199 * auVar313._44_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xc) & 1);
                  in_ZMM16._48_4_ =
                       (uint)bVar199 * auVar312._48_4_ | (uint)!bVar199 * auVar313._48_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xd) & 1);
                  in_ZMM16._52_4_ =
                       (uint)bVar199 * auVar312._52_4_ | (uint)!bVar199 * auVar313._52_4_;
                  bVar199 = (bool)((byte)(uVar171 >> 0xe) & 1);
                  in_ZMM16._56_4_ =
                       (uint)bVar199 * auVar312._56_4_ | (uint)!bVar199 * auVar313._56_4_;
                  bVar199 = SUB81(uVar171 >> 0xf,0);
                  in_ZMM16._60_4_ =
                       (uint)bVar199 * auVar312._60_4_ | (uint)!bVar199 * auVar313._60_4_;
                  auVar311 = vfmadd231ps_avx512f(auVar311,in_ZMM16,auVar337);
                  auVar311 = vfmadd231ps_avx512f(auVar311,in_ZMM16,in_ZMM9);
                  auVar312 = vmulps_avx512f(auVar311,auVar311);
                  auVar313 = vfmadd213ps_avx512f(auVar311,(undefined1  [64])afVar146,
                                                 (undefined1  [64])afVar147);
                  auVar313 = vfmadd213ps_avx512f(auVar313,auVar311,(undefined1  [64])afVar148);
                  auVar313 = vfmadd213ps_avx512f(auVar313,auVar311,(undefined1  [64])afVar149);
                  auVar313 = vfmadd213ps_avx512f(auVar313,auVar311,(undefined1  [64])afVar150);
                  auVar313 = vfmadd213ps_avx512f(auVar313,auVar311,(undefined1  [64])afVar151);
                  in_ZMM17 = vfmadd213ps_avx512f(auVar313,auVar312,auVar311);
                  auVar311 = vaddps_avx512f(in_ZMM17,(undefined1  [64])afVar142);
                  auVar312 = vcvttps2dq_avx512f(in_ZMM16);
                  auVar312 = vpaddd_avx512f(auVar312,auVar338);
                  auVar312 = vpslld_avx512f(auVar312,0x17);
                  auVar311 = vfmadd213ps_avx512f(auVar312,auVar311,auVar340);
                  auVar312 = vrcp14ps_avx512f(auVar311);
                  auVar311 = vfmsub213ps_avx512f(auVar311,auVar312,auVar340);
                  auVar311 = vfnmadd132ps_avx512vl(auVar311,auVar312,auVar312);
                  auVar311 = vfnmsub213ps_avx512f(auVar311,auVar341,auVar340);
                  auVar310 = vmulps_avx512f(auVar311,auVar310);
                  break;
                case 6:
                  auVar311 = vbroadcastss_avx512f
                                       (ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var168)));
                  uVar3 = (*(uint **)(&this->field_0x118 + (long)p_Var168))[1];
                  auVar128._4_4_ = uVar3;
                  auVar128._0_4_ = uVar3;
                  auVar128._8_4_ = uVar3;
                  auVar128._12_4_ = uVar3;
                  auVar128._16_4_ = uVar3;
                  auVar128._20_4_ = uVar3;
                  auVar128._24_4_ = uVar3;
                  auVar128._28_4_ = uVar3;
                  auVar128._32_4_ = uVar3;
                  auVar128._36_4_ = uVar3;
                  auVar128._40_4_ = uVar3;
                  auVar128._44_4_ = uVar3;
                  auVar128._48_4_ = uVar3;
                  auVar128._52_4_ = uVar3;
                  auVar128._56_4_ = uVar3;
                  auVar128._60_4_ = uVar3;
                  auVar311 = vfmadd213ps_avx512f(auVar311,auVar310,auVar128);
                  auVar311 = vmaxps_avx512f(auVar311,auVar309);
                  auVar311 = vminps_avx512f(auVar311,auVar340);
                  auVar310 = vmulps_avx512f(auVar311,auVar310);
                }
                *(undefined1 (*) [64])pAVar188 = auVar310;
                pAVar188 = pAVar188 + 8;
                uVar174 = uVar174 + 1;
                iVar161 = iVar161 + 1;
              } while (uVar174 != local_228.w);
            }
            iVar194 = iVar194 + 1;
          } while (iVar194 != local_228.h);
        }
        local_300 = (_func_int **)((long)local_300 + 1);
      } while (local_300 != (_func_int **)(long)local_228.c);
    }
    if ((uVar176 == 0x10) && (uVar190 == 1)) {
      lVar192 = (long)local_228.c;
      if (0 < lVar192) {
        local_1b0 = pp_Var13[-3];
        iVar10 = *(int *)(&this->field_0xdc + (long)local_1b0);
        iVar11 = *(int *)(&this->field_0xe0 + (long)local_1b0);
        iVar175 = *(int *)(&this->field_0xe4 + (long)local_1b0);
        iVar172 = *(int *)(&this->field_0xe8 + (long)local_1b0);
        uVar12 = *(undefined4 *)(&this->field_0x114 + (long)local_1b0);
        lVar187 = *(long *)(&this->field_0x1a8 + (long)local_1b0);
        uVar160 = *(uint *)(&this->field_0xd4 + (long)local_1b0);
        uVar176 = *(uint *)(&this->field_0xd8 + (long)local_1b0);
        lVar166 = local_228.elemsize * local_228.cstep;
        iVar180 = bottom_blob->w;
        local_168._0_4_ = (1 - uVar160) * iVar10;
        iVar189 = bottom_blob->h;
        uVar190 = bottom_blob->c;
        local_1a8._0_4_ = local_228.h;
        local_300 = (_func_int **)0x0;
        do {
          if (0 < (int)local_1a8._0_4_) {
            sVar15 = (this->weight_data_tm).cstep;
            sVar16 = (this->weight_data_tm).elemsize;
            local_2d8 = (Allocator *)((long)(_func_int ***)pvVar197 + lVar166 * (long)local_300);
            pvVar196 = (this->weight_data_tm).data;
            iVar195 = 0;
            do {
              if (0 < iVar173) {
                iVar161 = bottom_blob->w;
                pvVar183 = bottom_blob->data;
                sVar17 = bottom_blob->elemsize;
                sVar18 = bottom_blob->cstep;
                pfVar198 = *(float **)(&this->field_0x118 + (long)local_1b0);
                uVar169 = 0;
                iVar194 = local_168._0_4_;
                do {
                  if (lVar187 == 0) {
                    fVar379 = 0.0;
                  }
                  else {
                    fVar379 = *(float *)(lVar187 + (long)local_300 * 4);
                  }
                  if ((int)uVar190 < 1) {
                    auVar336 = ZEXT864(0);
                  }
                  else {
                    auVar336 = ZEXT864(0);
                    uVar171 = 0;
                    pvVar184 = (void *)(sVar15 * (long)local_300 * sVar16 + (long)pvVar196);
                    do {
                      if (0 < (int)uVar176) {
                        uVar181 = 0;
                        uVar186 = 0;
                        do {
                          iVar162 = (((int)uVar186 - uVar176) + 1) * iVar11 + iVar195;
                          if (((-1 < iVar162) &&
                              (iVar163 = iVar162 / iVar172, iVar162 % iVar172 == 0)) &&
                             ((0 < (int)uVar160 && (iVar163 < iVar189)))) {
                            uVar185 = (ulong)uVar160;
                            uVar191 = uVar181;
                            iVar162 = iVar194;
                            do {
                              if (((-1 < iVar162) &&
                                  (iVar164 = iVar162 / iVar175, iVar162 % iVar175 == 0)) &&
                                 (iVar164 < iVar180)) {
                                auVar336 = vfmadd231ps_avx512f(auVar336,*(undefined1 (*) [64])
                                                                         ((long)pvVar183 +
                                                                         (long)(iVar164 << 4) * 4 +
                                                                         (long)iVar163 *
                                                                         (long)iVar161 * sVar17 +
                                                                         sVar18 * sVar17 * uVar171),
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar184 +
                                                                (uVar191 & 0xffffffff) * 4));
                              }
                              uVar191 = uVar191 + 0x10;
                              iVar162 = iVar162 + iVar10;
                              uVar185 = uVar185 - 1;
                            } while (uVar185 != 0);
                          }
                          uVar186 = uVar186 + 1;
                          uVar181 = uVar181 + (ulong)uVar160 * 0x10;
                        } while (uVar186 != uVar176);
                      }
                      pvVar184 = (void *)((long)pvVar184 + (long)(int)(uVar160 * uVar176 * 0x10) * 4
                                         );
                      uVar171 = uVar171 + 1;
                    } while (uVar171 != uVar190);
                  }
                  auVar257 = vextractf64x4_avx512f(auVar336,1);
                  fVar395 = auVar336._4_4_ + auVar257._4_4_;
                  auVar381._0_4_ =
                       auVar336._0_4_ + auVar257._0_4_ + auVar336._16_4_ + auVar257._16_4_;
                  auVar381._4_4_ = fVar395 + fVar395;
                  auVar381._8_4_ =
                       auVar336._8_4_ + auVar257._8_4_ + auVar336._24_4_ + auVar257._24_4_;
                  auVar381._12_4_ =
                       auVar336._12_4_ + auVar257._12_4_ + auVar336._28_4_ + auVar257._28_4_;
                  auVar203 = vshufpd_avx(auVar381,auVar381,1);
                  auVar382._0_4_ = auVar203._0_4_ + auVar381._0_4_;
                  auVar382._4_4_ = auVar203._4_4_ + auVar381._4_4_;
                  auVar382._8_4_ = auVar203._8_4_ + auVar381._8_4_;
                  auVar382._12_4_ = auVar203._12_4_ + auVar381._12_4_;
                  auVar203 = vmovshdup_avx(auVar382);
                  fVar379 = auVar203._0_4_ + fVar379 + auVar382._0_4_;
                  auVar203 = ZEXT416((uint)fVar379);
                  fVar395 = fVar379;
                  switch(uVar12) {
                  case 1:
                    auVar203 = vmaxss_avx(auVar203,ZEXT416(0));
                    fVar395 = auVar203._0_4_;
                    break;
                  case 2:
                    uVar40 = vcmpss_avx512f(auVar203,ZEXT416(0),0xe);
                    bVar199 = (bool)((byte)uVar40 & 1);
                    fVar395 = (float)((uint)bVar199 * 0x3f800000 + (uint)!bVar199 * (int)*pfVar198)
                              * fVar379;
                    break;
                  case 3:
                    auVar203 = vmaxss_avx(auVar203,ZEXT416((uint)*pfVar198));
                    fVar395 = auVar203._0_4_;
                    if (pfVar198[1] < auVar203._0_4_) {
                      fVar395 = pfVar198[1];
                    }
                    break;
                  case 4:
                    auVar203 = vminss_avx(auVar203,SUB6416(ZEXT464(0x42b0c0a5),0));
                    auVar50._8_4_ = 0x80000000;
                    auVar50._0_8_ = 0x8000000080000000;
                    auVar50._12_4_ = 0x80000000;
                    auVar204 = vxorps_avx512vl(auVar203,auVar50);
                    uVar40 = vcmpss_avx512f(auVar203,ZEXT416(0xc2b0c0a5),1);
                    bVar199 = (bool)((byte)uVar40 & 1);
                    fVar379 = expf((float)((uint)bVar199 * 0x42b0c0a5 +
                                          (uint)!bVar199 * auVar204._0_4_));
                    fVar395 = 1.0 / (fVar379 + 1.0);
                    break;
                  case 5:
                    fVar395 = expf(fVar379);
                    fVar395 = logf(fVar395 + 1.0);
                    fVar395 = tanhf(fVar395);
                    fVar395 = fVar395 * fVar379;
                    break;
                  case 6:
                    fVar5 = *pfVar198;
                    auVar49._8_4_ = 0x80000000;
                    auVar49._0_8_ = 0x8000000080000000;
                    auVar49._12_4_ = 0x80000000;
                    auVar204 = vxorps_avx512vl(ZEXT416((uint)pfVar198[1]),auVar49);
                    fVar402 = auVar204._0_4_ / fVar5;
                    fVar395 = 0.0;
                    if ((fVar402 <= fVar379) &&
                       (fVar395 = fVar379, fVar379 <= fVar402 + 1.0 / fVar5)) {
                      auVar203 = vfmadd213ss_fma(ZEXT416((uint)fVar5),auVar203,
                                                 ZEXT416((uint)pfVar198[1]));
                      fVar395 = auVar203._0_4_ * fVar379;
                    }
                  }
                  *(float *)&local_2d8->_vptr_Allocator = fVar395;
                  local_2d8 = (Allocator *)((long)&local_2d8->_vptr_Allocator + 4);
                  uVar169 = uVar169 + 1;
                  iVar194 = iVar194 + 1;
                } while (uVar169 != iVar173);
              }
              iVar195 = iVar195 + 1;
            } while (iVar195 != local_1a8._0_4_);
          }
          local_300 = (_func_int **)((long)local_300 + 1);
        } while (local_300 != (_func_int **)lVar192);
      }
    }
    else {
      local_1d8._4_4_ = local_228.c >> 0x1f;
      local_1d8._0_4_ = uVar190 ^ 8;
      if ((uVar176 == 8 && uVar190 == 8) && (0 < (long)local_228.c)) {
        p_Var168 = pp_Var13[-3];
        iVar10 = *(int *)(&this->field_0xdc + (long)p_Var168);
        iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var168);
        iVar175 = *(int *)(&this->field_0xe4 + (long)p_Var168);
        iVar172 = *(int *)(&this->field_0xe8 + (long)p_Var168);
        iVar180 = *(int *)(&this->field_0x114 + (long)p_Var168);
        lVar192 = *(long *)(&this->field_0x1a8 + (long)p_Var168);
        uVar160 = *(uint *)(&this->field_0xd4 + (long)p_Var168);
        uVar169 = *(uint *)(&this->field_0xd8 + (long)p_Var168);
        local_168._0_4_ = (1 - uVar160) * iVar10;
        local_300 = (_func_int **)0x0;
        auVar399._8_4_ = 0x42b0c0a5;
        auVar399._0_8_ = 0x42b0c0a542b0c0a5;
        auVar399._12_4_ = 0x42b0c0a5;
        auVar399._16_4_ = 0x42b0c0a5;
        auVar399._20_4_ = 0x42b0c0a5;
        auVar399._24_4_ = 0x42b0c0a5;
        auVar399._28_4_ = 0x42b0c0a5;
        auVar406._8_4_ = 0xc2b0c0a5;
        auVar406._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar406._12_4_ = 0xc2b0c0a5;
        auVar406._16_4_ = 0xc2b0c0a5;
        auVar406._20_4_ = 0xc2b0c0a5;
        auVar406._24_4_ = 0xc2b0c0a5;
        auVar406._28_4_ = 0xc2b0c0a5;
        auVar412._8_4_ = 0x3f000000;
        auVar412._0_8_ = 0x3f0000003f000000;
        auVar412._12_4_ = 0x3f000000;
        auVar412._16_4_ = 0x3f000000;
        auVar412._20_4_ = 0x3f000000;
        auVar412._24_4_ = 0x3f000000;
        auVar412._28_4_ = 0x3f000000;
        auVar418._8_4_ = 0x3fb8aa3b;
        auVar418._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar418._12_4_ = 0x3fb8aa3b;
        auVar418._16_4_ = 0x3fb8aa3b;
        auVar418._20_4_ = 0x3fb8aa3b;
        auVar418._24_4_ = 0x3fb8aa3b;
        auVar418._28_4_ = 0x3fb8aa3b;
        auVar424._8_4_ = 0x3f800000;
        auVar424._0_8_ = 0x3f8000003f800000;
        auVar424._12_4_ = 0x3f800000;
        auVar424._16_4_ = 0x3f800000;
        auVar424._20_4_ = 0x3f800000;
        auVar424._24_4_ = 0x3f800000;
        auVar424._28_4_ = 0x3f800000;
        auVar430._8_4_ = 0x3f318000;
        auVar430._0_8_ = 0x3f3180003f318000;
        auVar430._12_4_ = 0x3f318000;
        auVar430._16_4_ = 0x3f318000;
        auVar430._20_4_ = 0x3f318000;
        auVar430._24_4_ = 0x3f318000;
        auVar430._28_4_ = 0x3f318000;
        auVar257 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar489._8_4_ = 0x3ab743ce;
        auVar489._0_8_ = 0x3ab743ce3ab743ce;
        auVar489._12_4_ = 0x3ab743ce;
        auVar489._16_4_ = 0x3ab743ce;
        auVar489._20_4_ = 0x3ab743ce;
        auVar489._24_4_ = 0x3ab743ce;
        auVar489._28_4_ = 0x3ab743ce;
        auVar495._8_4_ = 0x3c088908;
        auVar495._0_8_ = 0x3c0889083c088908;
        auVar495._12_4_ = 0x3c088908;
        auVar495._16_4_ = 0x3c088908;
        auVar495._20_4_ = 0x3c088908;
        auVar495._24_4_ = 0x3c088908;
        auVar495._28_4_ = 0x3c088908;
        auVar501._8_4_ = 0x3d2aa9c1;
        auVar501._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar501._12_4_ = 0x3d2aa9c1;
        auVar501._16_4_ = 0x3d2aa9c1;
        auVar501._20_4_ = 0x3d2aa9c1;
        auVar501._24_4_ = 0x3d2aa9c1;
        auVar501._28_4_ = 0x3d2aa9c1;
        auVar507._8_4_ = 0x3e2aaaaa;
        auVar507._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar507._12_4_ = 0x3e2aaaaa;
        auVar507._16_4_ = 0x3e2aaaaa;
        auVar507._20_4_ = 0x3e2aaaaa;
        auVar507._24_4_ = 0x3e2aaaaa;
        auVar507._28_4_ = 0x3e2aaaaa;
        auVar513._8_4_ = 0x3f800000;
        auVar513._0_8_ = 0x3f8000003f800000;
        auVar513._12_4_ = 0x3f800000;
        auVar513._16_4_ = 0x3f800000;
        auVar513._20_4_ = 0x3f800000;
        auVar513._24_4_ = 0x3f800000;
        auVar513._28_4_ = 0x3f800000;
        auVar519._8_4_ = 0xb95e8083;
        auVar519._0_8_ = 0xb95e8083b95e8083;
        auVar519._12_4_ = 0xb95e8083;
        auVar519._16_4_ = 0xb95e8083;
        auVar519._20_4_ = 0xb95e8083;
        auVar519._24_4_ = 0xb95e8083;
        auVar519._28_4_ = 0xb95e8083;
        auVar258 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar279 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar280 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar281 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar282 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar283 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar284 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar285 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar286 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        do {
          local_1a8._0_4_ = local_228.h;
          if (0 < local_228.h) {
            iVar189 = bottom_blob->w;
            iVar195 = bottom_blob->h;
            pAVar188 = (Allocator *)
                       ((long)(_func_int ***)local_228.data +
                       local_228.cstep * (long)local_300 * local_228.elemsize);
            uVar170 = bottom_blob->c;
            iVar194 = 0;
            do {
              if (0 < local_228.w) {
                uVar174 = 0;
                iVar161 = local_168._0_4_;
                do {
                  if (lVar192 == 0) {
                    auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar336 = ZEXT3264(*(undefined1 (*) [32])(lVar192 + (long)local_300 * 0x20));
                  }
                  if (0 < (int)uVar170) {
                    pvVar197 = (void *)((this->weight_data_tm).cstep * (long)local_300 *
                                        (this->weight_data_tm).elemsize +
                                       (long)(this->weight_data_tm).data);
                    pvVar196 = bottom_blob->data;
                    uVar171 = 0;
                    do {
                      if (0 < (int)uVar169) {
                        uVar181 = 0;
                        uVar186 = 0;
                        do {
                          iVar162 = (((int)uVar186 - uVar169) + 1) * iVar11 + iVar194;
                          if ((((-1 < iVar162) &&
                               (iVar163 = iVar162 / iVar172, iVar162 % iVar172 == 0)) &&
                              (0 < (int)uVar160)) && (iVar163 < iVar195)) {
                            lVar187 = (long)iVar163 * (long)bottom_blob->w * bottom_blob->elemsize +
                                      bottom_blob->cstep * bottom_blob->elemsize * uVar171;
                            uVar185 = (ulong)uVar160;
                            uVar191 = uVar181;
                            iVar162 = iVar161;
                            do {
                              if (((-1 < iVar162) &&
                                  (iVar163 = iVar162 / iVar175, iVar162 % iVar175 == 0)) &&
                                 (iVar163 < iVar189)) {
                                lVar166 = (long)(iVar163 << 3);
                                uVar12 = *(undefined4 *)((long)pvVar196 + lVar166 * 4 + lVar187);
                                auVar450._4_4_ = uVar12;
                                auVar450._0_4_ = uVar12;
                                auVar450._8_4_ = uVar12;
                                auVar450._12_4_ = uVar12;
                                auVar450._16_4_ = uVar12;
                                auVar450._20_4_ = uVar12;
                                auVar450._24_4_ = uVar12;
                                auVar450._28_4_ = uVar12;
                                uVar12 = *(undefined4 *)((long)pvVar196 + lVar166 * 4 + lVar187 + 4)
                                ;
                                auVar477._4_4_ = uVar12;
                                auVar477._0_4_ = uVar12;
                                auVar477._8_4_ = uVar12;
                                auVar477._12_4_ = uVar12;
                                auVar477._16_4_ = uVar12;
                                auVar477._20_4_ = uVar12;
                                auVar477._24_4_ = uVar12;
                                auVar477._28_4_ = uVar12;
                                in_ZMM9 = ZEXT3264(auVar477);
                                auVar287 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar196 +
                                                                       lVar166 * 4 + lVar187 + 8)));
                                in_ZMM16 = ZEXT3264(auVar287);
                                auVar288 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar196 +
                                                                       lVar166 * 4 + lVar187 + 0xc))
                                                     );
                                in_ZMM17 = ZEXT3264(auVar288);
                                auVar289 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar196 +
                                                                       lVar166 * 4 + lVar187 + 0x10)
                                                             ));
                                auVar290 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar196 +
                                                                       lVar166 * 4 + lVar187 + 0x14)
                                                             ));
                                auVar259 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar196 +
                                                                       lVar166 * 4 + lVar187 + 0x18)
                                                             ));
                                auVar260 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar196 +
                                                                       lVar166 * 4 + lVar187 + 0x1c)
                                                             ));
                                uVar201 = uVar191 & 0xffffffff;
                                auVar203 = vfmadd231ps_fma(auVar336._0_32_,auVar450,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar197 + uVar201 * 4));
                                auVar203 = vfmadd231ps_fma(ZEXT1632(auVar203),auVar477,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar197 + uVar201 * 4 + 0x20));
                                auVar287 = vfmadd231ps_avx512vl
                                                     (ZEXT1632(auVar203),auVar287,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar197 + uVar201 * 4 + 0x40));
                                auVar287 = vfmadd231ps_avx512vl
                                                     (auVar287,auVar288,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar197 + uVar201 * 4 + 0x60));
                                auVar287 = vfmadd231ps_avx512vl
                                                     (auVar287,auVar289,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar197 + uVar201 * 4 + 0x80));
                                auVar287 = vfmadd231ps_avx512vl
                                                     (auVar287,auVar290,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar197 + uVar201 * 4 + 0xa0));
                                auVar287 = vfmadd231ps_avx512vl
                                                     (auVar287,auVar259,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar197 + uVar201 * 4 + 0xc0));
                                auVar287 = vfmadd231ps_avx512vl
                                                     (auVar287,auVar260,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar197 + uVar201 * 4 + 0xe0));
                                auVar336 = ZEXT3264(auVar287);
                              }
                              uVar191 = uVar191 + 0x40;
                              iVar162 = iVar162 + iVar10;
                              uVar185 = uVar185 - 1;
                            } while (uVar185 != 0);
                          }
                          uVar186 = uVar186 + 1;
                          uVar181 = uVar181 + (ulong)uVar160 * 0x40;
                        } while (uVar186 != uVar169);
                      }
                      pvVar197 = (void *)((long)pvVar197 + (long)(int)(uVar160 * uVar169 * 0x40) * 4
                                         );
                      uVar171 = uVar171 + 1;
                    } while (uVar171 != uVar170);
                  }
                  auVar287 = auVar336._0_32_;
                  if (iVar180 - 1U < 6) {
                    auVar288 = ZEXT1632(ZEXT816(0) << 0x40);
                    auVar389._28_36_ = auVar336._28_36_;
                    switch(iVar180) {
                    case 1:
                      auVar287 = vmaxps_avx(auVar287,ZEXT1632(ZEXT816(0) << 0x40));
                      break;
                    case 2:
                      auVar289 = vmaxps_avx(auVar287,auVar288);
                      auVar287 = vminps_avx(auVar287,auVar288);
                      uVar12 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                      auVar102._4_4_ = uVar12;
                      auVar102._0_4_ = uVar12;
                      auVar102._8_4_ = uVar12;
                      auVar102._12_4_ = uVar12;
                      auVar102._16_4_ = uVar12;
                      auVar102._20_4_ = uVar12;
                      auVar102._24_4_ = uVar12;
                      auVar102._28_4_ = uVar12;
                      auVar287 = vfmadd132ps_avx512vl(auVar287,auVar289,auVar102);
                      break;
                    case 3:
                      uVar12 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                      auVar100._4_4_ = uVar12;
                      auVar100._0_4_ = uVar12;
                      auVar100._8_4_ = uVar12;
                      auVar100._12_4_ = uVar12;
                      auVar100._16_4_ = uVar12;
                      auVar100._20_4_ = uVar12;
                      auVar100._24_4_ = uVar12;
                      auVar100._28_4_ = uVar12;
                      auVar287 = vmaxps_avx512vl(auVar287,auVar100);
                      uVar12 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var168))[1];
                      auVar101._4_4_ = uVar12;
                      auVar101._0_4_ = uVar12;
                      auVar101._8_4_ = uVar12;
                      auVar101._12_4_ = uVar12;
                      auVar101._16_4_ = uVar12;
                      auVar101._20_4_ = uVar12;
                      auVar101._24_4_ = uVar12;
                      auVar101._28_4_ = uVar12;
                      auVar287 = vminps_avx512vl(auVar287,auVar101);
                      break;
                    case 4:
                      auVar98._8_4_ = 0x80000000;
                      auVar98._0_8_ = 0x8000000080000000;
                      auVar98._12_4_ = 0x80000000;
                      auVar98._16_4_ = 0x80000000;
                      auVar98._20_4_ = 0x80000000;
                      auVar98._24_4_ = 0x80000000;
                      auVar98._28_4_ = 0x80000000;
                      auVar287 = vxorps_avx512vl(auVar287,auVar98);
                      auVar287 = vminps_avx(auVar287,auVar399);
                      auVar287 = vmaxps_avx(auVar287,auVar406);
                      auVar203 = vfmadd231ps_fma(auVar412,auVar287,auVar418);
                      auVar288 = vrndscaleps_avx512vl(ZEXT1632(auVar203),1);
                      uVar171 = vcmpps_avx512vl(ZEXT1632(auVar203),auVar288,1);
                      auVar289 = vsubps_avx512vl(auVar288,auVar424);
                      bVar199 = (bool)((byte)uVar171 & 1);
                      auVar296._0_4_ =
                           (uint)bVar199 * auVar289._0_4_ | (uint)!bVar199 * auVar288._0_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                      auVar296._4_4_ =
                           (uint)bVar199 * auVar289._4_4_ | (uint)!bVar199 * auVar288._4_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                      auVar296._8_4_ =
                           (uint)bVar199 * auVar289._8_4_ | (uint)!bVar199 * auVar288._8_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                      auVar296._12_4_ =
                           (uint)bVar199 * auVar289._12_4_ | (uint)!bVar199 * auVar288._12_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                      auVar296._16_4_ =
                           (uint)bVar199 * auVar289._16_4_ | (uint)!bVar199 * auVar288._16_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                      auVar296._20_4_ =
                           (uint)bVar199 * auVar289._20_4_ | (uint)!bVar199 * auVar288._20_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                      auVar296._24_4_ =
                           (uint)bVar199 * auVar289._24_4_ | (uint)!bVar199 * auVar288._24_4_;
                      bVar199 = SUB81(uVar171 >> 7,0);
                      auVar296._28_4_ =
                           (uint)bVar199 * auVar289._28_4_ | (uint)!bVar199 * auVar288._28_4_;
                      in_ZMM16 = ZEXT3264(auVar296);
                      auVar287 = vfmsub231ps_avx512vl(auVar287,auVar296,auVar430);
                      auVar99._8_4_ = 0x395e8083;
                      auVar99._0_8_ = 0x395e8083395e8083;
                      auVar99._12_4_ = 0x395e8083;
                      auVar99._16_4_ = 0x395e8083;
                      auVar99._20_4_ = 0x395e8083;
                      auVar99._24_4_ = 0x395e8083;
                      auVar99._28_4_ = 0x395e8083;
                      auVar287 = vfmsub231ps_avx512vl(auVar287,auVar296,auVar99);
                      auVar451._0_4_ = auVar287._0_4_ * auVar287._0_4_;
                      auVar451._4_4_ = auVar287._4_4_ * auVar287._4_4_;
                      auVar451._8_4_ = auVar287._8_4_ * auVar287._8_4_;
                      auVar451._12_4_ = auVar287._12_4_ * auVar287._12_4_;
                      auVar451._16_4_ = auVar287._16_4_ * auVar287._16_4_;
                      auVar451._20_4_ = auVar287._20_4_ * auVar287._20_4_;
                      auVar451._24_4_ = auVar287._24_4_ * auVar287._24_4_;
                      auVar451._28_4_ = 0;
                      auVar203 = vfmadd213ps_fma(auVar257,auVar287,auVar489);
                      auVar203 = vfmadd213ps_fma(ZEXT1632(auVar203),auVar287,auVar495);
                      auVar203 = vfmadd213ps_fma(ZEXT1632(auVar203),auVar287,auVar501);
                      auVar203 = vfmadd213ps_fma(ZEXT1632(auVar203),auVar287,auVar507);
                      auVar203 = vfmadd213ps_fma(ZEXT1632(auVar203),auVar287,auVar412);
                      auVar203 = vfmadd213ps_fma(ZEXT1632(auVar203),auVar451,auVar287);
                      in_ZMM9 = ZEXT1664(auVar203);
                      auVar452._0_4_ = auVar203._0_4_ + 1.0;
                      auVar452._4_4_ = auVar203._4_4_ + 1.0;
                      auVar452._8_4_ = auVar203._8_4_ + 1.0;
                      auVar452._12_4_ = auVar203._12_4_ + 1.0;
                      auVar452._16_4_ = 0x3f800000;
                      auVar452._20_4_ = 0x3f800000;
                      auVar452._24_4_ = 0x3f800000;
                      auVar452._28_4_ = 0x3f800000;
                      auVar287 = vcvttps2dq_avx512vl(auVar296);
                      auVar287 = vpslld_avx2(auVar287,0x17);
                      auVar287 = vpaddd_avx2(auVar513,auVar287);
                      auVar203 = vfmadd213ps_fma(auVar287,auVar452,auVar424);
                      auVar287 = vrcpps_avx(ZEXT1632(auVar203));
                      auVar203 = vfmsub213ps_fma(ZEXT1632(auVar203),auVar287,auVar424);
                      auVar203 = vfnmadd132ps_fma(ZEXT1632(auVar203),auVar287,auVar287);
                      auVar287 = ZEXT1632(auVar203);
                      break;
                    case 5:
                      auVar287 = vminps_avx(auVar287,auVar399);
                      auVar287 = vmaxps_avx(auVar287,auVar406);
                      auVar203 = vfmadd213ps_fma(auVar418,auVar287,auVar412);
                      auVar289 = vrndscaleps_avx512vl(ZEXT1632(auVar203),1);
                      uVar171 = vcmpps_avx512vl(ZEXT1632(auVar203),auVar289,1);
                      auVar290 = vsubps_avx512vl(auVar289,auVar424);
                      bVar199 = (bool)((byte)uVar171 & 1);
                      auVar291._0_4_ =
                           (uint)bVar199 * auVar290._0_4_ | (uint)!bVar199 * auVar289._0_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                      auVar291._4_4_ =
                           (uint)bVar199 * auVar290._4_4_ | (uint)!bVar199 * auVar289._4_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                      auVar291._8_4_ =
                           (uint)bVar199 * auVar290._8_4_ | (uint)!bVar199 * auVar289._8_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                      auVar291._12_4_ =
                           (uint)bVar199 * auVar290._12_4_ | (uint)!bVar199 * auVar289._12_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                      auVar291._16_4_ =
                           (uint)bVar199 * auVar290._16_4_ | (uint)!bVar199 * auVar289._16_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                      auVar291._20_4_ =
                           (uint)bVar199 * auVar290._20_4_ | (uint)!bVar199 * auVar289._20_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                      auVar291._24_4_ =
                           (uint)bVar199 * auVar290._24_4_ | (uint)!bVar199 * auVar289._24_4_;
                      bVar199 = SUB81(uVar171 >> 7,0);
                      auVar291._28_4_ =
                           (uint)bVar199 * auVar290._28_4_ | (uint)!bVar199 * auVar289._28_4_;
                      auVar287 = vfmsub231ps_avx512vl(auVar287,auVar291,auVar430);
                      auVar287 = vfnmsub231ps_avx512vl(auVar287,auVar291,auVar519);
                      auVar478._0_4_ = auVar287._0_4_ * auVar287._0_4_;
                      auVar478._4_4_ = auVar287._4_4_ * auVar287._4_4_;
                      auVar478._8_4_ = auVar287._8_4_ * auVar287._8_4_;
                      auVar478._12_4_ = auVar287._12_4_ * auVar287._12_4_;
                      auVar478._16_4_ = auVar287._16_4_ * auVar287._16_4_;
                      auVar478._20_4_ = auVar287._20_4_ * auVar287._20_4_;
                      auVar478._24_4_ = auVar287._24_4_ * auVar287._24_4_;
                      auVar478._28_4_ = 0;
                      auVar289 = vfmadd213ps_avx512vl(auVar257,auVar287,auVar489);
                      auVar289 = vfmadd213ps_avx512vl(auVar289,auVar287,auVar495);
                      auVar289 = vfmadd213ps_avx512vl(auVar289,auVar287,auVar501);
                      auVar289 = vfmadd213ps_avx512vl(auVar289,auVar287,auVar507);
                      auVar289 = vfmadd213ps_avx512vl(auVar289,auVar287,auVar412);
                      auVar287 = vfmadd213ps_avx512vl(auVar289,auVar478,auVar287);
                      auVar289 = vaddps_avx512vl(auVar287,auVar424);
                      auVar287 = vcvttps2dq_avx512vl(auVar291);
                      auVar287 = vpslld_avx2(auVar287,0x17);
                      auVar287 = vpaddd_avx2(auVar287,auVar513);
                      auVar203 = vfmadd213ps_fma(auVar287,auVar289,auVar424);
                      uVar171 = vcmpps_avx512vl(ZEXT1632(auVar203),auVar288,2);
                      auVar92._8_4_ = 0x800000;
                      auVar92._0_8_ = 0x80000000800000;
                      auVar92._12_4_ = 0x800000;
                      auVar92._16_4_ = 0x800000;
                      auVar92._20_4_ = 0x800000;
                      auVar92._24_4_ = 0x800000;
                      auVar92._28_4_ = 0x800000;
                      auVar287 = vmaxps_avx512vl(ZEXT1632(auVar203),auVar92);
                      auVar290 = vpsrld_avx2(auVar287,0x17);
                      auVar288 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                      auVar93._8_4_ = 0x3f000000;
                      auVar93._0_8_ = 0x3f0000003f000000;
                      auVar93._12_4_ = 0x3f000000;
                      auVar93._16_4_ = 0x3f000000;
                      auVar93._20_4_ = 0x3f000000;
                      auVar93._24_4_ = 0x3f000000;
                      auVar93._28_4_ = 0x3f000000;
                      auVar287 = vpternlogd_avx512vl(auVar287,auVar288,auVar93,0xea);
                      auVar94._8_4_ = 0x3f3504f3;
                      auVar94._0_8_ = 0x3f3504f33f3504f3;
                      auVar94._12_4_ = 0x3f3504f3;
                      auVar94._16_4_ = 0x3f3504f3;
                      auVar94._20_4_ = 0x3f3504f3;
                      auVar94._24_4_ = 0x3f3504f3;
                      auVar94._28_4_ = 0x3f3504f3;
                      uVar186 = vcmpps_avx512vl(auVar287,auVar94,1);
                      auVar288 = vaddps_avx512vl(auVar287,auVar258);
                      auVar287 = vaddps_avx512vl(auVar288,auVar287);
                      bVar199 = (bool)((byte)uVar186 & 1);
                      auVar292._0_4_ =
                           (uint)bVar199 * auVar287._0_4_ | (uint)!bVar199 * auVar288._0_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 1) & 1);
                      auVar292._4_4_ =
                           (uint)bVar199 * auVar287._4_4_ | (uint)!bVar199 * auVar288._4_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 2) & 1);
                      auVar292._8_4_ =
                           (uint)bVar199 * auVar287._8_4_ | (uint)!bVar199 * auVar288._8_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 3) & 1);
                      auVar292._12_4_ =
                           (uint)bVar199 * auVar287._12_4_ | (uint)!bVar199 * auVar288._12_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 4) & 1);
                      auVar292._16_4_ =
                           (uint)bVar199 * auVar287._16_4_ | (uint)!bVar199 * auVar288._16_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 5) & 1);
                      auVar292._20_4_ =
                           (uint)bVar199 * auVar287._20_4_ | (uint)!bVar199 * auVar288._20_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 6) & 1);
                      auVar292._24_4_ =
                           (uint)bVar199 * auVar287._24_4_ | (uint)!bVar199 * auVar288._24_4_;
                      bVar199 = SUB81(uVar186 >> 7,0);
                      auVar292._28_4_ =
                           (uint)bVar199 * auVar287._28_4_ | (uint)!bVar199 * auVar288._28_4_;
                      auVar288 = vmulps_avx512vl(auVar292,auVar292);
                      auVar95._8_4_ = 0xbdebd1b8;
                      auVar95._0_8_ = 0xbdebd1b8bdebd1b8;
                      auVar95._12_4_ = 0xbdebd1b8;
                      auVar95._16_4_ = 0xbdebd1b8;
                      auVar95._20_4_ = 0xbdebd1b8;
                      auVar95._24_4_ = 0xbdebd1b8;
                      auVar95._28_4_ = 0xbdebd1b8;
                      auVar287 = vfmadd213ps_avx512vl(auVar279,auVar292,auVar95);
                      auVar96._8_4_ = 0x3def251a;
                      auVar96._0_8_ = 0x3def251a3def251a;
                      auVar96._12_4_ = 0x3def251a;
                      auVar96._16_4_ = 0x3def251a;
                      auVar96._20_4_ = 0x3def251a;
                      auVar96._24_4_ = 0x3def251a;
                      auVar96._28_4_ = 0x3def251a;
                      auVar287 = vfmadd213ps_avx512vl(auVar287,auVar292,auVar96);
                      auVar287 = vfmadd213ps_avx512vl(auVar287,auVar292,auVar280);
                      auVar287 = vfmadd213ps_avx512vl(auVar287,auVar292,auVar281);
                      auVar287 = vfmadd213ps_avx512vl(auVar287,auVar292,auVar282);
                      auVar287 = vfmadd213ps_avx512vl(auVar287,auVar292,auVar283);
                      auVar287 = vfmadd213ps_avx512vl(auVar287,auVar292,auVar284);
                      auVar287 = vfmadd213ps_avx512vl(auVar287,auVar292,auVar285);
                      auVar289 = vmulps_avx512vl(auVar288,auVar292);
                      auVar289 = vmulps_avx512vl(auVar289,auVar287);
                      auVar97._8_4_ = 0xffffff82;
                      auVar97._0_8_ = 0xffffff82ffffff82;
                      auVar97._12_4_ = 0xffffff82;
                      auVar97._16_4_ = 0xffffff82;
                      auVar97._20_4_ = 0xffffff82;
                      auVar97._24_4_ = 0xffffff82;
                      auVar97._28_4_ = 0xffffff82;
                      auVar287 = vpaddd_avx512vl(auVar290,auVar97);
                      auVar287 = vcvtdq2ps_avx(auVar287);
                      auVar290 = vsubps_avx512vl(auVar287,auVar424);
                      bVar199 = (bool)((byte)uVar186 & 1);
                      auVar293._0_4_ =
                           (uint)bVar199 * auVar290._0_4_ | (uint)!bVar199 * auVar287._0_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 1) & 1);
                      auVar293._4_4_ =
                           (uint)bVar199 * auVar290._4_4_ | (uint)!bVar199 * auVar287._4_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 2) & 1);
                      auVar293._8_4_ =
                           (uint)bVar199 * auVar290._8_4_ | (uint)!bVar199 * auVar287._8_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 3) & 1);
                      auVar293._12_4_ =
                           (uint)bVar199 * auVar290._12_4_ | (uint)!bVar199 * auVar287._12_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 4) & 1);
                      auVar293._16_4_ =
                           (uint)bVar199 * auVar290._16_4_ | (uint)!bVar199 * auVar287._16_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 5) & 1);
                      auVar293._20_4_ =
                           (uint)bVar199 * auVar290._20_4_ | (uint)!bVar199 * auVar287._20_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 6) & 1);
                      auVar293._24_4_ =
                           (uint)bVar199 * auVar290._24_4_ | (uint)!bVar199 * auVar287._24_4_;
                      bVar199 = SUB81(uVar186 >> 7,0);
                      auVar293._28_4_ =
                           (uint)bVar199 * auVar290._28_4_ | (uint)!bVar199 * auVar287._28_4_;
                      auVar287 = vfmadd231ps_avx512vl(auVar289,auVar293,auVar519);
                      auVar287 = vfmsub231ps_avx512vl(auVar287,auVar412,auVar288);
                      auVar287 = vsubps_avx512vl(auVar287,auVar292);
                      auVar203 = vfmsub231ps_fma(auVar287,auVar430,auVar293);
                      auVar287 = vmulps_avx512vl(ZEXT1632(auVar203),auVar286);
                      auVar288 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      bVar199 = (bool)((byte)uVar171 & 1);
                      auVar294._0_4_ =
                           (uint)bVar199 * auVar288._0_4_ | (uint)!bVar199 * auVar287._0_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                      auVar294._4_4_ =
                           (uint)bVar199 * auVar288._4_4_ | (uint)!bVar199 * auVar287._4_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                      auVar294._8_4_ =
                           (uint)bVar199 * auVar288._8_4_ | (uint)!bVar199 * auVar287._8_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                      auVar294._12_4_ =
                           (uint)bVar199 * auVar288._12_4_ | (uint)!bVar199 * auVar287._12_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                      auVar294._16_4_ =
                           (uint)bVar199 * auVar288._16_4_ | (uint)!bVar199 * auVar287._16_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                      auVar294._20_4_ =
                           (uint)bVar199 * auVar288._20_4_ | (uint)!bVar199 * auVar287._20_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                      auVar294._24_4_ =
                           (uint)bVar199 * auVar288._24_4_ | (uint)!bVar199 * auVar287._24_4_;
                      bVar199 = SUB81(uVar171 >> 7,0);
                      auVar294._28_4_ =
                           (uint)bVar199 * auVar288._28_4_ | (uint)!bVar199 * auVar287._28_4_;
                      auVar287 = vminps_avx(auVar294,auVar399);
                      auVar287 = vmaxps_avx(auVar287,auVar406);
                      auVar203 = vfmadd213ps_fma(auVar418,auVar287,auVar412);
                      auVar288 = vrndscaleps_avx512vl(ZEXT1632(auVar203),1);
                      uVar171 = vcmpps_avx512vl(ZEXT1632(auVar203),auVar288,1);
                      auVar289 = vsubps_avx512vl(auVar288,auVar424);
                      bVar199 = (bool)((byte)uVar171 & 1);
                      auVar295._0_4_ =
                           (uint)bVar199 * auVar289._0_4_ | (uint)!bVar199 * auVar288._0_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                      auVar295._4_4_ =
                           (uint)bVar199 * auVar289._4_4_ | (uint)!bVar199 * auVar288._4_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                      auVar295._8_4_ =
                           (uint)bVar199 * auVar289._8_4_ | (uint)!bVar199 * auVar288._8_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                      auVar295._12_4_ =
                           (uint)bVar199 * auVar289._12_4_ | (uint)!bVar199 * auVar288._12_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                      auVar295._16_4_ =
                           (uint)bVar199 * auVar289._16_4_ | (uint)!bVar199 * auVar288._16_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                      auVar295._20_4_ =
                           (uint)bVar199 * auVar289._20_4_ | (uint)!bVar199 * auVar288._20_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                      auVar295._24_4_ =
                           (uint)bVar199 * auVar289._24_4_ | (uint)!bVar199 * auVar288._24_4_;
                      bVar199 = SUB81(uVar171 >> 7,0);
                      auVar295._28_4_ =
                           (uint)bVar199 * auVar289._28_4_ | (uint)!bVar199 * auVar288._28_4_;
                      in_ZMM16 = ZEXT3264(auVar295);
                      auVar287 = vfmsub231ps_avx512vl(auVar287,auVar295,auVar430);
                      auVar287 = vfnmsub231ps_avx512vl(auVar287,auVar295,auVar519);
                      auVar479._0_4_ = auVar287._0_4_ * auVar287._0_4_;
                      auVar479._4_4_ = auVar287._4_4_ * auVar287._4_4_;
                      auVar479._8_4_ = auVar287._8_4_ * auVar287._8_4_;
                      auVar479._12_4_ = auVar287._12_4_ * auVar287._12_4_;
                      auVar479._16_4_ = auVar287._16_4_ * auVar287._16_4_;
                      auVar479._20_4_ = auVar287._20_4_ * auVar287._20_4_;
                      auVar479._24_4_ = auVar287._24_4_ * auVar287._24_4_;
                      auVar479._28_4_ = 0;
                      auVar288 = vfmadd213ps_avx512vl(auVar257,auVar287,auVar489);
                      auVar288 = vfmadd213ps_avx512vl(auVar288,auVar287,auVar495);
                      auVar288 = vfmadd213ps_avx512vl(auVar288,auVar287,auVar501);
                      auVar288 = vfmadd213ps_avx512vl(auVar288,auVar287,auVar507);
                      auVar288 = vfmadd213ps_avx512vl(auVar288,auVar287,auVar412);
                      auVar287 = vfmadd213ps_avx512vl(auVar288,auVar479,auVar287);
                      in_ZMM17 = ZEXT3264(auVar287);
                      auVar288 = vaddps_avx512vl(auVar287,auVar424);
                      auVar287 = vcvttps2dq_avx512vl(auVar295);
                      auVar287 = vpslld_avx2(auVar287,0x17);
                      auVar287 = vpaddd_avx2(auVar287,auVar513);
                      auVar203 = vfmadd213ps_fma(auVar287,auVar288,auVar424);
                      auVar287 = vrcpps_avx(ZEXT1632(auVar203));
                      auVar203 = vfmsub213ps_fma(ZEXT1632(auVar203),auVar287,auVar424);
                      auVar203 = vfnmadd132ps_fma(ZEXT1632(auVar203),auVar287,auVar287);
                      auVar287 = vfnmadd213ps_avx512vl(ZEXT1632(auVar203),auVar286,auVar258);
                      in_ZMM9 = ZEXT3264(auVar287);
                      auVar389._0_4_ = auVar287._0_4_ * auVar336._0_4_;
                      auVar389._4_4_ = auVar287._4_4_ * auVar336._4_4_;
                      auVar389._8_4_ = auVar287._8_4_ * auVar336._8_4_;
                      auVar389._12_4_ = auVar287._12_4_ * auVar336._12_4_;
                      auVar389._16_4_ = auVar287._16_4_ * auVar336._16_4_;
                      auVar389._20_4_ = auVar287._20_4_ * auVar336._20_4_;
                      auVar389._24_4_ = auVar287._24_4_ * auVar336._24_4_;
                      auVar287 = auVar389._0_32_;
                      break;
                    case 6:
                      uVar12 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                      auVar453._4_4_ = uVar12;
                      auVar453._0_4_ = uVar12;
                      auVar453._8_4_ = uVar12;
                      auVar453._12_4_ = uVar12;
                      auVar453._16_4_ = uVar12;
                      auVar453._20_4_ = uVar12;
                      auVar453._24_4_ = uVar12;
                      auVar453._28_4_ = uVar12;
                      uVar12 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var168))[1];
                      auVar91._4_4_ = uVar12;
                      auVar91._0_4_ = uVar12;
                      auVar91._8_4_ = uVar12;
                      auVar91._12_4_ = uVar12;
                      auVar91._16_4_ = uVar12;
                      auVar91._20_4_ = uVar12;
                      auVar91._24_4_ = uVar12;
                      auVar91._28_4_ = uVar12;
                      auVar287 = vfmadd213ps_avx512vl(auVar453,auVar287,auVar91);
                      auVar287 = vmaxps_avx(auVar287,auVar288);
                      auVar287 = vminps_avx(auVar287,auVar424);
                      auVar390._0_4_ = auVar287._0_4_ * auVar336._0_4_;
                      auVar390._4_4_ = auVar287._4_4_ * auVar336._4_4_;
                      auVar390._8_4_ = auVar287._8_4_ * auVar336._8_4_;
                      auVar390._12_4_ = auVar287._12_4_ * auVar336._12_4_;
                      auVar390._16_4_ = auVar287._16_4_ * auVar336._16_4_;
                      auVar390._20_4_ = auVar287._20_4_ * auVar336._20_4_;
                      auVar390._24_4_ = auVar287._24_4_ * auVar336._24_4_;
                      auVar390._28_36_ = auVar389._28_36_;
                      auVar287 = auVar390._0_32_;
                    }
                  }
                  *(undefined1 (*) [32])pAVar188 = auVar287;
                  pAVar188 = pAVar188 + 4;
                  uVar174 = uVar174 + 1;
                  iVar161 = iVar161 + 1;
                } while (uVar174 != local_228.w);
              }
              iVar194 = iVar194 + 1;
            } while (iVar194 != local_228.h);
          }
          local_300 = (_func_int **)((long)local_300 + 1);
        } while (local_300 != (_func_int **)(long)local_228.c);
      }
      if ((uVar176 == 4 && (uint)local_1d8 == 0) && (0 < (long)local_228.c)) {
        p_Var168 = pp_Var13[-3];
        iVar10 = *(int *)(&this->field_0xdc + (long)p_Var168);
        iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var168);
        iVar175 = *(int *)(&this->field_0xe4 + (long)p_Var168);
        iVar172 = *(int *)(&this->field_0xe8 + (long)p_Var168);
        iVar180 = *(int *)(&this->field_0x114 + (long)p_Var168);
        lVar192 = *(long *)(&this->field_0x1a8 + (long)p_Var168);
        uVar160 = *(uint *)(&this->field_0xd4 + (long)p_Var168);
        uVar169 = *(uint *)(&this->field_0xd8 + (long)p_Var168);
        iVar189 = (1 - uVar160) * iVar10;
        local_168._0_4_ = iVar189;
        local_300 = (_func_int **)0x0;
        auVar400._8_4_ = 0x42b0c0a5;
        auVar400._0_8_ = 0x42b0c0a542b0c0a5;
        auVar400._12_4_ = 0x42b0c0a5;
        auVar400._16_4_ = 0x42b0c0a5;
        auVar400._20_4_ = 0x42b0c0a5;
        auVar400._24_4_ = 0x42b0c0a5;
        auVar400._28_4_ = 0x42b0c0a5;
        auVar407._8_4_ = 0xc2b0c0a5;
        auVar407._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar407._12_4_ = 0xc2b0c0a5;
        auVar407._16_4_ = 0xc2b0c0a5;
        auVar407._20_4_ = 0xc2b0c0a5;
        auVar407._24_4_ = 0xc2b0c0a5;
        auVar407._28_4_ = 0xc2b0c0a5;
        auVar413._8_4_ = 0x3f000000;
        auVar413._0_8_ = 0x3f0000003f000000;
        auVar413._12_4_ = 0x3f000000;
        auVar413._16_4_ = 0x3f000000;
        auVar413._20_4_ = 0x3f000000;
        auVar413._24_4_ = 0x3f000000;
        auVar413._28_4_ = 0x3f000000;
        auVar419._8_4_ = 0x3fb8aa3b;
        auVar419._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar419._12_4_ = 0x3fb8aa3b;
        auVar419._16_4_ = 0x3fb8aa3b;
        auVar419._20_4_ = 0x3fb8aa3b;
        auVar419._24_4_ = 0x3fb8aa3b;
        auVar419._28_4_ = 0x3fb8aa3b;
        auVar425._8_4_ = 0x3f800000;
        auVar425._0_8_ = 0x3f8000003f800000;
        auVar425._12_4_ = 0x3f800000;
        auVar425._16_4_ = 0x3f800000;
        auVar425._20_4_ = 0x3f800000;
        auVar425._24_4_ = 0x3f800000;
        auVar425._28_4_ = 0x3f800000;
        auVar431._8_4_ = 0x3f318000;
        auVar431._0_8_ = 0x3f3180003f318000;
        auVar431._12_4_ = 0x3f318000;
        auVar431._16_4_ = 0x3f318000;
        auVar431._20_4_ = 0x3f318000;
        auVar431._24_4_ = 0x3f318000;
        auVar431._28_4_ = 0x3f318000;
        auVar257 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar490._8_4_ = 0x3ab743ce;
        auVar490._0_8_ = 0x3ab743ce3ab743ce;
        auVar490._12_4_ = 0x3ab743ce;
        auVar490._16_4_ = 0x3ab743ce;
        auVar490._20_4_ = 0x3ab743ce;
        auVar490._24_4_ = 0x3ab743ce;
        auVar490._28_4_ = 0x3ab743ce;
        auVar496._8_4_ = 0x3c088908;
        auVar496._0_8_ = 0x3c0889083c088908;
        auVar496._12_4_ = 0x3c088908;
        auVar496._16_4_ = 0x3c088908;
        auVar496._20_4_ = 0x3c088908;
        auVar496._24_4_ = 0x3c088908;
        auVar496._28_4_ = 0x3c088908;
        auVar502._8_4_ = 0x3d2aa9c1;
        auVar502._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar502._12_4_ = 0x3d2aa9c1;
        auVar502._16_4_ = 0x3d2aa9c1;
        auVar502._20_4_ = 0x3d2aa9c1;
        auVar502._24_4_ = 0x3d2aa9c1;
        auVar502._28_4_ = 0x3d2aa9c1;
        auVar508._8_4_ = 0x3e2aaaaa;
        auVar508._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar508._12_4_ = 0x3e2aaaaa;
        auVar508._16_4_ = 0x3e2aaaaa;
        auVar508._20_4_ = 0x3e2aaaaa;
        auVar508._24_4_ = 0x3e2aaaaa;
        auVar508._28_4_ = 0x3e2aaaaa;
        auVar514._8_4_ = 0x3f800000;
        auVar514._0_8_ = 0x3f8000003f800000;
        auVar514._12_4_ = 0x3f800000;
        auVar514._16_4_ = 0x3f800000;
        auVar514._20_4_ = 0x3f800000;
        auVar514._24_4_ = 0x3f800000;
        auVar514._28_4_ = 0x3f800000;
        auVar520._8_4_ = 0xb95e8083;
        auVar520._0_8_ = 0xb95e8083b95e8083;
        auVar520._12_4_ = 0xb95e8083;
        auVar520._16_4_ = 0xb95e8083;
        auVar520._20_4_ = 0xb95e8083;
        auVar520._24_4_ = 0xb95e8083;
        auVar520._28_4_ = 0xb95e8083;
        auVar258 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar279 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar280 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar281 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar282 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar283 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar284 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar285 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar286 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar287 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar288 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar289 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        do {
          local_1a8._0_4_ = local_228.h;
          if (0 < local_228.h) {
            iVar195 = bottom_blob->w;
            iVar194 = bottom_blob->h;
            pAVar188 = (Allocator *)
                       ((long)(_func_int ***)local_228.data +
                       local_228.cstep * (long)local_300 * local_228.elemsize);
            uVar170 = bottom_blob->c;
            iVar161 = 0;
            do {
              if (0 < local_228.w) {
                uVar174 = 0;
                iVar162 = iVar189;
                do {
                  if (lVar192 == 0) {
                    auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar336 = ZEXT3264(*(undefined1 (*) [32])(lVar192 + (long)local_300 * 0x20));
                  }
                  if (0 < (int)uVar170) {
                    pvVar197 = (void *)((this->weight_data_tm).cstep * (long)local_300 *
                                        (this->weight_data_tm).elemsize +
                                       (long)(this->weight_data_tm).data);
                    pvVar196 = bottom_blob->data;
                    uVar171 = 0;
                    do {
                      if (0 < (int)uVar169) {
                        uVar186 = 0;
                        uVar181 = 0;
                        do {
                          iVar163 = (((int)uVar181 - uVar169) + 1) * iVar11 + iVar161;
                          if ((((-1 < iVar163) &&
                               (iVar164 = iVar163 / iVar172, iVar163 % iVar172 == 0)) &&
                              (0 < (int)uVar160)) && (iVar164 < iVar194)) {
                            lVar187 = (long)iVar164 * (long)bottom_blob->w * bottom_blob->elemsize +
                                      bottom_blob->cstep * bottom_blob->elemsize * uVar171;
                            uVar185 = (ulong)uVar160;
                            uVar191 = uVar186;
                            iVar163 = iVar162;
                            do {
                              if (((-1 < iVar163) &&
                                  (iVar164 = iVar163 / iVar175, iVar163 % iVar175 == 0)) &&
                                 (iVar164 < iVar195)) {
                                lVar166 = (long)(iVar164 << 2);
                                uVar12 = *(undefined4 *)((long)pvVar196 + lVar166 * 4 + lVar187);
                                auVar454._4_4_ = uVar12;
                                auVar454._0_4_ = uVar12;
                                auVar454._8_4_ = uVar12;
                                auVar454._12_4_ = uVar12;
                                auVar454._16_4_ = uVar12;
                                auVar454._20_4_ = uVar12;
                                auVar454._24_4_ = uVar12;
                                auVar454._28_4_ = uVar12;
                                uVar12 = *(undefined4 *)((long)pvVar196 + lVar166 * 4 + lVar187 + 4)
                                ;
                                auVar480._4_4_ = uVar12;
                                auVar480._0_4_ = uVar12;
                                auVar480._8_4_ = uVar12;
                                auVar480._12_4_ = uVar12;
                                auVar480._16_4_ = uVar12;
                                auVar480._20_4_ = uVar12;
                                auVar480._24_4_ = uVar12;
                                auVar480._28_4_ = uVar12;
                                in_ZMM9 = ZEXT3264(auVar480);
                                auVar290 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar196 +
                                                                       lVar166 * 4 + lVar187 + 8)));
                                in_ZMM16 = ZEXT3264(auVar290);
                                auVar259 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar196 +
                                                                       lVar166 * 4 + lVar187 + 0xc))
                                                     );
                                in_ZMM17 = ZEXT3264(auVar259);
                                uVar201 = uVar191 & 0xffffffff;
                                auVar203 = vfmadd231ps_fma(auVar336._0_32_,auVar454,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar197 + uVar201 * 4));
                                auVar203 = vfmadd231ps_fma(ZEXT1632(auVar203),auVar480,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar197 + uVar201 * 4 + 0x20));
                                auVar290 = vfmadd231ps_avx512vl
                                                     (ZEXT1632(auVar203),auVar290,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar197 + uVar201 * 4 + 0x40));
                                auVar290 = vfmadd231ps_avx512vl
                                                     (auVar290,auVar259,
                                                      *(undefined1 (*) [32])
                                                       ((long)pvVar197 + uVar201 * 4 + 0x60));
                                auVar336 = ZEXT3264(auVar290);
                              }
                              uVar191 = uVar191 + 0x20;
                              iVar163 = iVar163 + iVar10;
                              uVar185 = uVar185 - 1;
                            } while (uVar185 != 0);
                          }
                          uVar181 = uVar181 + 1;
                          uVar186 = uVar186 + (ulong)uVar160 * 0x20;
                        } while (uVar181 != uVar169);
                      }
                      pvVar197 = (void *)((long)pvVar197 + (long)(int)(uVar160 * uVar169 * 0x20) * 4
                                         );
                      uVar171 = uVar171 + 1;
                    } while (uVar171 != uVar170);
                  }
                  auVar290 = auVar336._0_32_;
                  if (iVar180 - 1U < 6) {
                    auVar259 = ZEXT1632(ZEXT816(0) << 0x40);
                    auVar391._28_36_ = auVar336._28_36_;
                    switch(iVar180) {
                    case 1:
                      auVar290 = vmaxps_avx(auVar290,ZEXT1632(ZEXT816(0) << 0x40));
                      break;
                    case 2:
                      auVar260 = vmaxps_avx(auVar290,auVar259);
                      auVar290 = vminps_avx(auVar290,auVar259);
                      uVar12 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                      auVar111._4_4_ = uVar12;
                      auVar111._0_4_ = uVar12;
                      auVar111._8_4_ = uVar12;
                      auVar111._12_4_ = uVar12;
                      auVar111._16_4_ = uVar12;
                      auVar111._20_4_ = uVar12;
                      auVar111._24_4_ = uVar12;
                      auVar111._28_4_ = uVar12;
                      auVar290 = vfmadd132ps_avx512vl(auVar290,auVar260,auVar111);
                      break;
                    case 3:
                      uVar12 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                      auVar109._4_4_ = uVar12;
                      auVar109._0_4_ = uVar12;
                      auVar109._8_4_ = uVar12;
                      auVar109._12_4_ = uVar12;
                      auVar109._16_4_ = uVar12;
                      auVar109._20_4_ = uVar12;
                      auVar109._24_4_ = uVar12;
                      auVar109._28_4_ = uVar12;
                      auVar290 = vmaxps_avx512vl(auVar290,auVar109);
                      uVar12 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var168))[1];
                      auVar110._4_4_ = uVar12;
                      auVar110._0_4_ = uVar12;
                      auVar110._8_4_ = uVar12;
                      auVar110._12_4_ = uVar12;
                      auVar110._16_4_ = uVar12;
                      auVar110._20_4_ = uVar12;
                      auVar110._24_4_ = uVar12;
                      auVar110._28_4_ = uVar12;
                      auVar290 = vminps_avx512vl(auVar290,auVar110);
                      break;
                    case 4:
                      auVar107._8_4_ = 0x80000000;
                      auVar107._0_8_ = 0x8000000080000000;
                      auVar107._12_4_ = 0x80000000;
                      auVar107._16_4_ = 0x80000000;
                      auVar107._20_4_ = 0x80000000;
                      auVar107._24_4_ = 0x80000000;
                      auVar107._28_4_ = 0x80000000;
                      auVar290 = vxorps_avx512vl(auVar290,auVar107);
                      auVar290 = vminps_avx(auVar290,auVar400);
                      auVar290 = vmaxps_avx(auVar290,auVar407);
                      auVar203 = vfmadd231ps_fma(auVar413,auVar290,auVar419);
                      auVar259 = vrndscaleps_avx512vl(ZEXT1632(auVar203),1);
                      uVar171 = vcmpps_avx512vl(ZEXT1632(auVar203),auVar259,1);
                      auVar260 = vsubps_avx512vl(auVar259,auVar425);
                      bVar199 = (bool)((byte)uVar171 & 1);
                      auVar302._0_4_ =
                           (uint)bVar199 * auVar260._0_4_ | (uint)!bVar199 * auVar259._0_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                      auVar302._4_4_ =
                           (uint)bVar199 * auVar260._4_4_ | (uint)!bVar199 * auVar259._4_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                      auVar302._8_4_ =
                           (uint)bVar199 * auVar260._8_4_ | (uint)!bVar199 * auVar259._8_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                      auVar302._12_4_ =
                           (uint)bVar199 * auVar260._12_4_ | (uint)!bVar199 * auVar259._12_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                      auVar302._16_4_ =
                           (uint)bVar199 * auVar260._16_4_ | (uint)!bVar199 * auVar259._16_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                      auVar302._20_4_ =
                           (uint)bVar199 * auVar260._20_4_ | (uint)!bVar199 * auVar259._20_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                      auVar302._24_4_ =
                           (uint)bVar199 * auVar260._24_4_ | (uint)!bVar199 * auVar259._24_4_;
                      bVar199 = SUB81(uVar171 >> 7,0);
                      auVar302._28_4_ =
                           (uint)bVar199 * auVar260._28_4_ | (uint)!bVar199 * auVar259._28_4_;
                      in_ZMM16 = ZEXT3264(auVar302);
                      auVar290 = vfmsub231ps_avx512vl(auVar290,auVar302,auVar431);
                      auVar108._8_4_ = 0x395e8083;
                      auVar108._0_8_ = 0x395e8083395e8083;
                      auVar108._12_4_ = 0x395e8083;
                      auVar108._16_4_ = 0x395e8083;
                      auVar108._20_4_ = 0x395e8083;
                      auVar108._24_4_ = 0x395e8083;
                      auVar108._28_4_ = 0x395e8083;
                      auVar290 = vfmsub231ps_avx512vl(auVar290,auVar302,auVar108);
                      auVar455._0_4_ = auVar290._0_4_ * auVar290._0_4_;
                      auVar455._4_4_ = auVar290._4_4_ * auVar290._4_4_;
                      auVar455._8_4_ = auVar290._8_4_ * auVar290._8_4_;
                      auVar455._12_4_ = auVar290._12_4_ * auVar290._12_4_;
                      auVar455._16_4_ = auVar290._16_4_ * auVar290._16_4_;
                      auVar455._20_4_ = auVar290._20_4_ * auVar290._20_4_;
                      auVar455._24_4_ = auVar290._24_4_ * auVar290._24_4_;
                      auVar455._28_4_ = 0;
                      auVar203 = vfmadd213ps_fma(auVar257,auVar290,auVar490);
                      auVar203 = vfmadd213ps_fma(ZEXT1632(auVar203),auVar290,auVar496);
                      auVar203 = vfmadd213ps_fma(ZEXT1632(auVar203),auVar290,auVar502);
                      auVar203 = vfmadd213ps_fma(ZEXT1632(auVar203),auVar290,auVar508);
                      auVar203 = vfmadd213ps_fma(ZEXT1632(auVar203),auVar290,auVar413);
                      auVar203 = vfmadd213ps_fma(ZEXT1632(auVar203),auVar455,auVar290);
                      in_ZMM9 = ZEXT1664(auVar203);
                      auVar456._0_4_ = auVar203._0_4_ + 1.0;
                      auVar456._4_4_ = auVar203._4_4_ + 1.0;
                      auVar456._8_4_ = auVar203._8_4_ + 1.0;
                      auVar456._12_4_ = auVar203._12_4_ + 1.0;
                      auVar456._16_4_ = 0x3f800000;
                      auVar456._20_4_ = 0x3f800000;
                      auVar456._24_4_ = 0x3f800000;
                      auVar456._28_4_ = 0x3f800000;
                      auVar290 = vcvttps2dq_avx512vl(auVar302);
                      auVar290 = vpslld_avx2(auVar290,0x17);
                      auVar290 = vpaddd_avx2(auVar514,auVar290);
                      auVar203 = vfmadd213ps_fma(auVar290,auVar456,auVar425);
                      auVar290 = vrcpps_avx(ZEXT1632(auVar203));
                      auVar203 = vfmsub213ps_fma(ZEXT1632(auVar203),auVar290,auVar425);
                      auVar203 = vfnmadd132ps_fma(ZEXT1632(auVar203),auVar290,auVar290);
                      auVar290 = ZEXT1632(auVar203);
                      break;
                    case 5:
                      auVar290 = vminps_avx(auVar290,auVar400);
                      auVar290 = vmaxps_avx(auVar290,auVar407);
                      auVar203 = vfmadd213ps_fma(auVar419,auVar290,auVar413);
                      auVar260 = vrndscaleps_avx512vl(ZEXT1632(auVar203),1);
                      uVar171 = vcmpps_avx512vl(ZEXT1632(auVar203),auVar260,1);
                      auVar261 = vsubps_avx512vl(auVar260,auVar425);
                      bVar199 = (bool)((byte)uVar171 & 1);
                      auVar297._0_4_ =
                           (uint)bVar199 * auVar261._0_4_ | (uint)!bVar199 * auVar260._0_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                      auVar297._4_4_ =
                           (uint)bVar199 * auVar261._4_4_ | (uint)!bVar199 * auVar260._4_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                      auVar297._8_4_ =
                           (uint)bVar199 * auVar261._8_4_ | (uint)!bVar199 * auVar260._8_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                      auVar297._12_4_ =
                           (uint)bVar199 * auVar261._12_4_ | (uint)!bVar199 * auVar260._12_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                      auVar297._16_4_ =
                           (uint)bVar199 * auVar261._16_4_ | (uint)!bVar199 * auVar260._16_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                      auVar297._20_4_ =
                           (uint)bVar199 * auVar261._20_4_ | (uint)!bVar199 * auVar260._20_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                      auVar297._24_4_ =
                           (uint)bVar199 * auVar261._24_4_ | (uint)!bVar199 * auVar260._24_4_;
                      bVar199 = SUB81(uVar171 >> 7,0);
                      auVar297._28_4_ =
                           (uint)bVar199 * auVar261._28_4_ | (uint)!bVar199 * auVar260._28_4_;
                      auVar290 = vfmsub231ps_avx512vl(auVar290,auVar297,auVar431);
                      auVar290 = vfnmsub231ps_avx512vl(auVar290,auVar297,auVar520);
                      auVar481._0_4_ = auVar290._0_4_ * auVar290._0_4_;
                      auVar481._4_4_ = auVar290._4_4_ * auVar290._4_4_;
                      auVar481._8_4_ = auVar290._8_4_ * auVar290._8_4_;
                      auVar481._12_4_ = auVar290._12_4_ * auVar290._12_4_;
                      auVar481._16_4_ = auVar290._16_4_ * auVar290._16_4_;
                      auVar481._20_4_ = auVar290._20_4_ * auVar290._20_4_;
                      auVar481._24_4_ = auVar290._24_4_ * auVar290._24_4_;
                      auVar481._28_4_ = 0;
                      auVar260 = vfmadd213ps_avx512vl(auVar257,auVar290,auVar490);
                      auVar260 = vfmadd213ps_avx512vl(auVar260,auVar290,auVar496);
                      auVar260 = vfmadd213ps_avx512vl(auVar260,auVar290,auVar502);
                      auVar260 = vfmadd213ps_avx512vl(auVar260,auVar290,auVar508);
                      auVar260 = vfmadd213ps_avx512vl(auVar260,auVar290,auVar413);
                      auVar290 = vfmadd213ps_avx512vl(auVar260,auVar481,auVar290);
                      auVar260 = vaddps_avx512vl(auVar290,auVar425);
                      auVar290 = vcvttps2dq_avx512vl(auVar297);
                      auVar290 = vpslld_avx2(auVar290,0x17);
                      auVar290 = vpaddd_avx2(auVar290,auVar514);
                      auVar203 = vfmadd213ps_fma(auVar290,auVar260,auVar425);
                      uVar171 = vcmpps_avx512vl(ZEXT1632(auVar203),auVar259,2);
                      auVar104._8_4_ = 0x800000;
                      auVar104._0_8_ = 0x80000000800000;
                      auVar104._12_4_ = 0x800000;
                      auVar104._16_4_ = 0x800000;
                      auVar104._20_4_ = 0x800000;
                      auVar104._24_4_ = 0x800000;
                      auVar104._28_4_ = 0x800000;
                      auVar290 = vmaxps_avx512vl(ZEXT1632(auVar203),auVar104);
                      auVar261 = vpsrld_avx2(auVar290,0x17);
                      auVar259 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                      auVar105._8_4_ = 0x3f000000;
                      auVar105._0_8_ = 0x3f0000003f000000;
                      auVar105._12_4_ = 0x3f000000;
                      auVar105._16_4_ = 0x3f000000;
                      auVar105._20_4_ = 0x3f000000;
                      auVar105._24_4_ = 0x3f000000;
                      auVar105._28_4_ = 0x3f000000;
                      auVar290 = vpternlogd_avx512vl(auVar290,auVar259,auVar105,0xea);
                      uVar186 = vcmpps_avx512vl(auVar290,auVar258,1);
                      auVar259 = vaddps_avx512vl(auVar290,auVar279);
                      auVar290 = vaddps_avx512vl(auVar259,auVar290);
                      bVar199 = (bool)((byte)uVar186 & 1);
                      auVar298._0_4_ =
                           (uint)bVar199 * auVar290._0_4_ | (uint)!bVar199 * auVar259._0_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 1) & 1);
                      auVar298._4_4_ =
                           (uint)bVar199 * auVar290._4_4_ | (uint)!bVar199 * auVar259._4_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 2) & 1);
                      auVar298._8_4_ =
                           (uint)bVar199 * auVar290._8_4_ | (uint)!bVar199 * auVar259._8_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 3) & 1);
                      auVar298._12_4_ =
                           (uint)bVar199 * auVar290._12_4_ | (uint)!bVar199 * auVar259._12_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 4) & 1);
                      auVar298._16_4_ =
                           (uint)bVar199 * auVar290._16_4_ | (uint)!bVar199 * auVar259._16_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 5) & 1);
                      auVar298._20_4_ =
                           (uint)bVar199 * auVar290._20_4_ | (uint)!bVar199 * auVar259._20_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 6) & 1);
                      auVar298._24_4_ =
                           (uint)bVar199 * auVar290._24_4_ | (uint)!bVar199 * auVar259._24_4_;
                      bVar199 = SUB81(uVar186 >> 7,0);
                      auVar298._28_4_ =
                           (uint)bVar199 * auVar290._28_4_ | (uint)!bVar199 * auVar259._28_4_;
                      auVar259 = vmulps_avx512vl(auVar298,auVar298);
                      auVar290 = vfmadd213ps_avx512vl(auVar280,auVar298,auVar281);
                      auVar290 = vfmadd213ps_avx512vl(auVar290,auVar298,auVar282);
                      auVar290 = vfmadd213ps_avx512vl(auVar290,auVar298,auVar283);
                      auVar290 = vfmadd213ps_avx512vl(auVar290,auVar298,auVar284);
                      auVar290 = vfmadd213ps_avx512vl(auVar290,auVar298,auVar285);
                      auVar290 = vfmadd213ps_avx512vl(auVar290,auVar298,auVar286);
                      auVar290 = vfmadd213ps_avx512vl(auVar290,auVar298,auVar287);
                      auVar290 = vfmadd213ps_avx512vl(auVar290,auVar298,auVar288);
                      auVar260 = vmulps_avx512vl(auVar259,auVar298);
                      auVar260 = vmulps_avx512vl(auVar260,auVar290);
                      auVar106._8_4_ = 0xffffff82;
                      auVar106._0_8_ = 0xffffff82ffffff82;
                      auVar106._12_4_ = 0xffffff82;
                      auVar106._16_4_ = 0xffffff82;
                      auVar106._20_4_ = 0xffffff82;
                      auVar106._24_4_ = 0xffffff82;
                      auVar106._28_4_ = 0xffffff82;
                      auVar290 = vpaddd_avx512vl(auVar261,auVar106);
                      auVar290 = vcvtdq2ps_avx(auVar290);
                      auVar261 = vsubps_avx512vl(auVar290,auVar425);
                      bVar199 = (bool)((byte)uVar186 & 1);
                      auVar299._0_4_ =
                           (uint)bVar199 * auVar261._0_4_ | (uint)!bVar199 * auVar290._0_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 1) & 1);
                      auVar299._4_4_ =
                           (uint)bVar199 * auVar261._4_4_ | (uint)!bVar199 * auVar290._4_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 2) & 1);
                      auVar299._8_4_ =
                           (uint)bVar199 * auVar261._8_4_ | (uint)!bVar199 * auVar290._8_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 3) & 1);
                      auVar299._12_4_ =
                           (uint)bVar199 * auVar261._12_4_ | (uint)!bVar199 * auVar290._12_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 4) & 1);
                      auVar299._16_4_ =
                           (uint)bVar199 * auVar261._16_4_ | (uint)!bVar199 * auVar290._16_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 5) & 1);
                      auVar299._20_4_ =
                           (uint)bVar199 * auVar261._20_4_ | (uint)!bVar199 * auVar290._20_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 6) & 1);
                      auVar299._24_4_ =
                           (uint)bVar199 * auVar261._24_4_ | (uint)!bVar199 * auVar290._24_4_;
                      bVar199 = SUB81(uVar186 >> 7,0);
                      auVar299._28_4_ =
                           (uint)bVar199 * auVar261._28_4_ | (uint)!bVar199 * auVar290._28_4_;
                      auVar290 = vfmadd231ps_avx512vl(auVar260,auVar299,auVar520);
                      auVar290 = vfmsub231ps_avx512vl(auVar290,auVar413,auVar259);
                      auVar290 = vsubps_avx512vl(auVar290,auVar298);
                      auVar203 = vfmsub231ps_fma(auVar290,auVar431,auVar299);
                      auVar290 = vmulps_avx512vl(ZEXT1632(auVar203),auVar289);
                      auVar259 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      bVar199 = (bool)((byte)uVar171 & 1);
                      auVar300._0_4_ =
                           (uint)bVar199 * auVar259._0_4_ | (uint)!bVar199 * auVar290._0_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                      auVar300._4_4_ =
                           (uint)bVar199 * auVar259._4_4_ | (uint)!bVar199 * auVar290._4_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                      auVar300._8_4_ =
                           (uint)bVar199 * auVar259._8_4_ | (uint)!bVar199 * auVar290._8_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                      auVar300._12_4_ =
                           (uint)bVar199 * auVar259._12_4_ | (uint)!bVar199 * auVar290._12_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                      auVar300._16_4_ =
                           (uint)bVar199 * auVar259._16_4_ | (uint)!bVar199 * auVar290._16_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                      auVar300._20_4_ =
                           (uint)bVar199 * auVar259._20_4_ | (uint)!bVar199 * auVar290._20_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                      auVar300._24_4_ =
                           (uint)bVar199 * auVar259._24_4_ | (uint)!bVar199 * auVar290._24_4_;
                      bVar199 = SUB81(uVar171 >> 7,0);
                      auVar300._28_4_ =
                           (uint)bVar199 * auVar259._28_4_ | (uint)!bVar199 * auVar290._28_4_;
                      auVar290 = vminps_avx(auVar300,auVar400);
                      auVar290 = vmaxps_avx(auVar290,auVar407);
                      auVar203 = vfmadd213ps_fma(auVar419,auVar290,auVar413);
                      auVar259 = vrndscaleps_avx512vl(ZEXT1632(auVar203),1);
                      uVar171 = vcmpps_avx512vl(ZEXT1632(auVar203),auVar259,1);
                      auVar260 = vsubps_avx512vl(auVar259,auVar425);
                      bVar199 = (bool)((byte)uVar171 & 1);
                      auVar301._0_4_ =
                           (uint)bVar199 * auVar260._0_4_ | (uint)!bVar199 * auVar259._0_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                      auVar301._4_4_ =
                           (uint)bVar199 * auVar260._4_4_ | (uint)!bVar199 * auVar259._4_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                      auVar301._8_4_ =
                           (uint)bVar199 * auVar260._8_4_ | (uint)!bVar199 * auVar259._8_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                      auVar301._12_4_ =
                           (uint)bVar199 * auVar260._12_4_ | (uint)!bVar199 * auVar259._12_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                      auVar301._16_4_ =
                           (uint)bVar199 * auVar260._16_4_ | (uint)!bVar199 * auVar259._16_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                      auVar301._20_4_ =
                           (uint)bVar199 * auVar260._20_4_ | (uint)!bVar199 * auVar259._20_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                      auVar301._24_4_ =
                           (uint)bVar199 * auVar260._24_4_ | (uint)!bVar199 * auVar259._24_4_;
                      bVar199 = SUB81(uVar171 >> 7,0);
                      auVar301._28_4_ =
                           (uint)bVar199 * auVar260._28_4_ | (uint)!bVar199 * auVar259._28_4_;
                      in_ZMM16 = ZEXT3264(auVar301);
                      auVar290 = vfmsub231ps_avx512vl(auVar290,auVar301,auVar431);
                      auVar290 = vfnmsub231ps_avx512vl(auVar290,auVar301,auVar520);
                      auVar482._0_4_ = auVar290._0_4_ * auVar290._0_4_;
                      auVar482._4_4_ = auVar290._4_4_ * auVar290._4_4_;
                      auVar482._8_4_ = auVar290._8_4_ * auVar290._8_4_;
                      auVar482._12_4_ = auVar290._12_4_ * auVar290._12_4_;
                      auVar482._16_4_ = auVar290._16_4_ * auVar290._16_4_;
                      auVar482._20_4_ = auVar290._20_4_ * auVar290._20_4_;
                      auVar482._24_4_ = auVar290._24_4_ * auVar290._24_4_;
                      auVar482._28_4_ = 0;
                      auVar259 = vfmadd213ps_avx512vl(auVar257,auVar290,auVar490);
                      auVar259 = vfmadd213ps_avx512vl(auVar259,auVar290,auVar496);
                      auVar259 = vfmadd213ps_avx512vl(auVar259,auVar290,auVar502);
                      auVar259 = vfmadd213ps_avx512vl(auVar259,auVar290,auVar508);
                      auVar259 = vfmadd213ps_avx512vl(auVar259,auVar290,auVar413);
                      auVar290 = vfmadd213ps_avx512vl(auVar259,auVar482,auVar290);
                      in_ZMM17 = ZEXT3264(auVar290);
                      auVar259 = vaddps_avx512vl(auVar290,auVar425);
                      auVar290 = vcvttps2dq_avx512vl(auVar301);
                      auVar290 = vpslld_avx2(auVar290,0x17);
                      auVar290 = vpaddd_avx2(auVar290,auVar514);
                      auVar203 = vfmadd213ps_fma(auVar290,auVar259,auVar425);
                      auVar290 = vrcpps_avx(ZEXT1632(auVar203));
                      auVar203 = vfmsub213ps_fma(ZEXT1632(auVar203),auVar290,auVar425);
                      auVar203 = vfnmadd132ps_fma(ZEXT1632(auVar203),auVar290,auVar290);
                      auVar290 = vfnmadd213ps_avx512vl(ZEXT1632(auVar203),auVar289,auVar279);
                      in_ZMM9 = ZEXT3264(auVar290);
                      auVar391._0_4_ = auVar290._0_4_ * auVar336._0_4_;
                      auVar391._4_4_ = auVar290._4_4_ * auVar336._4_4_;
                      auVar391._8_4_ = auVar290._8_4_ * auVar336._8_4_;
                      auVar391._12_4_ = auVar290._12_4_ * auVar336._12_4_;
                      auVar391._16_4_ = auVar290._16_4_ * auVar336._16_4_;
                      auVar391._20_4_ = auVar290._20_4_ * auVar336._20_4_;
                      auVar391._24_4_ = auVar290._24_4_ * auVar336._24_4_;
                      auVar290 = auVar391._0_32_;
                      break;
                    case 6:
                      uVar12 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                      auVar457._4_4_ = uVar12;
                      auVar457._0_4_ = uVar12;
                      auVar457._8_4_ = uVar12;
                      auVar457._12_4_ = uVar12;
                      auVar457._16_4_ = uVar12;
                      auVar457._20_4_ = uVar12;
                      auVar457._24_4_ = uVar12;
                      auVar457._28_4_ = uVar12;
                      uVar12 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var168))[1];
                      auVar103._4_4_ = uVar12;
                      auVar103._0_4_ = uVar12;
                      auVar103._8_4_ = uVar12;
                      auVar103._12_4_ = uVar12;
                      auVar103._16_4_ = uVar12;
                      auVar103._20_4_ = uVar12;
                      auVar103._24_4_ = uVar12;
                      auVar103._28_4_ = uVar12;
                      auVar290 = vfmadd213ps_avx512vl(auVar457,auVar290,auVar103);
                      auVar290 = vmaxps_avx(auVar290,auVar259);
                      auVar290 = vminps_avx(auVar290,auVar425);
                      auVar392._0_4_ = auVar290._0_4_ * auVar336._0_4_;
                      auVar392._4_4_ = auVar290._4_4_ * auVar336._4_4_;
                      auVar392._8_4_ = auVar290._8_4_ * auVar336._8_4_;
                      auVar392._12_4_ = auVar290._12_4_ * auVar336._12_4_;
                      auVar392._16_4_ = auVar290._16_4_ * auVar336._16_4_;
                      auVar392._20_4_ = auVar290._20_4_ * auVar336._20_4_;
                      auVar392._24_4_ = auVar290._24_4_ * auVar336._24_4_;
                      auVar392._28_36_ = auVar391._28_36_;
                      auVar290 = auVar392._0_32_;
                    }
                  }
                  *(undefined1 (*) [32])pAVar188 = auVar290;
                  pAVar188 = pAVar188 + 4;
                  uVar174 = uVar174 + 1;
                  iVar162 = iVar162 + 1;
                } while (uVar174 != local_228.w);
              }
              iVar161 = iVar161 + 1;
            } while (iVar161 != local_228.h);
          }
          local_300 = (_func_int **)((long)local_300 + 1);
        } while (local_300 != (_func_int **)(long)local_228.c);
      }
      local_1b8 = uVar190 ^ 4;
      if ((uVar176 == 8 && local_1b8 == 0) && (0 < (long)local_228.c)) {
        p_Var168 = pp_Var13[-3];
        iVar10 = *(int *)(&this->field_0xdc + (long)p_Var168);
        iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var168);
        iVar175 = *(int *)(&this->field_0xe4 + (long)p_Var168);
        iVar172 = *(int *)(&this->field_0xe8 + (long)p_Var168);
        uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var168);
        lVar192 = *(long *)(&this->field_0x1a8 + (long)p_Var168);
        uVar160 = *(uint *)(&this->field_0xd4 + (long)p_Var168);
        uVar169 = *(uint *)(&this->field_0xd8 + (long)p_Var168);
        iVar180 = (1 - uVar160) * iVar10;
        local_168._0_4_ = iVar180;
        local_300 = (_func_int **)0x0;
        auVar244 = ZEXT816(0) << 0x40;
        auVar396._8_4_ = 0x42b0c0a5;
        auVar396._0_8_ = 0x42b0c0a542b0c0a5;
        auVar396._12_4_ = 0x42b0c0a5;
        auVar403._8_4_ = 0xc2b0c0a5;
        auVar403._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar403._12_4_ = 0xc2b0c0a5;
        auVar409._8_4_ = 0x3f000000;
        auVar409._0_8_ = 0x3f0000003f000000;
        auVar409._12_4_ = 0x3f000000;
        auVar415._8_4_ = 0x3fb8aa3b;
        auVar415._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar415._12_4_ = 0x3fb8aa3b;
        auVar421._8_4_ = 0x3f800000;
        auVar421._0_8_ = 0x3f8000003f800000;
        auVar421._12_4_ = 0x3f800000;
        auVar427._8_4_ = 0x3f318000;
        auVar427._0_8_ = 0x3f3180003f318000;
        auVar427._12_4_ = 0x3f318000;
        auVar203 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar486._8_4_ = 0x3ab743ce;
        auVar486._0_8_ = 0x3ab743ce3ab743ce;
        auVar486._12_4_ = 0x3ab743ce;
        auVar492._8_4_ = 0x3c088908;
        auVar492._0_8_ = 0x3c0889083c088908;
        auVar492._12_4_ = 0x3c088908;
        auVar498._8_4_ = 0x3d2aa9c1;
        auVar498._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar498._12_4_ = 0x3d2aa9c1;
        auVar504._8_4_ = 0x3e2aaaaa;
        auVar504._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar504._12_4_ = 0x3e2aaaaa;
        auVar510._8_4_ = 0x3f800000;
        auVar510._0_8_ = 0x3f8000003f800000;
        auVar510._12_4_ = 0x3f800000;
        auVar516._8_4_ = 0xb95e8083;
        auVar516._0_8_ = 0xb95e8083b95e8083;
        auVar516._12_4_ = 0xb95e8083;
        auVar204 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar205 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar226 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar227 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar228 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar229 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar230 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar231 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar232 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        do {
          local_1a8._0_4_ = local_228.h;
          if (0 < local_228.h) {
            iVar189 = bottom_blob->w;
            iVar195 = bottom_blob->h;
            pAVar188 = (Allocator *)
                       ((long)(_func_int ***)local_228.data +
                       local_228.cstep * (long)local_300 * local_228.elemsize);
            uVar170 = bottom_blob->c;
            iVar194 = 0;
            do {
              if (0 < local_228.w) {
                uVar174 = 0;
                iVar161 = iVar180;
                do {
                  if (lVar192 == 0) {
                    auVar237 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar237 = *(undefined1 (*) [16])(lVar192 + (long)local_300 * 0x10);
                  }
                  auVar336 = ZEXT1664(auVar237);
                  if (0 < (int)uVar170) {
                    pvVar197 = (void *)((this->weight_data_tm).cstep * (long)local_300 *
                                        (this->weight_data_tm).elemsize +
                                       (long)(this->weight_data_tm).data);
                    pvVar196 = bottom_blob->data;
                    uVar171 = 0;
                    do {
                      if (0 < (int)uVar169) {
                        uVar181 = 0;
                        uVar186 = 0;
                        do {
                          iVar162 = (((int)uVar186 - uVar169) + 1) * iVar11 + iVar194;
                          if ((((-1 < iVar162) &&
                               (iVar163 = iVar162 / iVar172, iVar162 % iVar172 == 0)) &&
                              (0 < (int)uVar160)) && (iVar163 < iVar195)) {
                            lVar187 = (long)iVar163 * (long)bottom_blob->w * bottom_blob->elemsize +
                                      bottom_blob->cstep * bottom_blob->elemsize * uVar171;
                            uVar185 = uVar181;
                            uVar191 = (ulong)uVar160;
                            iVar162 = iVar161;
                            do {
                              if (((-1 < iVar162) &&
                                  (iVar163 = iVar162 / iVar175, iVar162 % iVar175 == 0)) &&
                                 (iVar163 < iVar189)) {
                                lVar166 = (long)(iVar163 << 3);
                                uVar4 = *(undefined4 *)((long)pvVar196 + lVar166 * 4 + lVar187);
                                auVar436._4_4_ = uVar4;
                                auVar436._0_4_ = uVar4;
                                auVar436._8_4_ = uVar4;
                                auVar436._12_4_ = uVar4;
                                uVar4 = *(undefined4 *)((long)pvVar196 + lVar166 * 4 + lVar187 + 4);
                                auVar465._4_4_ = uVar4;
                                auVar465._0_4_ = uVar4;
                                auVar465._8_4_ = uVar4;
                                auVar465._12_4_ = uVar4;
                                in_ZMM9 = ZEXT1664(auVar465);
                                auVar233 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar196 +
                                                                       lVar166 * 4 + lVar187 + 8)));
                                in_ZMM16 = ZEXT1664(auVar233);
                                auVar234 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar196 +
                                                                       lVar166 * 4 + lVar187 + 0xc))
                                                     );
                                in_ZMM17 = ZEXT1664(auVar234);
                                auVar235 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar196 +
                                                                       lVar166 * 4 + lVar187 + 0x10)
                                                             ));
                                auVar236 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar196 +
                                                                       lVar166 * 4 + lVar187 + 0x14)
                                                             ));
                                auVar206 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar196 +
                                                                       lVar166 * 4 + lVar187 + 0x18)
                                                             ));
                                auVar207 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar196 +
                                                                       lVar166 * 4 + lVar187 + 0x1c)
                                                             ));
                                uVar201 = uVar185 & 0xffffffff;
                                auVar237 = vfmadd231ps_fma(auVar336._0_16_,auVar436,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar197 + uVar201 * 4));
                                auVar237 = vfmadd231ps_fma(auVar237,auVar465,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar197 + uVar201 * 4 + 0x10));
                                auVar237 = vfmadd231ps_avx512vl
                                                     (auVar237,auVar233,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar197 + uVar201 * 4 + 0x20));
                                auVar237 = vfmadd231ps_avx512vl
                                                     (auVar237,auVar234,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar197 + uVar201 * 4 + 0x30));
                                auVar237 = vfmadd231ps_avx512vl
                                                     (auVar237,auVar235,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar197 + uVar201 * 4 + 0x40));
                                auVar237 = vfmadd231ps_avx512vl
                                                     (auVar237,auVar236,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar197 + uVar201 * 4 + 0x50));
                                auVar237 = vfmadd231ps_avx512vl
                                                     (auVar237,auVar206,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar197 + uVar201 * 4 + 0x60));
                                auVar237 = vfmadd231ps_avx512vl
                                                     (auVar237,auVar207,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar197 + uVar201 * 4 + 0x70));
                                auVar336 = ZEXT1664(auVar237);
                              }
                              uVar185 = uVar185 + 0x20;
                              iVar162 = iVar162 + iVar10;
                              uVar191 = uVar191 - 1;
                            } while (uVar191 != 0);
                          }
                          uVar186 = uVar186 + 1;
                          uVar181 = uVar181 + (ulong)uVar160 * 0x20;
                        } while (uVar186 != uVar169);
                      }
                      auVar237 = auVar336._0_16_;
                      pvVar197 = (void *)((long)pvVar197 + (long)(int)(uVar160 * uVar169 * 0x20) * 4
                                         );
                      uVar171 = uVar171 + 1;
                    } while (uVar171 != uVar170);
                  }
                  switch(uVar12) {
                  case 1:
                    auVar237 = vmaxps_avx(auVar237,auVar244);
                    break;
                  case 2:
                    auVar233 = vmaxps_avx(auVar237,auVar244);
                    auVar237 = vminps_avx(auVar237,auVar244);
                    uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                    auVar62._4_4_ = uVar4;
                    auVar62._0_4_ = uVar4;
                    auVar62._8_4_ = uVar4;
                    auVar62._12_4_ = uVar4;
                    auVar237 = vfmadd132ps_avx512vl(auVar237,auVar233,auVar62);
                    break;
                  case 3:
                    uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                    auVar60._4_4_ = uVar4;
                    auVar60._0_4_ = uVar4;
                    auVar60._8_4_ = uVar4;
                    auVar60._12_4_ = uVar4;
                    auVar237 = vmaxps_avx512vl(auVar237,auVar60);
                    uVar4 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var168))[1];
                    auVar61._4_4_ = uVar4;
                    auVar61._0_4_ = uVar4;
                    auVar61._8_4_ = uVar4;
                    auVar61._12_4_ = uVar4;
                    auVar237 = vminps_avx512vl(auVar237,auVar61);
                    break;
                  case 4:
                    auVar58._8_4_ = 0x80000000;
                    auVar58._0_8_ = 0x8000000080000000;
                    auVar58._12_4_ = 0x80000000;
                    auVar237 = vxorps_avx512vl(auVar237,auVar58);
                    auVar237 = vminps_avx(auVar237,auVar396);
                    auVar237 = vmaxps_avx(auVar237,auVar403);
                    auVar233 = vfmadd231ps_fma(auVar409,auVar237,auVar415);
                    auVar234 = vcvttps2dq_avx512vl(auVar233);
                    auVar234 = vcvtdq2ps_avx512vl(auVar234);
                    uVar171 = vcmpps_avx512vl(auVar233,auVar234,1);
                    auVar233 = vsubps_avx512vl(auVar234,auVar421);
                    bVar199 = (bool)((byte)uVar171 & 1);
                    auVar243._0_4_ =
                         (uint)bVar199 * auVar233._0_4_ | (uint)!bVar199 * auVar234._0_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                    auVar243._4_4_ =
                         (uint)bVar199 * auVar233._4_4_ | (uint)!bVar199 * auVar234._4_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                    auVar243._8_4_ =
                         (uint)bVar199 * auVar233._8_4_ | (uint)!bVar199 * auVar234._8_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                    auVar243._12_4_ =
                         (uint)bVar199 * auVar233._12_4_ | (uint)!bVar199 * auVar234._12_4_;
                    in_ZMM16 = ZEXT1664(auVar243);
                    auVar237 = vfmsub231ps_avx512vl(auVar237,auVar243,auVar427);
                    auVar59._8_4_ = 0x395e8083;
                    auVar59._0_8_ = 0x395e8083395e8083;
                    auVar59._12_4_ = 0x395e8083;
                    auVar233 = vfmsub231ps_avx512vl(auVar237,auVar243,auVar59);
                    auVar437._0_4_ = auVar233._0_4_ * auVar233._0_4_;
                    auVar437._4_4_ = auVar233._4_4_ * auVar233._4_4_;
                    auVar437._8_4_ = auVar233._8_4_ * auVar233._8_4_;
                    auVar437._12_4_ = auVar233._12_4_ * auVar233._12_4_;
                    auVar237 = vfmadd213ps_fma(auVar203,auVar233,auVar486);
                    auVar237 = vfmadd213ps_fma(auVar237,auVar233,auVar492);
                    auVar237 = vfmadd213ps_fma(auVar237,auVar233,auVar498);
                    auVar237 = vfmadd213ps_fma(auVar237,auVar233,auVar504);
                    auVar237 = vfmadd213ps_fma(auVar237,auVar233,auVar409);
                    auVar237 = vfmadd213ps_fma(auVar237,auVar437,auVar233);
                    in_ZMM9 = ZEXT1664(auVar237);
                    auVar438._0_4_ = auVar237._0_4_ + 1.0;
                    auVar438._4_4_ = auVar237._4_4_ + 1.0;
                    auVar438._8_4_ = auVar237._8_4_ + 1.0;
                    auVar438._12_4_ = auVar237._12_4_ + 1.0;
                    auVar237 = vcvttps2dq_avx512vl(auVar243);
                    auVar237 = vpslld_avx(auVar237,0x17);
                    auVar237 = vpaddd_avx(auVar510,auVar237);
                    auVar233 = vfmadd213ps_fma(auVar237,auVar438,auVar421);
                    auVar237 = vrcpps_avx(auVar233);
                    auVar233 = vfmsub213ps_fma(auVar233,auVar237,auVar421);
                    auVar237 = vfnmadd132ps_fma(auVar233,auVar237,auVar237);
                    break;
                  case 5:
                    auVar233 = vminps_avx(auVar237,auVar396);
                    auVar233 = vmaxps_avx(auVar233,auVar403);
                    auVar234 = vfmadd213ps_fma(auVar415,auVar233,auVar409);
                    auVar235 = vcvttps2dq_avx512vl(auVar234);
                    auVar235 = vcvtdq2ps_avx512vl(auVar235);
                    uVar171 = vcmpps_avx512vl(auVar234,auVar235,1);
                    auVar234 = vsubps_avx512vl(auVar235,auVar421);
                    bVar199 = (bool)((byte)uVar171 & 1);
                    auVar238._0_4_ =
                         (uint)bVar199 * auVar234._0_4_ | (uint)!bVar199 * auVar235._0_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                    auVar238._4_4_ =
                         (uint)bVar199 * auVar234._4_4_ | (uint)!bVar199 * auVar235._4_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                    auVar238._8_4_ =
                         (uint)bVar199 * auVar234._8_4_ | (uint)!bVar199 * auVar235._8_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                    auVar238._12_4_ =
                         (uint)bVar199 * auVar234._12_4_ | (uint)!bVar199 * auVar235._12_4_;
                    auVar233 = vfmsub231ps_avx512vl(auVar233,auVar238,auVar427);
                    auVar233 = vfnmsub231ps_avx512vl(auVar233,auVar238,auVar516);
                    auVar466._0_4_ = auVar233._0_4_ * auVar233._0_4_;
                    auVar466._4_4_ = auVar233._4_4_ * auVar233._4_4_;
                    auVar466._8_4_ = auVar233._8_4_ * auVar233._8_4_;
                    auVar466._12_4_ = auVar233._12_4_ * auVar233._12_4_;
                    auVar234 = vfmadd213ps_avx512vl(auVar203,auVar233,auVar486);
                    auVar234 = vfmadd213ps_avx512vl(auVar234,auVar233,auVar492);
                    auVar234 = vfmadd213ps_avx512vl(auVar234,auVar233,auVar498);
                    auVar234 = vfmadd213ps_avx512vl(auVar234,auVar233,auVar504);
                    auVar234 = vfmadd213ps_avx512vl(auVar234,auVar233,auVar409);
                    auVar233 = vfmadd213ps_avx512vl(auVar234,auVar466,auVar233);
                    auVar234 = vaddps_avx512vl(auVar233,auVar421);
                    auVar233 = vcvttps2dq_avx512vl(auVar238);
                    auVar233 = vpslld_avx(auVar233,0x17);
                    auVar233 = vpaddd_avx(auVar233,auVar510);
                    auVar233 = vfmadd213ps_fma(auVar233,auVar234,auVar421);
                    uVar171 = vcmpps_avx512vl(auVar233,auVar244,2);
                    auVar52._8_4_ = 0x800000;
                    auVar52._0_8_ = 0x80000000800000;
                    auVar52._12_4_ = 0x800000;
                    auVar233 = vmaxps_avx512vl(auVar233,auVar52);
                    auVar236 = vpsrld_avx(auVar233,0x17);
                    auVar234 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar53._8_4_ = 0x3f000000;
                    auVar53._0_8_ = 0x3f0000003f000000;
                    auVar53._12_4_ = 0x3f000000;
                    auVar233 = vpternlogd_avx512vl(auVar233,auVar234,auVar53,0xea);
                    auVar54._8_4_ = 0x3f3504f3;
                    auVar54._0_8_ = 0x3f3504f33f3504f3;
                    auVar54._12_4_ = 0x3f3504f3;
                    uVar186 = vcmpps_avx512vl(auVar233,auVar54,1);
                    auVar55._8_4_ = 0xbf800000;
                    auVar55._0_8_ = 0xbf800000bf800000;
                    auVar55._12_4_ = 0xbf800000;
                    auVar234 = vaddps_avx512vl(auVar233,auVar55);
                    auVar233 = vaddps_avx512vl(auVar234,auVar233);
                    bVar199 = (bool)((byte)uVar186 & 1);
                    auVar239._0_4_ =
                         (uint)bVar199 * auVar233._0_4_ | (uint)!bVar199 * auVar234._0_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 1) & 1);
                    auVar239._4_4_ =
                         (uint)bVar199 * auVar233._4_4_ | (uint)!bVar199 * auVar234._4_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 2) & 1);
                    auVar239._8_4_ =
                         (uint)bVar199 * auVar233._8_4_ | (uint)!bVar199 * auVar234._8_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 3) & 1);
                    auVar239._12_4_ =
                         (uint)bVar199 * auVar233._12_4_ | (uint)!bVar199 * auVar234._12_4_;
                    auVar234 = vmulps_avx512vl(auVar239,auVar239);
                    auVar56._8_4_ = 0xbdebd1b8;
                    auVar56._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar56._12_4_ = 0xbdebd1b8;
                    auVar233 = vfmadd213ps_avx512vl(auVar204,auVar239,auVar56);
                    auVar233 = vfmadd213ps_avx512vl(auVar233,auVar239,auVar205);
                    auVar233 = vfmadd213ps_avx512vl(auVar233,auVar239,auVar226);
                    auVar233 = vfmadd213ps_avx512vl(auVar233,auVar239,auVar227);
                    auVar233 = vfmadd213ps_avx512vl(auVar233,auVar239,auVar228);
                    auVar233 = vfmadd213ps_avx512vl(auVar233,auVar239,auVar229);
                    auVar233 = vfmadd213ps_avx512vl(auVar233,auVar239,auVar230);
                    auVar233 = vfmadd213ps_avx512vl(auVar233,auVar239,auVar231);
                    auVar235 = vmulps_avx512vl(auVar234,auVar239);
                    auVar235 = vmulps_avx512vl(auVar235,auVar233);
                    auVar57._8_4_ = 0xffffff82;
                    auVar57._0_8_ = 0xffffff82ffffff82;
                    auVar57._12_4_ = 0xffffff82;
                    auVar233 = vpaddd_avx512vl(auVar236,auVar57);
                    auVar233 = vcvtdq2ps_avx(auVar233);
                    auVar236 = vsubps_avx512vl(auVar233,auVar421);
                    bVar199 = (bool)((byte)uVar186 & 1);
                    auVar240._0_4_ =
                         (uint)bVar199 * auVar236._0_4_ | (uint)!bVar199 * auVar233._0_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 1) & 1);
                    auVar240._4_4_ =
                         (uint)bVar199 * auVar236._4_4_ | (uint)!bVar199 * auVar233._4_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 2) & 1);
                    auVar240._8_4_ =
                         (uint)bVar199 * auVar236._8_4_ | (uint)!bVar199 * auVar233._8_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 3) & 1);
                    auVar240._12_4_ =
                         (uint)bVar199 * auVar236._12_4_ | (uint)!bVar199 * auVar233._12_4_;
                    auVar233 = vfmadd231ps_avx512vl(auVar235,auVar240,auVar516);
                    auVar233 = vfmsub231ps_avx512vl(auVar233,auVar409,auVar234);
                    auVar233 = vsubps_avx512vl(auVar233,auVar239);
                    auVar233 = vfnmadd231ps_fma(auVar233,auVar427,auVar240);
                    auVar234 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar199 = (bool)((byte)uVar171 & 1);
                    auVar241._0_4_ =
                         (uint)bVar199 * auVar234._0_4_ |
                         (uint)!bVar199 * (int)(auVar233._0_4_ + auVar233._0_4_);
                    bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                    auVar241._4_4_ =
                         (uint)bVar199 * auVar234._4_4_ |
                         (uint)!bVar199 * (int)(auVar233._4_4_ + auVar233._4_4_);
                    bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                    auVar241._8_4_ =
                         (uint)bVar199 * auVar234._8_4_ |
                         (uint)!bVar199 * (int)(auVar233._8_4_ + auVar233._8_4_);
                    bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                    auVar241._12_4_ =
                         (uint)bVar199 * auVar234._12_4_ |
                         (uint)!bVar199 * (int)(auVar233._12_4_ + auVar233._12_4_);
                    auVar233 = vminps_avx(auVar241,auVar396);
                    auVar233 = vmaxps_avx(auVar233,auVar403);
                    auVar234 = vfmadd213ps_fma(auVar415,auVar233,auVar409);
                    auVar235 = vcvttps2dq_avx512vl(auVar234);
                    auVar235 = vcvtdq2ps_avx512vl(auVar235);
                    uVar171 = vcmpps_avx512vl(auVar234,auVar235,1);
                    auVar234 = vsubps_avx512vl(auVar235,auVar421);
                    bVar199 = (bool)((byte)uVar171 & 1);
                    auVar242._0_4_ =
                         (uint)bVar199 * auVar234._0_4_ | (uint)!bVar199 * auVar235._0_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                    auVar242._4_4_ =
                         (uint)bVar199 * auVar234._4_4_ | (uint)!bVar199 * auVar235._4_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                    auVar242._8_4_ =
                         (uint)bVar199 * auVar234._8_4_ | (uint)!bVar199 * auVar235._8_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                    auVar242._12_4_ =
                         (uint)bVar199 * auVar234._12_4_ | (uint)!bVar199 * auVar235._12_4_;
                    auVar233 = vfmsub231ps_avx512vl(auVar233,auVar242,auVar427);
                    auVar233 = vfnmsub231ps_avx512vl(auVar233,auVar242,auVar516);
                    auVar467._0_4_ = auVar233._0_4_ * auVar233._0_4_;
                    auVar467._4_4_ = auVar233._4_4_ * auVar233._4_4_;
                    auVar467._8_4_ = auVar233._8_4_ * auVar233._8_4_;
                    auVar467._12_4_ = auVar233._12_4_ * auVar233._12_4_;
                    auVar234 = vfmadd213ps_avx512vl(auVar203,auVar233,auVar486);
                    auVar234 = vfmadd213ps_avx512vl(auVar234,auVar233,auVar492);
                    auVar234 = vfmadd213ps_avx512vl(auVar234,auVar233,auVar498);
                    auVar234 = vfmadd213ps_avx512vl(auVar234,auVar233,auVar504);
                    auVar234 = vfmadd213ps_avx512vl(auVar234,auVar233,auVar409);
                    auVar233 = vfmadd213ps_avx512vl(auVar234,auVar467,auVar233);
                    in_ZMM17 = ZEXT1664(auVar233);
                    auVar234 = vaddps_avx512vl(auVar233,auVar421);
                    auVar233 = vcvttps2dq_avx512vl(auVar242);
                    auVar233 = vpslld_avx(auVar233,0x17);
                    auVar233 = vpaddd_avx(auVar233,auVar510);
                    auVar234 = vfmadd213ps_fma(auVar233,auVar234,auVar421);
                    auVar233 = vrcpps_avx(auVar234);
                    auVar235 = vaddps_avx512vl(auVar233,auVar233);
                    in_ZMM16 = ZEXT1664(auVar235);
                    auVar234 = vfmsub213ps_avx512vl(auVar234,auVar235,auVar232);
                    auVar233 = vfnmadd213ps_avx512vl(auVar234,auVar233,auVar235);
                    in_ZMM9 = ZEXT1664(auVar233);
                    auVar237 = vfmsub231ps_fma(auVar237,auVar237,auVar233);
                    break;
                  case 6:
                    uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                    auVar439._4_4_ = uVar4;
                    auVar439._0_4_ = uVar4;
                    auVar439._8_4_ = uVar4;
                    auVar439._12_4_ = uVar4;
                    uVar4 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var168))[1];
                    auVar51._4_4_ = uVar4;
                    auVar51._0_4_ = uVar4;
                    auVar51._8_4_ = uVar4;
                    auVar51._12_4_ = uVar4;
                    auVar233 = vfmadd213ps_avx512vl(auVar439,auVar237,auVar51);
                    auVar233 = vmaxps_avx(auVar233,auVar244);
                    auVar233 = vminps_avx(auVar233,auVar421);
                    auVar383._0_4_ = auVar233._0_4_ * auVar237._0_4_;
                    auVar383._4_4_ = auVar233._4_4_ * auVar237._4_4_;
                    auVar383._8_4_ = auVar233._8_4_ * auVar237._8_4_;
                    auVar383._12_4_ = auVar233._12_4_ * auVar237._12_4_;
                    auVar237 = auVar383;
                  }
                  *(undefined1 (*) [16])pAVar188 = auVar237;
                  pAVar188 = pAVar188 + 2;
                  uVar174 = uVar174 + 1;
                  iVar161 = iVar161 + 1;
                } while (uVar174 != local_228.w);
              }
              iVar194 = iVar194 + 1;
            } while (iVar194 != local_228.h);
          }
          local_300 = (_func_int **)((long)local_300 + 1);
        } while (local_300 != (_func_int **)(long)local_228.c);
      }
      local_1d8._0_4_ = (uint)local_1d8 | uVar176 ^ 1;
      if (((uint)local_1d8 == 0) && (0 < (long)local_228.c)) {
        p_Var168 = pp_Var13[-3];
        iVar10 = *(int *)(&this->field_0xdc + (long)p_Var168);
        iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var168);
        iVar175 = *(int *)(&this->field_0xe4 + (long)p_Var168);
        iVar172 = *(int *)(&this->field_0xe8 + (long)p_Var168);
        iVar180 = *(int *)(&this->field_0x114 + (long)p_Var168);
        lVar192 = *(long *)(&this->field_0x1a8 + (long)p_Var168);
        uVar160 = *(uint *)(&this->field_0xd4 + (long)p_Var168);
        uVar169 = *(uint *)(&this->field_0xd8 + (long)p_Var168);
        iVar189 = (1 - uVar160) * iVar10;
        local_168._0_4_ = iVar189;
        local_300 = (_func_int **)0x0;
        auVar401._8_4_ = 0x42b0c0a5;
        auVar401._0_8_ = 0x42b0c0a542b0c0a5;
        auVar401._12_4_ = 0x42b0c0a5;
        auVar401._16_4_ = 0x42b0c0a5;
        auVar401._20_4_ = 0x42b0c0a5;
        auVar401._24_4_ = 0x42b0c0a5;
        auVar401._28_4_ = 0x42b0c0a5;
        auVar408._8_4_ = 0xc2b0c0a5;
        auVar408._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar408._12_4_ = 0xc2b0c0a5;
        auVar408._16_4_ = 0xc2b0c0a5;
        auVar408._20_4_ = 0xc2b0c0a5;
        auVar408._24_4_ = 0xc2b0c0a5;
        auVar408._28_4_ = 0xc2b0c0a5;
        auVar414._8_4_ = 0x3f000000;
        auVar414._0_8_ = 0x3f0000003f000000;
        auVar414._12_4_ = 0x3f000000;
        auVar414._16_4_ = 0x3f000000;
        auVar414._20_4_ = 0x3f000000;
        auVar414._24_4_ = 0x3f000000;
        auVar414._28_4_ = 0x3f000000;
        auVar420._8_4_ = 0x3fb8aa3b;
        auVar420._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar420._12_4_ = 0x3fb8aa3b;
        auVar420._16_4_ = 0x3fb8aa3b;
        auVar420._20_4_ = 0x3fb8aa3b;
        auVar420._24_4_ = 0x3fb8aa3b;
        auVar420._28_4_ = 0x3fb8aa3b;
        auVar426._8_4_ = 0x3f800000;
        auVar426._0_8_ = 0x3f8000003f800000;
        auVar426._12_4_ = 0x3f800000;
        auVar426._16_4_ = 0x3f800000;
        auVar426._20_4_ = 0x3f800000;
        auVar426._24_4_ = 0x3f800000;
        auVar426._28_4_ = 0x3f800000;
        auVar432._8_4_ = 0x3f318000;
        auVar432._0_8_ = 0x3f3180003f318000;
        auVar432._12_4_ = 0x3f318000;
        auVar432._16_4_ = 0x3f318000;
        auVar432._20_4_ = 0x3f318000;
        auVar432._24_4_ = 0x3f318000;
        auVar432._28_4_ = 0x3f318000;
        auVar257 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar491._8_4_ = 0x3ab743ce;
        auVar491._0_8_ = 0x3ab743ce3ab743ce;
        auVar491._12_4_ = 0x3ab743ce;
        auVar491._16_4_ = 0x3ab743ce;
        auVar491._20_4_ = 0x3ab743ce;
        auVar491._24_4_ = 0x3ab743ce;
        auVar491._28_4_ = 0x3ab743ce;
        auVar497._8_4_ = 0x3c088908;
        auVar497._0_8_ = 0x3c0889083c088908;
        auVar497._12_4_ = 0x3c088908;
        auVar497._16_4_ = 0x3c088908;
        auVar497._20_4_ = 0x3c088908;
        auVar497._24_4_ = 0x3c088908;
        auVar497._28_4_ = 0x3c088908;
        auVar503._8_4_ = 0x3d2aa9c1;
        auVar503._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar503._12_4_ = 0x3d2aa9c1;
        auVar503._16_4_ = 0x3d2aa9c1;
        auVar503._20_4_ = 0x3d2aa9c1;
        auVar503._24_4_ = 0x3d2aa9c1;
        auVar503._28_4_ = 0x3d2aa9c1;
        auVar509._8_4_ = 0x3e2aaaaa;
        auVar509._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar509._12_4_ = 0x3e2aaaaa;
        auVar509._16_4_ = 0x3e2aaaaa;
        auVar509._20_4_ = 0x3e2aaaaa;
        auVar509._24_4_ = 0x3e2aaaaa;
        auVar509._28_4_ = 0x3e2aaaaa;
        auVar515._8_4_ = 0x3f800000;
        auVar515._0_8_ = 0x3f8000003f800000;
        auVar515._12_4_ = 0x3f800000;
        auVar515._16_4_ = 0x3f800000;
        auVar515._20_4_ = 0x3f800000;
        auVar515._24_4_ = 0x3f800000;
        auVar515._28_4_ = 0x3f800000;
        auVar521._8_4_ = 0xb95e8083;
        auVar521._0_8_ = 0xb95e8083b95e8083;
        auVar521._12_4_ = 0xb95e8083;
        auVar521._16_4_ = 0xb95e8083;
        auVar521._20_4_ = 0xb95e8083;
        auVar521._24_4_ = 0xb95e8083;
        auVar521._28_4_ = 0xb95e8083;
        auVar258 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar279 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar280 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar281 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar282 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar283 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar284 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar285 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar286 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar287 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar288 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar289 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        do {
          local_1a8._0_4_ = local_228.h;
          if (0 < local_228.h) {
            iVar195 = bottom_blob->w;
            iVar194 = bottom_blob->h;
            pAVar188 = (Allocator *)
                       ((long)(_func_int ***)local_228.data +
                       local_228.cstep * (long)local_300 * local_228.elemsize);
            uVar170 = bottom_blob->c;
            iVar161 = 0;
            do {
              if (0 < local_228.w) {
                uVar174 = 0;
                iVar162 = iVar189;
                do {
                  if (lVar192 == 0) {
                    auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar336 = ZEXT3264(*(undefined1 (*) [32])(lVar192 + (long)local_300 * 0x20));
                  }
                  if (0 < (int)uVar170) {
                    pvVar197 = (void *)((this->weight_data_tm).cstep * (long)local_300 *
                                        (this->weight_data_tm).elemsize +
                                       (long)(this->weight_data_tm).data);
                    uVar171 = 0;
                    do {
                      if (0 < (int)uVar169) {
                        uVar181 = 0;
                        uVar186 = 0;
                        do {
                          iVar163 = (((int)uVar186 - uVar169) + 1) * iVar11 + iVar161;
                          if ((((-1 < iVar163) &&
                               (iVar164 = iVar163 / iVar172, iVar163 % iVar172 == 0)) &&
                              (iVar164 < iVar194)) && (0 < (int)uVar160)) {
                            uVar185 = (ulong)uVar160;
                            uVar191 = uVar181;
                            iVar163 = iVar162;
                            do {
                              if (((-1 < iVar163) &&
                                  (iVar165 = iVar163 / iVar175, iVar163 % iVar175 == 0)) &&
                                 (iVar165 < iVar195)) {
                                uVar12 = *(undefined4 *)
                                          ((long)bottom_blob->data +
                                          (long)iVar165 * 4 +
                                          (long)iVar164 *
                                          (long)bottom_blob->w * bottom_blob->elemsize +
                                          bottom_blob->cstep * bottom_blob->elemsize * uVar171);
                                auVar458._4_4_ = uVar12;
                                auVar458._0_4_ = uVar12;
                                auVar458._8_4_ = uVar12;
                                auVar458._12_4_ = uVar12;
                                auVar458._16_4_ = uVar12;
                                auVar458._20_4_ = uVar12;
                                auVar458._24_4_ = uVar12;
                                auVar458._28_4_ = uVar12;
                                auVar203 = vfmadd231ps_fma(auVar336._0_32_,auVar458,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar197 +
                                                            (uVar191 & 0xffffffff) * 4));
                                auVar336 = ZEXT1664(auVar203);
                              }
                              uVar191 = uVar191 + 8;
                              iVar163 = iVar163 + iVar10;
                              uVar185 = uVar185 - 1;
                            } while (uVar185 != 0);
                          }
                          uVar186 = uVar186 + 1;
                          uVar181 = uVar181 + (ulong)uVar160 * 8;
                        } while (uVar186 != uVar169);
                      }
                      pvVar197 = (void *)((long)pvVar197 + (long)(int)(uVar160 * uVar169 * 8) * 4);
                      uVar171 = uVar171 + 1;
                    } while (uVar171 != uVar170);
                  }
                  auVar290 = auVar336._0_32_;
                  if (iVar180 - 1U < 6) {
                    auVar259 = ZEXT1632(ZEXT816(0) << 0x40);
                    auVar393._28_36_ = auVar336._28_36_;
                    switch(iVar180) {
                    case 1:
                      auVar290 = vmaxps_avx(auVar290,ZEXT1632(ZEXT816(0) << 0x40));
                      break;
                    case 2:
                      auVar260 = vmaxps_avx(auVar290,auVar259);
                      auVar290 = vminps_avx(auVar290,auVar259);
                      uVar12 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                      auVar120._4_4_ = uVar12;
                      auVar120._0_4_ = uVar12;
                      auVar120._8_4_ = uVar12;
                      auVar120._12_4_ = uVar12;
                      auVar120._16_4_ = uVar12;
                      auVar120._20_4_ = uVar12;
                      auVar120._24_4_ = uVar12;
                      auVar120._28_4_ = uVar12;
                      auVar290 = vfmadd132ps_avx512vl(auVar290,auVar260,auVar120);
                      break;
                    case 3:
                      uVar12 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                      auVar118._4_4_ = uVar12;
                      auVar118._0_4_ = uVar12;
                      auVar118._8_4_ = uVar12;
                      auVar118._12_4_ = uVar12;
                      auVar118._16_4_ = uVar12;
                      auVar118._20_4_ = uVar12;
                      auVar118._24_4_ = uVar12;
                      auVar118._28_4_ = uVar12;
                      auVar290 = vmaxps_avx512vl(auVar290,auVar118);
                      uVar12 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var168))[1];
                      auVar119._4_4_ = uVar12;
                      auVar119._0_4_ = uVar12;
                      auVar119._8_4_ = uVar12;
                      auVar119._12_4_ = uVar12;
                      auVar119._16_4_ = uVar12;
                      auVar119._20_4_ = uVar12;
                      auVar119._24_4_ = uVar12;
                      auVar119._28_4_ = uVar12;
                      auVar290 = vminps_avx512vl(auVar290,auVar119);
                      break;
                    case 4:
                      auVar116._8_4_ = 0x80000000;
                      auVar116._0_8_ = 0x8000000080000000;
                      auVar116._12_4_ = 0x80000000;
                      auVar116._16_4_ = 0x80000000;
                      auVar116._20_4_ = 0x80000000;
                      auVar116._24_4_ = 0x80000000;
                      auVar116._28_4_ = 0x80000000;
                      auVar290 = vxorps_avx512vl(auVar290,auVar116);
                      auVar290 = vminps_avx(auVar290,auVar401);
                      auVar290 = vmaxps_avx(auVar290,auVar408);
                      auVar203 = vfmadd231ps_fma(auVar414,auVar290,auVar420);
                      auVar259 = vrndscaleps_avx512vl(ZEXT1632(auVar203),1);
                      uVar171 = vcmpps_avx512vl(ZEXT1632(auVar203),auVar259,1);
                      auVar260 = vsubps_avx512vl(auVar259,auVar426);
                      bVar199 = (bool)((byte)uVar171 & 1);
                      auVar308._0_4_ =
                           (uint)bVar199 * auVar260._0_4_ | (uint)!bVar199 * auVar259._0_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                      auVar308._4_4_ =
                           (uint)bVar199 * auVar260._4_4_ | (uint)!bVar199 * auVar259._4_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                      auVar308._8_4_ =
                           (uint)bVar199 * auVar260._8_4_ | (uint)!bVar199 * auVar259._8_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                      auVar308._12_4_ =
                           (uint)bVar199 * auVar260._12_4_ | (uint)!bVar199 * auVar259._12_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                      auVar308._16_4_ =
                           (uint)bVar199 * auVar260._16_4_ | (uint)!bVar199 * auVar259._16_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                      auVar308._20_4_ =
                           (uint)bVar199 * auVar260._20_4_ | (uint)!bVar199 * auVar259._20_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                      auVar308._24_4_ =
                           (uint)bVar199 * auVar260._24_4_ | (uint)!bVar199 * auVar259._24_4_;
                      bVar199 = SUB81(uVar171 >> 7,0);
                      auVar308._28_4_ =
                           (uint)bVar199 * auVar260._28_4_ | (uint)!bVar199 * auVar259._28_4_;
                      in_ZMM16 = ZEXT3264(auVar308);
                      auVar290 = vfmsub231ps_avx512vl(auVar290,auVar308,auVar432);
                      auVar117._8_4_ = 0x395e8083;
                      auVar117._0_8_ = 0x395e8083395e8083;
                      auVar117._12_4_ = 0x395e8083;
                      auVar117._16_4_ = 0x395e8083;
                      auVar117._20_4_ = 0x395e8083;
                      auVar117._24_4_ = 0x395e8083;
                      auVar117._28_4_ = 0x395e8083;
                      auVar290 = vfmsub231ps_avx512vl(auVar290,auVar308,auVar117);
                      auVar459._0_4_ = auVar290._0_4_ * auVar290._0_4_;
                      auVar459._4_4_ = auVar290._4_4_ * auVar290._4_4_;
                      auVar459._8_4_ = auVar290._8_4_ * auVar290._8_4_;
                      auVar459._12_4_ = auVar290._12_4_ * auVar290._12_4_;
                      auVar459._16_4_ = auVar290._16_4_ * auVar290._16_4_;
                      auVar459._20_4_ = auVar290._20_4_ * auVar290._20_4_;
                      auVar459._24_4_ = auVar290._24_4_ * auVar290._24_4_;
                      auVar459._28_4_ = 0;
                      auVar203 = vfmadd213ps_fma(auVar257,auVar290,auVar491);
                      auVar203 = vfmadd213ps_fma(ZEXT1632(auVar203),auVar290,auVar497);
                      auVar203 = vfmadd213ps_fma(ZEXT1632(auVar203),auVar290,auVar503);
                      auVar203 = vfmadd213ps_fma(ZEXT1632(auVar203),auVar290,auVar509);
                      auVar203 = vfmadd213ps_fma(ZEXT1632(auVar203),auVar290,auVar414);
                      auVar203 = vfmadd213ps_fma(ZEXT1632(auVar203),auVar459,auVar290);
                      in_ZMM9 = ZEXT1664(auVar203);
                      auVar460._0_4_ = auVar203._0_4_ + 1.0;
                      auVar460._4_4_ = auVar203._4_4_ + 1.0;
                      auVar460._8_4_ = auVar203._8_4_ + 1.0;
                      auVar460._12_4_ = auVar203._12_4_ + 1.0;
                      auVar460._16_4_ = 0x3f800000;
                      auVar460._20_4_ = 0x3f800000;
                      auVar460._24_4_ = 0x3f800000;
                      auVar460._28_4_ = 0x3f800000;
                      auVar290 = vcvttps2dq_avx512vl(auVar308);
                      auVar290 = vpslld_avx2(auVar290,0x17);
                      auVar290 = vpaddd_avx2(auVar515,auVar290);
                      auVar203 = vfmadd213ps_fma(auVar290,auVar460,auVar426);
                      auVar290 = vrcpps_avx(ZEXT1632(auVar203));
                      auVar203 = vfmsub213ps_fma(ZEXT1632(auVar203),auVar290,auVar426);
                      auVar203 = vfnmadd132ps_fma(ZEXT1632(auVar203),auVar290,auVar290);
                      auVar290 = ZEXT1632(auVar203);
                      break;
                    case 5:
                      auVar290 = vminps_avx(auVar290,auVar401);
                      auVar290 = vmaxps_avx(auVar290,auVar408);
                      auVar203 = vfmadd213ps_fma(auVar420,auVar290,auVar414);
                      auVar260 = vrndscaleps_avx512vl(ZEXT1632(auVar203),1);
                      uVar171 = vcmpps_avx512vl(ZEXT1632(auVar203),auVar260,1);
                      auVar261 = vsubps_avx512vl(auVar260,auVar426);
                      bVar199 = (bool)((byte)uVar171 & 1);
                      auVar303._0_4_ =
                           (uint)bVar199 * auVar261._0_4_ | (uint)!bVar199 * auVar260._0_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                      auVar303._4_4_ =
                           (uint)bVar199 * auVar261._4_4_ | (uint)!bVar199 * auVar260._4_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                      auVar303._8_4_ =
                           (uint)bVar199 * auVar261._8_4_ | (uint)!bVar199 * auVar260._8_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                      auVar303._12_4_ =
                           (uint)bVar199 * auVar261._12_4_ | (uint)!bVar199 * auVar260._12_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                      auVar303._16_4_ =
                           (uint)bVar199 * auVar261._16_4_ | (uint)!bVar199 * auVar260._16_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                      auVar303._20_4_ =
                           (uint)bVar199 * auVar261._20_4_ | (uint)!bVar199 * auVar260._20_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                      auVar303._24_4_ =
                           (uint)bVar199 * auVar261._24_4_ | (uint)!bVar199 * auVar260._24_4_;
                      bVar199 = SUB81(uVar171 >> 7,0);
                      auVar303._28_4_ =
                           (uint)bVar199 * auVar261._28_4_ | (uint)!bVar199 * auVar260._28_4_;
                      auVar290 = vfmsub231ps_avx512vl(auVar290,auVar303,auVar432);
                      auVar290 = vfnmsub231ps_avx512vl(auVar290,auVar303,auVar521);
                      auVar483._0_4_ = auVar290._0_4_ * auVar290._0_4_;
                      auVar483._4_4_ = auVar290._4_4_ * auVar290._4_4_;
                      auVar483._8_4_ = auVar290._8_4_ * auVar290._8_4_;
                      auVar483._12_4_ = auVar290._12_4_ * auVar290._12_4_;
                      auVar483._16_4_ = auVar290._16_4_ * auVar290._16_4_;
                      auVar483._20_4_ = auVar290._20_4_ * auVar290._20_4_;
                      auVar483._24_4_ = auVar290._24_4_ * auVar290._24_4_;
                      auVar483._28_4_ = 0;
                      auVar260 = vfmadd213ps_avx512vl(auVar257,auVar290,auVar491);
                      auVar260 = vfmadd213ps_avx512vl(auVar260,auVar290,auVar497);
                      auVar260 = vfmadd213ps_avx512vl(auVar260,auVar290,auVar503);
                      auVar260 = vfmadd213ps_avx512vl(auVar260,auVar290,auVar509);
                      auVar260 = vfmadd213ps_avx512vl(auVar260,auVar290,auVar414);
                      auVar290 = vfmadd213ps_avx512vl(auVar260,auVar483,auVar290);
                      auVar260 = vaddps_avx512vl(auVar290,auVar426);
                      auVar290 = vcvttps2dq_avx512vl(auVar303);
                      auVar290 = vpslld_avx2(auVar290,0x17);
                      auVar290 = vpaddd_avx2(auVar290,auVar515);
                      auVar203 = vfmadd213ps_fma(auVar290,auVar260,auVar426);
                      uVar171 = vcmpps_avx512vl(ZEXT1632(auVar203),auVar259,2);
                      auVar113._8_4_ = 0x800000;
                      auVar113._0_8_ = 0x80000000800000;
                      auVar113._12_4_ = 0x800000;
                      auVar113._16_4_ = 0x800000;
                      auVar113._20_4_ = 0x800000;
                      auVar113._24_4_ = 0x800000;
                      auVar113._28_4_ = 0x800000;
                      auVar290 = vmaxps_avx512vl(ZEXT1632(auVar203),auVar113);
                      auVar261 = vpsrld_avx2(auVar290,0x17);
                      auVar259 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                      auVar114._8_4_ = 0x3f000000;
                      auVar114._0_8_ = 0x3f0000003f000000;
                      auVar114._12_4_ = 0x3f000000;
                      auVar114._16_4_ = 0x3f000000;
                      auVar114._20_4_ = 0x3f000000;
                      auVar114._24_4_ = 0x3f000000;
                      auVar114._28_4_ = 0x3f000000;
                      auVar290 = vpternlogd_avx512vl(auVar290,auVar259,auVar114,0xea);
                      uVar186 = vcmpps_avx512vl(auVar290,auVar258,1);
                      auVar259 = vaddps_avx512vl(auVar290,auVar279);
                      auVar290 = vaddps_avx512vl(auVar259,auVar290);
                      bVar199 = (bool)((byte)uVar186 & 1);
                      auVar304._0_4_ =
                           (uint)bVar199 * auVar290._0_4_ | (uint)!bVar199 * auVar259._0_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 1) & 1);
                      auVar304._4_4_ =
                           (uint)bVar199 * auVar290._4_4_ | (uint)!bVar199 * auVar259._4_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 2) & 1);
                      auVar304._8_4_ =
                           (uint)bVar199 * auVar290._8_4_ | (uint)!bVar199 * auVar259._8_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 3) & 1);
                      auVar304._12_4_ =
                           (uint)bVar199 * auVar290._12_4_ | (uint)!bVar199 * auVar259._12_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 4) & 1);
                      auVar304._16_4_ =
                           (uint)bVar199 * auVar290._16_4_ | (uint)!bVar199 * auVar259._16_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 5) & 1);
                      auVar304._20_4_ =
                           (uint)bVar199 * auVar290._20_4_ | (uint)!bVar199 * auVar259._20_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 6) & 1);
                      auVar304._24_4_ =
                           (uint)bVar199 * auVar290._24_4_ | (uint)!bVar199 * auVar259._24_4_;
                      bVar199 = SUB81(uVar186 >> 7,0);
                      auVar304._28_4_ =
                           (uint)bVar199 * auVar290._28_4_ | (uint)!bVar199 * auVar259._28_4_;
                      auVar259 = vmulps_avx512vl(auVar304,auVar304);
                      auVar290 = vfmadd213ps_avx512vl(auVar280,auVar304,auVar281);
                      auVar290 = vfmadd213ps_avx512vl(auVar290,auVar304,auVar282);
                      auVar290 = vfmadd213ps_avx512vl(auVar290,auVar304,auVar283);
                      auVar290 = vfmadd213ps_avx512vl(auVar290,auVar304,auVar284);
                      auVar290 = vfmadd213ps_avx512vl(auVar290,auVar304,auVar285);
                      auVar290 = vfmadd213ps_avx512vl(auVar290,auVar304,auVar286);
                      auVar290 = vfmadd213ps_avx512vl(auVar290,auVar304,auVar287);
                      auVar290 = vfmadd213ps_avx512vl(auVar290,auVar304,auVar288);
                      auVar260 = vmulps_avx512vl(auVar259,auVar304);
                      auVar260 = vmulps_avx512vl(auVar260,auVar290);
                      auVar115._8_4_ = 0xffffff82;
                      auVar115._0_8_ = 0xffffff82ffffff82;
                      auVar115._12_4_ = 0xffffff82;
                      auVar115._16_4_ = 0xffffff82;
                      auVar115._20_4_ = 0xffffff82;
                      auVar115._24_4_ = 0xffffff82;
                      auVar115._28_4_ = 0xffffff82;
                      auVar290 = vpaddd_avx512vl(auVar261,auVar115);
                      auVar290 = vcvtdq2ps_avx(auVar290);
                      auVar261 = vsubps_avx512vl(auVar290,auVar426);
                      bVar199 = (bool)((byte)uVar186 & 1);
                      auVar305._0_4_ =
                           (uint)bVar199 * auVar261._0_4_ | (uint)!bVar199 * auVar290._0_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 1) & 1);
                      auVar305._4_4_ =
                           (uint)bVar199 * auVar261._4_4_ | (uint)!bVar199 * auVar290._4_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 2) & 1);
                      auVar305._8_4_ =
                           (uint)bVar199 * auVar261._8_4_ | (uint)!bVar199 * auVar290._8_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 3) & 1);
                      auVar305._12_4_ =
                           (uint)bVar199 * auVar261._12_4_ | (uint)!bVar199 * auVar290._12_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 4) & 1);
                      auVar305._16_4_ =
                           (uint)bVar199 * auVar261._16_4_ | (uint)!bVar199 * auVar290._16_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 5) & 1);
                      auVar305._20_4_ =
                           (uint)bVar199 * auVar261._20_4_ | (uint)!bVar199 * auVar290._20_4_;
                      bVar199 = (bool)((byte)(uVar186 >> 6) & 1);
                      auVar305._24_4_ =
                           (uint)bVar199 * auVar261._24_4_ | (uint)!bVar199 * auVar290._24_4_;
                      bVar199 = SUB81(uVar186 >> 7,0);
                      auVar305._28_4_ =
                           (uint)bVar199 * auVar261._28_4_ | (uint)!bVar199 * auVar290._28_4_;
                      auVar290 = vfmadd231ps_avx512vl(auVar260,auVar305,auVar521);
                      auVar290 = vfmsub231ps_avx512vl(auVar290,auVar414,auVar259);
                      auVar290 = vsubps_avx512vl(auVar290,auVar304);
                      auVar203 = vfmsub231ps_fma(auVar290,auVar432,auVar305);
                      auVar290 = vmulps_avx512vl(ZEXT1632(auVar203),auVar289);
                      auVar259 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      bVar199 = (bool)((byte)uVar171 & 1);
                      auVar306._0_4_ =
                           (uint)bVar199 * auVar259._0_4_ | (uint)!bVar199 * auVar290._0_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                      auVar306._4_4_ =
                           (uint)bVar199 * auVar259._4_4_ | (uint)!bVar199 * auVar290._4_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                      auVar306._8_4_ =
                           (uint)bVar199 * auVar259._8_4_ | (uint)!bVar199 * auVar290._8_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                      auVar306._12_4_ =
                           (uint)bVar199 * auVar259._12_4_ | (uint)!bVar199 * auVar290._12_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                      auVar306._16_4_ =
                           (uint)bVar199 * auVar259._16_4_ | (uint)!bVar199 * auVar290._16_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                      auVar306._20_4_ =
                           (uint)bVar199 * auVar259._20_4_ | (uint)!bVar199 * auVar290._20_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                      auVar306._24_4_ =
                           (uint)bVar199 * auVar259._24_4_ | (uint)!bVar199 * auVar290._24_4_;
                      bVar199 = SUB81(uVar171 >> 7,0);
                      auVar306._28_4_ =
                           (uint)bVar199 * auVar259._28_4_ | (uint)!bVar199 * auVar290._28_4_;
                      auVar290 = vminps_avx(auVar306,auVar401);
                      auVar290 = vmaxps_avx(auVar290,auVar408);
                      auVar203 = vfmadd213ps_fma(auVar420,auVar290,auVar414);
                      auVar259 = vrndscaleps_avx512vl(ZEXT1632(auVar203),1);
                      uVar171 = vcmpps_avx512vl(ZEXT1632(auVar203),auVar259,1);
                      auVar260 = vsubps_avx512vl(auVar259,auVar426);
                      bVar199 = (bool)((byte)uVar171 & 1);
                      auVar307._0_4_ =
                           (uint)bVar199 * auVar260._0_4_ | (uint)!bVar199 * auVar259._0_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                      auVar307._4_4_ =
                           (uint)bVar199 * auVar260._4_4_ | (uint)!bVar199 * auVar259._4_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                      auVar307._8_4_ =
                           (uint)bVar199 * auVar260._8_4_ | (uint)!bVar199 * auVar259._8_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                      auVar307._12_4_ =
                           (uint)bVar199 * auVar260._12_4_ | (uint)!bVar199 * auVar259._12_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 4) & 1);
                      auVar307._16_4_ =
                           (uint)bVar199 * auVar260._16_4_ | (uint)!bVar199 * auVar259._16_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 5) & 1);
                      auVar307._20_4_ =
                           (uint)bVar199 * auVar260._20_4_ | (uint)!bVar199 * auVar259._20_4_;
                      bVar199 = (bool)((byte)(uVar171 >> 6) & 1);
                      auVar307._24_4_ =
                           (uint)bVar199 * auVar260._24_4_ | (uint)!bVar199 * auVar259._24_4_;
                      bVar199 = SUB81(uVar171 >> 7,0);
                      auVar307._28_4_ =
                           (uint)bVar199 * auVar260._28_4_ | (uint)!bVar199 * auVar259._28_4_;
                      in_ZMM16 = ZEXT3264(auVar307);
                      auVar290 = vfmsub231ps_avx512vl(auVar290,auVar307,auVar432);
                      auVar290 = vfnmsub231ps_avx512vl(auVar290,auVar307,auVar521);
                      auVar484._0_4_ = auVar290._0_4_ * auVar290._0_4_;
                      auVar484._4_4_ = auVar290._4_4_ * auVar290._4_4_;
                      auVar484._8_4_ = auVar290._8_4_ * auVar290._8_4_;
                      auVar484._12_4_ = auVar290._12_4_ * auVar290._12_4_;
                      auVar484._16_4_ = auVar290._16_4_ * auVar290._16_4_;
                      auVar484._20_4_ = auVar290._20_4_ * auVar290._20_4_;
                      auVar484._24_4_ = auVar290._24_4_ * auVar290._24_4_;
                      auVar484._28_4_ = 0;
                      auVar259 = vfmadd213ps_avx512vl(auVar257,auVar290,auVar491);
                      auVar259 = vfmadd213ps_avx512vl(auVar259,auVar290,auVar497);
                      auVar259 = vfmadd213ps_avx512vl(auVar259,auVar290,auVar503);
                      auVar259 = vfmadd213ps_avx512vl(auVar259,auVar290,auVar509);
                      auVar259 = vfmadd213ps_avx512vl(auVar259,auVar290,auVar414);
                      auVar290 = vfmadd213ps_avx512vl(auVar259,auVar484,auVar290);
                      in_ZMM17 = ZEXT3264(auVar290);
                      auVar259 = vaddps_avx512vl(auVar290,auVar426);
                      auVar290 = vcvttps2dq_avx512vl(auVar307);
                      auVar290 = vpslld_avx2(auVar290,0x17);
                      auVar290 = vpaddd_avx2(auVar290,auVar515);
                      auVar203 = vfmadd213ps_fma(auVar290,auVar259,auVar426);
                      auVar290 = vrcpps_avx(ZEXT1632(auVar203));
                      auVar203 = vfmsub213ps_fma(ZEXT1632(auVar203),auVar290,auVar426);
                      auVar203 = vfnmadd132ps_fma(ZEXT1632(auVar203),auVar290,auVar290);
                      auVar290 = vfnmadd213ps_avx512vl(ZEXT1632(auVar203),auVar289,auVar279);
                      in_ZMM9 = ZEXT3264(auVar290);
                      auVar393._0_4_ = auVar290._0_4_ * auVar336._0_4_;
                      auVar393._4_4_ = auVar290._4_4_ * auVar336._4_4_;
                      auVar393._8_4_ = auVar290._8_4_ * auVar336._8_4_;
                      auVar393._12_4_ = auVar290._12_4_ * auVar336._12_4_;
                      auVar393._16_4_ = auVar290._16_4_ * auVar336._16_4_;
                      auVar393._20_4_ = auVar290._20_4_ * auVar336._20_4_;
                      auVar393._24_4_ = auVar290._24_4_ * auVar336._24_4_;
                      auVar290 = auVar393._0_32_;
                      break;
                    case 6:
                      uVar12 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                      auVar461._4_4_ = uVar12;
                      auVar461._0_4_ = uVar12;
                      auVar461._8_4_ = uVar12;
                      auVar461._12_4_ = uVar12;
                      auVar461._16_4_ = uVar12;
                      auVar461._20_4_ = uVar12;
                      auVar461._24_4_ = uVar12;
                      auVar461._28_4_ = uVar12;
                      uVar12 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var168))[1];
                      auVar112._4_4_ = uVar12;
                      auVar112._0_4_ = uVar12;
                      auVar112._8_4_ = uVar12;
                      auVar112._12_4_ = uVar12;
                      auVar112._16_4_ = uVar12;
                      auVar112._20_4_ = uVar12;
                      auVar112._24_4_ = uVar12;
                      auVar112._28_4_ = uVar12;
                      auVar290 = vfmadd213ps_avx512vl(auVar461,auVar290,auVar112);
                      auVar290 = vmaxps_avx(auVar290,auVar259);
                      auVar290 = vminps_avx(auVar290,auVar426);
                      auVar394._0_4_ = auVar290._0_4_ * auVar336._0_4_;
                      auVar394._4_4_ = auVar290._4_4_ * auVar336._4_4_;
                      auVar394._8_4_ = auVar290._8_4_ * auVar336._8_4_;
                      auVar394._12_4_ = auVar290._12_4_ * auVar336._12_4_;
                      auVar394._16_4_ = auVar290._16_4_ * auVar336._16_4_;
                      auVar394._20_4_ = auVar290._20_4_ * auVar336._20_4_;
                      auVar394._24_4_ = auVar290._24_4_ * auVar336._24_4_;
                      auVar394._28_36_ = auVar393._28_36_;
                      auVar290 = auVar394._0_32_;
                    }
                  }
                  *(undefined1 (*) [32])pAVar188 = auVar290;
                  pAVar188 = pAVar188 + 4;
                  uVar174 = uVar174 + 1;
                  iVar162 = iVar162 + 1;
                } while (uVar174 != local_228.w);
              }
              iVar161 = iVar161 + 1;
            } while (iVar161 != local_228.h);
          }
          local_300 = (_func_int **)((long)local_300 + 1);
        } while (local_300 != (_func_int **)(long)local_228.c);
      }
      local_238 = uVar190 ^ 1;
      if ((uVar176 == 8 && uVar190 == 1) &&
         (local_1d8 = (_func_int **)(long)local_228.c, 0 < (long)local_1d8)) {
        p_Var168 = pp_Var13[-3];
        iVar10 = *(int *)(&this->field_0xdc + (long)p_Var168);
        iVar11 = *(int *)(&this->field_0xe0 + (long)p_Var168);
        iVar175 = *(int *)(&this->field_0xe4 + (long)p_Var168);
        iVar172 = *(int *)(&this->field_0xe8 + (long)p_Var168);
        iVar180 = *(int *)(&this->field_0x114 + (long)p_Var168);
        lVar192 = *(long *)(&this->field_0x1a8 + (long)p_Var168);
        uVar160 = *(uint *)(&this->field_0xd4 + (long)p_Var168);
        local_168._0_8_ = p_Var168;
        uVar190 = *(uint *)(&this->field_0xd8 + (long)p_Var168);
        local_1c8 = (Allocator *)local_228.data;
        local_d0 = local_228.elemsize * local_228.cstep;
        iVar189 = bottom_blob->w;
        iVar195 = bottom_blob->h;
        uVar169 = bottom_blob->c;
        local_1a8._0_4_ = local_228.h;
        local_300 = (_func_int **)0x0;
        do {
          if (0 < (int)local_1a8._0_4_) {
            sVar15 = (this->weight_data_tm).cstep;
            sVar16 = (this->weight_data_tm).elemsize;
            local_2d8 = (Allocator *)
                        ((long)&local_1c8->_vptr_Allocator + local_d0 * (long)local_300);
            pvVar197 = (this->weight_data_tm).data;
            iVar194 = 0;
            do {
              if (0 < iVar173) {
                iVar162 = bottom_blob->w;
                pvVar196 = bottom_blob->data;
                sVar17 = bottom_blob->elemsize;
                sVar18 = bottom_blob->cstep;
                pfVar198 = *(float **)(&this->field_0x118 + local_168._0_8_);
                uVar170 = 0;
                iVar161 = (1 - uVar160) * iVar10;
                do {
                  if (lVar192 == 0) {
                    fVar379 = 0.0;
                  }
                  else {
                    fVar379 = *(float *)(lVar192 + (long)local_300 * 4);
                  }
                  if ((int)uVar169 < 1) {
                    auVar257 = SUB6432(ZEXT864(0),0);
                  }
                  else {
                    auVar336 = ZEXT864(0);
                    uVar171 = 0;
                    pvVar183 = (void *)(sVar15 * (long)local_300 * sVar16 + (long)pvVar197);
                    do {
                      if (0 < (int)uVar190) {
                        uVar181 = 0;
                        uVar186 = 0;
                        do {
                          iVar163 = (((int)uVar186 - uVar190) + 1) * iVar11 + iVar194;
                          if ((((-1 < iVar163) &&
                               (iVar164 = iVar163 / iVar172, iVar163 % iVar172 == 0)) &&
                              (0 < (int)uVar160)) && (iVar164 < iVar195)) {
                            uVar185 = (ulong)uVar160;
                            uVar191 = uVar181;
                            iVar163 = iVar161;
                            do {
                              if (((-1 < iVar163) &&
                                  (iVar165 = iVar163 / iVar175, iVar163 % iVar175 == 0)) &&
                                 (iVar165 < iVar189)) {
                                auVar203 = vfmadd231ps_fma(auVar336._0_32_,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar196 +
                                                            (long)(iVar165 << 3) * 4 +
                                                            (long)iVar164 * (long)iVar162 * sVar17 +
                                                            sVar18 * sVar17 * uVar171),
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar183 +
                                                            (uVar191 & 0xffffffff) * 4));
                                auVar336 = ZEXT1664(auVar203);
                              }
                              uVar191 = uVar191 + 8;
                              iVar163 = iVar163 + iVar10;
                              uVar185 = uVar185 - 1;
                            } while (uVar185 != 0);
                          }
                          uVar186 = uVar186 + 1;
                          uVar181 = uVar181 + (ulong)uVar160 * 8;
                        } while (uVar186 != uVar190);
                      }
                      auVar257 = auVar336._0_32_;
                      pvVar183 = (void *)((long)pvVar183 + (long)(int)(uVar160 * uVar190 * 8) * 4);
                      uVar171 = uVar171 + 1;
                    } while (uVar171 != uVar169);
                  }
                  auVar204._0_4_ = auVar257._16_4_ + auVar257._0_4_;
                  auVar204._4_4_ = auVar257._20_4_ + auVar257._4_4_;
                  auVar204._8_4_ = auVar257._24_4_ + auVar257._8_4_;
                  auVar204._12_4_ = auVar257._28_4_ + auVar257._12_4_;
                  auVar203 = vshufpd_avx(auVar204,auVar204,1);
                  auVar205._0_4_ = auVar203._0_4_ + auVar204._0_4_;
                  auVar205._4_4_ = auVar203._4_4_ + auVar204._4_4_;
                  auVar205._8_4_ = auVar203._8_4_ + auVar204._8_4_;
                  auVar205._12_4_ = auVar203._12_4_ + auVar204._12_4_;
                  auVar203 = vmovshdup_avx(auVar205);
                  fVar379 = auVar203._0_4_ + fVar379 + auVar205._0_4_;
                  auVar203 = ZEXT416((uint)fVar379);
                  fVar395 = fVar379;
                  if (iVar180 - 1U < 6) {
                    switch(iVar180) {
                    case 1:
                      auVar203 = vmaxss_avx(ZEXT416((uint)fVar379),ZEXT416(0));
                      fVar395 = auVar203._0_4_;
                      break;
                    case 2:
                      uVar40 = vcmpss_avx512f(ZEXT416((uint)fVar379),ZEXT416(0),0xe);
                      bVar199 = (bool)((byte)uVar40 & 1);
                      fVar395 = (float)((uint)bVar199 * 0x3f800000 + (uint)!bVar199 * (int)*pfVar198
                                       ) * fVar379;
                      break;
                    case 3:
                      auVar203 = vmaxss_avx(auVar203,ZEXT416((uint)*pfVar198));
                      fVar395 = auVar203._0_4_;
                      if (pfVar198[1] < auVar203._0_4_) {
                        fVar395 = pfVar198[1];
                      }
                      break;
                    case 4:
                      auVar203 = vminss_avx(auVar203,SUB6416(ZEXT464(0x42b0c0a5),0));
                      auVar63._8_4_ = 0x80000000;
                      auVar63._0_8_ = 0x8000000080000000;
                      auVar63._12_4_ = 0x80000000;
                      auVar204 = vxorps_avx512vl(auVar203,auVar63);
                      uVar40 = vcmpss_avx512f(auVar203,ZEXT416(0xc2b0c0a5),1);
                      bVar199 = (bool)((byte)uVar40 & 1);
                      in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                      fVar379 = expf((float)((uint)bVar199 * 0x42b0c0a5 +
                                            (uint)!bVar199 * auVar204._0_4_));
                      fVar395 = 1.0 / (fVar379 + 1.0);
                      break;
                    case 5:
                      in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                      fVar395 = expf(fVar379);
                      fVar395 = logf(fVar395 + 1.0);
                      fVar395 = tanhf(fVar395);
                      fVar395 = fVar395 * fVar379;
                      break;
                    case 6:
                      fVar5 = *pfVar198;
                      auVar226._8_4_ = 0x80000000;
                      auVar226._0_8_ = 0x8000000080000000;
                      auVar226._12_4_ = 0x80000000;
                      auVar204 = vxorps_avx512vl(ZEXT416((uint)pfVar198[1]),auVar226);
                      fVar402 = auVar204._0_4_ / fVar5;
                      fVar395 = 0.0;
                      if ((fVar402 <= fVar379) &&
                         (fVar395 = fVar379, fVar379 <= fVar402 + 1.0 / fVar5)) {
                        auVar203 = vfmadd213ss_fma(ZEXT416((uint)fVar5),auVar203,
                                                   ZEXT416((uint)pfVar198[1]));
                        fVar395 = auVar203._0_4_ * fVar379;
                      }
                    }
                  }
                  *(float *)&local_2d8->_vptr_Allocator = fVar395;
                  local_2d8 = (Allocator *)((long)&local_2d8->_vptr_Allocator + 4);
                  uVar170 = uVar170 + 1;
                  iVar161 = iVar161 + 1;
                } while (uVar170 != iVar173);
              }
              iVar194 = iVar194 + 1;
            } while (iVar194 != local_1a8._0_4_);
          }
          local_300 = (_func_int **)((long)local_300 + 1);
        } while (local_300 != local_1d8);
      }
      iVar10 = local_228.w;
      pvVar197 = local_228.data;
      if ((uVar176 == 4 && local_1b8 == 0) && (0 < (long)local_228.c)) {
        p_Var168 = pp_Var13[-3];
        iVar11 = *(int *)(&this->field_0xdc + (long)p_Var168);
        iVar173 = *(int *)(&this->field_0xe0 + (long)p_Var168);
        iVar175 = *(int *)(&this->field_0xe4 + (long)p_Var168);
        iVar172 = *(int *)(&this->field_0xe8 + (long)p_Var168);
        uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var168);
        lVar192 = *(long *)(&this->field_0x1a8 + (long)p_Var168);
        uVar160 = *(uint *)(&this->field_0xd4 + (long)p_Var168);
        uVar190 = *(uint *)(&this->field_0xd8 + (long)p_Var168);
        iVar180 = (1 - uVar160) * iVar11;
        local_168._0_4_ = iVar180;
        local_300 = (_func_int **)0x0;
        auVar234 = ZEXT816(0) << 0x40;
        auVar397._8_4_ = 0x42b0c0a5;
        auVar397._0_8_ = 0x42b0c0a542b0c0a5;
        auVar397._12_4_ = 0x42b0c0a5;
        auVar404._8_4_ = 0xc2b0c0a5;
        auVar404._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar404._12_4_ = 0xc2b0c0a5;
        auVar410._8_4_ = 0x3f000000;
        auVar410._0_8_ = 0x3f0000003f000000;
        auVar410._12_4_ = 0x3f000000;
        auVar416._8_4_ = 0x3fb8aa3b;
        auVar416._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar416._12_4_ = 0x3fb8aa3b;
        auVar422._8_4_ = 0x3f800000;
        auVar422._0_8_ = 0x3f8000003f800000;
        auVar422._12_4_ = 0x3f800000;
        auVar428._8_4_ = 0x3f318000;
        auVar428._0_8_ = 0x3f3180003f318000;
        auVar428._12_4_ = 0x3f318000;
        auVar203 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar487._8_4_ = 0x3ab743ce;
        auVar487._0_8_ = 0x3ab743ce3ab743ce;
        auVar487._12_4_ = 0x3ab743ce;
        auVar493._8_4_ = 0x3c088908;
        auVar493._0_8_ = 0x3c0889083c088908;
        auVar493._12_4_ = 0x3c088908;
        auVar499._8_4_ = 0x3d2aa9c1;
        auVar499._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar499._12_4_ = 0x3d2aa9c1;
        auVar505._8_4_ = 0x3e2aaaaa;
        auVar505._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar505._12_4_ = 0x3e2aaaaa;
        auVar511._8_4_ = 0x3f800000;
        auVar511._0_8_ = 0x3f8000003f800000;
        auVar511._12_4_ = 0x3f800000;
        auVar517._8_4_ = 0xb95e8083;
        auVar517._0_8_ = 0xb95e8083b95e8083;
        auVar517._12_4_ = 0xb95e8083;
        auVar204 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar205 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar226 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar227 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar228 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar229 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar230 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar231 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar232 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar244 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar237 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar233 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        do {
          local_1a8._0_4_ = local_228.h;
          if (0 < local_228.h) {
            iVar189 = bottom_blob->w;
            iVar195 = bottom_blob->h;
            pAVar188 = (Allocator *)
                       ((long)(_func_int ***)local_228.data +
                       local_228.cstep * (long)local_300 * local_228.elemsize);
            uVar169 = bottom_blob->c;
            iVar194 = 0;
            do {
              if (0 < local_228.w) {
                uVar170 = 0;
                iVar161 = iVar180;
                do {
                  if (lVar192 == 0) {
                    auVar235 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar235 = *(undefined1 (*) [16])(lVar192 + (long)local_300 * 0x10);
                  }
                  auVar336 = ZEXT1664(auVar235);
                  if (0 < (int)uVar169) {
                    pvVar196 = (void *)((this->weight_data_tm).cstep * (long)local_300 *
                                        (this->weight_data_tm).elemsize +
                                       (long)(this->weight_data_tm).data);
                    pvVar183 = bottom_blob->data;
                    uVar171 = 0;
                    do {
                      if (0 < (int)uVar190) {
                        uVar186 = 0;
                        uVar181 = 0;
                        do {
                          iVar162 = (((int)uVar181 - uVar190) + 1) * iVar173 + iVar194;
                          if ((((-1 < iVar162) &&
                               (iVar163 = iVar162 / iVar172, iVar162 % iVar172 == 0)) &&
                              (0 < (int)uVar160)) && (iVar163 < iVar195)) {
                            lVar187 = (long)iVar163 * (long)bottom_blob->w * bottom_blob->elemsize +
                                      bottom_blob->cstep * bottom_blob->elemsize * uVar171;
                            uVar185 = (ulong)uVar160;
                            uVar191 = uVar186;
                            iVar162 = iVar161;
                            do {
                              if (((-1 < iVar162) &&
                                  (iVar163 = iVar162 / iVar175, iVar162 % iVar175 == 0)) &&
                                 (iVar163 < iVar189)) {
                                lVar166 = (long)(iVar163 << 2);
                                uVar4 = *(undefined4 *)((long)pvVar183 + lVar166 * 4 + lVar187);
                                auVar440._4_4_ = uVar4;
                                auVar440._0_4_ = uVar4;
                                auVar440._8_4_ = uVar4;
                                auVar440._12_4_ = uVar4;
                                uVar4 = *(undefined4 *)((long)pvVar183 + lVar166 * 4 + lVar187 + 4);
                                auVar468._4_4_ = uVar4;
                                auVar468._0_4_ = uVar4;
                                auVar468._8_4_ = uVar4;
                                auVar468._12_4_ = uVar4;
                                in_ZMM9 = ZEXT1664(auVar468);
                                auVar236 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar183 +
                                                                       lVar166 * 4 + lVar187 + 8)));
                                in_ZMM16 = ZEXT1664(auVar236);
                                auVar206 = vbroadcastss_avx512vl
                                                     (ZEXT416(*(uint *)((long)pvVar183 +
                                                                       lVar166 * 4 + lVar187 + 0xc))
                                                     );
                                in_ZMM17 = ZEXT1664(auVar206);
                                uVar201 = uVar191 & 0xffffffff;
                                auVar235 = vfmadd231ps_fma(auVar336._0_16_,auVar440,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar196 + uVar201 * 4));
                                auVar235 = vfmadd231ps_fma(auVar235,auVar468,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar196 + uVar201 * 4 + 0x10));
                                auVar235 = vfmadd231ps_avx512vl
                                                     (auVar235,auVar236,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar196 + uVar201 * 4 + 0x20));
                                auVar235 = vfmadd231ps_avx512vl
                                                     (auVar235,auVar206,
                                                      *(undefined1 (*) [16])
                                                       ((long)pvVar196 + uVar201 * 4 + 0x30));
                                auVar336 = ZEXT1664(auVar235);
                              }
                              uVar191 = uVar191 + 0x10;
                              iVar162 = iVar162 + iVar11;
                              uVar185 = uVar185 - 1;
                            } while (uVar185 != 0);
                          }
                          uVar181 = uVar181 + 1;
                          uVar186 = uVar186 + (ulong)uVar160 * 0x10;
                        } while (uVar181 != uVar190);
                      }
                      auVar235 = auVar336._0_16_;
                      pvVar196 = (void *)((long)pvVar196 + (long)(int)(uVar160 * uVar190 * 0x10) * 4
                                         );
                      uVar171 = uVar171 + 1;
                    } while (uVar171 != uVar169);
                  }
                  switch(uVar12) {
                  case 1:
                    auVar235 = vmaxps_avx(auVar235,auVar234);
                    break;
                  case 2:
                    auVar236 = vmaxps_avx(auVar235,auVar234);
                    auVar235 = vminps_avx(auVar235,auVar234);
                    uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                    auVar72._4_4_ = uVar4;
                    auVar72._0_4_ = uVar4;
                    auVar72._8_4_ = uVar4;
                    auVar72._12_4_ = uVar4;
                    auVar235 = vfmadd132ps_avx512vl(auVar235,auVar236,auVar72);
                    break;
                  case 3:
                    uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                    auVar70._4_4_ = uVar4;
                    auVar70._0_4_ = uVar4;
                    auVar70._8_4_ = uVar4;
                    auVar70._12_4_ = uVar4;
                    auVar235 = vmaxps_avx512vl(auVar235,auVar70);
                    uVar4 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var168))[1];
                    auVar71._4_4_ = uVar4;
                    auVar71._0_4_ = uVar4;
                    auVar71._8_4_ = uVar4;
                    auVar71._12_4_ = uVar4;
                    auVar235 = vminps_avx512vl(auVar235,auVar71);
                    break;
                  case 4:
                    auVar68._8_4_ = 0x80000000;
                    auVar68._0_8_ = 0x8000000080000000;
                    auVar68._12_4_ = 0x80000000;
                    auVar235 = vxorps_avx512vl(auVar235,auVar68);
                    auVar235 = vminps_avx(auVar235,auVar397);
                    auVar235 = vmaxps_avx(auVar235,auVar404);
                    auVar236 = vfmadd231ps_fma(auVar410,auVar235,auVar416);
                    auVar206 = vcvttps2dq_avx512vl(auVar236);
                    auVar206 = vcvtdq2ps_avx512vl(auVar206);
                    uVar171 = vcmpps_avx512vl(auVar236,auVar206,1);
                    auVar236 = vsubps_avx512vl(auVar206,auVar422);
                    bVar199 = (bool)((byte)uVar171 & 1);
                    auVar250._0_4_ =
                         (uint)bVar199 * auVar236._0_4_ | (uint)!bVar199 * auVar206._0_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                    auVar250._4_4_ =
                         (uint)bVar199 * auVar236._4_4_ | (uint)!bVar199 * auVar206._4_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                    auVar250._8_4_ =
                         (uint)bVar199 * auVar236._8_4_ | (uint)!bVar199 * auVar206._8_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                    auVar250._12_4_ =
                         (uint)bVar199 * auVar236._12_4_ | (uint)!bVar199 * auVar206._12_4_;
                    in_ZMM16 = ZEXT1664(auVar250);
                    auVar235 = vfmsub231ps_avx512vl(auVar235,auVar250,auVar428);
                    auVar69._8_4_ = 0x395e8083;
                    auVar69._0_8_ = 0x395e8083395e8083;
                    auVar69._12_4_ = 0x395e8083;
                    auVar236 = vfmsub231ps_avx512vl(auVar235,auVar250,auVar69);
                    auVar441._0_4_ = auVar236._0_4_ * auVar236._0_4_;
                    auVar441._4_4_ = auVar236._4_4_ * auVar236._4_4_;
                    auVar441._8_4_ = auVar236._8_4_ * auVar236._8_4_;
                    auVar441._12_4_ = auVar236._12_4_ * auVar236._12_4_;
                    auVar235 = vfmadd213ps_fma(auVar203,auVar236,auVar487);
                    auVar235 = vfmadd213ps_fma(auVar235,auVar236,auVar493);
                    auVar235 = vfmadd213ps_fma(auVar235,auVar236,auVar499);
                    auVar235 = vfmadd213ps_fma(auVar235,auVar236,auVar505);
                    auVar235 = vfmadd213ps_fma(auVar235,auVar236,auVar410);
                    auVar235 = vfmadd213ps_fma(auVar235,auVar441,auVar236);
                    in_ZMM9 = ZEXT1664(auVar235);
                    auVar442._0_4_ = auVar235._0_4_ + 1.0;
                    auVar442._4_4_ = auVar235._4_4_ + 1.0;
                    auVar442._8_4_ = auVar235._8_4_ + 1.0;
                    auVar442._12_4_ = auVar235._12_4_ + 1.0;
                    auVar235 = vcvttps2dq_avx512vl(auVar250);
                    auVar235 = vpslld_avx(auVar235,0x17);
                    auVar235 = vpaddd_avx(auVar511,auVar235);
                    auVar236 = vfmadd213ps_fma(auVar235,auVar442,auVar422);
                    auVar235 = vrcpps_avx(auVar236);
                    auVar236 = vfmsub213ps_fma(auVar236,auVar235,auVar422);
                    auVar235 = vfnmadd132ps_fma(auVar236,auVar235,auVar235);
                    break;
                  case 5:
                    auVar236 = vminps_avx(auVar235,auVar397);
                    auVar236 = vmaxps_avx(auVar236,auVar404);
                    auVar206 = vfmadd213ps_fma(auVar416,auVar236,auVar410);
                    auVar207 = vcvttps2dq_avx512vl(auVar206);
                    auVar207 = vcvtdq2ps_avx512vl(auVar207);
                    uVar171 = vcmpps_avx512vl(auVar206,auVar207,1);
                    auVar206 = vsubps_avx512vl(auVar207,auVar422);
                    bVar199 = (bool)((byte)uVar171 & 1);
                    auVar245._0_4_ =
                         (uint)bVar199 * auVar206._0_4_ | (uint)!bVar199 * auVar207._0_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                    auVar245._4_4_ =
                         (uint)bVar199 * auVar206._4_4_ | (uint)!bVar199 * auVar207._4_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                    auVar245._8_4_ =
                         (uint)bVar199 * auVar206._8_4_ | (uint)!bVar199 * auVar207._8_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                    auVar245._12_4_ =
                         (uint)bVar199 * auVar206._12_4_ | (uint)!bVar199 * auVar207._12_4_;
                    auVar236 = vfmsub231ps_avx512vl(auVar236,auVar245,auVar428);
                    auVar236 = vfnmsub231ps_avx512vl(auVar236,auVar245,auVar517);
                    auVar469._0_4_ = auVar236._0_4_ * auVar236._0_4_;
                    auVar469._4_4_ = auVar236._4_4_ * auVar236._4_4_;
                    auVar469._8_4_ = auVar236._8_4_ * auVar236._8_4_;
                    auVar469._12_4_ = auVar236._12_4_ * auVar236._12_4_;
                    auVar206 = vfmadd213ps_avx512vl(auVar203,auVar236,auVar487);
                    auVar206 = vfmadd213ps_avx512vl(auVar206,auVar236,auVar493);
                    auVar206 = vfmadd213ps_avx512vl(auVar206,auVar236,auVar499);
                    auVar206 = vfmadd213ps_avx512vl(auVar206,auVar236,auVar505);
                    auVar206 = vfmadd213ps_avx512vl(auVar206,auVar236,auVar410);
                    auVar236 = vfmadd213ps_avx512vl(auVar206,auVar469,auVar236);
                    auVar206 = vaddps_avx512vl(auVar236,auVar422);
                    auVar236 = vcvttps2dq_avx512vl(auVar245);
                    auVar236 = vpslld_avx(auVar236,0x17);
                    auVar236 = vpaddd_avx(auVar236,auVar511);
                    auVar236 = vfmadd213ps_fma(auVar236,auVar206,auVar422);
                    uVar171 = vcmpps_avx512vl(auVar236,auVar234,2);
                    auVar65._8_4_ = 0x800000;
                    auVar65._0_8_ = 0x80000000800000;
                    auVar65._12_4_ = 0x800000;
                    auVar236 = vmaxps_avx512vl(auVar236,auVar65);
                    auVar208 = vpsrld_avx(auVar236,0x17);
                    auVar206 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar66._8_4_ = 0x3f000000;
                    auVar66._0_8_ = 0x3f0000003f000000;
                    auVar66._12_4_ = 0x3f000000;
                    auVar236 = vpternlogd_avx512vl(auVar236,auVar206,auVar66,0xea);
                    uVar186 = vcmpps_avx512vl(auVar236,auVar204,1);
                    auVar206 = vaddps_avx512vl(auVar236,auVar205);
                    auVar236 = vaddps_avx512vl(auVar206,auVar236);
                    bVar199 = (bool)((byte)uVar186 & 1);
                    auVar246._0_4_ =
                         (uint)bVar199 * auVar236._0_4_ | (uint)!bVar199 * auVar206._0_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 1) & 1);
                    auVar246._4_4_ =
                         (uint)bVar199 * auVar236._4_4_ | (uint)!bVar199 * auVar206._4_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 2) & 1);
                    auVar246._8_4_ =
                         (uint)bVar199 * auVar236._8_4_ | (uint)!bVar199 * auVar206._8_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 3) & 1);
                    auVar246._12_4_ =
                         (uint)bVar199 * auVar236._12_4_ | (uint)!bVar199 * auVar206._12_4_;
                    auVar206 = vmulps_avx512vl(auVar246,auVar246);
                    auVar236 = vfmadd213ps_avx512vl(auVar226,auVar246,auVar227);
                    auVar236 = vfmadd213ps_avx512vl(auVar236,auVar246,auVar228);
                    auVar236 = vfmadd213ps_avx512vl(auVar236,auVar246,auVar229);
                    auVar236 = vfmadd213ps_avx512vl(auVar236,auVar246,auVar230);
                    auVar236 = vfmadd213ps_avx512vl(auVar236,auVar246,auVar231);
                    auVar236 = vfmadd213ps_avx512vl(auVar236,auVar246,auVar232);
                    auVar236 = vfmadd213ps_avx512vl(auVar236,auVar246,auVar244);
                    auVar236 = vfmadd213ps_avx512vl(auVar236,auVar246,auVar237);
                    auVar207 = vmulps_avx512vl(auVar206,auVar246);
                    auVar207 = vmulps_avx512vl(auVar207,auVar236);
                    auVar67._8_4_ = 0xffffff82;
                    auVar67._0_8_ = 0xffffff82ffffff82;
                    auVar67._12_4_ = 0xffffff82;
                    auVar236 = vpaddd_avx512vl(auVar208,auVar67);
                    auVar236 = vcvtdq2ps_avx(auVar236);
                    auVar208 = vsubps_avx512vl(auVar236,auVar422);
                    bVar199 = (bool)((byte)uVar186 & 1);
                    auVar247._0_4_ =
                         (uint)bVar199 * auVar208._0_4_ | (uint)!bVar199 * auVar236._0_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 1) & 1);
                    auVar247._4_4_ =
                         (uint)bVar199 * auVar208._4_4_ | (uint)!bVar199 * auVar236._4_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 2) & 1);
                    auVar247._8_4_ =
                         (uint)bVar199 * auVar208._8_4_ | (uint)!bVar199 * auVar236._8_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 3) & 1);
                    auVar247._12_4_ =
                         (uint)bVar199 * auVar208._12_4_ | (uint)!bVar199 * auVar236._12_4_;
                    auVar236 = vfmadd231ps_avx512vl(auVar207,auVar247,auVar517);
                    auVar236 = vfmsub231ps_avx512vl(auVar236,auVar410,auVar206);
                    auVar236 = vsubps_avx512vl(auVar236,auVar246);
                    auVar236 = vfnmadd231ps_fma(auVar236,auVar428,auVar247);
                    auVar206 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar199 = (bool)((byte)uVar171 & 1);
                    auVar248._0_4_ =
                         (uint)bVar199 * auVar206._0_4_ |
                         (uint)!bVar199 * (int)(auVar236._0_4_ + auVar236._0_4_);
                    bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                    auVar248._4_4_ =
                         (uint)bVar199 * auVar206._4_4_ |
                         (uint)!bVar199 * (int)(auVar236._4_4_ + auVar236._4_4_);
                    bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                    auVar248._8_4_ =
                         (uint)bVar199 * auVar206._8_4_ |
                         (uint)!bVar199 * (int)(auVar236._8_4_ + auVar236._8_4_);
                    bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                    auVar248._12_4_ =
                         (uint)bVar199 * auVar206._12_4_ |
                         (uint)!bVar199 * (int)(auVar236._12_4_ + auVar236._12_4_);
                    auVar236 = vminps_avx(auVar248,auVar397);
                    auVar236 = vmaxps_avx(auVar236,auVar404);
                    auVar206 = vfmadd213ps_fma(auVar416,auVar236,auVar410);
                    auVar207 = vcvttps2dq_avx512vl(auVar206);
                    auVar207 = vcvtdq2ps_avx512vl(auVar207);
                    uVar171 = vcmpps_avx512vl(auVar206,auVar207,1);
                    auVar206 = vsubps_avx512vl(auVar207,auVar422);
                    bVar199 = (bool)((byte)uVar171 & 1);
                    auVar249._0_4_ =
                         (uint)bVar199 * auVar206._0_4_ | (uint)!bVar199 * auVar207._0_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                    auVar249._4_4_ =
                         (uint)bVar199 * auVar206._4_4_ | (uint)!bVar199 * auVar207._4_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                    auVar249._8_4_ =
                         (uint)bVar199 * auVar206._8_4_ | (uint)!bVar199 * auVar207._8_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                    auVar249._12_4_ =
                         (uint)bVar199 * auVar206._12_4_ | (uint)!bVar199 * auVar207._12_4_;
                    auVar236 = vfmsub231ps_avx512vl(auVar236,auVar249,auVar428);
                    auVar236 = vfnmsub231ps_avx512vl(auVar236,auVar249,auVar517);
                    auVar470._0_4_ = auVar236._0_4_ * auVar236._0_4_;
                    auVar470._4_4_ = auVar236._4_4_ * auVar236._4_4_;
                    auVar470._8_4_ = auVar236._8_4_ * auVar236._8_4_;
                    auVar470._12_4_ = auVar236._12_4_ * auVar236._12_4_;
                    auVar206 = vfmadd213ps_avx512vl(auVar203,auVar236,auVar487);
                    auVar206 = vfmadd213ps_avx512vl(auVar206,auVar236,auVar493);
                    auVar206 = vfmadd213ps_avx512vl(auVar206,auVar236,auVar499);
                    auVar206 = vfmadd213ps_avx512vl(auVar206,auVar236,auVar505);
                    auVar206 = vfmadd213ps_avx512vl(auVar206,auVar236,auVar410);
                    auVar236 = vfmadd213ps_avx512vl(auVar206,auVar470,auVar236);
                    in_ZMM17 = ZEXT1664(auVar236);
                    auVar206 = vaddps_avx512vl(auVar236,auVar422);
                    auVar236 = vcvttps2dq_avx512vl(auVar249);
                    auVar236 = vpslld_avx(auVar236,0x17);
                    auVar236 = vpaddd_avx(auVar236,auVar511);
                    auVar206 = vfmadd213ps_fma(auVar236,auVar206,auVar422);
                    auVar236 = vrcpps_avx(auVar206);
                    auVar207 = vaddps_avx512vl(auVar236,auVar236);
                    in_ZMM16 = ZEXT1664(auVar207);
                    auVar206 = vfmsub213ps_avx512vl(auVar206,auVar207,auVar233);
                    auVar236 = vfnmadd213ps_avx512vl(auVar206,auVar236,auVar207);
                    in_ZMM9 = ZEXT1664(auVar236);
                    auVar235 = vfmsub231ps_fma(auVar235,auVar235,auVar236);
                    break;
                  case 6:
                    uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                    auVar443._4_4_ = uVar4;
                    auVar443._0_4_ = uVar4;
                    auVar443._8_4_ = uVar4;
                    auVar443._12_4_ = uVar4;
                    uVar4 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var168))[1];
                    auVar64._4_4_ = uVar4;
                    auVar64._0_4_ = uVar4;
                    auVar64._8_4_ = uVar4;
                    auVar64._12_4_ = uVar4;
                    auVar236 = vfmadd213ps_avx512vl(auVar443,auVar235,auVar64);
                    auVar236 = vmaxps_avx(auVar236,auVar234);
                    auVar236 = vminps_avx(auVar236,auVar422);
                    auVar384._0_4_ = auVar236._0_4_ * auVar235._0_4_;
                    auVar384._4_4_ = auVar236._4_4_ * auVar235._4_4_;
                    auVar384._8_4_ = auVar236._8_4_ * auVar235._8_4_;
                    auVar384._12_4_ = auVar236._12_4_ * auVar235._12_4_;
                    auVar235 = auVar384;
                  }
                  *(undefined1 (*) [16])pAVar188 = auVar235;
                  pAVar188 = pAVar188 + 2;
                  uVar170 = uVar170 + 1;
                  iVar161 = iVar161 + 1;
                } while (uVar170 != local_228.w);
              }
              iVar194 = iVar194 + 1;
            } while (iVar194 != local_228.h);
          }
          local_300 = (_func_int **)((long)local_300 + 1);
        } while (local_300 != (_func_int **)(long)local_228.c);
      }
      local_1b8 = local_1b8 | uVar176 ^ 1;
      if ((local_1b8 == 0) && (0 < (long)local_228.c)) {
        p_Var168 = pp_Var13[-3];
        iVar11 = *(int *)(&this->field_0xdc + (long)p_Var168);
        iVar173 = *(int *)(&this->field_0xe0 + (long)p_Var168);
        iVar175 = *(int *)(&this->field_0xe4 + (long)p_Var168);
        iVar172 = *(int *)(&this->field_0xe8 + (long)p_Var168);
        uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var168);
        lVar192 = *(long *)(&this->field_0x1a8 + (long)p_Var168);
        uVar160 = *(uint *)(&this->field_0xd4 + (long)p_Var168);
        uVar190 = *(uint *)(&this->field_0xd8 + (long)p_Var168);
        iVar180 = (1 - uVar160) * iVar11;
        local_168._0_4_ = iVar180;
        local_300 = (_func_int **)0x0;
        auVar234 = ZEXT816(0) << 0x40;
        auVar398._8_4_ = 0x42b0c0a5;
        auVar398._0_8_ = 0x42b0c0a542b0c0a5;
        auVar398._12_4_ = 0x42b0c0a5;
        auVar405._8_4_ = 0xc2b0c0a5;
        auVar405._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar405._12_4_ = 0xc2b0c0a5;
        auVar411._8_4_ = 0x3f000000;
        auVar411._0_8_ = 0x3f0000003f000000;
        auVar411._12_4_ = 0x3f000000;
        auVar417._8_4_ = 0x3fb8aa3b;
        auVar417._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar417._12_4_ = 0x3fb8aa3b;
        auVar423._8_4_ = 0x3f800000;
        auVar423._0_8_ = 0x3f8000003f800000;
        auVar423._12_4_ = 0x3f800000;
        auVar429._8_4_ = 0x3f318000;
        auVar429._0_8_ = 0x3f3180003f318000;
        auVar429._12_4_ = 0x3f318000;
        auVar203 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar488._8_4_ = 0x3ab743ce;
        auVar488._0_8_ = 0x3ab743ce3ab743ce;
        auVar488._12_4_ = 0x3ab743ce;
        auVar494._8_4_ = 0x3c088908;
        auVar494._0_8_ = 0x3c0889083c088908;
        auVar494._12_4_ = 0x3c088908;
        auVar500._8_4_ = 0x3d2aa9c1;
        auVar500._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar500._12_4_ = 0x3d2aa9c1;
        auVar506._8_4_ = 0x3e2aaaaa;
        auVar506._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar506._12_4_ = 0x3e2aaaaa;
        auVar512._8_4_ = 0x3f800000;
        auVar512._0_8_ = 0x3f8000003f800000;
        auVar512._12_4_ = 0x3f800000;
        auVar518._8_4_ = 0xb95e8083;
        auVar518._0_8_ = 0xb95e8083b95e8083;
        auVar518._12_4_ = 0xb95e8083;
        auVar204 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar205 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar226 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar227 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar228 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar229 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar230 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar231 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar232 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar244 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar237 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar233 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        do {
          local_1a8._0_4_ = local_228.h;
          if (0 < local_228.h) {
            iVar189 = bottom_blob->w;
            iVar195 = bottom_blob->h;
            pAVar188 = (Allocator *)
                       ((long)(_func_int ***)local_228.data +
                       local_228.cstep * (long)local_300 * local_228.elemsize);
            uVar169 = bottom_blob->c;
            iVar194 = 0;
            do {
              if (0 < local_228.w) {
                uVar170 = 0;
                iVar161 = iVar180;
                do {
                  if (lVar192 == 0) {
                    auVar235 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar235 = *(undefined1 (*) [16])(lVar192 + (long)local_300 * 0x10);
                  }
                  auVar336 = ZEXT1664(auVar235);
                  if (0 < (int)uVar169) {
                    pvVar196 = (void *)((this->weight_data_tm).cstep * (long)local_300 *
                                        (this->weight_data_tm).elemsize +
                                       (long)(this->weight_data_tm).data);
                    uVar171 = 0;
                    do {
                      if (0 < (int)uVar190) {
                        uVar181 = 0;
                        uVar186 = 0;
                        do {
                          iVar162 = (((int)uVar186 - uVar190) + 1) * iVar173 + iVar194;
                          if ((((-1 < iVar162) &&
                               (iVar163 = iVar162 / iVar172, iVar162 % iVar172 == 0)) &&
                              (iVar163 < iVar195)) && (0 < (int)uVar160)) {
                            uVar185 = (ulong)uVar160;
                            uVar191 = uVar181;
                            iVar162 = iVar161;
                            do {
                              if (((-1 < iVar162) &&
                                  (iVar164 = iVar162 / iVar175, iVar162 % iVar175 == 0)) &&
                                 (iVar164 < iVar189)) {
                                uVar4 = *(undefined4 *)
                                         ((long)bottom_blob->data +
                                         (long)iVar164 * 4 +
                                         (long)iVar163 *
                                         (long)bottom_blob->w * bottom_blob->elemsize +
                                         bottom_blob->cstep * bottom_blob->elemsize * uVar171);
                                auVar444._4_4_ = uVar4;
                                auVar444._0_4_ = uVar4;
                                auVar444._8_4_ = uVar4;
                                auVar444._12_4_ = uVar4;
                                auVar235 = vfmadd231ps_fma(auVar336._0_16_,auVar444,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar196 +
                                                            (uVar191 & 0xffffffff) * 4));
                                auVar336 = ZEXT1664(auVar235);
                              }
                              uVar191 = uVar191 + 4;
                              iVar162 = iVar162 + iVar11;
                              uVar185 = uVar185 - 1;
                            } while (uVar185 != 0);
                          }
                          uVar186 = uVar186 + 1;
                          uVar181 = uVar181 + (ulong)uVar160 * 4;
                        } while (uVar186 != uVar190);
                      }
                      auVar235 = auVar336._0_16_;
                      pvVar196 = (void *)((long)pvVar196 + (long)(int)(uVar160 * uVar190 * 4) * 4);
                      uVar171 = uVar171 + 1;
                    } while (uVar171 != uVar169);
                  }
                  switch(uVar12) {
                  case 1:
                    auVar235 = vmaxps_avx(auVar235,auVar234);
                    break;
                  case 2:
                    auVar236 = vmaxps_avx(auVar235,auVar234);
                    auVar235 = vminps_avx(auVar235,auVar234);
                    uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                    auVar81._4_4_ = uVar4;
                    auVar81._0_4_ = uVar4;
                    auVar81._8_4_ = uVar4;
                    auVar81._12_4_ = uVar4;
                    auVar235 = vfmadd132ps_avx512vl(auVar235,auVar236,auVar81);
                    break;
                  case 3:
                    uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                    auVar79._4_4_ = uVar4;
                    auVar79._0_4_ = uVar4;
                    auVar79._8_4_ = uVar4;
                    auVar79._12_4_ = uVar4;
                    auVar235 = vmaxps_avx512vl(auVar235,auVar79);
                    uVar4 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var168))[1];
                    auVar80._4_4_ = uVar4;
                    auVar80._0_4_ = uVar4;
                    auVar80._8_4_ = uVar4;
                    auVar80._12_4_ = uVar4;
                    auVar235 = vminps_avx512vl(auVar235,auVar80);
                    break;
                  case 4:
                    auVar77._8_4_ = 0x80000000;
                    auVar77._0_8_ = 0x8000000080000000;
                    auVar77._12_4_ = 0x80000000;
                    auVar235 = vxorps_avx512vl(auVar235,auVar77);
                    auVar235 = vminps_avx(auVar235,auVar398);
                    auVar235 = vmaxps_avx(auVar235,auVar405);
                    auVar236 = vfmadd231ps_fma(auVar411,auVar235,auVar417);
                    auVar206 = vcvttps2dq_avx512vl(auVar236);
                    auVar206 = vcvtdq2ps_avx512vl(auVar206);
                    uVar171 = vcmpps_avx512vl(auVar236,auVar206,1);
                    auVar236 = vsubps_avx512vl(auVar206,auVar423);
                    bVar199 = (bool)((byte)uVar171 & 1);
                    auVar256._0_4_ =
                         (uint)bVar199 * auVar236._0_4_ | (uint)!bVar199 * auVar206._0_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                    auVar256._4_4_ =
                         (uint)bVar199 * auVar236._4_4_ | (uint)!bVar199 * auVar206._4_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                    auVar256._8_4_ =
                         (uint)bVar199 * auVar236._8_4_ | (uint)!bVar199 * auVar206._8_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                    auVar256._12_4_ =
                         (uint)bVar199 * auVar236._12_4_ | (uint)!bVar199 * auVar206._12_4_;
                    in_ZMM16 = ZEXT1664(auVar256);
                    auVar235 = vfmsub231ps_avx512vl(auVar235,auVar256,auVar429);
                    auVar78._8_4_ = 0x395e8083;
                    auVar78._0_8_ = 0x395e8083395e8083;
                    auVar78._12_4_ = 0x395e8083;
                    auVar236 = vfmsub231ps_avx512vl(auVar235,auVar256,auVar78);
                    auVar445._0_4_ = auVar236._0_4_ * auVar236._0_4_;
                    auVar445._4_4_ = auVar236._4_4_ * auVar236._4_4_;
                    auVar445._8_4_ = auVar236._8_4_ * auVar236._8_4_;
                    auVar445._12_4_ = auVar236._12_4_ * auVar236._12_4_;
                    auVar235 = vfmadd213ps_fma(auVar203,auVar236,auVar488);
                    auVar235 = vfmadd213ps_fma(auVar235,auVar236,auVar494);
                    auVar235 = vfmadd213ps_fma(auVar235,auVar236,auVar500);
                    auVar235 = vfmadd213ps_fma(auVar235,auVar236,auVar506);
                    auVar235 = vfmadd213ps_fma(auVar235,auVar236,auVar411);
                    auVar235 = vfmadd213ps_fma(auVar235,auVar445,auVar236);
                    in_ZMM9 = ZEXT1664(auVar235);
                    auVar446._0_4_ = auVar235._0_4_ + 1.0;
                    auVar446._4_4_ = auVar235._4_4_ + 1.0;
                    auVar446._8_4_ = auVar235._8_4_ + 1.0;
                    auVar446._12_4_ = auVar235._12_4_ + 1.0;
                    auVar235 = vcvttps2dq_avx512vl(auVar256);
                    auVar235 = vpslld_avx(auVar235,0x17);
                    auVar235 = vpaddd_avx(auVar512,auVar235);
                    auVar236 = vfmadd213ps_fma(auVar235,auVar446,auVar423);
                    auVar235 = vrcpps_avx(auVar236);
                    auVar236 = vfmsub213ps_fma(auVar236,auVar235,auVar423);
                    auVar235 = vfnmadd132ps_fma(auVar236,auVar235,auVar235);
                    break;
                  case 5:
                    auVar236 = vminps_avx(auVar235,auVar398);
                    auVar236 = vmaxps_avx(auVar236,auVar405);
                    auVar206 = vfmadd213ps_fma(auVar417,auVar236,auVar411);
                    auVar207 = vcvttps2dq_avx512vl(auVar206);
                    auVar207 = vcvtdq2ps_avx512vl(auVar207);
                    uVar171 = vcmpps_avx512vl(auVar206,auVar207,1);
                    auVar206 = vsubps_avx512vl(auVar207,auVar423);
                    bVar199 = (bool)((byte)uVar171 & 1);
                    auVar251._0_4_ =
                         (uint)bVar199 * auVar206._0_4_ | (uint)!bVar199 * auVar207._0_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                    auVar251._4_4_ =
                         (uint)bVar199 * auVar206._4_4_ | (uint)!bVar199 * auVar207._4_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                    auVar251._8_4_ =
                         (uint)bVar199 * auVar206._8_4_ | (uint)!bVar199 * auVar207._8_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                    auVar251._12_4_ =
                         (uint)bVar199 * auVar206._12_4_ | (uint)!bVar199 * auVar207._12_4_;
                    auVar236 = vfmsub231ps_avx512vl(auVar236,auVar251,auVar429);
                    auVar236 = vfnmsub231ps_avx512vl(auVar236,auVar251,auVar518);
                    auVar471._0_4_ = auVar236._0_4_ * auVar236._0_4_;
                    auVar471._4_4_ = auVar236._4_4_ * auVar236._4_4_;
                    auVar471._8_4_ = auVar236._8_4_ * auVar236._8_4_;
                    auVar471._12_4_ = auVar236._12_4_ * auVar236._12_4_;
                    auVar206 = vfmadd213ps_avx512vl(auVar203,auVar236,auVar488);
                    auVar206 = vfmadd213ps_avx512vl(auVar206,auVar236,auVar494);
                    auVar206 = vfmadd213ps_avx512vl(auVar206,auVar236,auVar500);
                    auVar206 = vfmadd213ps_avx512vl(auVar206,auVar236,auVar506);
                    auVar206 = vfmadd213ps_avx512vl(auVar206,auVar236,auVar411);
                    auVar236 = vfmadd213ps_avx512vl(auVar206,auVar471,auVar236);
                    auVar206 = vaddps_avx512vl(auVar236,auVar423);
                    auVar236 = vcvttps2dq_avx512vl(auVar251);
                    auVar236 = vpslld_avx(auVar236,0x17);
                    auVar236 = vpaddd_avx(auVar236,auVar512);
                    auVar236 = vfmadd213ps_fma(auVar236,auVar206,auVar423);
                    uVar171 = vcmpps_avx512vl(auVar236,auVar234,2);
                    auVar74._8_4_ = 0x800000;
                    auVar74._0_8_ = 0x80000000800000;
                    auVar74._12_4_ = 0x800000;
                    auVar236 = vmaxps_avx512vl(auVar236,auVar74);
                    auVar208 = vpsrld_avx(auVar236,0x17);
                    auVar206 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar75._8_4_ = 0x3f000000;
                    auVar75._0_8_ = 0x3f0000003f000000;
                    auVar75._12_4_ = 0x3f000000;
                    auVar236 = vpternlogd_avx512vl(auVar236,auVar206,auVar75,0xea);
                    uVar186 = vcmpps_avx512vl(auVar236,auVar204,1);
                    auVar206 = vaddps_avx512vl(auVar236,auVar205);
                    auVar236 = vaddps_avx512vl(auVar206,auVar236);
                    bVar199 = (bool)((byte)uVar186 & 1);
                    auVar252._0_4_ =
                         (uint)bVar199 * auVar236._0_4_ | (uint)!bVar199 * auVar206._0_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 1) & 1);
                    auVar252._4_4_ =
                         (uint)bVar199 * auVar236._4_4_ | (uint)!bVar199 * auVar206._4_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 2) & 1);
                    auVar252._8_4_ =
                         (uint)bVar199 * auVar236._8_4_ | (uint)!bVar199 * auVar206._8_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 3) & 1);
                    auVar252._12_4_ =
                         (uint)bVar199 * auVar236._12_4_ | (uint)!bVar199 * auVar206._12_4_;
                    auVar206 = vmulps_avx512vl(auVar252,auVar252);
                    auVar236 = vfmadd213ps_avx512vl(auVar226,auVar252,auVar227);
                    auVar236 = vfmadd213ps_avx512vl(auVar236,auVar252,auVar228);
                    auVar236 = vfmadd213ps_avx512vl(auVar236,auVar252,auVar229);
                    auVar236 = vfmadd213ps_avx512vl(auVar236,auVar252,auVar230);
                    auVar236 = vfmadd213ps_avx512vl(auVar236,auVar252,auVar231);
                    auVar236 = vfmadd213ps_avx512vl(auVar236,auVar252,auVar232);
                    auVar236 = vfmadd213ps_avx512vl(auVar236,auVar252,auVar244);
                    auVar236 = vfmadd213ps_avx512vl(auVar236,auVar252,auVar237);
                    auVar207 = vmulps_avx512vl(auVar206,auVar252);
                    auVar207 = vmulps_avx512vl(auVar207,auVar236);
                    auVar76._8_4_ = 0xffffff82;
                    auVar76._0_8_ = 0xffffff82ffffff82;
                    auVar76._12_4_ = 0xffffff82;
                    auVar236 = vpaddd_avx512vl(auVar208,auVar76);
                    auVar236 = vcvtdq2ps_avx(auVar236);
                    auVar208 = vsubps_avx512vl(auVar236,auVar423);
                    bVar199 = (bool)((byte)uVar186 & 1);
                    auVar253._0_4_ =
                         (uint)bVar199 * auVar208._0_4_ | (uint)!bVar199 * auVar236._0_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 1) & 1);
                    auVar253._4_4_ =
                         (uint)bVar199 * auVar208._4_4_ | (uint)!bVar199 * auVar236._4_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 2) & 1);
                    auVar253._8_4_ =
                         (uint)bVar199 * auVar208._8_4_ | (uint)!bVar199 * auVar236._8_4_;
                    bVar199 = (bool)((byte)(uVar186 >> 3) & 1);
                    auVar253._12_4_ =
                         (uint)bVar199 * auVar208._12_4_ | (uint)!bVar199 * auVar236._12_4_;
                    auVar236 = vfmadd231ps_avx512vl(auVar207,auVar253,auVar518);
                    auVar236 = vfmsub231ps_avx512vl(auVar236,auVar411,auVar206);
                    auVar236 = vsubps_avx512vl(auVar236,auVar252);
                    auVar236 = vfnmadd231ps_fma(auVar236,auVar429,auVar253);
                    auVar206 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar199 = (bool)((byte)uVar171 & 1);
                    auVar254._0_4_ =
                         (uint)bVar199 * auVar206._0_4_ |
                         (uint)!bVar199 * (int)(auVar236._0_4_ + auVar236._0_4_);
                    bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                    auVar254._4_4_ =
                         (uint)bVar199 * auVar206._4_4_ |
                         (uint)!bVar199 * (int)(auVar236._4_4_ + auVar236._4_4_);
                    bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                    auVar254._8_4_ =
                         (uint)bVar199 * auVar206._8_4_ |
                         (uint)!bVar199 * (int)(auVar236._8_4_ + auVar236._8_4_);
                    bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                    auVar254._12_4_ =
                         (uint)bVar199 * auVar206._12_4_ |
                         (uint)!bVar199 * (int)(auVar236._12_4_ + auVar236._12_4_);
                    auVar236 = vminps_avx(auVar254,auVar398);
                    auVar236 = vmaxps_avx(auVar236,auVar405);
                    auVar206 = vfmadd213ps_fma(auVar417,auVar236,auVar411);
                    auVar207 = vcvttps2dq_avx512vl(auVar206);
                    auVar207 = vcvtdq2ps_avx512vl(auVar207);
                    uVar171 = vcmpps_avx512vl(auVar206,auVar207,1);
                    auVar206 = vsubps_avx512vl(auVar207,auVar423);
                    bVar199 = (bool)((byte)uVar171 & 1);
                    auVar255._0_4_ =
                         (uint)bVar199 * auVar206._0_4_ | (uint)!bVar199 * auVar207._0_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 1) & 1);
                    auVar255._4_4_ =
                         (uint)bVar199 * auVar206._4_4_ | (uint)!bVar199 * auVar207._4_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 2) & 1);
                    auVar255._8_4_ =
                         (uint)bVar199 * auVar206._8_4_ | (uint)!bVar199 * auVar207._8_4_;
                    bVar199 = (bool)((byte)(uVar171 >> 3) & 1);
                    auVar255._12_4_ =
                         (uint)bVar199 * auVar206._12_4_ | (uint)!bVar199 * auVar207._12_4_;
                    auVar236 = vfmsub231ps_avx512vl(auVar236,auVar255,auVar429);
                    auVar236 = vfnmsub231ps_avx512vl(auVar236,auVar255,auVar518);
                    auVar472._0_4_ = auVar236._0_4_ * auVar236._0_4_;
                    auVar472._4_4_ = auVar236._4_4_ * auVar236._4_4_;
                    auVar472._8_4_ = auVar236._8_4_ * auVar236._8_4_;
                    auVar472._12_4_ = auVar236._12_4_ * auVar236._12_4_;
                    auVar206 = vfmadd213ps_avx512vl(auVar203,auVar236,auVar488);
                    auVar206 = vfmadd213ps_avx512vl(auVar206,auVar236,auVar494);
                    auVar206 = vfmadd213ps_avx512vl(auVar206,auVar236,auVar500);
                    auVar206 = vfmadd213ps_avx512vl(auVar206,auVar236,auVar506);
                    auVar206 = vfmadd213ps_avx512vl(auVar206,auVar236,auVar411);
                    auVar236 = vfmadd213ps_avx512vl(auVar206,auVar472,auVar236);
                    in_ZMM17 = ZEXT1664(auVar236);
                    auVar206 = vaddps_avx512vl(auVar236,auVar423);
                    auVar236 = vcvttps2dq_avx512vl(auVar255);
                    auVar236 = vpslld_avx(auVar236,0x17);
                    auVar236 = vpaddd_avx(auVar236,auVar512);
                    auVar206 = vfmadd213ps_fma(auVar236,auVar206,auVar423);
                    auVar236 = vrcpps_avx(auVar206);
                    auVar207 = vaddps_avx512vl(auVar236,auVar236);
                    in_ZMM16 = ZEXT1664(auVar207);
                    auVar206 = vfmsub213ps_avx512vl(auVar206,auVar207,auVar233);
                    auVar236 = vfnmadd213ps_avx512vl(auVar206,auVar236,auVar207);
                    in_ZMM9 = ZEXT1664(auVar236);
                    auVar235 = vfmsub231ps_fma(auVar235,auVar235,auVar236);
                    break;
                  case 6:
                    uVar4 = **(undefined4 **)(&this->field_0x118 + (long)p_Var168);
                    auVar447._4_4_ = uVar4;
                    auVar447._0_4_ = uVar4;
                    auVar447._8_4_ = uVar4;
                    auVar447._12_4_ = uVar4;
                    uVar4 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var168))[1];
                    auVar73._4_4_ = uVar4;
                    auVar73._0_4_ = uVar4;
                    auVar73._8_4_ = uVar4;
                    auVar73._12_4_ = uVar4;
                    auVar236 = vfmadd213ps_avx512vl(auVar447,auVar235,auVar73);
                    auVar236 = vmaxps_avx(auVar236,auVar234);
                    auVar236 = vminps_avx(auVar236,auVar423);
                    auVar385._0_4_ = auVar236._0_4_ * auVar235._0_4_;
                    auVar385._4_4_ = auVar236._4_4_ * auVar235._4_4_;
                    auVar385._8_4_ = auVar236._8_4_ * auVar235._8_4_;
                    auVar385._12_4_ = auVar236._12_4_ * auVar235._12_4_;
                    auVar235 = auVar385;
                  }
                  *(undefined1 (*) [16])pAVar188 = auVar235;
                  pAVar188 = pAVar188 + 2;
                  uVar170 = uVar170 + 1;
                  iVar161 = iVar161 + 1;
                } while (uVar170 != local_228.w);
              }
              iVar194 = iVar194 + 1;
            } while (iVar194 != local_228.h);
          }
          local_300 = (_func_int **)((long)local_300 + 1);
        } while (local_300 != (_func_int **)(long)local_228.c);
      }
      auVar203 = in_ZMM17._0_16_;
      if ((uVar176 == 4 && local_238 == 0) &&
         (local_1d8 = (_func_int **)(long)local_228.c, 0 < (long)local_1d8)) {
        p_Var168 = pp_Var13[-3];
        iVar11 = *(int *)(&this->field_0xdc + (long)p_Var168);
        iVar173 = *(int *)(&this->field_0xe0 + (long)p_Var168);
        iVar175 = *(int *)(&this->field_0xe4 + (long)p_Var168);
        iVar172 = *(int *)(&this->field_0xe8 + (long)p_Var168);
        iVar180 = *(int *)(&this->field_0x114 + (long)p_Var168);
        lVar192 = *(long *)(&this->field_0x1a8 + (long)p_Var168);
        uVar160 = *(uint *)(&this->field_0xd4 + (long)p_Var168);
        local_168._0_8_ = p_Var168;
        uVar190 = *(uint *)(&this->field_0xd8 + (long)p_Var168);
        local_1c8 = (Allocator *)(local_228.elemsize * local_228.cstep);
        iVar189 = bottom_blob->w;
        iVar195 = bottom_blob->h;
        uVar169 = bottom_blob->c;
        local_1a8._0_4_ = local_228.h;
        local_300 = (_func_int **)0x0;
        do {
          if (0 < (int)local_1a8._0_4_) {
            sVar15 = (this->weight_data_tm).cstep;
            sVar16 = (this->weight_data_tm).elemsize;
            local_2d8 = (Allocator *)
                        ((long)(_func_int ***)pvVar197 + (long)local_1c8 * (long)local_300);
            pvVar196 = (this->weight_data_tm).data;
            iVar194 = 0;
            do {
              if (0 < iVar10) {
                iVar162 = bottom_blob->w;
                pvVar183 = bottom_blob->data;
                sVar17 = bottom_blob->elemsize;
                sVar18 = bottom_blob->cstep;
                pfVar198 = *(float **)(&this->field_0x118 + local_168._0_8_);
                uVar170 = 0;
                iVar161 = (1 - uVar160) * iVar11;
                do {
                  if (lVar192 == 0) {
                    fVar379 = 0.0;
                  }
                  else {
                    fVar379 = *(float *)(lVar192 + (long)local_300 * 4);
                  }
                  if ((int)uVar169 < 1) {
                    auVar203 = SUB6416(ZEXT864(0),0);
                  }
                  else {
                    auVar336 = ZEXT864(0);
                    uVar171 = 0;
                    pvVar184 = (void *)(sVar15 * (long)local_300 * sVar16 + (long)pvVar196);
                    do {
                      if (0 < (int)uVar190) {
                        uVar181 = 0;
                        uVar186 = 0;
                        do {
                          iVar163 = (((int)uVar186 - uVar190) + 1) * iVar173 + iVar194;
                          if ((((-1 < iVar163) &&
                               (iVar164 = iVar163 / iVar172, iVar163 % iVar172 == 0)) &&
                              (0 < (int)uVar160)) && (iVar164 < iVar195)) {
                            uVar185 = (ulong)uVar160;
                            uVar191 = uVar181;
                            iVar163 = iVar161;
                            do {
                              if (((-1 < iVar163) &&
                                  (iVar165 = iVar163 / iVar175, iVar163 % iVar175 == 0)) &&
                                 (iVar165 < iVar189)) {
                                auVar203 = vfmadd231ps_fma(auVar336._0_16_,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar183 +
                                                            (long)(iVar165 << 2) * 4 +
                                                            (long)iVar164 * (long)iVar162 * sVar17 +
                                                            sVar18 * sVar17 * uVar171),
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar184 +
                                                            (uVar191 & 0xffffffff) * 4));
                                auVar336 = ZEXT1664(auVar203);
                              }
                              uVar191 = uVar191 + 4;
                              iVar163 = iVar163 + iVar11;
                              uVar185 = uVar185 - 1;
                            } while (uVar185 != 0);
                          }
                          uVar186 = uVar186 + 1;
                          uVar181 = uVar181 + (ulong)uVar160 * 4;
                        } while (uVar186 != uVar190);
                      }
                      auVar203 = auVar336._0_16_;
                      pvVar184 = (void *)((long)pvVar184 + (long)(int)(uVar160 * uVar190 * 4) * 4);
                      uVar171 = uVar171 + 1;
                    } while (uVar171 != uVar169);
                  }
                  auVar204 = vshufpd_avx(auVar203,auVar203,1);
                  auVar386._0_4_ = auVar204._0_4_ + auVar203._0_4_;
                  auVar386._4_4_ = auVar204._4_4_ + auVar203._4_4_;
                  auVar386._8_4_ = auVar204._8_4_ + auVar203._8_4_;
                  auVar386._12_4_ = auVar204._12_4_ + auVar203._12_4_;
                  auVar203 = vmovshdup_avx(auVar386);
                  fVar379 = auVar203._0_4_ + fVar379 + auVar386._0_4_;
                  auVar203 = ZEXT416((uint)fVar379);
                  fVar395 = fVar379;
                  if (iVar180 - 1U < 6) {
                    switch(iVar180) {
                    case 1:
                      auVar203 = vmaxss_avx(ZEXT416((uint)fVar379),ZEXT416(0));
                      fVar395 = auVar203._0_4_;
                      break;
                    case 2:
                      uVar40 = vcmpss_avx512f(ZEXT416((uint)fVar379),ZEXT416(0),0xe);
                      bVar199 = (bool)((byte)uVar40 & 1);
                      fVar395 = (float)((uint)bVar199 * 0x3f800000 + (uint)!bVar199 * (int)*pfVar198
                                       ) * fVar379;
                      break;
                    case 3:
                      auVar203 = vmaxss_avx(auVar203,ZEXT416((uint)*pfVar198));
                      fVar395 = auVar203._0_4_;
                      if (pfVar198[1] < auVar203._0_4_) {
                        fVar395 = pfVar198[1];
                      }
                      break;
                    case 4:
                      auVar203 = vminss_avx(auVar203,SUB6416(ZEXT464(0x42b0c0a5),0));
                      auVar83._8_4_ = 0x80000000;
                      auVar83._0_8_ = 0x8000000080000000;
                      auVar83._12_4_ = 0x80000000;
                      auVar204 = vxorps_avx512vl(auVar203,auVar83);
                      uVar40 = vcmpss_avx512f(auVar203,ZEXT416(0xc2b0c0a5),1);
                      bVar199 = (bool)((byte)uVar40 & 1);
                      in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                      fVar379 = expf((float)((uint)bVar199 * 0x42b0c0a5 +
                                            (uint)!bVar199 * auVar204._0_4_));
                      fVar395 = 1.0 / (fVar379 + 1.0);
                      break;
                    case 5:
                      in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                      fVar395 = expf(fVar379);
                      fVar395 = logf(fVar395 + 1.0);
                      fVar395 = tanhf(fVar395);
                      fVar395 = fVar395 * fVar379;
                      break;
                    case 6:
                      fVar5 = *pfVar198;
                      auVar82._8_4_ = 0x80000000;
                      auVar82._0_8_ = 0x8000000080000000;
                      auVar82._12_4_ = 0x80000000;
                      auVar204 = vxorps_avx512vl(ZEXT416((uint)pfVar198[1]),auVar82);
                      fVar402 = auVar204._0_4_ / fVar5;
                      fVar395 = 0.0;
                      if ((fVar402 <= fVar379) &&
                         (fVar395 = fVar379, fVar379 <= fVar402 + 1.0 / fVar5)) {
                        auVar203 = vfmadd213ss_fma(ZEXT416((uint)fVar5),auVar203,
                                                   ZEXT416((uint)pfVar198[1]));
                        fVar395 = auVar203._0_4_ * fVar379;
                      }
                    }
                  }
                  *(float *)&local_2d8->_vptr_Allocator = fVar395;
                  local_2d8 = (Allocator *)((long)&local_2d8->_vptr_Allocator + 4);
                  uVar170 = uVar170 + 1;
                  iVar161 = iVar161 + 1;
                } while (uVar170 != iVar10);
              }
              iVar194 = iVar194 + 1;
            } while (iVar194 != local_1a8._0_4_);
          }
          auVar203 = in_ZMM17._0_16_;
          local_300 = (_func_int **)((long)local_300 + 1);
        } while (local_300 != local_1d8);
      }
      iVar11 = local_228.h;
      iVar10 = local_228.w;
      if (local_238 == 0 && uVar176 == 1) {
        local_1d8 = this->_vptr_Deconvolution_x86_avx512;
        p_Var168 = local_1d8[-3];
        if (0 < *(int *)(&this->field_0xd0 + (long)p_Var168)) {
          lVar192 = local_228.cstep * local_228.elemsize;
          local_1c8 = (Allocator *)local_228.data;
          iVar173 = bottom_blob->h;
          uVar160 = bottom_blob->c;
          uVar171 = (ulong)(uint)local_228.w;
          lVar166 = (long)local_1cc;
          auVar309 = vpbroadcastd_avx512f(ZEXT416((uint)bottom_blob->w));
          lVar187 = (long)local_228.w;
          local_2f0 = 0;
          auVar310 = ZEXT1264(ZEXT812(0));
          auVar341 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar340 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar339 = vpmovsxbd_avx512f(_DAT_00559544);
          auVar338 = vpternlogd_avx512f(in_ZMM16,in_ZMM16,in_ZMM16,0xff);
          auVar203 = vxorps_avx512vl(auVar203,auVar203);
          auVar311 = ZEXT1664(auVar203);
          auVar337 = vpbroadcastq_avx512f(ZEXT816(0x10));
          auVar336 = vpbroadcastd_avx512f(ZEXT416(0x10));
          local_168 = vmovdqu64_avx512f(auVar309);
          do {
            if (0 < iVar11) {
              local_280 = (Allocator *)((long)&local_1c8->_vptr_Allocator + lVar192 * local_2f0);
              pp_Var13 = this->_vptr_Deconvolution_x86_avx512;
              local_1a8._0_8_ =
                   (void *)((this->weight_data_tm).cstep * (this->weight_data_tm).elemsize *
                            local_2f0 + (long)(this->weight_data_tm).data);
              iVar175 = 0;
              do {
                if (0 < iVar10) {
                  iVar172 = bottom_blob->w;
                  pvVar197 = bottom_blob->data;
                  sVar15 = bottom_blob->elemsize;
                  sVar16 = bottom_blob->cstep;
                  pp_Var20 = this->_vptr_Deconvolution_x86_avx512;
                  iVar180 = iVar175 - local_1b4;
                  uVar186 = 0;
                  do {
                    auVar203 = auVar311._0_16_;
                    p_Var168 = pp_Var13[-3];
                    if (*(int *)(&this->field_0x10c + (long)p_Var168) == 0) {
                      auVar312 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    else {
                      auVar312 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var168) +
                                                  local_2f0 * 4));
                    }
                    auVar204 = auVar312._0_16_;
                    if (0 < (int)uVar160) {
                      p_Var21 = pp_Var20[-3];
                      auVar313 = vpbroadcastd_avx512f();
                      local_2e8 = local_1a8._0_8_;
                      uVar181 = 0;
                      do {
                        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var21)) {
                          iVar189 = 0;
                          do {
                            iVar195 = *(int *)(&this->field_0xe0 + (long)p_Var21) * iVar189 +
                                      iVar180;
                            if ((((-1 < iVar195) &&
                                 (iVar194 = iVar195 / *(int *)(&this->field_0xe8 + (long)p_Var21),
                                 iVar195 % *(int *)(&this->field_0xe8 + (long)p_Var21) == 0)) &&
                                (iVar194 < iVar173)) &&
                               (iVar195 = *(int *)(&this->field_0xd4 + (long)p_Var21), 0 < iVar195))
                            {
                              uVar191 = (ulong)(iVar195 + 0xfU & 0xfffffff0);
                              auVar433 = ZEXT1664(CONCAT124(auVar310._4_12_,auVar312._0_4_));
                              auVar312 = vpbroadcastq_avx512f();
                              auVar314 = vpbroadcastd_avx512f
                                                   (ZEXT416(*(uint *)(&this->field_0xdc +
                                                                     (long)p_Var21)));
                              uVar185 = 0;
                              auVar315 = vmovdqa64_avx512f(auVar340);
                              auVar316 = vmovdqa64_avx512f(auVar341);
                              auVar317 = vmovdqa64_avx512f(auVar339);
                              do {
                                uVar40 = vpcmpuq_avx512f(auVar315,auVar312,2);
                                uVar41 = vpcmpuq_avx512f(auVar316,auVar312,2);
                                bVar30 = (byte)uVar41;
                                uVar200 = CONCAT11(bVar30,(byte)uVar40);
                                auVar318 = vpmulld_avx512f(auVar314,auVar317);
                                auVar318 = vpaddd_avx512f(auVar313,auVar318);
                                uVar201 = vpcmpgtd_avx512f(auVar318,auVar338);
                                uVar201 = uVar200 & uVar201;
                                auVar319 = vpgatherdd_avx512f(*(undefined4 *)
                                                               (&this->field_0xe4 +
                                                               (long)(p_Var21 + uVar185 * 4)));
                                iVar164 = (uint)((byte)uVar201 & 1) * auVar319._0_4_;
                                iVar161 = (uint)((byte)(uVar201 >> 1) & 1) * auVar319._4_4_;
                                auVar342._4_4_ = iVar161;
                                auVar342._0_4_ = iVar164;
                                iVar163 = (uint)((byte)(uVar201 >> 2) & 1) * auVar319._8_4_;
                                auVar342._8_4_ = iVar163;
                                iVar162 = (uint)((byte)(uVar201 >> 3) & 1) * auVar319._12_4_;
                                auVar342._12_4_ = iVar162;
                                auVar342._16_4_ = (uint)((byte)(uVar201 >> 4) & 1) * auVar319._16_4_
                                ;
                                auVar342._20_4_ = (uint)((byte)(uVar201 >> 5) & 1) * auVar319._20_4_
                                ;
                                auVar342._24_4_ = (uint)((byte)(uVar201 >> 6) & 1) * auVar319._24_4_
                                ;
                                auVar342._28_4_ = (uint)((byte)(uVar201 >> 7) & 1) * auVar319._28_4_
                                ;
                                auVar342._32_4_ = (uint)((byte)(uVar201 >> 8) & 1) * auVar319._32_4_
                                ;
                                auVar342._36_4_ = (uint)((byte)(uVar201 >> 9) & 1) * auVar319._36_4_
                                ;
                                auVar342._40_4_ =
                                     (uint)((byte)(uVar201 >> 10) & 1) * auVar319._40_4_;
                                auVar342._44_4_ =
                                     (uint)((byte)(uVar201 >> 0xb) & 1) * auVar319._44_4_;
                                auVar342._48_4_ =
                                     (uint)((byte)(uVar201 >> 0xc) & 1) * auVar319._48_4_;
                                auVar342._52_4_ =
                                     (uint)((byte)(uVar201 >> 0xd) & 1) * auVar319._52_4_;
                                auVar342._56_4_ =
                                     (uint)((byte)(uVar201 >> 0xe) & 1) * auVar319._56_4_;
                                auVar342._60_4_ = (uint)(byte)(uVar201 >> 0xf) * auVar319._60_4_;
                                if ((uVar201 & 1) != 0) {
                                  in_ZMM9 = ZEXT464((uint)(auVar318._0_4_ % iVar164));
                                }
                                if ((uVar201 & 2) != 0) {
                                  auVar204 = vpinsrd_avx(in_ZMM9._0_16_,auVar318._4_4_ % iVar161,1);
                                  in_ZMM9 = vinserti32x4_avx512f(in_ZMM9,auVar204,0);
                                }
                                if ((uVar201 & 4) != 0) {
                                  auVar204 = vpinsrd_avx(in_ZMM9._0_16_,auVar318._8_4_ % iVar163,2);
                                  in_ZMM9 = vinserti32x4_avx512f(in_ZMM9,auVar204,0);
                                }
                                if ((uVar201 & 8) != 0) {
                                  auVar204 = vpinsrd_avx(in_ZMM9._0_16_,auVar318._12_4_ % iVar162,3)
                                  ;
                                  in_ZMM9 = vinserti32x4_avx512f(in_ZMM9,auVar204,0);
                                }
                                auVar343 = in_ZMM9;
                                if ((uVar201 & 0x10) != 0) {
                                  auVar319 = vpbroadcastd_avx512f();
                                  auVar343._0_16_ = in_ZMM9._0_16_;
                                  auVar343._16_4_ = auVar319._16_4_;
                                  auVar343._20_4_ = in_ZMM9._20_4_;
                                  auVar343._24_4_ = in_ZMM9._24_4_;
                                  auVar343._28_4_ = in_ZMM9._28_4_;
                                  auVar343._32_4_ = in_ZMM9._32_4_;
                                  auVar343._36_4_ = in_ZMM9._36_4_;
                                  auVar343._40_4_ = in_ZMM9._40_4_;
                                  auVar343._44_4_ = in_ZMM9._44_4_;
                                  auVar343._48_4_ = in_ZMM9._48_4_;
                                  auVar343._52_4_ = in_ZMM9._52_4_;
                                  auVar343._56_4_ = in_ZMM9._56_4_;
                                  auVar343._60_4_ = in_ZMM9._60_4_;
                                }
                                auVar344 = auVar343;
                                if ((uVar201 & 0x20) != 0) {
                                  auVar319 = vpbroadcastd_avx512f();
                                  auVar344._0_20_ = auVar343._0_20_;
                                  auVar344._20_4_ = auVar319._20_4_;
                                  auVar344._24_4_ = auVar343._24_4_;
                                  auVar344._28_4_ = auVar343._28_4_;
                                  auVar344._32_4_ = auVar343._32_4_;
                                  auVar344._36_4_ = auVar343._36_4_;
                                  auVar344._40_4_ = auVar343._40_4_;
                                  auVar344._44_4_ = auVar343._44_4_;
                                  auVar344._48_4_ = auVar343._48_4_;
                                  auVar344._52_4_ = auVar343._52_4_;
                                  auVar344._56_4_ = auVar343._56_4_;
                                  auVar344._60_4_ = auVar343._60_4_;
                                }
                                auVar345 = auVar344;
                                if ((uVar201 & 0x40) != 0) {
                                  auVar319 = vpbroadcastd_avx512f();
                                  auVar345._0_24_ = auVar344._0_24_;
                                  auVar345._24_4_ = auVar319._24_4_;
                                  auVar345._28_4_ = auVar344._28_4_;
                                  auVar345._32_4_ = auVar344._32_4_;
                                  auVar345._36_4_ = auVar344._36_4_;
                                  auVar345._40_4_ = auVar344._40_4_;
                                  auVar345._44_4_ = auVar344._44_4_;
                                  auVar345._48_4_ = auVar344._48_4_;
                                  auVar345._52_4_ = auVar344._52_4_;
                                  auVar345._56_4_ = auVar344._56_4_;
                                  auVar345._60_4_ = auVar344._60_4_;
                                }
                                auVar346 = auVar345;
                                if ((uVar201 & 0x80) != 0) {
                                  auVar319 = vpbroadcastd_avx512f();
                                  auVar346._0_28_ = auVar345._0_28_;
                                  auVar346._28_4_ = auVar319._28_4_;
                                  auVar346._32_4_ = auVar345._32_4_;
                                  auVar346._36_4_ = auVar345._36_4_;
                                  auVar346._40_4_ = auVar345._40_4_;
                                  auVar346._44_4_ = auVar345._44_4_;
                                  auVar346._48_4_ = auVar345._48_4_;
                                  auVar346._52_4_ = auVar345._52_4_;
                                  auVar346._56_4_ = auVar345._56_4_;
                                  auVar346._60_4_ = auVar345._60_4_;
                                }
                                auVar347 = auVar346;
                                if ((uVar201 & 0x100) != 0) {
                                  vextracti32x4_avx512f(auVar318,2);
                                  vextracti32x4_avx512f(auVar342,2);
                                  auVar319 = vpbroadcastd_avx512f();
                                  auVar347._0_32_ = auVar346._0_32_;
                                  auVar347._32_4_ = auVar319._32_4_;
                                  auVar347._36_4_ = auVar346._36_4_;
                                  auVar347._40_4_ = auVar346._40_4_;
                                  auVar347._44_4_ = auVar346._44_4_;
                                  auVar347._48_4_ = auVar346._48_4_;
                                  auVar347._52_4_ = auVar346._52_4_;
                                  auVar347._56_4_ = auVar346._56_4_;
                                  auVar347._60_4_ = auVar346._60_4_;
                                }
                                auVar348 = auVar347;
                                if ((uVar201 & 0x200) != 0) {
                                  vextracti32x4_avx512f(auVar318,2);
                                  vextracti32x4_avx512f(auVar342,2);
                                  auVar319 = vpbroadcastd_avx512f();
                                  auVar348._0_36_ = auVar347._0_36_;
                                  auVar348._36_4_ = auVar319._36_4_;
                                  auVar348._40_4_ = auVar347._40_4_;
                                  auVar348._44_4_ = auVar347._44_4_;
                                  auVar348._48_4_ = auVar347._48_4_;
                                  auVar348._52_4_ = auVar347._52_4_;
                                  auVar348._56_4_ = auVar347._56_4_;
                                  auVar348._60_4_ = auVar347._60_4_;
                                }
                                auVar349 = auVar348;
                                if ((uVar201 & 0x400) != 0) {
                                  vextracti32x4_avx512f(auVar318,2);
                                  vextracti32x4_avx512f(auVar342,2);
                                  auVar319 = vpbroadcastd_avx512f();
                                  auVar349._0_40_ = auVar348._0_40_;
                                  auVar349._40_4_ = auVar319._40_4_;
                                  auVar349._44_4_ = auVar348._44_4_;
                                  auVar349._48_4_ = auVar348._48_4_;
                                  auVar349._52_4_ = auVar348._52_4_;
                                  auVar349._56_4_ = auVar348._56_4_;
                                  auVar349._60_4_ = auVar348._60_4_;
                                }
                                auVar350 = auVar349;
                                if ((uVar201 & 0x800) != 0) {
                                  vextracti32x4_avx512f(auVar318,2);
                                  vextracti32x4_avx512f(auVar342,2);
                                  auVar319 = vpbroadcastd_avx512f();
                                  auVar350._0_44_ = auVar349._0_44_;
                                  auVar350._44_4_ = auVar319._44_4_;
                                  auVar350._48_4_ = auVar349._48_4_;
                                  auVar350._52_4_ = auVar349._52_4_;
                                  auVar350._56_4_ = auVar349._56_4_;
                                  auVar350._60_4_ = auVar349._60_4_;
                                }
                                auVar351 = auVar350;
                                if ((uVar201 & 0x1000) != 0) {
                                  vextracti32x4_avx512f(auVar318,3);
                                  vextracti32x4_avx512f(auVar342,3);
                                  auVar319 = vpbroadcastd_avx512f();
                                  auVar351._0_48_ = auVar350._0_48_;
                                  auVar351._48_4_ = auVar319._48_4_;
                                  auVar351._52_4_ = auVar350._52_4_;
                                  auVar351._56_4_ = auVar350._56_4_;
                                  auVar351._60_4_ = auVar350._60_4_;
                                }
                                auVar352 = auVar351;
                                if ((uVar201 & 0x2000) != 0) {
                                  vextracti32x4_avx512f(auVar318,3);
                                  vextracti32x4_avx512f(auVar342,3);
                                  auVar319 = vpbroadcastd_avx512f();
                                  auVar352._0_52_ = auVar351._0_52_;
                                  auVar352._52_4_ = auVar319._52_4_;
                                  auVar352._56_4_ = auVar351._56_4_;
                                  auVar352._60_4_ = auVar351._60_4_;
                                }
                                auVar353 = auVar352;
                                if ((uVar201 & 0x4000) != 0) {
                                  vextracti32x4_avx512f(auVar318,3);
                                  vextracti32x4_avx512f(auVar342,3);
                                  auVar319 = vpbroadcastd_avx512f();
                                  auVar353._0_56_ = auVar352._0_56_;
                                  auVar353._56_4_ = auVar319._56_4_;
                                  auVar353._60_4_ = auVar352._60_4_;
                                }
                                auVar485 = auVar353;
                                if ((uVar201 & 0x8000) != 0) {
                                  vextracti32x4_avx512f(auVar318,3);
                                  vextracti32x4_avx512f(auVar342,3);
                                  auVar319 = vpbroadcastd_avx512f();
                                  auVar485._60_4_ = auVar319._60_4_;
                                  auVar485._0_60_ = auVar353._0_60_;
                                }
                                uVar202 = vptestnmd_avx512f(auVar485,auVar485);
                                uVar201 = uVar201 & uVar202;
                                if ((uVar201 & 1) != 0) {
                                  auVar485 = ZEXT464((uint)(auVar318._0_4_ / iVar164));
                                }
                                if ((uVar201 & 2) != 0) {
                                  auVar204 = vpinsrd_avx(auVar485._0_16_,auVar318._4_4_ / iVar161,1)
                                  ;
                                  auVar485 = vinserti32x4_avx512f(auVar485,auVar204,0);
                                }
                                if ((uVar201 & 4) != 0) {
                                  auVar204 = vpinsrd_avx(auVar485._0_16_,auVar318._8_4_ / iVar163,2)
                                  ;
                                  auVar485 = vinserti32x4_avx512f(auVar485,auVar204,0);
                                }
                                if ((uVar201 & 8) != 0) {
                                  auVar204 = vpinsrd_avx(auVar485._0_16_,auVar318._12_4_ / iVar162,3
                                                        );
                                  auVar485 = vinserti32x4_avx512f(auVar485,auVar204,0);
                                }
                                auVar354 = auVar485;
                                if ((uVar201 & 0x10) != 0) {
                                  auVar319 = vpbroadcastd_avx512f();
                                  auVar354._0_16_ = auVar485._0_16_;
                                  auVar354._16_4_ = auVar319._16_4_;
                                  auVar354._20_4_ = auVar485._20_4_;
                                  auVar354._24_4_ = auVar485._24_4_;
                                  auVar354._28_4_ = auVar485._28_4_;
                                  auVar354._32_4_ = auVar485._32_4_;
                                  auVar354._36_4_ = auVar485._36_4_;
                                  auVar354._40_4_ = auVar485._40_4_;
                                  auVar354._44_4_ = auVar485._44_4_;
                                  auVar354._48_4_ = auVar485._48_4_;
                                  auVar354._52_4_ = auVar485._52_4_;
                                  auVar354._56_4_ = auVar485._56_4_;
                                  auVar354._60_4_ = auVar485._60_4_;
                                }
                                auVar355 = auVar354;
                                if ((uVar201 & 0x20) != 0) {
                                  auVar319 = vpbroadcastd_avx512f();
                                  auVar355._0_20_ = auVar354._0_20_;
                                  auVar355._20_4_ = auVar319._20_4_;
                                  auVar355._24_4_ = auVar354._24_4_;
                                  auVar355._28_4_ = auVar354._28_4_;
                                  auVar355._32_4_ = auVar354._32_4_;
                                  auVar355._36_4_ = auVar354._36_4_;
                                  auVar355._40_4_ = auVar354._40_4_;
                                  auVar355._44_4_ = auVar354._44_4_;
                                  auVar355._48_4_ = auVar354._48_4_;
                                  auVar355._52_4_ = auVar354._52_4_;
                                  auVar355._56_4_ = auVar354._56_4_;
                                  auVar355._60_4_ = auVar354._60_4_;
                                }
                                auVar356 = auVar355;
                                if ((uVar201 & 0x40) != 0) {
                                  auVar319 = vpbroadcastd_avx512f();
                                  auVar356._0_24_ = auVar355._0_24_;
                                  auVar356._24_4_ = auVar319._24_4_;
                                  auVar356._28_4_ = auVar355._28_4_;
                                  auVar356._32_4_ = auVar355._32_4_;
                                  auVar356._36_4_ = auVar355._36_4_;
                                  auVar356._40_4_ = auVar355._40_4_;
                                  auVar356._44_4_ = auVar355._44_4_;
                                  auVar356._48_4_ = auVar355._48_4_;
                                  auVar356._52_4_ = auVar355._52_4_;
                                  auVar356._56_4_ = auVar355._56_4_;
                                  auVar356._60_4_ = auVar355._60_4_;
                                }
                                auVar357 = auVar356;
                                if ((uVar201 & 0x80) != 0) {
                                  auVar319 = vpbroadcastd_avx512f();
                                  auVar357._0_28_ = auVar356._0_28_;
                                  auVar357._28_4_ = auVar319._28_4_;
                                  auVar357._32_4_ = auVar356._32_4_;
                                  auVar357._36_4_ = auVar356._36_4_;
                                  auVar357._40_4_ = auVar356._40_4_;
                                  auVar357._44_4_ = auVar356._44_4_;
                                  auVar357._48_4_ = auVar356._48_4_;
                                  auVar357._52_4_ = auVar356._52_4_;
                                  auVar357._56_4_ = auVar356._56_4_;
                                  auVar357._60_4_ = auVar356._60_4_;
                                }
                                auVar358 = auVar357;
                                if ((uVar201 & 0x100) != 0) {
                                  vextracti32x4_avx512f(auVar318,2);
                                  vextracti32x4_avx512f(auVar342,2);
                                  auVar319 = vpbroadcastd_avx512f();
                                  auVar358._0_32_ = auVar357._0_32_;
                                  auVar358._32_4_ = auVar319._32_4_;
                                  auVar358._36_4_ = auVar357._36_4_;
                                  auVar358._40_4_ = auVar357._40_4_;
                                  auVar358._44_4_ = auVar357._44_4_;
                                  auVar358._48_4_ = auVar357._48_4_;
                                  auVar358._52_4_ = auVar357._52_4_;
                                  auVar358._56_4_ = auVar357._56_4_;
                                  auVar358._60_4_ = auVar357._60_4_;
                                }
                                auVar359 = auVar358;
                                if ((uVar201 & 0x200) != 0) {
                                  vextracti32x4_avx512f(auVar318,2);
                                  vextracti32x4_avx512f(auVar342,2);
                                  auVar319 = vpbroadcastd_avx512f();
                                  auVar359._0_36_ = auVar358._0_36_;
                                  auVar359._36_4_ = auVar319._36_4_;
                                  auVar359._40_4_ = auVar358._40_4_;
                                  auVar359._44_4_ = auVar358._44_4_;
                                  auVar359._48_4_ = auVar358._48_4_;
                                  auVar359._52_4_ = auVar358._52_4_;
                                  auVar359._56_4_ = auVar358._56_4_;
                                  auVar359._60_4_ = auVar358._60_4_;
                                }
                                auVar360 = auVar359;
                                if ((uVar201 & 0x400) != 0) {
                                  vextracti32x4_avx512f(auVar318,2);
                                  vextracti32x4_avx512f(auVar342,2);
                                  auVar319 = vpbroadcastd_avx512f();
                                  auVar360._0_40_ = auVar359._0_40_;
                                  auVar360._40_4_ = auVar319._40_4_;
                                  auVar360._44_4_ = auVar359._44_4_;
                                  auVar360._48_4_ = auVar359._48_4_;
                                  auVar360._52_4_ = auVar359._52_4_;
                                  auVar360._56_4_ = auVar359._56_4_;
                                  auVar360._60_4_ = auVar359._60_4_;
                                }
                                auVar361 = auVar360;
                                if ((uVar201 & 0x800) != 0) {
                                  vextracti32x4_avx512f(auVar318,2);
                                  vextracti32x4_avx512f(auVar342,2);
                                  auVar319 = vpbroadcastd_avx512f();
                                  auVar361._0_44_ = auVar360._0_44_;
                                  auVar361._44_4_ = auVar319._44_4_;
                                  auVar361._48_4_ = auVar360._48_4_;
                                  auVar361._52_4_ = auVar360._52_4_;
                                  auVar361._56_4_ = auVar360._56_4_;
                                  auVar361._60_4_ = auVar360._60_4_;
                                }
                                auVar362 = auVar361;
                                if ((uVar201 & 0x1000) != 0) {
                                  vextracti32x4_avx512f(auVar318,3);
                                  vextracti32x4_avx512f(auVar342,3);
                                  auVar319 = vpbroadcastd_avx512f();
                                  auVar362._0_48_ = auVar361._0_48_;
                                  auVar362._48_4_ = auVar319._48_4_;
                                  auVar362._52_4_ = auVar361._52_4_;
                                  auVar362._56_4_ = auVar361._56_4_;
                                  auVar362._60_4_ = auVar361._60_4_;
                                }
                                auVar363 = auVar362;
                                if ((uVar201 & 0x2000) != 0) {
                                  vextracti32x4_avx512f(auVar318,3);
                                  vextracti32x4_avx512f(auVar342,3);
                                  auVar319 = vpbroadcastd_avx512f();
                                  auVar363._0_52_ = auVar362._0_52_;
                                  auVar363._52_4_ = auVar319._52_4_;
                                  auVar363._56_4_ = auVar362._56_4_;
                                  auVar363._60_4_ = auVar362._60_4_;
                                }
                                auVar364 = auVar363;
                                if ((uVar201 & 0x4000) != 0) {
                                  vextracti32x4_avx512f(auVar318,3);
                                  vextracti32x4_avx512f(auVar342,3);
                                  auVar319 = vpbroadcastd_avx512f();
                                  auVar364._0_56_ = auVar363._0_56_;
                                  auVar364._56_4_ = auVar319._56_4_;
                                  auVar364._60_4_ = auVar363._60_4_;
                                }
                                in_ZMM9 = auVar364;
                                if ((uVar201 & 0x8000) != 0) {
                                  vextracti32x4_avx512f(auVar318,3);
                                  vextracti32x4_avx512f(auVar342,3);
                                  auVar318 = vpbroadcastd_avx512f();
                                  in_ZMM9._60_4_ = auVar318._60_4_;
                                  in_ZMM9._0_60_ = auVar364._0_60_;
                                }
                                uVar202 = vpcmpgtd_avx512f(auVar309,in_ZMM9);
                                uVar202 = uVar201 & uVar202;
                                auVar318 = vgatherdps_avx512f(*(undefined4 *)
                                                               ((long)pvVar197 +
                                                               uVar191 * 4 +
                                                               (long)iVar194 *
                                                               (long)iVar172 * sVar15 +
                                                               sVar16 * sVar15 * uVar181));
                                bVar22 = (byte)uVar202;
                                auVar365._4_4_ = (uint)((byte)(uVar202 >> 1) & 1) * auVar318._4_4_;
                                auVar365._0_4_ = (uint)(bVar22 & 1) * auVar318._0_4_;
                                auVar365._8_4_ = (uint)((byte)(uVar202 >> 2) & 1) * auVar318._8_4_;
                                auVar365._12_4_ = (uint)((byte)(uVar202 >> 3) & 1) * auVar318._12_4_
                                ;
                                auVar365._16_4_ = (uint)((byte)(uVar202 >> 4) & 1) * auVar318._16_4_
                                ;
                                auVar365._20_4_ = (uint)((byte)(uVar202 >> 5) & 1) * auVar318._20_4_
                                ;
                                auVar365._24_4_ = (uint)((byte)(uVar202 >> 6) & 1) * auVar318._24_4_
                                ;
                                auVar365._28_4_ = (uint)((byte)(uVar202 >> 7) & 1) * auVar318._28_4_
                                ;
                                bVar31 = (byte)(uVar202 >> 8);
                                auVar365._32_4_ = (uint)(bVar31 & 1) * auVar318._32_4_;
                                auVar365._36_4_ = (uint)((byte)(uVar202 >> 9) & 1) * auVar318._36_4_
                                ;
                                auVar365._40_4_ =
                                     (uint)((byte)(uVar202 >> 10) & 1) * auVar318._40_4_;
                                auVar365._44_4_ =
                                     (uint)((byte)(uVar202 >> 0xb) & 1) * auVar318._44_4_;
                                auVar365._48_4_ =
                                     (uint)((byte)(uVar202 >> 0xc) & 1) * auVar318._48_4_;
                                auVar365._52_4_ =
                                     (uint)((byte)(uVar202 >> 0xd) & 1) * auVar318._52_4_;
                                auVar365._56_4_ =
                                     (uint)((byte)(uVar202 >> 0xe) & 1) * auVar318._56_4_;
                                auVar365._60_4_ = (uint)(byte)(uVar202 >> 0xf) * auVar318._60_4_;
                                piVar14 = (int *)(local_2e8 + (ulong)(uint)(iVar195 * iVar189) * 4 +
                                                 uVar185 * 4);
                                auVar366._4_4_ = (uint)((byte)(uVar202 >> 1) & 1) * piVar14[1];
                                auVar366._0_4_ = (uint)(bVar22 & 1) * *piVar14;
                                auVar366._8_4_ = (uint)((byte)(uVar202 >> 2) & 1) * piVar14[2];
                                auVar366._12_4_ = (uint)((byte)(uVar202 >> 3) & 1) * piVar14[3];
                                auVar366._16_4_ = (uint)((byte)(uVar202 >> 4) & 1) * piVar14[4];
                                auVar366._20_4_ = (uint)((byte)(uVar202 >> 5) & 1) * piVar14[5];
                                auVar366._24_4_ = (uint)((byte)(uVar202 >> 6) & 1) * piVar14[6];
                                auVar366._28_4_ = (uint)((byte)(uVar202 >> 7) & 1) * piVar14[7];
                                auVar366._32_4_ = (uint)(bVar31 & 1) * piVar14[8];
                                auVar366._36_4_ = (uint)((byte)(uVar202 >> 9) & 1) * piVar14[9];
                                auVar366._40_4_ = (uint)((byte)(uVar202 >> 10) & 1) * piVar14[10];
                                auVar366._44_4_ = (uint)((byte)(uVar202 >> 0xb) & 1) * piVar14[0xb];
                                auVar366._48_4_ = (uint)((byte)(uVar202 >> 0xc) & 1) * piVar14[0xc];
                                auVar366._52_4_ = (uint)((byte)(uVar202 >> 0xd) & 1) * piVar14[0xd];
                                auVar366._56_4_ = (uint)((byte)(uVar202 >> 0xe) & 1) * piVar14[0xe];
                                auVar366._60_4_ = (uint)(byte)(uVar202 >> 0xf) * piVar14[0xf];
                                uVar39 = vpcmpd_avx512f(in_ZMM9,auVar309,5);
                                uVar201 = uVar201 & uVar39;
                                auVar318 = vfmadd231ps_avx512f(auVar433,auVar366,auVar365);
                                iVar161 = auVar433._0_4_;
                                bVar23 = (bool)((byte)(uVar202 >> 1) & 1);
                                iVar162 = auVar433._4_4_;
                                bVar24 = (bool)((byte)(uVar202 >> 2) & 1);
                                iVar163 = auVar433._8_4_;
                                bVar25 = (bool)((byte)(uVar202 >> 3) & 1);
                                iVar164 = auVar433._12_4_;
                                bVar26 = (bool)((byte)(uVar202 >> 4) & 1);
                                iVar165 = auVar433._16_4_;
                                bVar27 = (bool)((byte)(uVar202 >> 5) & 1);
                                iVar368 = auVar433._20_4_;
                                bVar28 = (bool)((byte)(uVar202 >> 6) & 1);
                                iVar369 = auVar433._24_4_;
                                bVar29 = (bool)((byte)(uVar202 >> 7) & 1);
                                iVar370 = auVar433._28_4_;
                                iVar371 = auVar433._32_4_;
                                bVar32 = (bool)((byte)(uVar202 >> 9) & 1);
                                iVar372 = auVar433._36_4_;
                                bVar33 = (bool)((byte)(uVar202 >> 10) & 1);
                                iVar373 = auVar433._40_4_;
                                bVar34 = (bool)((byte)(uVar202 >> 0xb) & 1);
                                iVar374 = auVar433._44_4_;
                                bVar35 = (bool)((byte)(uVar202 >> 0xc) & 1);
                                iVar375 = auVar433._48_4_;
                                bVar36 = (bool)((byte)(uVar202 >> 0xd) & 1);
                                iVar376 = auVar433._52_4_;
                                bVar37 = (bool)((byte)(uVar202 >> 0xe) & 1);
                                iVar377 = auVar433._56_4_;
                                bVar38 = SUB81(uVar202 >> 0xf,0);
                                iVar378 = auVar433._60_4_;
                                bVar199 = (bool)((byte)uVar201 & 1);
                                auVar433._0_4_ =
                                     (uint)bVar199 * iVar161 |
                                     (uint)!bVar199 *
                                     ((uint)(bVar22 & 1) * auVar318._0_4_ |
                                     (uint)!(bool)(bVar22 & 1) * iVar161);
                                bVar199 = (bool)((byte)(uVar201 >> 1) & 1);
                                auVar433._4_4_ =
                                     (uint)bVar199 * iVar162 |
                                     (uint)!bVar199 *
                                     ((uint)bVar23 * auVar318._4_4_ | (uint)!bVar23 * iVar162);
                                bVar199 = (bool)((byte)(uVar201 >> 2) & 1);
                                auVar433._8_4_ =
                                     (uint)bVar199 * iVar163 |
                                     (uint)!bVar199 *
                                     ((uint)bVar24 * auVar318._8_4_ | (uint)!bVar24 * iVar163);
                                bVar199 = (bool)((byte)(uVar201 >> 3) & 1);
                                auVar433._12_4_ =
                                     (uint)bVar199 * iVar164 |
                                     (uint)!bVar199 *
                                     ((uint)bVar25 * auVar318._12_4_ | (uint)!bVar25 * iVar164);
                                bVar199 = (bool)((byte)(uVar201 >> 4) & 1);
                                auVar433._16_4_ =
                                     (uint)bVar199 * iVar165 |
                                     (uint)!bVar199 *
                                     ((uint)bVar26 * auVar318._16_4_ | (uint)!bVar26 * iVar165);
                                bVar199 = (bool)((byte)(uVar201 >> 5) & 1);
                                auVar433._20_4_ =
                                     (uint)bVar199 * iVar368 |
                                     (uint)!bVar199 *
                                     ((uint)bVar27 * auVar318._20_4_ | (uint)!bVar27 * iVar368);
                                bVar199 = (bool)((byte)(uVar201 >> 6) & 1);
                                auVar433._24_4_ =
                                     (uint)bVar199 * iVar369 |
                                     (uint)!bVar199 *
                                     ((uint)bVar28 * auVar318._24_4_ | (uint)!bVar28 * iVar369);
                                bVar199 = (bool)((byte)(uVar201 >> 7) & 1);
                                auVar433._28_4_ =
                                     (uint)bVar199 * iVar370 |
                                     (uint)!bVar199 *
                                     ((uint)bVar29 * auVar318._28_4_ | (uint)!bVar29 * iVar370);
                                bVar199 = (bool)((byte)(uVar201 >> 8) & 1);
                                auVar433._32_4_ =
                                     (uint)bVar199 * iVar371 |
                                     (uint)!bVar199 *
                                     ((uint)(bVar31 & 1) * auVar318._32_4_ |
                                     (uint)!(bool)(bVar31 & 1) * iVar371);
                                bVar199 = (bool)((byte)(uVar201 >> 9) & 1);
                                auVar433._36_4_ =
                                     (uint)bVar199 * iVar372 |
                                     (uint)!bVar199 *
                                     ((uint)bVar32 * auVar318._36_4_ | (uint)!bVar32 * iVar372);
                                bVar199 = (bool)((byte)(uVar201 >> 10) & 1);
                                auVar433._40_4_ =
                                     (uint)bVar199 * iVar373 |
                                     (uint)!bVar199 *
                                     ((uint)bVar33 * auVar318._40_4_ | (uint)!bVar33 * iVar373);
                                bVar199 = (bool)((byte)(uVar201 >> 0xb) & 1);
                                auVar433._44_4_ =
                                     (uint)bVar199 * iVar374 |
                                     (uint)!bVar199 *
                                     ((uint)bVar34 * auVar318._44_4_ | (uint)!bVar34 * iVar374);
                                bVar199 = (bool)((byte)(uVar201 >> 0xc) & 1);
                                auVar433._48_4_ =
                                     (uint)bVar199 * iVar375 |
                                     (uint)!bVar199 *
                                     ((uint)bVar35 * auVar318._48_4_ | (uint)!bVar35 * iVar375);
                                bVar199 = (bool)((byte)(uVar201 >> 0xd) & 1);
                                auVar433._52_4_ =
                                     (uint)bVar199 * iVar376 |
                                     (uint)!bVar199 *
                                     ((uint)bVar36 * auVar318._52_4_ | (uint)!bVar36 * iVar376);
                                bVar199 = (bool)((byte)(uVar201 >> 0xe) & 1);
                                auVar433._56_4_ =
                                     (uint)bVar199 * iVar377 |
                                     (uint)!bVar199 *
                                     ((uint)bVar37 * auVar318._56_4_ | (uint)!bVar37 * iVar377);
                                bVar199 = SUB81(uVar201 >> 0xf,0);
                                auVar433._60_4_ =
                                     (uint)bVar199 * iVar378 |
                                     (uint)!bVar199 *
                                     ((uint)bVar38 * auVar318._60_4_ | (uint)!bVar38 * iVar378);
                                uVar185 = uVar185 + 0x10;
                                auVar315 = vpaddq_avx512f(auVar315,auVar337);
                                auVar316 = vpaddq_avx512f(auVar316,auVar337);
                                auVar317 = vpaddd_avx512f(auVar317,auVar336);
                              } while (uVar191 != uVar185);
                              bVar199 = (bool)((byte)uVar40 & 1);
                              auVar367._0_4_ = bVar199 * auVar433._0_4_ | (uint)!bVar199 * iVar161;
                              bVar199 = (bool)((byte)(uVar200 >> 1) & 1);
                              auVar367._4_4_ = bVar199 * auVar433._4_4_ | (uint)!bVar199 * iVar162;
                              bVar199 = (bool)((byte)(uVar200 >> 2) & 1);
                              auVar367._8_4_ = bVar199 * auVar433._8_4_ | (uint)!bVar199 * iVar163;
                              bVar199 = (bool)((byte)(uVar200 >> 3) & 1);
                              auVar367._12_4_ = bVar199 * auVar433._12_4_ | (uint)!bVar199 * iVar164
                              ;
                              bVar199 = (bool)((byte)(uVar200 >> 4) & 1);
                              auVar367._16_4_ = bVar199 * auVar433._16_4_ | (uint)!bVar199 * iVar165
                              ;
                              bVar199 = (bool)((byte)(uVar200 >> 5) & 1);
                              auVar367._20_4_ = bVar199 * auVar433._20_4_ | (uint)!bVar199 * iVar368
                              ;
                              bVar199 = (bool)((byte)(uVar200 >> 6) & 1);
                              auVar367._24_4_ = bVar199 * auVar433._24_4_ | (uint)!bVar199 * iVar369
                              ;
                              bVar199 = (bool)((byte)(uVar200 >> 7) & 1);
                              auVar367._28_4_ = bVar199 * auVar433._28_4_ | (uint)!bVar199 * iVar370
                              ;
                              auVar367._32_4_ =
                                   (bVar30 & 1) * auVar433._32_4_ |
                                   (uint)!(bool)(bVar30 & 1) * iVar371;
                              bVar199 = (bool)(bVar30 >> 1 & 1);
                              auVar367._36_4_ = bVar199 * auVar433._36_4_ | (uint)!bVar199 * iVar372
                              ;
                              bVar199 = (bool)(bVar30 >> 2 & 1);
                              auVar367._40_4_ = bVar199 * auVar433._40_4_ | (uint)!bVar199 * iVar373
                              ;
                              bVar199 = (bool)(bVar30 >> 3 & 1);
                              auVar367._44_4_ = bVar199 * auVar433._44_4_ | (uint)!bVar199 * iVar374
                              ;
                              bVar199 = (bool)(bVar30 >> 4 & 1);
                              auVar367._48_4_ = bVar199 * auVar433._48_4_ | (uint)!bVar199 * iVar375
                              ;
                              bVar199 = (bool)(bVar30 >> 5 & 1);
                              auVar367._52_4_ = bVar199 * auVar433._52_4_ | (uint)!bVar199 * iVar376
                              ;
                              bVar199 = (bool)(bVar30 >> 6 & 1);
                              auVar367._56_4_ = bVar199 * auVar433._56_4_ | (uint)!bVar199 * iVar377
                              ;
                              auVar367._60_4_ =
                                   (bVar30 >> 7) * auVar433._60_4_ |
                                   (uint)!(bool)(bVar30 >> 7) * iVar378;
                              auVar257 = vextractf64x4_avx512f(auVar367,1);
                              auVar312 = vaddps_avx512f(auVar367,ZEXT3264(auVar257));
                              auVar387._0_4_ = auVar312._0_4_ + auVar312._16_4_;
                              auVar387._4_4_ = auVar312._4_4_ + auVar312._20_4_;
                              auVar387._8_4_ = auVar312._8_4_ + auVar312._24_4_;
                              auVar387._12_4_ = auVar312._12_4_ + auVar312._28_4_;
                              auVar204 = vshufpd_avx(auVar387,auVar387,1);
                              auVar388._0_4_ = auVar387._0_4_ + auVar204._0_4_;
                              auVar388._4_4_ = auVar387._4_4_ + auVar204._4_4_;
                              auVar388._8_4_ = auVar387._8_4_ + auVar204._8_4_;
                              auVar388._12_4_ = auVar387._12_4_ + auVar204._12_4_;
                              auVar204 = vhaddps_avx(auVar388,auVar388);
                              auVar312 = ZEXT1664(auVar204);
                            }
                            iVar189 = iVar189 + 1;
                          } while (iVar189 != *(int *)(&this->field_0xd8 + (long)p_Var21));
                        }
                        auVar204 = auVar312._0_16_;
                        uVar181 = uVar181 + 1;
                        local_2e8 = local_2e8 + lVar166 * 4;
                      } while (uVar181 != uVar160);
                    }
                    fVar395 = auVar204._0_4_;
                    fVar379 = fVar395;
                    switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var168)) {
                    case 1:
                      auVar203 = vmaxss_avx(auVar204,ZEXT416(0));
                      fVar379 = auVar203._0_4_;
                      break;
                    case 2:
                      uVar40 = vcmpss_avx512f(auVar204,ZEXT416(0),0xe);
                      bVar199 = (bool)((byte)uVar40 & 1);
                      fVar379 = (float)((uint)bVar199 * 0x3f800000 +
                                       (uint)!bVar199 *
                                       **(int **)(&this->field_0x118 + (long)p_Var168)) * fVar395;
                      break;
                    case 3:
                      fVar395 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var168))[1];
                      auVar203 = vmaxss_avx(auVar204,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                        (long)p_Var168)));
                      fVar379 = auVar203._0_4_;
                      if (fVar395 < auVar203._0_4_) {
                        fVar379 = fVar395;
                      }
                      break;
                    case 4:
                      auVar204 = vminss_avx(auVar204,SUB6416(ZEXT464(0x42b0c0a5),0));
                      auVar85._8_4_ = 0x80000000;
                      auVar85._0_8_ = 0x8000000080000000;
                      auVar85._12_4_ = 0x80000000;
                      auVar205 = vxorps_avx512vl(auVar204,auVar85);
                      uVar40 = vcmpss_avx512f(auVar204,ZEXT416(0xc2b0c0a5),1);
                      bVar199 = (bool)((byte)uVar40 & 1);
                      in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                      fVar379 = expf((float)((uint)bVar199 * 0x42b0c0a5 +
                                            (uint)!bVar199 * auVar205._0_4_));
                      auVar336 = vpbroadcastd_avx512f(ZEXT416(0x10));
                      auVar337 = vpbroadcastq_avx512f(ZEXT816(0x10));
                      auVar203 = vxorps_avx512vl(auVar203,auVar203);
                      auVar311 = ZEXT1664(auVar203);
                      auVar338 = vpternlogd_avx512f(auVar338,auVar338,auVar338,0xff);
                      auVar339 = vpmovsxbd_avx512f(_DAT_00559544);
                      auVar340 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                      auVar341 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                      auVar310 = ZEXT1264(ZEXT812(0));
                      auVar309 = vmovdqu64_avx512f(local_168);
                      fVar379 = 1.0 / (fVar379 + 1.0);
                      break;
                    case 5:
                      in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                      fVar379 = expf(fVar395);
                      fVar379 = logf(fVar379 + 1.0);
                      fVar379 = tanhf(fVar379);
                      auVar336 = vpbroadcastd_avx512f(ZEXT416(0x10));
                      auVar337 = vpbroadcastq_avx512f(ZEXT816(0x10));
                      auVar203 = vxorps_avx512vl(auVar203,auVar203);
                      auVar311 = ZEXT1664(auVar203);
                      auVar338 = vpternlogd_avx512f(auVar338,auVar338,auVar338,0xff);
                      auVar339 = vpmovsxbd_avx512f(_DAT_00559544);
                      auVar340 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                      auVar341 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                      auVar310 = ZEXT1264(ZEXT812(0));
                      auVar309 = vmovdqu64_avx512f(local_168);
                      fVar379 = fVar379 * fVar395;
                      break;
                    case 6:
                      fVar5 = **(float **)(&this->field_0x118 + (long)p_Var168);
                      auVar84._8_4_ = 0x80000000;
                      auVar84._0_8_ = 0x8000000080000000;
                      auVar84._12_4_ = 0x80000000;
                      auVar205 = ZEXT416((uint)(*(float **)(&this->field_0x118 + (long)p_Var168))[1]
                                        );
                      auVar203 = vxorps_avx512vl(auVar205,auVar84);
                      fVar402 = auVar203._0_4_ / fVar5;
                      fVar379 = 0.0;
                      if ((fVar402 <= fVar395) &&
                         (fVar379 = fVar395, fVar395 <= fVar402 + 1.0 / fVar5)) {
                        auVar203 = vfmadd213ss_fma(ZEXT416((uint)fVar5),auVar204,auVar205);
                        fVar379 = auVar203._0_4_ * fVar395;
                      }
                    }
                    *(float *)((long)&local_280->_vptr_Allocator + uVar186 * 4) = fVar379;
                    uVar186 = uVar186 + 1;
                  } while (uVar186 != uVar171);
                }
                local_280 = (Allocator *)((long)&local_280->_vptr_Allocator + lVar187 * 4);
                iVar175 = iVar175 + 1;
              } while (iVar175 != iVar11);
              p_Var168 = local_1d8[-3];
            }
            local_2f0 = local_2f0 + 1;
          } while (local_2f0 < *(int *)(&this->field_0xd0 + (long)p_Var168));
        }
      }
    }
  }
LAB_0027f987:
  pMVar159 = local_120;
  Deconvolution::cut_padding
            ((Deconvolution *)
             ((long)&this->_vptr_Deconvolution_x86_avx512 +
             (long)this->_vptr_Deconvolution_x86_avx512[-3]),&local_228,local_120,local_1c0);
  if ((pMVar159->data == (void *)0x0) || (iVar175 = 0, (long)pMVar159->c * pMVar159->cstep == 0)) {
    iVar175 = -100;
  }
LAB_0027f9d1:
  piVar14 = (int *)CONCAT44(local_228.refcount._4_4_,(int)local_228.refcount);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_228.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_228.data != (Allocator *)0x0) {
          free(local_228.data);
        }
      }
      else {
        (*(local_228.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar175;
}

Assistant:

int Deconvolution_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        gemm->forward(bottom_blob_2, top_col2im, opt_b);

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_load_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_load_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_load_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}